

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_8_0_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined1 (*pauVar1) [16];
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  unkbyte10 Var24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [14];
  undefined1 auVar27 [16];
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  bool bVar37;
  short sVar38;
  short sVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  short sVar62;
  short sVar64;
  short sVar66;
  short sVar68;
  short sVar70;
  short sVar72;
  short sVar74;
  short sVar76;
  short sVar79;
  short sVar80;
  short sVar85;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar39;
  undefined1 auVar49 [16];
  short sVar58;
  undefined1 auVar50 [16];
  short sVar40;
  short sVar60;
  short sVar86;
  undefined1 auVar51 [16];
  ushort uVar41;
  ushort uVar61;
  ushort uVar65;
  ushort uVar69;
  ushort uVar73;
  ushort uVar77;
  ushort uVar78;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  byte bVar106;
  ulong uVar107;
  byte bVar120;
  byte bVar121;
  byte bVar123;
  byte bVar124;
  byte bVar125;
  byte bVar126;
  byte bVar128;
  byte bVar129;
  byte bVar130;
  byte bVar131;
  byte bVar133;
  byte bVar134;
  byte bVar135;
  byte bVar136;
  byte bVar138;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  ushort uVar139;
  short sVar140;
  ushort uVar166;
  ushort uVar170;
  ushort uVar174;
  ushort uVar178;
  ushort uVar182;
  ushort uVar186;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  ushort uVar190;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  short sVar167;
  short sVar171;
  short sVar175;
  short sVar179;
  short sVar183;
  short sVar187;
  short sVar191;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  byte bVar194;
  byte bVar212;
  byte bVar213;
  byte bVar214;
  byte bVar215;
  byte bVar216;
  byte bVar217;
  byte bVar218;
  byte bVar219;
  byte bVar220;
  byte bVar221;
  byte bVar222;
  byte bVar223;
  byte bVar224;
  byte bVar225;
  undefined1 in_XMM4 [16];
  undefined1 auVar195 [16];
  byte bVar226;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  byte bVar227;
  short sVar229;
  byte bVar242;
  short sVar244;
  byte bVar246;
  short sVar248;
  byte bVar250;
  short sVar252;
  byte bVar254;
  short sVar256;
  byte bVar258;
  short sVar260;
  byte bVar262;
  short sVar264;
  byte bVar266;
  undefined1 in_XMM5 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  byte bVar241;
  byte bVar245;
  byte bVar249;
  byte bVar253;
  byte bVar257;
  byte bVar261;
  byte bVar265;
  byte bVar269;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  short sVar268;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  ushort uVar270;
  ushort uVar286;
  ushort uVar287;
  ushort uVar288;
  ushort uVar289;
  ushort uVar290;
  ushort uVar291;
  undefined1 in_XMM6 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  ushort uVar292;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  ushort uVar293;
  short sVar294;
  ushort uVar307;
  short sVar308;
  ushort uVar309;
  short sVar310;
  ushort uVar311;
  short sVar312;
  ushort uVar313;
  short sVar314;
  ushort uVar315;
  short sVar316;
  ushort uVar317;
  short sVar318;
  undefined1 in_XMM7 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  ushort uVar319;
  undefined1 auVar298 [16];
  ushort uVar320;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  short sVar321;
  ushort uVar322;
  ushort uVar333;
  ushort uVar334;
  ushort uVar335;
  ushort uVar336;
  ushort uVar337;
  ushort uVar338;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  ushort uVar339;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  short sVar348;
  short sVar349;
  short sVar363;
  short sVar364;
  short sVar365;
  short sVar366;
  short sVar367;
  short sVar369;
  short sVar371;
  short sVar372;
  short sVar374;
  byte bVar376;
  undefined1 in_XMM10 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  byte bVar375;
  byte bVar380;
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  short sVar378;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  short sVar379;
  ushort uVar381;
  byte bVar386;
  short sVar387;
  byte bVar390;
  short sVar391;
  byte bVar394;
  short sVar395;
  byte bVar398;
  short sVar399;
  byte bVar402;
  short sVar403;
  byte bVar405;
  short sVar406;
  byte bVar408;
  short sVar409;
  undefined1 auVar382 [16];
  byte bVar389;
  byte bVar393;
  byte bVar397;
  byte bVar401;
  byte bVar404;
  byte bVar407;
  byte bVar410;
  undefined1 auVar383 [16];
  ushort uVar388;
  ushort uVar392;
  ushort uVar396;
  ushort uVar400;
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  byte bVar411;
  byte bVar417;
  byte bVar418;
  byte bVar419;
  byte bVar420;
  byte bVar421;
  byte bVar422;
  byte bVar423;
  byte bVar424;
  byte bVar425;
  byte bVar426;
  byte bVar427;
  byte bVar428;
  byte bVar429;
  byte bVar430;
  undefined1 in_XMM12 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  byte bVar431;
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  byte bVar432;
  byte bVar440;
  byte bVar441;
  byte bVar442;
  byte bVar443;
  byte bVar444;
  byte bVar445;
  byte bVar446;
  byte bVar447;
  byte bVar448;
  byte bVar449;
  byte bVar450;
  byte bVar451;
  byte bVar452;
  byte bVar453;
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  byte bVar454;
  undefined1 auVar439 [16];
  byte bVar455;
  byte bVar459;
  byte bVar460;
  byte bVar461;
  byte bVar462;
  byte bVar463;
  byte bVar464;
  byte bVar465;
  byte bVar466;
  byte bVar467;
  byte bVar468;
  ushort uVar469;
  byte bVar471;
  ushort uVar472;
  byte bVar474;
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  byte bVar470;
  byte bVar473;
  byte bVar476;
  undefined1 auVar458 [16];
  ushort uVar475;
  ushort uVar477;
  ushort uVar478;
  ushort uVar484;
  ushort uVar485;
  ushort uVar486;
  ushort uVar487;
  ushort uVar488;
  ushort uVar489;
  ushort uVar490;
  ushort uVar491;
  ushort uVar492;
  ushort uVar493;
  ushort uVar494;
  ushort uVar495;
  ushort uVar496;
  ushort uVar497;
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  byte local_1f8;
  byte bStack_1f7;
  byte bStack_1f6;
  byte bStack_1f5;
  byte bStack_1f4;
  byte bStack_1f3;
  byte bStack_1f2;
  byte bStack_1f1;
  byte bStack_1f0;
  byte bStack_1ef;
  byte bStack_1ee;
  byte bStack_1ed;
  byte bStack_1ec;
  byte bStack_1eb;
  byte bStack_1ea;
  byte bStack_1e9;
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  byte local_1b8;
  byte bStack_1b7;
  byte bStack_1b6;
  byte bStack_1b5;
  byte bStack_1b4;
  byte bStack_1b3;
  byte bStack_1b2;
  byte bStack_1b1;
  byte bStack_1b0;
  byte bStack_1af;
  byte bStack_1ae;
  byte bStack_1ad;
  byte bStack_1ac;
  byte bStack_1ab;
  byte bStack_1aa;
  byte bStack_1a9;
  undefined1 local_198 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  byte bStack_e0;
  byte bStack_df;
  byte bStack_de;
  byte bStack_dd;
  byte bStack_dc;
  byte bStack_db;
  byte bStack_da;
  byte bStack_d9;
  short local_c8;
  short sStack_c6;
  short local_b8;
  short sStack_b6;
  short local_a8;
  short sStack_a6;
  undefined1 local_98 [16];
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short sVar59;
  short sVar63;
  short sVar67;
  short sVar71;
  short sVar75;
  short sVar122;
  short sVar127;
  short sVar132;
  short sVar137;
  short sVar141;
  short sVar168;
  short sVar169;
  short sVar172;
  short sVar173;
  short sVar176;
  short sVar177;
  short sVar180;
  short sVar181;
  short sVar184;
  short sVar185;
  short sVar188;
  short sVar189;
  short sVar192;
  short sVar193;
  short sVar228;
  short sVar243;
  short sVar247;
  short sVar251;
  short sVar255;
  short sVar259;
  short sVar263;
  short sVar267;
  short sVar368;
  short sVar370;
  short sVar373;
  short sVar377;
  
  bVar37 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar34 = (long)dir;
  lVar31 = (long)cdef_directions_padded[lVar34 + 2][0];
  lVar32 = (long)cdef_directions_padded[lVar34 + 2][1];
  lVar28 = (long)cdef_directions_padded[lVar34 + 4][0];
  lVar30 = (long)cdef_directions_padded[lVar34 + 4][1];
  lVar36 = (long)cdef_directions_padded[lVar34][0];
  lVar34 = (long)cdef_directions_padded[lVar34][1];
  if (block_width == 8) {
    local_98._0_4_ = pri_damping;
    if (pri_strength != 0) {
      iVar20 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar20 == 0; iVar20 = iVar20 + -1) {
        }
      }
      local_98._0_4_ = pri_damping - iVar20;
      if (pri_damping < iVar20) {
        local_98._0_4_ = 0;
      }
    }
    local_168._0_4_ = sec_damping;
    if (sec_strength != 0) {
      iVar20 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar20 == 0; iVar20 = iVar20 + -1) {
        }
      }
      local_168._0_4_ = sec_damping - iVar20;
      if (sec_damping < iVar20) {
        local_168._0_4_ = 0;
      }
    }
    auVar45 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
    uVar43 = auVar45._0_4_;
    auVar45 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
    uVar44 = auVar45._0_4_;
    uStack_1d4 = auVar45._0_2_;
    uStack_1d2 = auVar45._2_2_;
    auVar45 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
    auVar46 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
    for (lVar35 = 0; lVar35 < block_height; lVar35 = lVar35 + 2) {
      auVar57 = *(undefined1 (*) [16])in;
      pauVar1 = (undefined1 (*) [16])((long)in + 0x120);
      sVar42 = *(short *)*pauVar1;
      sVar62 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 2);
      sVar66 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 4);
      sVar70 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 6);
      sVar74 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 8);
      sVar79 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 10);
      sVar85 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 0xc);
      auVar26 = *(undefined1 (*) [14])*pauVar1;
      sVar191 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 0xe);
      auVar203 = *pauVar1;
      auVar195 = lddqu(in_XMM4,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar31 * 2));
      auVar230 = lddqu(in_XMM5,*(undefined1 (*) [16])
                                (*(undefined1 (*) [16])((long)in + 0x120) + lVar31 * 2));
      auVar350 = lddqu(in_XMM10,*(undefined1 (*) [16])((long)in + lVar31 * -2));
      auVar340 = lddqu(in_XMM9,*(undefined1 (*) [16])((long)in + lVar31 * -2 + 0x120));
      sVar171 = auVar195._0_2_;
      sVar348 = auVar57._0_2_;
      auVar142._0_2_ = sVar171 - sVar348;
      sVar122 = auVar195._2_2_;
      sVar363 = auVar57._2_2_;
      auVar142._2_2_ = sVar122 - sVar363;
      sVar175 = auVar195._4_2_;
      sVar365 = auVar57._4_2_;
      auVar142._4_2_ = sVar175 - sVar365;
      sVar127 = auVar195._6_2_;
      sVar366 = auVar57._6_2_;
      auVar142._6_2_ = sVar127 - sVar366;
      sVar179 = auVar195._8_2_;
      sVar369 = auVar57._8_2_;
      auVar142._8_2_ = sVar179 - sVar369;
      sVar132 = auVar195._10_2_;
      sVar371 = auVar57._10_2_;
      auVar142._10_2_ = sVar132 - sVar371;
      sVar183 = auVar195._12_2_;
      sVar137 = auVar195._14_2_;
      sVar374 = auVar57._12_2_;
      auVar142._12_2_ = sVar183 - sVar374;
      sVar378 = auVar57._14_2_;
      auVar142._14_2_ = sVar137 - sVar378;
      sVar187 = auVar230._0_2_;
      auVar231._0_2_ = sVar187 - sVar42;
      sVar141 = auVar230._2_2_;
      auVar231._2_2_ = sVar141 - sVar62;
      sVar168 = auVar230._4_2_;
      auVar231._4_2_ = sVar168 - sVar66;
      sVar169 = auVar230._6_2_;
      auVar231._6_2_ = sVar169 - sVar70;
      sVar172 = auVar230._8_2_;
      auVar231._8_2_ = sVar172 - sVar74;
      sVar173 = auVar230._10_2_;
      auVar231._10_2_ = sVar173 - sVar79;
      sVar176 = auVar230._12_2_;
      sVar177 = auVar230._14_2_;
      auVar231._12_2_ = sVar176 - sVar85;
      auVar231._14_2_ = sVar177 - sVar191;
      auVar271 = pabsw(in_XMM6,auVar142);
      auVar143 = psraw(auVar142,0xf);
      local_98._4_4_ = 0;
      uVar41 = auVar271._0_2_;
      auVar47._0_2_ = uVar41 >> local_98._0_8_;
      uVar61 = auVar271._2_2_;
      auVar47._2_2_ = uVar61 >> local_98._0_8_;
      uVar65 = auVar271._4_2_;
      auVar47._4_2_ = uVar65 >> local_98._0_8_;
      uVar477 = auVar271._6_2_;
      auVar47._6_2_ = uVar477 >> local_98._0_8_;
      uVar69 = auVar271._8_2_;
      auVar47._8_2_ = uVar69 >> local_98._0_8_;
      uVar73 = auVar271._10_2_;
      auVar47._10_2_ = uVar73 >> local_98._0_8_;
      uVar484 = auVar271._12_2_;
      uVar77 = auVar271._14_2_;
      auVar47._12_2_ = uVar484 >> local_98._0_8_;
      auVar47._14_2_ = uVar77 >> local_98._0_8_;
      auVar271 = pabsw(in_XMM7,auVar231);
      uVar81 = auVar271._0_2_;
      auVar323._0_2_ = uVar81 >> local_98._0_8_;
      uVar486 = auVar271._2_2_;
      auVar323._2_2_ = uVar486 >> local_98._0_8_;
      uVar87 = auVar271._4_2_;
      auVar323._4_2_ = uVar87 >> local_98._0_8_;
      uVar488 = auVar271._6_2_;
      auVar323._6_2_ = uVar488 >> local_98._0_8_;
      uVar490 = auVar271._8_2_;
      auVar323._8_2_ = uVar490 >> local_98._0_8_;
      uVar492 = auVar271._10_2_;
      auVar323._10_2_ = uVar492 >> local_98._0_8_;
      uVar494 = auVar271._12_2_;
      uVar496 = auVar271._14_2_;
      auVar323._12_2_ = uVar494 >> local_98._0_8_;
      auVar323._14_2_ = uVar496 >> local_98._0_8_;
      auVar232 = psraw(auVar231,0xf);
      auVar27._4_4_ = uVar43;
      auVar27._0_4_ = uVar43;
      auVar27._8_4_ = uVar43;
      auVar27._12_4_ = uVar43;
      auVar91 = psubusw(auVar27,auVar47);
      auVar271 = psubusw(auVar27,auVar323);
      sVar39 = auVar91._0_2_;
      sVar58 = auVar91._2_2_;
      sVar71 = auVar91._4_2_;
      sVar72 = auVar91._6_2_;
      sVar75 = auVar91._8_2_;
      sVar76 = auVar91._10_2_;
      sVar140 = auVar91._12_2_;
      sVar80 = auVar91._14_2_;
      sVar38 = auVar271._0_2_;
      sVar40 = auVar271._2_2_;
      sVar59 = auVar271._4_2_;
      sVar60 = auVar271._6_2_;
      sVar63 = auVar271._8_2_;
      sVar64 = auVar271._10_2_;
      sVar67 = auVar271._12_2_;
      sVar68 = auVar271._14_2_;
      auVar92._0_2_ =
           (((short)uVar41 < sVar39) * uVar41 | (ushort)((short)uVar41 >= sVar39) * sVar39) +
           auVar143._0_2_;
      auVar92._2_2_ =
           (((short)uVar61 < sVar58) * uVar61 | (ushort)((short)uVar61 >= sVar58) * sVar58) +
           auVar143._2_2_;
      auVar92._4_2_ =
           (((short)uVar65 < sVar71) * uVar65 | (ushort)((short)uVar65 >= sVar71) * sVar71) +
           auVar143._4_2_;
      auVar92._6_2_ =
           (((short)uVar477 < sVar72) * uVar477 | (ushort)((short)uVar477 >= sVar72) * sVar72) +
           auVar143._6_2_;
      auVar92._8_2_ =
           (((short)uVar69 < sVar75) * uVar69 | (ushort)((short)uVar69 >= sVar75) * sVar75) +
           auVar143._8_2_;
      auVar92._10_2_ =
           (((short)uVar73 < sVar76) * uVar73 | (ushort)((short)uVar73 >= sVar76) * sVar76) +
           auVar143._10_2_;
      auVar92._12_2_ =
           (((short)uVar484 < sVar140) * uVar484 | (ushort)((short)uVar484 >= sVar140) * sVar140) +
           auVar143._12_2_;
      auVar92._14_2_ =
           (((short)uVar77 < sVar80) * uVar77 | (ushort)((short)uVar77 >= sVar80) * sVar80) +
           auVar143._14_2_;
      auVar48._0_2_ =
           (((short)uVar81 < sVar38) * uVar81 | (ushort)((short)uVar81 >= sVar38) * sVar38) +
           auVar232._0_2_;
      auVar48._2_2_ =
           (((short)uVar486 < sVar40) * uVar486 | (ushort)((short)uVar486 >= sVar40) * sVar40) +
           auVar232._2_2_;
      auVar48._4_2_ =
           (((short)uVar87 < sVar59) * uVar87 | (ushort)((short)uVar87 >= sVar59) * sVar59) +
           auVar232._4_2_;
      auVar48._6_2_ =
           (((short)uVar488 < sVar60) * uVar488 | (ushort)((short)uVar488 >= sVar60) * sVar60) +
           auVar232._6_2_;
      auVar48._8_2_ =
           (((short)uVar490 < sVar63) * uVar490 | (ushort)((short)uVar490 >= sVar63) * sVar63) +
           auVar232._8_2_;
      auVar48._10_2_ =
           (((short)uVar492 < sVar64) * uVar492 | (ushort)((short)uVar492 >= sVar64) * sVar64) +
           auVar232._10_2_;
      auVar48._12_2_ =
           (((short)uVar494 < sVar67) * uVar494 | (ushort)((short)uVar494 >= sVar67) * sVar67) +
           auVar232._12_2_;
      auVar48._14_2_ =
           (((short)uVar496 < sVar68) * uVar496 | (ushort)((short)uVar496 >= sVar68) * sVar68) +
           auVar232._14_2_;
      auVar92 = auVar92 ^ auVar143;
      auVar48 = auVar48 ^ auVar232;
      sVar180 = auVar350._0_2_;
      auVar272._0_2_ = sVar180 - sVar348;
      sVar184 = auVar350._2_2_;
      auVar272._2_2_ = sVar184 - sVar363;
      sVar188 = auVar350._4_2_;
      auVar272._4_2_ = sVar188 - sVar365;
      sVar192 = auVar350._6_2_;
      auVar272._6_2_ = sVar192 - sVar366;
      sVar228 = auVar350._8_2_;
      auVar272._8_2_ = sVar228 - sVar369;
      sVar243 = auVar350._10_2_;
      auVar272._10_2_ = sVar243 - sVar371;
      sVar247 = auVar350._12_2_;
      sVar251 = auVar350._14_2_;
      auVar272._12_2_ = sVar247 - sVar374;
      auVar272._14_2_ = sVar251 - sVar378;
      sVar255 = auVar340._0_2_;
      auVar295._0_2_ = sVar255 - sVar42;
      sVar259 = auVar340._2_2_;
      auVar295._2_2_ = sVar259 - sVar62;
      sVar263 = auVar340._4_2_;
      auVar295._4_2_ = sVar263 - sVar66;
      sVar267 = auVar340._6_2_;
      auVar295._6_2_ = sVar267 - sVar70;
      sVar294 = auVar340._8_2_;
      auVar295._8_2_ = sVar294 - sVar74;
      sVar310 = auVar340._10_2_;
      auVar295._10_2_ = sVar310 - sVar79;
      sVar314 = auVar340._12_2_;
      sVar318 = auVar340._14_2_;
      auVar295._12_2_ = sVar314 - sVar85;
      auVar295._14_2_ = sVar318 - sVar191;
      auVar324 = pabsw(auVar323,auVar272);
      auVar143 = psraw(auVar272,0xf);
      uVar41 = auVar324._0_2_;
      auVar144._0_2_ = uVar41 >> local_98._0_8_;
      uVar61 = auVar324._2_2_;
      auVar144._2_2_ = uVar61 >> local_98._0_8_;
      uVar65 = auVar324._4_2_;
      auVar144._4_2_ = uVar65 >> local_98._0_8_;
      uVar477 = auVar324._6_2_;
      auVar144._6_2_ = uVar477 >> local_98._0_8_;
      uVar69 = auVar324._8_2_;
      auVar144._8_2_ = uVar69 >> local_98._0_8_;
      uVar73 = auVar324._10_2_;
      auVar144._10_2_ = uVar73 >> local_98._0_8_;
      uVar484 = auVar324._12_2_;
      uVar77 = auVar324._14_2_;
      auVar144._12_2_ = uVar484 >> local_98._0_8_;
      auVar144._14_2_ = uVar77 >> local_98._0_8_;
      auVar341 = pabsw(auVar340,auVar295);
      uVar81 = auVar341._0_2_;
      auVar351._0_2_ = uVar81 >> local_98._0_8_;
      uVar486 = auVar341._2_2_;
      auVar351._2_2_ = uVar486 >> local_98._0_8_;
      uVar87 = auVar341._4_2_;
      auVar351._4_2_ = uVar87 >> local_98._0_8_;
      uVar488 = auVar341._6_2_;
      auVar351._6_2_ = uVar488 >> local_98._0_8_;
      uVar490 = auVar341._8_2_;
      auVar351._8_2_ = uVar490 >> local_98._0_8_;
      uVar492 = auVar341._10_2_;
      auVar351._10_2_ = uVar492 >> local_98._0_8_;
      uVar494 = auVar341._12_2_;
      uVar496 = auVar341._14_2_;
      auVar351._12_2_ = uVar494 >> local_98._0_8_;
      auVar351._14_2_ = uVar496 >> local_98._0_8_;
      auVar232 = psraw(auVar295,0xf);
      auVar91 = psubusw(auVar27,auVar144);
      auVar271 = psubusw(auVar27,auVar351);
      sVar39 = auVar91._0_2_;
      sVar58 = auVar91._2_2_;
      sVar71 = auVar91._4_2_;
      sVar72 = auVar91._6_2_;
      sVar75 = auVar91._8_2_;
      sVar76 = auVar91._10_2_;
      sVar140 = auVar91._12_2_;
      sVar80 = auVar91._14_2_;
      sVar38 = auVar271._0_2_;
      sVar40 = auVar271._2_2_;
      sVar59 = auVar271._4_2_;
      sVar60 = auVar271._6_2_;
      sVar63 = auVar271._8_2_;
      sVar64 = auVar271._10_2_;
      sVar67 = auVar271._12_2_;
      sVar68 = auVar271._14_2_;
      auVar233._0_2_ =
           (((short)uVar41 < sVar39) * uVar41 | (ushort)((short)uVar41 >= sVar39) * sVar39) +
           auVar143._0_2_;
      auVar233._2_2_ =
           (((short)uVar61 < sVar58) * uVar61 | (ushort)((short)uVar61 >= sVar58) * sVar58) +
           auVar143._2_2_;
      auVar233._4_2_ =
           (((short)uVar65 < sVar71) * uVar65 | (ushort)((short)uVar65 >= sVar71) * sVar71) +
           auVar143._4_2_;
      auVar233._6_2_ =
           (((short)uVar477 < sVar72) * uVar477 | (ushort)((short)uVar477 >= sVar72) * sVar72) +
           auVar143._6_2_;
      auVar233._8_2_ =
           (((short)uVar69 < sVar75) * uVar69 | (ushort)((short)uVar69 >= sVar75) * sVar75) +
           auVar143._8_2_;
      auVar233._10_2_ =
           (((short)uVar73 < sVar76) * uVar73 | (ushort)((short)uVar73 >= sVar76) * sVar76) +
           auVar143._10_2_;
      auVar233._12_2_ =
           (((short)uVar484 < sVar140) * uVar484 | (ushort)((short)uVar484 >= sVar140) * sVar140) +
           auVar143._12_2_;
      auVar233._14_2_ =
           (((short)uVar77 < sVar80) * uVar77 | (ushort)((short)uVar77 >= sVar80) * sVar80) +
           auVar143._14_2_;
      auVar145._0_2_ =
           (((short)uVar81 < sVar38) * uVar81 | (ushort)((short)uVar81 >= sVar38) * sVar38) +
           auVar232._0_2_;
      auVar145._2_2_ =
           (((short)uVar486 < sVar40) * uVar486 | (ushort)((short)uVar486 >= sVar40) * sVar40) +
           auVar232._2_2_;
      auVar145._4_2_ =
           (((short)uVar87 < sVar59) * uVar87 | (ushort)((short)uVar87 >= sVar59) * sVar59) +
           auVar232._4_2_;
      auVar145._6_2_ =
           (((short)uVar488 < sVar60) * uVar488 | (ushort)((short)uVar488 >= sVar60) * sVar60) +
           auVar232._6_2_;
      auVar145._8_2_ =
           (((short)uVar490 < sVar63) * uVar490 | (ushort)((short)uVar490 >= sVar63) * sVar63) +
           auVar232._8_2_;
      auVar145._10_2_ =
           (((short)uVar492 < sVar64) * uVar492 | (ushort)((short)uVar492 >= sVar64) * sVar64) +
           auVar232._10_2_;
      auVar145._12_2_ =
           (((short)uVar494 < sVar67) * uVar494 | (ushort)((short)uVar494 >= sVar67) * sVar67) +
           auVar232._12_2_;
      auVar145._14_2_ =
           (((short)uVar496 < sVar68) * uVar496 | (ushort)((short)uVar496 >= sVar68) * sVar68) +
           auVar232._14_2_;
      auVar233 = auVar233 ^ auVar143;
      auVar145 = auVar145 ^ auVar232;
      auVar271 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar37][0]),
                         ZEXT416((uint)cdef_pri_taps[bVar37][0]),0);
      auVar49._0_4_ = auVar271._0_4_;
      auVar49._4_4_ = auVar49._0_4_;
      auVar49._8_4_ = auVar49._0_4_;
      auVar49._12_4_ = auVar49._0_4_;
      sVar39 = auVar271._0_2_;
      sVar58 = auVar271._2_2_;
      auVar271 = lddqu(auVar49,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar32 * 2));
      auVar232 = lddqu(auVar232,*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])((long)in + 0x120) + lVar32 * 2));
      sVar38 = auVar271._0_2_;
      auVar50._0_2_ = sVar38 - sVar348;
      sVar59 = auVar271._2_2_;
      auVar50._2_2_ = sVar59 - sVar363;
      sVar63 = auVar271._4_2_;
      auVar50._4_2_ = sVar63 - sVar365;
      sVar67 = auVar271._6_2_;
      auVar50._6_2_ = sVar67 - sVar366;
      sVar71 = auVar271._8_2_;
      auVar50._8_2_ = sVar71 - sVar369;
      sVar75 = auVar271._10_2_;
      auVar50._10_2_ = sVar75 - sVar371;
      sVar140 = auVar271._12_2_;
      sVar167 = auVar271._14_2_;
      auVar50._12_2_ = sVar140 - sVar374;
      auVar50._14_2_ = sVar167 - sVar378;
      sVar256 = auVar232._0_2_;
      auVar296._0_2_ = sVar256 - sVar42;
      sVar260 = auVar232._2_2_;
      auVar296._2_2_ = sVar260 - sVar62;
      sVar264 = auVar232._4_2_;
      auVar296._4_2_ = sVar264 - sVar66;
      sVar268 = auVar232._6_2_;
      auVar296._6_2_ = sVar268 - sVar70;
      sVar308 = auVar232._8_2_;
      auVar296._8_2_ = sVar308 - sVar74;
      sVar312 = auVar232._10_2_;
      auVar296._10_2_ = sVar312 - sVar79;
      sVar316 = auVar232._12_2_;
      sVar321 = auVar232._14_2_;
      auVar296._12_2_ = sVar316 - sVar85;
      auVar296._14_2_ = sVar321 - sVar191;
      auVar324 = pabsw(auVar324,auVar50);
      uVar41 = auVar324._0_2_;
      auVar93._0_2_ = uVar41 >> local_98._0_8_;
      uVar61 = auVar324._2_2_;
      auVar93._2_2_ = uVar61 >> local_98._0_8_;
      uVar65 = auVar324._4_2_;
      auVar93._4_2_ = uVar65 >> local_98._0_8_;
      uVar477 = auVar324._6_2_;
      auVar93._6_2_ = uVar477 >> local_98._0_8_;
      uVar69 = auVar324._8_2_;
      auVar93._8_2_ = uVar69 >> local_98._0_8_;
      uVar73 = auVar324._10_2_;
      auVar93._10_2_ = uVar73 >> local_98._0_8_;
      uVar484 = auVar324._12_2_;
      uVar77 = auVar324._14_2_;
      auVar93._12_2_ = uVar484 >> local_98._0_8_;
      auVar93._14_2_ = uVar77 >> local_98._0_8_;
      auVar342 = pabsw(auVar341,auVar296);
      auVar91 = psubusw(auVar27,auVar93);
      uVar81 = auVar342._0_2_;
      auVar352._0_2_ = uVar81 >> local_98._0_8_;
      uVar486 = auVar342._2_2_;
      auVar352._2_2_ = uVar486 >> local_98._0_8_;
      uVar87 = auVar342._4_2_;
      auVar352._4_2_ = uVar87 >> local_98._0_8_;
      uVar488 = auVar342._6_2_;
      auVar352._6_2_ = uVar488 >> local_98._0_8_;
      uVar490 = auVar342._8_2_;
      auVar352._8_2_ = uVar490 >> local_98._0_8_;
      uVar492 = auVar342._10_2_;
      auVar352._10_2_ = uVar492 >> local_98._0_8_;
      uVar494 = auVar342._12_2_;
      uVar496 = auVar342._14_2_;
      auVar352._12_2_ = uVar494 >> local_98._0_8_;
      auVar352._14_2_ = uVar496 >> local_98._0_8_;
      auVar143 = psubusw(auVar27,auVar352);
      sVar181 = auVar91._0_2_;
      sVar185 = auVar91._2_2_;
      sVar189 = auVar91._4_2_;
      sVar193 = auVar91._6_2_;
      sVar229 = auVar91._8_2_;
      sVar244 = auVar91._10_2_;
      sVar248 = auVar91._12_2_;
      sVar252 = auVar91._14_2_;
      auVar341 = lddqu(auVar324,*(undefined1 (*) [16])((long)in + lVar32 * -2));
      auVar91 = psraw(auVar50,0xf);
      auVar324 = psraw(auVar296,0xf);
      sVar40 = auVar143._0_2_;
      sVar60 = auVar143._2_2_;
      sVar64 = auVar143._4_2_;
      sVar68 = auVar143._6_2_;
      sVar72 = auVar143._8_2_;
      sVar76 = auVar143._10_2_;
      sVar80 = auVar143._12_2_;
      sVar86 = auVar143._14_2_;
      auVar273._0_2_ =
           (((short)uVar41 < sVar181) * uVar41 | (ushort)((short)uVar41 >= sVar181) * sVar181) +
           auVar91._0_2_;
      auVar273._2_2_ =
           (((short)uVar61 < sVar185) * uVar61 | (ushort)((short)uVar61 >= sVar185) * sVar185) +
           auVar91._2_2_;
      auVar273._4_2_ =
           (((short)uVar65 < sVar189) * uVar65 | (ushort)((short)uVar65 >= sVar189) * sVar189) +
           auVar91._4_2_;
      auVar273._6_2_ =
           (((short)uVar477 < sVar193) * uVar477 | (ushort)((short)uVar477 >= sVar193) * sVar193) +
           auVar91._6_2_;
      auVar273._8_2_ =
           (((short)uVar69 < sVar229) * uVar69 | (ushort)((short)uVar69 >= sVar229) * sVar229) +
           auVar91._8_2_;
      auVar273._10_2_ =
           (((short)uVar73 < sVar244) * uVar73 | (ushort)((short)uVar73 >= sVar244) * sVar244) +
           auVar91._10_2_;
      auVar273._12_2_ =
           (((short)uVar484 < sVar248) * uVar484 | (ushort)((short)uVar484 >= sVar248) * sVar248) +
           auVar91._12_2_;
      auVar273._14_2_ =
           (((short)uVar77 < sVar252) * uVar77 | (ushort)((short)uVar77 >= sVar252) * sVar252) +
           auVar91._14_2_;
      auVar94._0_2_ =
           (((short)uVar81 < sVar40) * uVar81 | (ushort)((short)uVar81 >= sVar40) * sVar40) +
           auVar324._0_2_;
      auVar94._2_2_ =
           (((short)uVar486 < sVar60) * uVar486 | (ushort)((short)uVar486 >= sVar60) * sVar60) +
           auVar324._2_2_;
      auVar94._4_2_ =
           (((short)uVar87 < sVar64) * uVar87 | (ushort)((short)uVar87 >= sVar64) * sVar64) +
           auVar324._4_2_;
      auVar94._6_2_ =
           (((short)uVar488 < sVar68) * uVar488 | (ushort)((short)uVar488 >= sVar68) * sVar68) +
           auVar324._6_2_;
      auVar94._8_2_ =
           (((short)uVar490 < sVar72) * uVar490 | (ushort)((short)uVar490 >= sVar72) * sVar72) +
           auVar324._8_2_;
      auVar94._10_2_ =
           (((short)uVar492 < sVar76) * uVar492 | (ushort)((short)uVar492 >= sVar76) * sVar76) +
           auVar324._10_2_;
      auVar94._12_2_ =
           (((short)uVar494 < sVar80) * uVar494 | (ushort)((short)uVar494 >= sVar80) * sVar80) +
           auVar324._12_2_;
      auVar94._14_2_ =
           (((short)uVar496 < sVar86) * uVar496 | (ushort)((short)uVar496 >= sVar86) * sVar86) +
           auVar324._14_2_;
      auVar273 = auVar273 ^ auVar91;
      auVar94 = auVar94 ^ auVar324;
      sVar185 = auVar341._0_2_;
      auVar325._0_2_ = sVar185 - sVar348;
      sVar189 = auVar341._2_2_;
      auVar325._2_2_ = sVar189 - sVar363;
      sVar193 = auVar341._4_2_;
      auVar325._4_2_ = sVar193 - sVar365;
      sVar229 = auVar341._6_2_;
      auVar325._6_2_ = sVar229 - sVar366;
      sVar244 = auVar341._8_2_;
      auVar325._8_2_ = sVar244 - sVar369;
      sVar248 = auVar341._10_2_;
      auVar325._10_2_ = sVar248 - sVar371;
      sVar252 = auVar341._12_2_;
      sVar349 = auVar341._14_2_;
      auVar325._12_2_ = sVar252 - sVar374;
      auVar325._14_2_ = sVar349 - sVar378;
      auVar91 = pabsw(auVar342,auVar325);
      uVar41 = auVar91._0_2_;
      auVar297._0_2_ = uVar41 >> local_98._0_8_;
      uVar61 = auVar91._2_2_;
      auVar297._2_2_ = uVar61 >> local_98._0_8_;
      uVar65 = auVar91._4_2_;
      auVar297._4_2_ = uVar65 >> local_98._0_8_;
      uVar477 = auVar91._6_2_;
      auVar297._6_2_ = uVar477 >> local_98._0_8_;
      uVar69 = auVar91._8_2_;
      auVar297._8_2_ = uVar69 >> local_98._0_8_;
      uVar73 = auVar91._10_2_;
      auVar297._10_2_ = uVar73 >> local_98._0_8_;
      uVar484 = auVar91._12_2_;
      uVar77 = auVar91._14_2_;
      auVar297._12_2_ = uVar484 >> local_98._0_8_;
      auVar297._14_2_ = uVar77 >> local_98._0_8_;
      auVar91 = psubusw(auVar27,auVar297);
      auVar143 = lddqu(auVar297,*(undefined1 (*) [16])((long)in + lVar32 * -2 + 0x120));
      sVar364 = auVar143._0_2_;
      auVar353._0_2_ = sVar364 - sVar42;
      sVar367 = auVar143._2_2_;
      auVar353._2_2_ = sVar367 - sVar62;
      sVar372 = auVar143._4_2_;
      auVar353._4_2_ = sVar372 - sVar66;
      sVar379 = auVar143._6_2_;
      auVar353._6_2_ = sVar379 - sVar70;
      sVar368 = auVar143._8_2_;
      auVar353._8_2_ = sVar368 - sVar74;
      sVar370 = auVar143._10_2_;
      auVar353._10_2_ = sVar370 - sVar79;
      sVar373 = auVar143._12_2_;
      sVar377 = auVar143._14_2_;
      auVar353._12_2_ = sVar373 - sVar85;
      auVar353._14_2_ = sVar377 - sVar191;
      auVar324 = pabsw(in_XMM12,auVar353);
      uVar81 = auVar324._0_2_;
      auVar433._0_2_ = uVar81 >> local_98._0_8_;
      uVar486 = auVar324._2_2_;
      auVar433._2_2_ = uVar486 >> local_98._0_8_;
      uVar87 = auVar324._4_2_;
      auVar433._4_2_ = uVar87 >> local_98._0_8_;
      uVar488 = auVar324._6_2_;
      auVar433._6_2_ = uVar488 >> local_98._0_8_;
      uVar490 = auVar324._8_2_;
      auVar433._8_2_ = uVar490 >> local_98._0_8_;
      uVar492 = auVar324._10_2_;
      auVar433._10_2_ = uVar492 >> local_98._0_8_;
      uVar494 = auVar324._12_2_;
      uVar496 = auVar324._14_2_;
      auVar433._12_2_ = uVar494 >> local_98._0_8_;
      auVar433._14_2_ = uVar496 >> local_98._0_8_;
      auVar324 = psubusw(auVar27,auVar433);
      sVar40 = auVar91._0_2_;
      sVar60 = auVar91._2_2_;
      sVar64 = auVar91._4_2_;
      sVar68 = auVar91._6_2_;
      sVar72 = auVar91._8_2_;
      sVar76 = auVar91._10_2_;
      sVar80 = auVar91._12_2_;
      sVar86 = auVar91._14_2_;
      sVar181 = auVar324._0_2_;
      sVar387 = auVar324._2_2_;
      sVar391 = auVar324._4_2_;
      sVar395 = auVar324._6_2_;
      sVar399 = auVar324._8_2_;
      sVar403 = auVar324._10_2_;
      sVar406 = auVar324._12_2_;
      sVar409 = auVar324._14_2_;
      auVar324 = psraw(auVar325,0xf);
      auVar51._0_2_ =
           (((short)uVar41 < sVar40) * uVar41 | (ushort)((short)uVar41 >= sVar40) * sVar40) +
           auVar324._0_2_;
      auVar51._2_2_ =
           (((short)uVar61 < sVar60) * uVar61 | (ushort)((short)uVar61 >= sVar60) * sVar60) +
           auVar324._2_2_;
      auVar51._4_2_ =
           (((short)uVar65 < sVar64) * uVar65 | (ushort)((short)uVar65 >= sVar64) * sVar64) +
           auVar324._4_2_;
      auVar51._6_2_ =
           (((short)uVar477 < sVar68) * uVar477 | (ushort)((short)uVar477 >= sVar68) * sVar68) +
           auVar324._6_2_;
      auVar51._8_2_ =
           (((short)uVar69 < sVar72) * uVar69 | (ushort)((short)uVar69 >= sVar72) * sVar72) +
           auVar324._8_2_;
      auVar51._10_2_ =
           (((short)uVar73 < sVar76) * uVar73 | (ushort)((short)uVar73 >= sVar76) * sVar76) +
           auVar324._10_2_;
      auVar51._12_2_ =
           (((short)uVar484 < sVar80) * uVar484 | (ushort)((short)uVar484 >= sVar80) * sVar80) +
           auVar324._12_2_;
      auVar51._14_2_ =
           (((short)uVar77 < sVar86) * uVar77 | (ushort)((short)uVar77 >= sVar86) * sVar86) +
           auVar324._14_2_;
      auVar51 = auVar51 ^ auVar324;
      auVar342 = psraw(auVar353,0xf);
      auVar382._0_2_ =
           (((short)uVar81 < sVar181) * uVar81 | (ushort)((short)uVar81 >= sVar181) * sVar181) +
           auVar342._0_2_;
      auVar382._2_2_ =
           (((short)uVar486 < sVar387) * uVar486 | (ushort)((short)uVar486 >= sVar387) * sVar387) +
           auVar342._2_2_;
      auVar382._4_2_ =
           (((short)uVar87 < sVar391) * uVar87 | (ushort)((short)uVar87 >= sVar391) * sVar391) +
           auVar342._4_2_;
      auVar382._6_2_ =
           (((short)uVar488 < sVar395) * uVar488 | (ushort)((short)uVar488 >= sVar395) * sVar395) +
           auVar342._6_2_;
      auVar382._8_2_ =
           (((short)uVar490 < sVar399) * uVar490 | (ushort)((short)uVar490 >= sVar399) * sVar399) +
           auVar342._8_2_;
      auVar382._10_2_ =
           (((short)uVar492 < sVar403) * uVar492 | (ushort)((short)uVar492 >= sVar403) * sVar403) +
           auVar342._10_2_;
      auVar382._12_2_ =
           (((short)uVar494 < sVar406) * uVar494 | (ushort)((short)uVar494 >= sVar406) * sVar406) +
           auVar342._12_2_;
      auVar382._14_2_ =
           (((short)uVar496 < sVar409) * uVar496 | (ushort)((short)uVar496 >= sVar409) * sVar409) +
           auVar342._14_2_;
      auVar382 = auVar382 ^ auVar342;
      auVar91 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar37][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar37][1]),0);
      sVar72 = auVar91._0_2_;
      sVar76 = auVar91._2_2_;
      auVar95._0_2_ = (ushort)(sVar171 < sVar348) * sVar171 | (ushort)(sVar171 >= sVar348) * sVar348
      ;
      auVar95._2_2_ = (ushort)(sVar122 < sVar363) * sVar122 | (ushort)(sVar122 >= sVar363) * sVar363
      ;
      auVar95._4_2_ = (ushort)(sVar175 < sVar365) * sVar175 | (ushort)(sVar175 >= sVar365) * sVar365
      ;
      auVar95._6_2_ = (ushort)(sVar127 < sVar366) * sVar127 | (ushort)(sVar127 >= sVar366) * sVar366
      ;
      auVar95._8_2_ = (ushort)(sVar179 < sVar369) * sVar179 | (ushort)(sVar179 >= sVar369) * sVar369
      ;
      auVar95._10_2_ =
           (ushort)(sVar132 < sVar371) * sVar132 | (ushort)(sVar132 >= sVar371) * sVar371;
      auVar95._12_2_ =
           (ushort)(sVar183 < sVar374) * sVar183 | (ushort)(sVar183 >= sVar374) * sVar374;
      auVar95._14_2_ =
           (ushort)(sVar137 < sVar378) * sVar137 | (ushort)(sVar137 >= sVar378) * sVar378;
      bVar269 = auVar350[0];
      bVar106 = auVar195[0];
      bVar194 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[1];
      bVar106 = auVar195[1];
      bVar212 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[2];
      bVar106 = auVar195[2];
      bVar213 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[3];
      bVar106 = auVar195[3];
      bVar214 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[4];
      bVar106 = auVar195[4];
      bVar215 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[5];
      bVar106 = auVar195[5];
      bVar216 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[6];
      bVar106 = auVar195[6];
      bVar217 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[7];
      bVar106 = auVar195[7];
      bVar218 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[8];
      bVar106 = auVar195[8];
      bVar219 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[9];
      bVar106 = auVar195[9];
      bVar220 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[10];
      bVar106 = auVar195[10];
      bVar221 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[0xb];
      bVar106 = auVar195[0xb];
      bVar222 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[0xc];
      bVar106 = auVar195[0xc];
      bVar223 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[0xd];
      bVar106 = auVar195[0xd];
      bVar224 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[0xe];
      bVar106 = auVar195[0xe];
      bVar120 = auVar195[0xf];
      bVar225 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar350[0xf];
      bVar226 = (bVar120 < bVar269) * bVar269 | (bVar120 >= bVar269) * bVar120;
      auVar146._0_2_ = (ushort)(sVar187 < sVar42) * sVar187 | (ushort)(sVar187 >= sVar42) * sVar42;
      auVar146._2_2_ = (ushort)(sVar141 < sVar62) * sVar141 | (ushort)(sVar141 >= sVar62) * sVar62;
      auVar146._4_2_ = (ushort)(sVar168 < sVar66) * sVar168 | (ushort)(sVar168 >= sVar66) * sVar66;
      auVar146._6_2_ = (ushort)(sVar169 < sVar70) * sVar169 | (ushort)(sVar169 >= sVar70) * sVar70;
      auVar146._8_2_ = (ushort)(sVar172 < sVar74) * sVar172 | (ushort)(sVar172 >= sVar74) * sVar74;
      auVar146._10_2_ = (ushort)(sVar173 < sVar79) * sVar173 | (ushort)(sVar173 >= sVar79) * sVar79;
      auVar146._12_2_ = (ushort)(sVar176 < sVar85) * sVar176 | (ushort)(sVar176 >= sVar85) * sVar85;
      auVar146._14_2_ =
           (ushort)(sVar177 < sVar191) * sVar177 | (ushort)(sVar177 >= sVar191) * sVar191;
      bVar269 = auVar340[0];
      bVar106 = auVar230[0];
      bVar106 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar340[1];
      bVar120 = auVar230[1];
      bVar120 = (bVar120 < bVar269) * bVar269 | (bVar120 >= bVar269) * bVar120;
      bVar269 = auVar340[2];
      bVar121 = auVar230[2];
      bVar121 = (bVar121 < bVar269) * bVar269 | (bVar121 >= bVar269) * bVar121;
      bVar269 = auVar340[3];
      bVar123 = auVar230[3];
      bVar123 = (bVar123 < bVar269) * bVar269 | (bVar123 >= bVar269) * bVar123;
      bVar269 = auVar340[4];
      bVar124 = auVar230[4];
      bVar124 = (bVar124 < bVar269) * bVar269 | (bVar124 >= bVar269) * bVar124;
      bVar269 = auVar340[5];
      bVar125 = auVar230[5];
      bVar125 = (bVar125 < bVar269) * bVar269 | (bVar125 >= bVar269) * bVar125;
      bVar269 = auVar340[6];
      bVar126 = auVar230[6];
      bVar126 = (bVar126 < bVar269) * bVar269 | (bVar126 >= bVar269) * bVar126;
      bVar269 = auVar340[7];
      bVar128 = auVar230[7];
      bVar128 = (bVar128 < bVar269) * bVar269 | (bVar128 >= bVar269) * bVar128;
      bVar269 = auVar340[8];
      bVar129 = auVar230[8];
      bVar129 = (bVar129 < bVar269) * bVar269 | (bVar129 >= bVar269) * bVar129;
      bVar269 = auVar340[9];
      bVar130 = auVar230[9];
      bVar130 = (bVar130 < bVar269) * bVar269 | (bVar130 >= bVar269) * bVar130;
      bVar269 = auVar340[10];
      bVar131 = auVar230[10];
      bVar131 = (bVar131 < bVar269) * bVar269 | (bVar131 >= bVar269) * bVar131;
      bVar269 = auVar340[0xb];
      bVar133 = auVar230[0xb];
      bVar133 = (bVar133 < bVar269) * bVar269 | (bVar133 >= bVar269) * bVar133;
      bVar269 = auVar340[0xc];
      bVar134 = auVar230[0xc];
      bVar134 = (bVar134 < bVar269) * bVar269 | (bVar134 >= bVar269) * bVar134;
      bVar269 = auVar340[0xd];
      bVar135 = auVar230[0xd];
      bVar135 = (bVar135 < bVar269) * bVar269 | (bVar135 >= bVar269) * bVar135;
      bVar269 = auVar340[0xe];
      bVar136 = auVar230[0xe];
      bVar138 = auVar230[0xf];
      bVar136 = (bVar136 < bVar269) * bVar269 | (bVar136 >= bVar269) * bVar136;
      bVar269 = auVar340[0xf];
      bVar138 = (bVar138 < bVar269) * bVar269 | (bVar138 >= bVar269) * bVar138;
      uVar477 = (ushort)(sVar38 < sVar180) * sVar38 | (ushort)(sVar38 >= sVar180) * sVar180;
      uVar484 = (ushort)(sVar59 < sVar184) * sVar59 | (ushort)(sVar59 >= sVar184) * sVar184;
      uVar486 = (ushort)(sVar63 < sVar188) * sVar63 | (ushort)(sVar63 >= sVar188) * sVar188;
      uVar488 = (ushort)(sVar67 < sVar192) * sVar67 | (ushort)(sVar67 >= sVar192) * sVar192;
      uVar490 = (ushort)(sVar71 < sVar228) * sVar71 | (ushort)(sVar71 >= sVar228) * sVar228;
      uVar492 = (ushort)(sVar75 < sVar243) * sVar75 | (ushort)(sVar75 >= sVar243) * sVar243;
      uVar494 = (ushort)(sVar140 < sVar247) * sVar140 | (ushort)(sVar140 >= sVar247) * sVar247;
      uVar496 = (ushort)(sVar167 < sVar251) * sVar167 | (ushort)(sVar167 >= sVar251) * sVar251;
      bVar269 = auVar341[0];
      bVar227 = auVar271[0];
      bVar227 = (bVar227 < bVar269) * bVar269 | (bVar227 >= bVar269) * bVar227;
      bVar269 = auVar341[1];
      bVar241 = auVar271[1];
      bVar241 = (bVar241 < bVar269) * bVar269 | (bVar241 >= bVar269) * bVar241;
      bVar269 = auVar341[2];
      bVar242 = auVar271[2];
      bVar242 = (bVar242 < bVar269) * bVar269 | (bVar242 >= bVar269) * bVar242;
      bVar269 = auVar341[3];
      bVar245 = auVar271[3];
      bVar245 = (bVar245 < bVar269) * bVar269 | (bVar245 >= bVar269) * bVar245;
      bVar269 = auVar341[4];
      bVar246 = auVar271[4];
      bVar246 = (bVar246 < bVar269) * bVar269 | (bVar246 >= bVar269) * bVar246;
      bVar269 = auVar341[5];
      bVar249 = auVar271[5];
      bVar249 = (bVar249 < bVar269) * bVar269 | (bVar249 >= bVar269) * bVar249;
      bVar269 = auVar341[6];
      bVar250 = auVar271[6];
      bVar250 = (bVar250 < bVar269) * bVar269 | (bVar250 >= bVar269) * bVar250;
      bVar269 = auVar341[7];
      bVar253 = auVar271[7];
      bVar253 = (bVar253 < bVar269) * bVar269 | (bVar253 >= bVar269) * bVar253;
      bVar269 = auVar341[8];
      bVar254 = auVar271[8];
      bVar254 = (bVar254 < bVar269) * bVar269 | (bVar254 >= bVar269) * bVar254;
      bVar269 = auVar341[9];
      bVar257 = auVar271[9];
      bVar257 = (bVar257 < bVar269) * bVar269 | (bVar257 >= bVar269) * bVar257;
      bVar269 = auVar341[10];
      bVar258 = auVar271[10];
      bVar258 = (bVar258 < bVar269) * bVar269 | (bVar258 >= bVar269) * bVar258;
      bVar269 = auVar341[0xb];
      bVar261 = auVar271[0xb];
      bVar261 = (bVar261 < bVar269) * bVar269 | (bVar261 >= bVar269) * bVar261;
      bVar269 = auVar341[0xc];
      bVar262 = auVar271[0xc];
      bVar262 = (bVar262 < bVar269) * bVar269 | (bVar262 >= bVar269) * bVar262;
      bVar269 = auVar341[0xd];
      bVar265 = auVar271[0xd];
      bVar265 = (bVar265 < bVar269) * bVar269 | (bVar265 >= bVar269) * bVar265;
      bVar269 = auVar341[0xe];
      bVar266 = auVar271[0xe];
      bVar375 = auVar271[0xf];
      bVar266 = (bVar266 < bVar269) * bVar269 | (bVar266 >= bVar269) * bVar266;
      bVar269 = auVar341[0xf];
      bVar269 = (bVar375 < bVar269) * bVar269 | (bVar375 >= bVar269) * bVar375;
      local_198[1] = (bVar241 < bVar212) * bVar212 | (bVar241 >= bVar212) * bVar241;
      local_198[0] = (bVar227 < bVar194) * bVar194 | (bVar227 >= bVar194) * bVar227;
      local_198[2] = (bVar242 < bVar213) * bVar213 | (bVar242 >= bVar213) * bVar242;
      local_198[3] = (bVar245 < bVar214) * bVar214 | (bVar245 >= bVar214) * bVar245;
      local_198[4] = (bVar246 < bVar215) * bVar215 | (bVar246 >= bVar215) * bVar246;
      local_198[5] = (bVar249 < bVar216) * bVar216 | (bVar249 >= bVar216) * bVar249;
      local_198[6] = (bVar250 < bVar217) * bVar217 | (bVar250 >= bVar217) * bVar250;
      local_198[7] = (bVar253 < bVar218) * bVar218 | (bVar253 >= bVar218) * bVar253;
      local_198[8] = (bVar254 < bVar219) * bVar219 | (bVar254 >= bVar219) * bVar254;
      local_198[9] = (bVar257 < bVar220) * bVar220 | (bVar257 >= bVar220) * bVar257;
      local_198[10] = (bVar258 < bVar221) * bVar221 | (bVar258 >= bVar221) * bVar258;
      local_198[0xb] = (bVar261 < bVar222) * bVar222 | (bVar261 >= bVar222) * bVar261;
      local_198[0xc] = (bVar262 < bVar223) * bVar223 | (bVar262 >= bVar223) * bVar262;
      local_198[0xd] = (bVar265 < bVar224) * bVar224 | (bVar265 >= bVar224) * bVar265;
      local_198[0xe] = (bVar266 < bVar225) * bVar225 | (bVar266 >= bVar225) * bVar266;
      local_198[0xf] = (bVar269 < bVar226) * bVar226 | (bVar269 >= bVar226) * bVar269;
      uVar41 = (ushort)(sVar256 < sVar255) * sVar256 | (ushort)(sVar256 >= sVar255) * sVar255;
      uVar61 = (ushort)(sVar260 < sVar259) * sVar260 | (ushort)(sVar260 >= sVar259) * sVar259;
      uVar65 = (ushort)(sVar264 < sVar263) * sVar264 | (ushort)(sVar264 >= sVar263) * sVar263;
      uVar69 = (ushort)(sVar268 < sVar267) * sVar268 | (ushort)(sVar268 >= sVar267) * sVar267;
      uVar73 = (ushort)(sVar308 < sVar294) * sVar308 | (ushort)(sVar308 >= sVar294) * sVar294;
      uVar77 = (ushort)(sVar312 < sVar310) * sVar312 | (ushort)(sVar312 >= sVar310) * sVar310;
      uVar81 = (ushort)(sVar316 < sVar314) * sVar316 | (ushort)(sVar316 >= sVar314) * sVar314;
      uVar87 = (ushort)(sVar321 < sVar318) * sVar321 | (ushort)(sVar321 >= sVar318) * sVar318;
      bVar269 = auVar143[0];
      bVar194 = auVar232[0];
      bVar194 = (bVar194 < bVar269) * bVar269 | (bVar194 >= bVar269) * bVar194;
      bVar269 = auVar143[1];
      bVar212 = auVar232[1];
      bVar212 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar143[2];
      bVar213 = auVar232[2];
      bVar213 = (bVar213 < bVar269) * bVar269 | (bVar213 >= bVar269) * bVar213;
      bVar269 = auVar143[3];
      bVar214 = auVar232[3];
      bVar214 = (bVar214 < bVar269) * bVar269 | (bVar214 >= bVar269) * bVar214;
      bVar269 = auVar143[4];
      bVar215 = auVar232[4];
      bVar215 = (bVar215 < bVar269) * bVar269 | (bVar215 >= bVar269) * bVar215;
      bVar269 = auVar143[5];
      bVar216 = auVar232[5];
      bVar216 = (bVar216 < bVar269) * bVar269 | (bVar216 >= bVar269) * bVar216;
      bVar269 = auVar143[6];
      bVar217 = auVar232[6];
      bVar217 = (bVar217 < bVar269) * bVar269 | (bVar217 >= bVar269) * bVar217;
      bVar269 = auVar143[7];
      bVar218 = auVar232[7];
      bVar218 = (bVar218 < bVar269) * bVar269 | (bVar218 >= bVar269) * bVar218;
      bVar269 = auVar143[8];
      bVar219 = auVar232[8];
      bVar219 = (bVar219 < bVar269) * bVar269 | (bVar219 >= bVar269) * bVar219;
      bVar269 = auVar143[9];
      bVar220 = auVar232[9];
      bVar220 = (bVar220 < bVar269) * bVar269 | (bVar220 >= bVar269) * bVar220;
      bVar269 = auVar143[10];
      bVar221 = auVar232[10];
      bVar221 = (bVar221 < bVar269) * bVar269 | (bVar221 >= bVar269) * bVar221;
      bVar269 = auVar143[0xb];
      bVar222 = auVar232[0xb];
      bVar222 = (bVar222 < bVar269) * bVar269 | (bVar222 >= bVar269) * bVar222;
      bVar269 = auVar143[0xc];
      bVar223 = auVar232[0xc];
      bVar223 = (bVar223 < bVar269) * bVar269 | (bVar223 >= bVar269) * bVar223;
      bVar269 = auVar143[0xd];
      bVar224 = auVar232[0xd];
      bVar224 = (bVar224 < bVar269) * bVar269 | (bVar224 >= bVar269) * bVar224;
      bVar269 = auVar143[0xe];
      bVar225 = auVar232[0xe];
      bVar226 = auVar232[0xf];
      bVar225 = (bVar225 < bVar269) * bVar269 | (bVar225 >= bVar269) * bVar225;
      bVar269 = auVar143[0xf];
      bVar269 = (bVar226 < bVar269) * bVar269 | (bVar226 >= bVar269) * bVar226;
      local_178[1] = (bVar212 < bVar120) * bVar120 | (bVar212 >= bVar120) * bVar212;
      local_178[0] = (bVar194 < bVar106) * bVar106 | (bVar194 >= bVar106) * bVar194;
      local_178[2] = (bVar213 < bVar121) * bVar121 | (bVar213 >= bVar121) * bVar213;
      local_178[3] = (bVar214 < bVar123) * bVar123 | (bVar214 >= bVar123) * bVar214;
      local_178[4] = (bVar215 < bVar124) * bVar124 | (bVar215 >= bVar124) * bVar215;
      local_178[5] = (bVar216 < bVar125) * bVar125 | (bVar216 >= bVar125) * bVar216;
      local_178[6] = (bVar217 < bVar126) * bVar126 | (bVar217 >= bVar126) * bVar217;
      local_178[7] = (bVar218 < bVar128) * bVar128 | (bVar218 >= bVar128) * bVar218;
      local_178[8] = (bVar219 < bVar129) * bVar129 | (bVar219 >= bVar129) * bVar219;
      local_178[9] = (bVar220 < bVar130) * bVar130 | (bVar220 >= bVar130) * bVar220;
      local_178[10] = (bVar221 < bVar131) * bVar131 | (bVar221 >= bVar131) * bVar221;
      local_178[0xb] = (bVar222 < bVar133) * bVar133 | (bVar222 >= bVar133) * bVar222;
      local_178[0xc] = (bVar223 < bVar134) * bVar134 | (bVar223 >= bVar134) * bVar223;
      local_178[0xd] = (bVar224 < bVar135) * bVar135 | (bVar224 >= bVar135) * bVar224;
      local_178[0xe] = (bVar225 < bVar136) * bVar136 | (bVar225 >= bVar136) * bVar225;
      local_178[0xf] = (bVar269 < bVar138) * bVar138 | (bVar269 >= bVar138) * bVar269;
      uVar478 = ((short)auVar95._0_2_ < (short)uVar477) * auVar95._0_2_ |
                ((short)auVar95._0_2_ >= (short)uVar477) * uVar477;
      uVar485 = ((short)auVar95._2_2_ < (short)uVar484) * auVar95._2_2_ |
                ((short)auVar95._2_2_ >= (short)uVar484) * uVar484;
      uVar487 = ((short)auVar95._4_2_ < (short)uVar486) * auVar95._4_2_ |
                ((short)auVar95._4_2_ >= (short)uVar486) * uVar486;
      uVar489 = ((short)auVar95._6_2_ < (short)uVar488) * auVar95._6_2_ |
                ((short)auVar95._6_2_ >= (short)uVar488) * uVar488;
      uVar491 = ((short)auVar95._8_2_ < (short)uVar490) * auVar95._8_2_ |
                ((short)auVar95._8_2_ >= (short)uVar490) * uVar490;
      uVar493 = ((short)auVar95._10_2_ < (short)uVar492) * auVar95._10_2_ |
                ((short)auVar95._10_2_ >= (short)uVar492) * uVar492;
      uVar495 = ((short)auVar95._12_2_ < (short)uVar494) * auVar95._12_2_ |
                ((short)auVar95._12_2_ >= (short)uVar494) * uVar494;
      uVar497 = ((short)auVar95._14_2_ < (short)uVar496) * auVar95._14_2_ |
                ((short)auVar95._14_2_ >= (short)uVar496) * uVar496;
      uVar41 = ((short)auVar146._0_2_ < (short)uVar41) * auVar146._0_2_ |
               ((short)auVar146._0_2_ >= (short)uVar41) * uVar41;
      uVar477 = ((short)auVar146._2_2_ < (short)uVar61) * auVar146._2_2_ |
                ((short)auVar146._2_2_ >= (short)uVar61) * uVar61;
      uVar484 = ((short)auVar146._4_2_ < (short)uVar65) * auVar146._4_2_ |
                ((short)auVar146._4_2_ >= (short)uVar65) * uVar65;
      uVar486 = ((short)auVar146._6_2_ < (short)uVar69) * auVar146._6_2_ |
                ((short)auVar146._6_2_ >= (short)uVar69) * uVar69;
      uVar490 = ((short)auVar146._8_2_ < (short)uVar73) * auVar146._8_2_ |
                ((short)auVar146._8_2_ >= (short)uVar73) * uVar73;
      uVar496 = ((short)auVar146._10_2_ < (short)uVar77) * auVar146._10_2_ |
                ((short)auVar146._10_2_ >= (short)uVar77) * uVar77;
      uVar82 = ((short)auVar146._12_2_ < (short)uVar81) * auVar146._12_2_ |
               ((short)auVar146._12_2_ >= (short)uVar81) * uVar81;
      uVar88 = ((short)auVar146._14_2_ < (short)uVar87) * auVar146._14_2_ |
               ((short)auVar146._14_2_ >= (short)uVar87) * uVar87;
      auVar230 = lddqu(auVar342,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar28 * 2));
      auVar143 = lddqu(auVar146,*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])((long)in + 0x120) + lVar28 * 2));
      sVar71 = auVar230._0_2_;
      auVar196._0_2_ = sVar71 - sVar348;
      sVar75 = auVar230._2_2_;
      auVar196._2_2_ = sVar75 - sVar363;
      sVar140 = auVar230._4_2_;
      auVar196._4_2_ = sVar140 - sVar365;
      sVar80 = auVar230._6_2_;
      auVar196._6_2_ = sVar80 - sVar366;
      sVar167 = auVar230._8_2_;
      auVar196._8_2_ = sVar167 - sVar369;
      sVar86 = auVar230._10_2_;
      auVar196._10_2_ = sVar86 - sVar371;
      sVar171 = auVar230._12_2_;
      sVar122 = auVar230._14_2_;
      auVar196._12_2_ = sVar171 - sVar374;
      auVar196._14_2_ = sVar122 - sVar378;
      sVar175 = auVar143._0_2_;
      auVar234._0_2_ = sVar175 - sVar42;
      sVar127 = auVar143._2_2_;
      auVar234._2_2_ = sVar127 - sVar62;
      sVar179 = auVar143._4_2_;
      auVar234._4_2_ = sVar179 - sVar66;
      sVar132 = auVar143._6_2_;
      auVar234._6_2_ = sVar132 - sVar70;
      sVar183 = auVar143._8_2_;
      auVar234._8_2_ = sVar183 - sVar74;
      sVar137 = auVar143._10_2_;
      auVar234._10_2_ = sVar137 - sVar79;
      sVar187 = auVar143._12_2_;
      sVar141 = auVar143._14_2_;
      auVar234._12_2_ = sVar187 - sVar85;
      auVar234._14_2_ = sVar141 - sVar191;
      auVar271 = pabsw(auVar95,auVar196);
      local_168._4_4_ = 0;
      uVar69 = auVar271._0_2_;
      auVar108._0_2_ = uVar69 >> local_168._0_8_;
      uVar77 = auVar271._2_2_;
      auVar108._2_2_ = uVar77 >> local_168._0_8_;
      uVar87 = auVar271._4_2_;
      auVar108._4_2_ = uVar87 >> local_168._0_8_;
      uVar492 = auVar271._6_2_;
      auVar108._6_2_ = uVar492 >> local_168._0_8_;
      uVar78 = auVar271._8_2_;
      auVar108._8_2_ = uVar78 >> local_168._0_8_;
      uVar84 = auVar271._10_2_;
      auVar108._10_2_ = uVar84 >> local_168._0_8_;
      uVar90 = auVar271._12_2_;
      uVar319 = auVar271._14_2_;
      auVar108._12_2_ = uVar90 >> local_168._0_8_;
      auVar108._14_2_ = uVar319 >> local_168._0_8_;
      auVar91 = pabsw(auVar324,auVar234);
      uVar139 = auVar91._0_2_;
      auVar343._0_2_ = uVar139 >> local_168._0_8_;
      uVar166 = auVar91._2_2_;
      auVar343._2_2_ = uVar166 >> local_168._0_8_;
      uVar170 = auVar91._4_2_;
      auVar343._4_2_ = uVar170 >> local_168._0_8_;
      uVar174 = auVar91._6_2_;
      auVar343._6_2_ = uVar174 >> local_168._0_8_;
      uVar178 = auVar91._8_2_;
      auVar343._8_2_ = uVar178 >> local_168._0_8_;
      uVar182 = auVar91._10_2_;
      auVar343._10_2_ = uVar182 >> local_168._0_8_;
      uVar186 = auVar91._12_2_;
      uVar190 = auVar91._14_2_;
      auVar343._12_2_ = uVar186 >> local_168._0_8_;
      auVar343._14_2_ = uVar190 >> local_168._0_8_;
      auVar21._4_2_ = uStack_1d4;
      auVar21._0_4_ = uVar44;
      auVar21._6_2_ = uStack_1d2;
      auVar21._8_2_ = uStack_1d4;
      auVar21._10_2_ = uStack_1d2;
      auVar21._12_2_ = uStack_1d4;
      auVar21._14_2_ = uStack_1d2;
      auVar195 = psubusw(auVar21,auVar108);
      auVar91 = psubusw(auVar21,auVar343);
      sVar168 = auVar195._0_2_;
      sVar169 = auVar195._2_2_;
      sVar172 = auVar195._4_2_;
      sVar173 = auVar195._6_2_;
      sVar176 = auVar195._8_2_;
      sVar177 = auVar195._10_2_;
      sVar180 = auVar195._12_2_;
      sVar181 = auVar195._14_2_;
      sVar38 = auVar91._0_2_;
      sVar40 = auVar91._2_2_;
      sVar59 = auVar91._4_2_;
      sVar60 = auVar91._6_2_;
      sVar63 = auVar91._8_2_;
      sVar64 = auVar91._10_2_;
      sVar67 = auVar91._12_2_;
      sVar68 = auVar91._14_2_;
      uVar61 = (ushort)(sVar71 < sVar185) * sVar71 | (ushort)(sVar71 >= sVar185) * sVar185;
      uVar65 = (ushort)(sVar75 < sVar189) * sVar75 | (ushort)(sVar75 >= sVar189) * sVar189;
      uVar73 = (ushort)(sVar140 < sVar193) * sVar140 | (ushort)(sVar140 >= sVar193) * sVar193;
      uVar81 = (ushort)(sVar80 < sVar229) * sVar80 | (ushort)(sVar80 >= sVar229) * sVar229;
      uVar488 = (ushort)(sVar167 < sVar244) * sVar167 | (ushort)(sVar167 >= sVar244) * sVar244;
      uVar494 = (ushort)(sVar86 < sVar248) * sVar86 | (ushort)(sVar86 >= sVar248) * sVar248;
      uVar83 = (ushort)(sVar171 < sVar252) * sVar171 | (ushort)(sVar171 >= sVar252) * sVar252;
      uVar89 = (ushort)(sVar122 < sVar349) * sVar122 | (ushort)(sVar122 >= sVar349) * sVar349;
      auVar91 = psraw(auVar196,0xf);
      auVar274._0_2_ =
           (((short)uVar69 < sVar168) * uVar69 | (ushort)((short)uVar69 >= sVar168) * sVar168) +
           auVar91._0_2_;
      auVar274._2_2_ =
           (((short)uVar77 < sVar169) * uVar77 | (ushort)((short)uVar77 >= sVar169) * sVar169) +
           auVar91._2_2_;
      auVar274._4_2_ =
           (((short)uVar87 < sVar172) * uVar87 | (ushort)((short)uVar87 >= sVar172) * sVar172) +
           auVar91._4_2_;
      auVar274._6_2_ =
           (((short)uVar492 < sVar173) * uVar492 | (ushort)((short)uVar492 >= sVar173) * sVar173) +
           auVar91._6_2_;
      auVar274._8_2_ =
           (((short)uVar78 < sVar176) * uVar78 | (ushort)((short)uVar78 >= sVar176) * sVar176) +
           auVar91._8_2_;
      auVar274._10_2_ =
           (((short)uVar84 < sVar177) * uVar84 | (ushort)((short)uVar84 >= sVar177) * sVar177) +
           auVar91._10_2_;
      auVar274._12_2_ =
           (((short)uVar90 < sVar180) * uVar90 | (ushort)((short)uVar90 >= sVar180) * sVar180) +
           auVar91._12_2_;
      auVar274._14_2_ =
           (((short)uVar319 < sVar181) * uVar319 | (ushort)((short)uVar319 >= sVar181) * sVar181) +
           auVar91._14_2_;
      auVar274 = auVar274 ^ auVar91;
      auVar271 = lddqu(auVar271,*(undefined1 (*) [16])((long)in + lVar28 * -2));
      auVar91 = psraw(auVar234,0xf);
      auVar109._0_2_ =
           (((short)uVar139 < sVar38) * uVar139 | (ushort)((short)uVar139 >= sVar38) * sVar38) +
           auVar91._0_2_;
      auVar109._2_2_ =
           (((short)uVar166 < sVar40) * uVar166 | (ushort)((short)uVar166 >= sVar40) * sVar40) +
           auVar91._2_2_;
      auVar109._4_2_ =
           (((short)uVar170 < sVar59) * uVar170 | (ushort)((short)uVar170 >= sVar59) * sVar59) +
           auVar91._4_2_;
      auVar109._6_2_ =
           (((short)uVar174 < sVar60) * uVar174 | (ushort)((short)uVar174 >= sVar60) * sVar60) +
           auVar91._6_2_;
      auVar109._8_2_ =
           (((short)uVar178 < sVar63) * uVar178 | (ushort)((short)uVar178 >= sVar63) * sVar63) +
           auVar91._8_2_;
      auVar109._10_2_ =
           (((short)uVar182 < sVar64) * uVar182 | (ushort)((short)uVar182 >= sVar64) * sVar64) +
           auVar91._10_2_;
      auVar109._12_2_ =
           (((short)uVar186 < sVar67) * uVar186 | (ushort)((short)uVar186 >= sVar67) * sVar67) +
           auVar91._12_2_;
      auVar109._14_2_ =
           (((short)uVar190 < sVar68) * uVar190 | (ushort)((short)uVar190 >= sVar68) * sVar68) +
           auVar91._14_2_;
      auVar109 = auVar109 ^ auVar91;
      bVar269 = auVar271[0];
      bVar106 = auVar230[0];
      bVar242 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[1];
      bVar106 = auVar230[1];
      bVar245 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[2];
      bVar106 = auVar230[2];
      bVar246 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[3];
      bVar106 = auVar230[3];
      bVar249 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[4];
      bVar106 = auVar230[4];
      bVar250 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[5];
      bVar106 = auVar230[5];
      bVar253 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[6];
      bVar106 = auVar230[6];
      bVar254 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[7];
      bVar106 = auVar230[7];
      bVar257 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[8];
      bVar106 = auVar230[8];
      bVar258 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[9];
      bVar106 = auVar230[9];
      bVar261 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[10];
      bVar106 = auVar230[10];
      bVar262 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[0xb];
      bVar106 = auVar230[0xb];
      bVar265 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[0xc];
      bVar106 = auVar230[0xc];
      bVar266 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[0xd];
      bVar106 = auVar230[0xd];
      bVar375 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[0xe];
      bVar106 = auVar230[0xe];
      bVar120 = auVar230[0xf];
      bVar376 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[0xf];
      bVar380 = (bVar120 < bVar269) * bVar269 | (bVar120 >= bVar269) * bVar120;
      sVar38 = auVar271._0_2_;
      uVar61 = (ushort)(sVar38 < (short)uVar61) * sVar38 | (sVar38 >= (short)uVar61) * uVar61;
      sVar40 = auVar271._2_2_;
      uVar69 = (ushort)(sVar40 < (short)uVar65) * sVar40 | (sVar40 >= (short)uVar65) * uVar65;
      sVar59 = auVar271._4_2_;
      uVar77 = (ushort)(sVar59 < (short)uVar73) * sVar59 | (sVar59 >= (short)uVar73) * uVar73;
      sVar60 = auVar271._6_2_;
      uVar87 = (ushort)(sVar60 < (short)uVar81) * sVar60 | (sVar60 >= (short)uVar81) * uVar81;
      sVar63 = auVar271._8_2_;
      uVar492 = (ushort)(sVar63 < (short)uVar488) * sVar63 | (sVar63 >= (short)uVar488) * uVar488;
      sVar64 = auVar271._10_2_;
      uVar78 = (ushort)(sVar64 < (short)uVar494) * sVar64 | (sVar64 >= (short)uVar494) * uVar494;
      sVar67 = auVar271._12_2_;
      uVar84 = (ushort)(sVar67 < (short)uVar83) * sVar67 | (sVar67 >= (short)uVar83) * uVar83;
      sVar68 = auVar271._14_2_;
      uVar90 = (ushort)(sVar68 < (short)uVar89) * sVar68 | (sVar68 >= (short)uVar89) * uVar89;
      auVar197._0_2_ = sVar38 - sVar348;
      auVar197._2_2_ = sVar40 - sVar363;
      auVar197._4_2_ = sVar59 - sVar365;
      auVar197._6_2_ = sVar60 - sVar366;
      auVar197._8_2_ = sVar63 - sVar369;
      auVar197._10_2_ = sVar64 - sVar371;
      auVar197._12_2_ = sVar67 - sVar374;
      auVar197._14_2_ = sVar68 - sVar378;
      auVar195 = pabsw(auVar91,auVar197);
      uVar139 = auVar195._0_2_;
      auVar326._0_2_ = uVar139 >> local_168._0_8_;
      uVar166 = auVar195._2_2_;
      auVar326._2_2_ = uVar166 >> local_168._0_8_;
      uVar170 = auVar195._4_2_;
      auVar326._4_2_ = uVar170 >> local_168._0_8_;
      uVar174 = auVar195._6_2_;
      auVar326._6_2_ = uVar174 >> local_168._0_8_;
      uVar178 = auVar195._8_2_;
      auVar326._8_2_ = uVar178 >> local_168._0_8_;
      uVar182 = auVar195._10_2_;
      auVar326._10_2_ = uVar182 >> local_168._0_8_;
      uVar186 = auVar195._12_2_;
      uVar190 = auVar195._14_2_;
      auVar326._12_2_ = uVar186 >> local_168._0_8_;
      auVar326._14_2_ = uVar190 >> local_168._0_8_;
      auVar271 = psubusw(auVar21,auVar326);
      uVar65 = (ushort)(sVar175 < sVar364) * sVar175 | (ushort)(sVar175 >= sVar364) * sVar364;
      uVar73 = (ushort)(sVar127 < sVar367) * sVar127 | (ushort)(sVar127 >= sVar367) * sVar367;
      uVar81 = (ushort)(sVar179 < sVar372) * sVar179 | (ushort)(sVar179 >= sVar372) * sVar372;
      uVar488 = (ushort)(sVar132 < sVar379) * sVar132 | (ushort)(sVar132 >= sVar379) * sVar379;
      uVar494 = (ushort)(sVar183 < sVar368) * sVar183 | (ushort)(sVar183 >= sVar368) * sVar368;
      uVar83 = (ushort)(sVar137 < sVar370) * sVar137 | (ushort)(sVar137 >= sVar370) * sVar370;
      uVar89 = (ushort)(sVar187 < sVar373) * sVar187 | (ushort)(sVar187 >= sVar373) * sVar373;
      uVar319 = (ushort)(sVar141 < sVar377) * sVar141 | (ushort)(sVar141 >= sVar377) * sVar377;
      auVar91 = lddqu(auVar143,*(undefined1 (*) [16])((long)in + lVar28 * -2 + 0x120));
      bVar269 = auVar91[0];
      bVar106 = auVar143[0];
      bVar106 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar91[1];
      bVar120 = auVar143[1];
      bVar120 = (bVar120 < bVar269) * bVar269 | (bVar120 >= bVar269) * bVar120;
      bVar269 = auVar91[2];
      bVar121 = auVar143[2];
      bVar121 = (bVar121 < bVar269) * bVar269 | (bVar121 >= bVar269) * bVar121;
      bVar269 = auVar91[3];
      bVar123 = auVar143[3];
      bVar123 = (bVar123 < bVar269) * bVar269 | (bVar123 >= bVar269) * bVar123;
      bVar269 = auVar91[4];
      bVar124 = auVar143[4];
      bVar124 = (bVar124 < bVar269) * bVar269 | (bVar124 >= bVar269) * bVar124;
      bVar269 = auVar91[5];
      bVar125 = auVar143[5];
      bVar125 = (bVar125 < bVar269) * bVar269 | (bVar125 >= bVar269) * bVar125;
      bVar269 = auVar91[6];
      bVar126 = auVar143[6];
      bVar126 = (bVar126 < bVar269) * bVar269 | (bVar126 >= bVar269) * bVar126;
      bVar269 = auVar91[7];
      bVar128 = auVar143[7];
      bVar128 = (bVar128 < bVar269) * bVar269 | (bVar128 >= bVar269) * bVar128;
      bVar269 = auVar91[8];
      bVar129 = auVar143[8];
      bVar129 = (bVar129 < bVar269) * bVar269 | (bVar129 >= bVar269) * bVar129;
      bVar269 = auVar91[9];
      bVar130 = auVar143[9];
      bVar130 = (bVar130 < bVar269) * bVar269 | (bVar130 >= bVar269) * bVar130;
      bVar269 = auVar91[10];
      bVar131 = auVar143[10];
      bVar131 = (bVar131 < bVar269) * bVar269 | (bVar131 >= bVar269) * bVar131;
      bVar269 = auVar91[0xb];
      bVar133 = auVar143[0xb];
      bVar133 = (bVar133 < bVar269) * bVar269 | (bVar133 >= bVar269) * bVar133;
      bVar269 = auVar91[0xc];
      bVar134 = auVar143[0xc];
      bVar134 = (bVar134 < bVar269) * bVar269 | (bVar134 >= bVar269) * bVar134;
      bVar269 = auVar91[0xd];
      bVar135 = auVar143[0xd];
      bVar135 = (bVar135 < bVar269) * bVar269 | (bVar135 >= bVar269) * bVar135;
      bVar269 = auVar91[0xe];
      bVar136 = auVar143[0xe];
      bVar138 = auVar143[0xf];
      bVar136 = (bVar136 < bVar269) * bVar269 | (bVar136 >= bVar269) * bVar136;
      bVar269 = auVar91[0xf];
      bVar138 = (bVar138 < bVar269) * bVar269 | (bVar138 >= bVar269) * bVar138;
      sVar38 = auVar91._0_2_;
      auVar298._0_2_ =
           (ushort)(sVar38 < (short)uVar65) * sVar38 | (sVar38 >= (short)uVar65) * uVar65;
      sVar40 = auVar91._2_2_;
      auVar298._2_2_ =
           (ushort)(sVar40 < (short)uVar73) * sVar40 | (sVar40 >= (short)uVar73) * uVar73;
      sVar59 = auVar91._4_2_;
      auVar298._4_2_ =
           (ushort)(sVar59 < (short)uVar81) * sVar59 | (sVar59 >= (short)uVar81) * uVar81;
      sVar60 = auVar91._6_2_;
      auVar298._6_2_ =
           (ushort)(sVar60 < (short)uVar488) * sVar60 | (sVar60 >= (short)uVar488) * uVar488;
      sVar63 = auVar91._8_2_;
      auVar298._8_2_ =
           (ushort)(sVar63 < (short)uVar494) * sVar63 | (sVar63 >= (short)uVar494) * uVar494;
      sVar64 = auVar91._10_2_;
      auVar298._10_2_ =
           (ushort)(sVar64 < (short)uVar83) * sVar64 | (sVar64 >= (short)uVar83) * uVar83;
      sVar67 = auVar91._12_2_;
      auVar298._12_2_ =
           (ushort)(sVar67 < (short)uVar89) * sVar67 | (sVar67 >= (short)uVar89) * uVar89;
      sVar68 = auVar91._14_2_;
      auVar298._14_2_ =
           (ushort)(sVar68 < (short)uVar319) * sVar68 | (sVar68 >= (short)uVar319) * uVar319;
      auVar147._0_2_ = sVar38 - sVar42;
      auVar147._2_2_ = sVar40 - sVar62;
      auVar147._4_2_ = sVar59 - sVar66;
      auVar147._6_2_ = sVar60 - sVar70;
      auVar147._8_2_ = sVar63 - sVar74;
      auVar147._10_2_ = sVar64 - sVar79;
      auVar147._12_2_ = sVar67 - sVar85;
      auVar147._14_2_ = sVar68 - sVar191;
      auVar91 = pabsw(auVar326,auVar147);
      uVar65 = auVar91._0_2_;
      auVar344._0_2_ = uVar65 >> local_168._0_8_;
      uVar73 = auVar91._2_2_;
      auVar344._2_2_ = uVar73 >> local_168._0_8_;
      uVar81 = auVar91._4_2_;
      auVar344._4_2_ = uVar81 >> local_168._0_8_;
      uVar488 = auVar91._6_2_;
      auVar344._6_2_ = uVar488 >> local_168._0_8_;
      uVar494 = auVar91._8_2_;
      auVar344._8_2_ = uVar494 >> local_168._0_8_;
      uVar83 = auVar91._10_2_;
      auVar344._10_2_ = uVar83 >> local_168._0_8_;
      uVar89 = auVar91._12_2_;
      uVar319 = auVar91._14_2_;
      auVar344._12_2_ = uVar89 >> local_168._0_8_;
      auVar344._14_2_ = uVar319 >> local_168._0_8_;
      auVar143 = psubusw(auVar21,auVar344);
      sVar38 = auVar271._0_2_;
      sVar40 = auVar271._2_2_;
      sVar59 = auVar271._4_2_;
      sVar60 = auVar271._6_2_;
      sVar63 = auVar271._8_2_;
      sVar64 = auVar271._10_2_;
      sVar67 = auVar271._12_2_;
      sVar68 = auVar271._14_2_;
      sVar71 = auVar143._0_2_;
      sVar75 = auVar143._2_2_;
      sVar140 = auVar143._4_2_;
      sVar80 = auVar143._6_2_;
      sVar167 = auVar143._8_2_;
      sVar86 = auVar143._10_2_;
      sVar171 = auVar143._12_2_;
      sVar122 = auVar143._14_2_;
      auVar271 = psraw(auVar197,0xf);
      auVar96._0_2_ =
           (((short)uVar139 < sVar38) * uVar139 | (ushort)((short)uVar139 >= sVar38) * sVar38) +
           auVar271._0_2_;
      auVar96._2_2_ =
           (((short)uVar166 < sVar40) * uVar166 | (ushort)((short)uVar166 >= sVar40) * sVar40) +
           auVar271._2_2_;
      auVar96._4_2_ =
           (((short)uVar170 < sVar59) * uVar170 | (ushort)((short)uVar170 >= sVar59) * sVar59) +
           auVar271._4_2_;
      auVar96._6_2_ =
           (((short)uVar174 < sVar60) * uVar174 | (ushort)((short)uVar174 >= sVar60) * sVar60) +
           auVar271._6_2_;
      auVar96._8_2_ =
           (((short)uVar178 < sVar63) * uVar178 | (ushort)((short)uVar178 >= sVar63) * sVar63) +
           auVar271._8_2_;
      auVar96._10_2_ =
           (((short)uVar182 < sVar64) * uVar182 | (ushort)((short)uVar182 >= sVar64) * sVar64) +
           auVar271._10_2_;
      auVar96._12_2_ =
           (((short)uVar186 < sVar67) * uVar186 | (ushort)((short)uVar186 >= sVar67) * sVar67) +
           auVar271._12_2_;
      auVar96._14_2_ =
           (((short)uVar190 < sVar68) * uVar190 | (ushort)((short)uVar190 >= sVar68) * sVar68) +
           auVar271._14_2_;
      auVar96 = auVar96 ^ auVar271;
      auVar271 = psraw(auVar147,0xf);
      auVar412._0_2_ =
           (((short)uVar65 < sVar71) * uVar65 | (ushort)((short)uVar65 >= sVar71) * sVar71) +
           auVar271._0_2_;
      auVar412._2_2_ =
           (((short)uVar73 < sVar75) * uVar73 | (ushort)((short)uVar73 >= sVar75) * sVar75) +
           auVar271._2_2_;
      auVar412._4_2_ =
           (((short)uVar81 < sVar140) * uVar81 | (ushort)((short)uVar81 >= sVar140) * sVar140) +
           auVar271._4_2_;
      auVar412._6_2_ =
           (((short)uVar488 < sVar80) * uVar488 | (ushort)((short)uVar488 >= sVar80) * sVar80) +
           auVar271._6_2_;
      auVar412._8_2_ =
           (((short)uVar494 < sVar167) * uVar494 | (ushort)((short)uVar494 >= sVar167) * sVar167) +
           auVar271._8_2_;
      auVar412._10_2_ =
           (((short)uVar83 < sVar86) * uVar83 | (ushort)((short)uVar83 >= sVar86) * sVar86) +
           auVar271._10_2_;
      auVar412._12_2_ =
           (((short)uVar89 < sVar171) * uVar89 | (ushort)((short)uVar89 >= sVar171) * sVar171) +
           auVar271._12_2_;
      auVar412._14_2_ =
           (((short)uVar319 < sVar122) * uVar319 | (ushort)((short)uVar319 >= sVar122) * sVar122) +
           auVar271._14_2_;
      auVar412 = auVar412 ^ auVar271;
      auVar230 = lddqu(auVar298,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar36 * 2));
      auVar413._0_2_ = auVar412._0_2_ + auVar109._0_2_;
      auVar413._2_2_ = auVar412._2_2_ + auVar109._2_2_;
      auVar413._4_2_ = auVar412._4_2_ + auVar109._4_2_;
      auVar413._6_2_ = auVar412._6_2_ + auVar109._6_2_;
      auVar413._8_2_ = auVar412._8_2_ + auVar109._8_2_;
      auVar413._10_2_ = auVar412._10_2_ + auVar109._10_2_;
      auVar413._12_2_ = auVar412._12_2_ + auVar109._12_2_;
      auVar413._14_2_ = auVar412._14_2_ + auVar109._14_2_;
      sVar71 = auVar230._0_2_;
      auVar148._0_2_ = sVar71 - sVar348;
      sVar75 = auVar230._2_2_;
      auVar148._2_2_ = sVar75 - sVar363;
      sVar140 = auVar230._4_2_;
      auVar148._4_2_ = sVar140 - sVar365;
      sVar80 = auVar230._6_2_;
      auVar148._6_2_ = sVar80 - sVar366;
      sVar167 = auVar230._8_2_;
      auVar148._8_2_ = sVar167 - sVar369;
      sVar86 = auVar230._10_2_;
      auVar148._10_2_ = sVar86 - sVar371;
      sVar171 = auVar230._12_2_;
      sVar122 = auVar230._14_2_;
      auVar148._12_2_ = sVar171 - sVar374;
      auVar148._14_2_ = sVar122 - sVar378;
      auVar143 = pabsw(auVar195,auVar148);
      uVar65 = auVar143._0_2_;
      auVar198._0_2_ = uVar65 >> local_168._0_8_;
      uVar73 = auVar143._2_2_;
      auVar198._2_2_ = uVar73 >> local_168._0_8_;
      uVar81 = auVar143._4_2_;
      auVar198._4_2_ = uVar81 >> local_168._0_8_;
      uVar488 = auVar143._6_2_;
      auVar198._6_2_ = uVar488 >> local_168._0_8_;
      uVar494 = auVar143._8_2_;
      auVar198._8_2_ = uVar494 >> local_168._0_8_;
      uVar83 = auVar143._10_2_;
      auVar198._10_2_ = uVar83 >> local_168._0_8_;
      uVar89 = auVar143._12_2_;
      uVar319 = auVar143._14_2_;
      auVar198._12_2_ = uVar89 >> local_168._0_8_;
      auVar198._14_2_ = uVar319 >> local_168._0_8_;
      auVar271 = psubusw(auVar21,auVar198);
      auVar195 = lddqu(auVar91,*(undefined1 (*) [16])
                                (*(undefined1 (*) [16])((long)in + 0x120) + lVar36 * 2));
      sVar168 = auVar195._0_2_;
      auVar275._0_2_ = sVar168 - sVar42;
      sVar169 = auVar195._2_2_;
      auVar275._2_2_ = sVar169 - sVar62;
      sVar172 = auVar195._4_2_;
      auVar275._4_2_ = sVar172 - sVar66;
      sVar173 = auVar195._6_2_;
      auVar275._6_2_ = sVar173 - sVar70;
      sVar176 = auVar195._8_2_;
      auVar275._8_2_ = sVar176 - sVar74;
      sVar177 = auVar195._10_2_;
      auVar275._10_2_ = sVar177 - sVar79;
      sVar180 = auVar195._12_2_;
      sVar181 = auVar195._14_2_;
      auVar275._12_2_ = sVar180 - sVar85;
      auVar275._14_2_ = sVar181 - sVar191;
      auVar91 = pabsw(auVar344,auVar275);
      uVar139 = auVar91._0_2_;
      auVar434._0_2_ = uVar139 >> local_168._0_8_;
      uVar166 = auVar91._2_2_;
      auVar434._2_2_ = uVar166 >> local_168._0_8_;
      uVar170 = auVar91._4_2_;
      auVar434._4_2_ = uVar170 >> local_168._0_8_;
      uVar174 = auVar91._6_2_;
      auVar434._6_2_ = uVar174 >> local_168._0_8_;
      uVar178 = auVar91._8_2_;
      auVar434._8_2_ = uVar178 >> local_168._0_8_;
      uVar182 = auVar91._10_2_;
      auVar434._10_2_ = uVar182 >> local_168._0_8_;
      uVar186 = auVar91._12_2_;
      uVar190 = auVar91._14_2_;
      auVar434._12_2_ = uVar186 >> local_168._0_8_;
      auVar434._14_2_ = uVar190 >> local_168._0_8_;
      auVar91 = psubusw(auVar21,auVar434);
      sVar38 = auVar271._0_2_;
      sVar40 = auVar271._2_2_;
      sVar59 = auVar271._4_2_;
      sVar60 = auVar271._6_2_;
      sVar63 = auVar271._8_2_;
      sVar64 = auVar271._10_2_;
      sVar67 = auVar271._12_2_;
      sVar68 = auVar271._14_2_;
      sVar175 = auVar91._0_2_;
      sVar127 = auVar91._2_2_;
      sVar179 = auVar91._4_2_;
      sVar132 = auVar91._6_2_;
      sVar183 = auVar91._8_2_;
      sVar137 = auVar91._10_2_;
      sVar187 = auVar91._12_2_;
      sVar141 = auVar91._14_2_;
      auVar271 = psraw(auVar148,0xf);
      auVar110._0_2_ =
           (((short)uVar65 < sVar38) * uVar65 | (ushort)((short)uVar65 >= sVar38) * sVar38) +
           auVar271._0_2_;
      auVar110._2_2_ =
           (((short)uVar73 < sVar40) * uVar73 | (ushort)((short)uVar73 >= sVar40) * sVar40) +
           auVar271._2_2_;
      auVar110._4_2_ =
           (((short)uVar81 < sVar59) * uVar81 | (ushort)((short)uVar81 >= sVar59) * sVar59) +
           auVar271._4_2_;
      auVar110._6_2_ =
           (((short)uVar488 < sVar60) * uVar488 | (ushort)((short)uVar488 >= sVar60) * sVar60) +
           auVar271._6_2_;
      auVar110._8_2_ =
           (((short)uVar494 < sVar63) * uVar494 | (ushort)((short)uVar494 >= sVar63) * sVar63) +
           auVar271._8_2_;
      auVar110._10_2_ =
           (((short)uVar83 < sVar64) * uVar83 | (ushort)((short)uVar83 >= sVar64) * sVar64) +
           auVar271._10_2_;
      auVar110._12_2_ =
           (((short)uVar89 < sVar67) * uVar89 | (ushort)((short)uVar89 >= sVar67) * sVar67) +
           auVar271._12_2_;
      auVar110._14_2_ =
           (((short)uVar319 < sVar68) * uVar319 | (ushort)((short)uVar319 >= sVar68) * sVar68) +
           auVar271._14_2_;
      auVar110 = auVar110 ^ auVar271;
      auVar271 = psraw(auVar275,0xf);
      auVar199._0_2_ =
           (((short)uVar139 < sVar175) * uVar139 | (ushort)((short)uVar139 >= sVar175) * sVar175) +
           auVar271._0_2_;
      auVar199._2_2_ =
           (((short)uVar166 < sVar127) * uVar166 | (ushort)((short)uVar166 >= sVar127) * sVar127) +
           auVar271._2_2_;
      auVar199._4_2_ =
           (((short)uVar170 < sVar179) * uVar170 | (ushort)((short)uVar170 >= sVar179) * sVar179) +
           auVar271._4_2_;
      auVar199._6_2_ =
           (((short)uVar174 < sVar132) * uVar174 | (ushort)((short)uVar174 >= sVar132) * sVar132) +
           auVar271._6_2_;
      auVar199._8_2_ =
           (((short)uVar178 < sVar183) * uVar178 | (ushort)((short)uVar178 >= sVar183) * sVar183) +
           auVar271._8_2_;
      auVar199._10_2_ =
           (((short)uVar182 < sVar137) * uVar182 | (ushort)((short)uVar182 >= sVar137) * sVar137) +
           auVar271._10_2_;
      auVar199._12_2_ =
           (((short)uVar186 < sVar187) * uVar186 | (ushort)((short)uVar186 >= sVar187) * sVar187) +
           auVar271._12_2_;
      auVar199._14_2_ =
           (((short)uVar190 < sVar141) * uVar190 | (ushort)((short)uVar190 >= sVar141) * sVar141) +
           auVar271._14_2_;
      auVar199 = auVar199 ^ auVar271;
      auVar271 = lddqu(auVar143,*(undefined1 (*) [16])((long)in + lVar36 * -2));
      bVar269 = auVar271[0];
      bVar194 = auVar230[0];
      bVar194 = (bVar194 < bVar269) * bVar269 | (bVar194 >= bVar269) * bVar194;
      bVar269 = auVar271[1];
      bVar212 = auVar230[1];
      bVar213 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[2];
      bVar212 = auVar230[2];
      bVar214 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[3];
      bVar212 = auVar230[3];
      bVar215 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[4];
      bVar212 = auVar230[4];
      bVar216 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[5];
      bVar212 = auVar230[5];
      bVar217 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[6];
      bVar212 = auVar230[6];
      bVar218 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[7];
      bVar212 = auVar230[7];
      bVar219 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[8];
      bVar212 = auVar230[8];
      bVar220 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[9];
      bVar212 = auVar230[9];
      bVar221 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[10];
      bVar212 = auVar230[10];
      bVar222 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xb];
      bVar212 = auVar230[0xb];
      bVar223 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xc];
      bVar212 = auVar230[0xc];
      bVar224 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xd];
      bVar212 = auVar230[0xd];
      bVar225 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xe];
      bVar212 = auVar230[0xe];
      bVar227 = auVar230[0xf];
      bVar226 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xf];
      bVar227 = (bVar227 < bVar269) * bVar269 | (bVar227 >= bVar269) * bVar227;
      sVar38 = auVar271._0_2_;
      uVar293 = (ushort)(sVar38 < sVar71) * sVar38 | (ushort)(sVar38 >= sVar71) * sVar71;
      sVar40 = auVar271._2_2_;
      uVar307 = (ushort)(sVar40 < sVar75) * sVar40 | (ushort)(sVar40 >= sVar75) * sVar75;
      sVar59 = auVar271._4_2_;
      uVar309 = (ushort)(sVar59 < sVar140) * sVar59 | (ushort)(sVar59 >= sVar140) * sVar140;
      sVar60 = auVar271._6_2_;
      uVar311 = (ushort)(sVar60 < sVar80) * sVar60 | (ushort)(sVar60 >= sVar80) * sVar80;
      sVar63 = auVar271._8_2_;
      uVar313 = (ushort)(sVar63 < sVar167) * sVar63 | (ushort)(sVar63 >= sVar167) * sVar167;
      sVar64 = auVar271._10_2_;
      uVar315 = (ushort)(sVar64 < sVar86) * sVar64 | (ushort)(sVar64 >= sVar86) * sVar86;
      sVar67 = auVar271._12_2_;
      uVar317 = (ushort)(sVar67 < sVar171) * sVar67 | (ushort)(sVar67 >= sVar171) * sVar171;
      sVar68 = auVar271._14_2_;
      uVar320 = (ushort)(sVar68 < sVar122) * sVar68 | (ushort)(sVar68 >= sVar122) * sVar122;
      auVar435._0_2_ = sVar38 - sVar348;
      auVar435._2_2_ = sVar40 - sVar363;
      auVar435._4_2_ = sVar59 - sVar365;
      auVar435._6_2_ = sVar60 - sVar366;
      auVar435._8_2_ = sVar63 - sVar369;
      auVar435._10_2_ = sVar64 - sVar371;
      auVar435._12_2_ = sVar67 - sVar374;
      auVar435._14_2_ = sVar68 - sVar378;
      auVar271 = pabsw(auVar57,auVar435);
      uVar139 = auVar271._0_2_;
      auVar276._0_2_ = uVar139 >> local_168._0_8_;
      uVar166 = auVar271._2_2_;
      auVar276._2_2_ = uVar166 >> local_168._0_8_;
      uVar170 = auVar271._4_2_;
      auVar276._4_2_ = uVar170 >> local_168._0_8_;
      uVar174 = auVar271._6_2_;
      auVar276._6_2_ = uVar174 >> local_168._0_8_;
      uVar178 = auVar271._8_2_;
      auVar276._8_2_ = uVar178 >> local_168._0_8_;
      uVar182 = auVar271._10_2_;
      auVar276._10_2_ = uVar182 >> local_168._0_8_;
      uVar186 = auVar271._12_2_;
      uVar190 = auVar271._14_2_;
      auVar276._12_2_ = uVar186 >> local_168._0_8_;
      auVar276._14_2_ = uVar190 >> local_168._0_8_;
      auVar91 = psubusw(auVar21,auVar276);
      auVar271 = lddqu(auVar276,*(undefined1 (*) [16])((long)in + lVar36 * -2 + 0x120));
      bVar269 = auVar271[0];
      bVar212 = auVar195[0];
      auVar149[0] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[1];
      bVar212 = auVar195[1];
      auVar149[1] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[2];
      bVar212 = auVar195[2];
      auVar149[2] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[3];
      bVar212 = auVar195[3];
      auVar149[3] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[4];
      bVar212 = auVar195[4];
      auVar149[4] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[5];
      bVar212 = auVar195[5];
      auVar149[5] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[6];
      bVar212 = auVar195[6];
      auVar149[6] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[7];
      bVar212 = auVar195[7];
      auVar149[7] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[8];
      bVar212 = auVar195[8];
      auVar149[8] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[9];
      bVar212 = auVar195[9];
      auVar149[9] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[10];
      bVar212 = auVar195[10];
      auVar149[10] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xb];
      bVar212 = auVar195[0xb];
      auVar149[0xb] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xc];
      bVar212 = auVar195[0xc];
      auVar149[0xc] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xd];
      bVar212 = auVar195[0xd];
      auVar149[0xd] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xe];
      bVar212 = auVar195[0xe];
      bVar241 = auVar195[0xf];
      auVar149[0xe] = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xf];
      auVar149[0xf] = (bVar241 < bVar269) * bVar269 | (bVar241 >= bVar269) * bVar241;
      sVar38 = auVar271._0_2_;
      uVar322 = (ushort)(sVar38 < sVar168) * sVar38 | (ushort)(sVar38 >= sVar168) * sVar168;
      sVar40 = auVar271._2_2_;
      uVar333 = (ushort)(sVar40 < sVar169) * sVar40 | (ushort)(sVar40 >= sVar169) * sVar169;
      sVar59 = auVar271._4_2_;
      uVar334 = (ushort)(sVar59 < sVar172) * sVar59 | (ushort)(sVar59 >= sVar172) * sVar172;
      sVar60 = auVar271._6_2_;
      uVar335 = (ushort)(sVar60 < sVar173) * sVar60 | (ushort)(sVar60 >= sVar173) * sVar173;
      sVar63 = auVar271._8_2_;
      uVar336 = (ushort)(sVar63 < sVar176) * sVar63 | (ushort)(sVar63 >= sVar176) * sVar176;
      sVar64 = auVar271._10_2_;
      uVar337 = (ushort)(sVar64 < sVar177) * sVar64 | (ushort)(sVar64 >= sVar177) * sVar177;
      sVar67 = auVar271._12_2_;
      uVar338 = (ushort)(sVar67 < sVar180) * sVar67 | (ushort)(sVar67 >= sVar180) * sVar180;
      sVar68 = auVar271._14_2_;
      uVar339 = (ushort)(sVar68 < sVar181) * sVar68 | (ushort)(sVar68 >= sVar181) * sVar181;
      auVar277._0_2_ = sVar38 - sVar42;
      auVar277._2_2_ = sVar40 - sVar62;
      auVar277._4_2_ = sVar59 - sVar66;
      auVar277._6_2_ = sVar60 - sVar70;
      auVar277._8_2_ = sVar63 - sVar74;
      auVar277._10_2_ = sVar64 - sVar79;
      auVar277._12_2_ = sVar67 - sVar85;
      auVar277._14_2_ = sVar68 - sVar191;
      auVar271 = pabsw(auVar149,auVar277);
      uVar65 = auVar271._0_2_;
      auVar52._0_2_ = uVar65 >> local_168._0_8_;
      uVar73 = auVar271._2_2_;
      auVar52._2_2_ = uVar73 >> local_168._0_8_;
      uVar81 = auVar271._4_2_;
      auVar52._4_2_ = uVar81 >> local_168._0_8_;
      uVar488 = auVar271._6_2_;
      auVar52._6_2_ = uVar488 >> local_168._0_8_;
      uVar494 = auVar271._8_2_;
      auVar52._8_2_ = uVar494 >> local_168._0_8_;
      uVar83 = auVar271._10_2_;
      auVar52._10_2_ = uVar83 >> local_168._0_8_;
      uVar89 = auVar271._12_2_;
      uVar319 = auVar271._14_2_;
      auVar52._12_2_ = uVar89 >> local_168._0_8_;
      auVar52._14_2_ = uVar319 >> local_168._0_8_;
      auVar271 = psubusw(auVar21,auVar52);
      sVar71 = auVar91._0_2_;
      sVar75 = auVar91._2_2_;
      sVar140 = auVar91._4_2_;
      sVar80 = auVar91._6_2_;
      sVar167 = auVar91._8_2_;
      sVar86 = auVar91._10_2_;
      sVar171 = auVar91._12_2_;
      sVar122 = auVar91._14_2_;
      sVar38 = auVar271._0_2_;
      sVar40 = auVar271._2_2_;
      sVar59 = auVar271._4_2_;
      sVar60 = auVar271._6_2_;
      sVar63 = auVar271._8_2_;
      sVar64 = auVar271._10_2_;
      sVar67 = auVar271._12_2_;
      sVar68 = auVar271._14_2_;
      auVar91 = psraw(auVar435,0xf);
      auVar345._0_2_ =
           (((short)uVar139 < sVar71) * uVar139 | (ushort)((short)uVar139 >= sVar71) * sVar71) +
           auVar91._0_2_;
      auVar345._2_2_ =
           (((short)uVar166 < sVar75) * uVar166 | (ushort)((short)uVar166 >= sVar75) * sVar75) +
           auVar91._2_2_;
      auVar345._4_2_ =
           (((short)uVar170 < sVar140) * uVar170 | (ushort)((short)uVar170 >= sVar140) * sVar140) +
           auVar91._4_2_;
      auVar345._6_2_ =
           (((short)uVar174 < sVar80) * uVar174 | (ushort)((short)uVar174 >= sVar80) * sVar80) +
           auVar91._6_2_;
      auVar345._8_2_ =
           (((short)uVar178 < sVar167) * uVar178 | (ushort)((short)uVar178 >= sVar167) * sVar167) +
           auVar91._8_2_;
      auVar345._10_2_ =
           (((short)uVar182 < sVar86) * uVar182 | (ushort)((short)uVar182 >= sVar86) * sVar86) +
           auVar91._10_2_;
      auVar345._12_2_ =
           (((short)uVar186 < sVar171) * uVar186 | (ushort)((short)uVar186 >= sVar171) * sVar171) +
           auVar91._12_2_;
      auVar345._14_2_ =
           (((short)uVar190 < sVar122) * uVar190 | (ushort)((short)uVar190 >= sVar122) * sVar122) +
           auVar91._14_2_;
      auVar345 = auVar345 ^ auVar91;
      auVar271 = psraw(auVar277,0xf);
      auVar235._0_2_ =
           (((short)uVar65 < sVar38) * uVar65 | (ushort)((short)uVar65 >= sVar38) * sVar38) +
           auVar271._0_2_;
      auVar235._2_2_ =
           (((short)uVar73 < sVar40) * uVar73 | (ushort)((short)uVar73 >= sVar40) * sVar40) +
           auVar271._2_2_;
      auVar235._4_2_ =
           (((short)uVar81 < sVar59) * uVar81 | (ushort)((short)uVar81 >= sVar59) * sVar59) +
           auVar271._4_2_;
      auVar235._6_2_ =
           (((short)uVar488 < sVar60) * uVar488 | (ushort)((short)uVar488 >= sVar60) * sVar60) +
           auVar271._6_2_;
      auVar235._8_2_ =
           (((short)uVar494 < sVar63) * uVar494 | (ushort)((short)uVar494 >= sVar63) * sVar63) +
           auVar271._8_2_;
      auVar235._10_2_ =
           (((short)uVar83 < sVar64) * uVar83 | (ushort)((short)uVar83 >= sVar64) * sVar64) +
           auVar271._10_2_;
      auVar235._12_2_ =
           (((short)uVar89 < sVar67) * uVar89 | (ushort)((short)uVar89 >= sVar67) * sVar67) +
           auVar271._12_2_;
      auVar235._14_2_ =
           (((short)uVar319 < sVar68) * uVar319 | (ushort)((short)uVar319 >= sVar68) * sVar68) +
           auVar271._14_2_;
      auVar235 = auVar235 ^ auVar271;
      local_a8 = auVar45._0_2_;
      sStack_a6 = auVar45._2_2_;
      in_XMM9._0_2_ =
           (auVar345._0_2_ + auVar110._0_2_ + auVar96._0_2_ + auVar274._0_2_) * local_a8 +
           (auVar51._0_2_ + auVar273._0_2_) * sVar72 + (auVar233._0_2_ + auVar92._0_2_) * sVar39;
      in_XMM9._2_2_ =
           (auVar345._2_2_ + auVar110._2_2_ + auVar96._2_2_ + auVar274._2_2_) * sStack_a6 +
           (auVar51._2_2_ + auVar273._2_2_) * sVar76 + (auVar233._2_2_ + auVar92._2_2_) * sVar58;
      in_XMM9._4_2_ =
           (auVar345._4_2_ + auVar110._4_2_ + auVar96._4_2_ + auVar274._4_2_) * local_a8 +
           (auVar51._4_2_ + auVar273._4_2_) * sVar72 + (auVar233._4_2_ + auVar92._4_2_) * sVar39;
      in_XMM9._6_2_ =
           (auVar345._6_2_ + auVar110._6_2_ + auVar96._6_2_ + auVar274._6_2_) * sStack_a6 +
           (auVar51._6_2_ + auVar273._6_2_) * sVar76 + (auVar233._6_2_ + auVar92._6_2_) * sVar58;
      in_XMM9._8_2_ =
           (auVar345._8_2_ + auVar110._8_2_ + auVar96._8_2_ + auVar274._8_2_) * local_a8 +
           (auVar51._8_2_ + auVar273._8_2_) * sVar72 + (auVar233._8_2_ + auVar92._8_2_) * sVar39;
      in_XMM9._10_2_ =
           (auVar345._10_2_ + auVar110._10_2_ + auVar96._10_2_ + auVar274._10_2_) * sStack_a6 +
           (auVar51._10_2_ + auVar273._10_2_) * sVar76 + (auVar233._10_2_ + auVar92._10_2_) * sVar58
      ;
      in_XMM9._12_2_ =
           (auVar345._12_2_ + auVar110._12_2_ + auVar96._12_2_ + auVar274._12_2_) * local_a8 +
           (auVar51._12_2_ + auVar273._12_2_) * sVar72 + (auVar233._12_2_ + auVar92._12_2_) * sVar39
      ;
      in_XMM9._14_2_ =
           (auVar345._14_2_ + auVar110._14_2_ + auVar96._14_2_ + auVar274._14_2_) * sStack_a6 +
           (auVar51._14_2_ + auVar273._14_2_) * sVar76 + (auVar233._14_2_ + auVar92._14_2_) * sVar58
      ;
      auVar143 = lddqu(auVar199,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar30 * 2));
      sVar75 = auVar143._0_2_;
      auVar111._0_2_ = sVar75 - sVar348;
      sVar140 = auVar143._2_2_;
      auVar111._2_2_ = sVar140 - sVar363;
      sVar80 = auVar143._4_2_;
      auVar111._4_2_ = sVar80 - sVar365;
      sVar167 = auVar143._6_2_;
      auVar111._6_2_ = sVar167 - sVar366;
      sVar86 = auVar143._8_2_;
      auVar111._8_2_ = sVar86 - sVar369;
      sVar171 = auVar143._10_2_;
      auVar111._10_2_ = sVar171 - sVar371;
      sVar122 = auVar143._12_2_;
      sVar175 = auVar143._14_2_;
      auVar111._12_2_ = sVar122 - sVar374;
      auVar111._14_2_ = sVar175 - sVar378;
      auVar195 = lddqu(auVar271,*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])((long)in + 0x120) + lVar30 * 2));
      sVar127 = auVar195._0_2_;
      auVar150._0_2_ = sVar127 - sVar42;
      sVar179 = auVar195._2_2_;
      auVar150._2_2_ = sVar179 - sVar62;
      sVar132 = auVar195._4_2_;
      auVar150._4_2_ = sVar132 - sVar66;
      sVar183 = auVar195._6_2_;
      auVar150._6_2_ = sVar183 - sVar70;
      sVar137 = auVar195._8_2_;
      auVar150._8_2_ = sVar137 - sVar74;
      sVar187 = auVar195._10_2_;
      auVar150._10_2_ = sVar187 - sVar79;
      sVar141 = auVar195._12_2_;
      sVar168 = auVar195._14_2_;
      auVar150._12_2_ = sVar141 - sVar85;
      auVar150._14_2_ = sVar168 - sVar191;
      auVar271 = pabsw(auVar413,auVar111);
      uVar65 = auVar271._0_2_;
      auVar53._0_2_ = uVar65 >> local_168._0_8_;
      uVar73 = auVar271._2_2_;
      auVar53._2_2_ = uVar73 >> local_168._0_8_;
      uVar81 = auVar271._4_2_;
      auVar53._4_2_ = uVar81 >> local_168._0_8_;
      uVar488 = auVar271._6_2_;
      auVar53._6_2_ = uVar488 >> local_168._0_8_;
      uVar494 = auVar271._8_2_;
      auVar53._8_2_ = uVar494 >> local_168._0_8_;
      uVar83 = auVar271._10_2_;
      auVar53._10_2_ = uVar83 >> local_168._0_8_;
      uVar89 = auVar271._12_2_;
      uVar319 = auVar271._14_2_;
      auVar53._12_2_ = uVar89 >> local_168._0_8_;
      auVar53._14_2_ = uVar319 >> local_168._0_8_;
      auVar230 = pabsw(auVar91,auVar150);
      uVar139 = auVar230._0_2_;
      auVar479._0_2_ = uVar139 >> local_168._0_8_;
      uVar166 = auVar230._2_2_;
      auVar479._2_2_ = uVar166 >> local_168._0_8_;
      uVar170 = auVar230._4_2_;
      auVar479._4_2_ = uVar170 >> local_168._0_8_;
      uVar174 = auVar230._6_2_;
      auVar479._6_2_ = uVar174 >> local_168._0_8_;
      uVar178 = auVar230._8_2_;
      auVar479._8_2_ = uVar178 >> local_168._0_8_;
      uVar182 = auVar230._10_2_;
      auVar479._10_2_ = uVar182 >> local_168._0_8_;
      uVar186 = auVar230._12_2_;
      uVar190 = auVar230._14_2_;
      auVar479._12_2_ = uVar186 >> local_168._0_8_;
      auVar479._14_2_ = uVar190 >> local_168._0_8_;
      auVar91 = psubusw(auVar21,auVar53);
      auVar271 = psubusw(auVar21,auVar479);
      sVar42 = auVar91._0_2_;
      sVar62 = auVar91._2_2_;
      sVar66 = auVar91._4_2_;
      sVar70 = auVar91._6_2_;
      sVar74 = auVar91._8_2_;
      sVar79 = auVar91._10_2_;
      sVar85 = auVar91._12_2_;
      sVar71 = auVar91._14_2_;
      sVar38 = auVar271._0_2_;
      sVar40 = auVar271._2_2_;
      sVar59 = auVar271._4_2_;
      sVar60 = auVar271._6_2_;
      sVar63 = auVar271._8_2_;
      sVar64 = auVar271._10_2_;
      sVar67 = auVar271._12_2_;
      sVar68 = auVar271._14_2_;
      auVar271 = psraw(auVar111,0xf);
      auVar97._0_2_ =
           (((short)uVar65 < sVar42) * uVar65 | (ushort)((short)uVar65 >= sVar42) * sVar42) +
           auVar271._0_2_;
      auVar97._2_2_ =
           (((short)uVar73 < sVar62) * uVar73 | (ushort)((short)uVar73 >= sVar62) * sVar62) +
           auVar271._2_2_;
      auVar97._4_2_ =
           (((short)uVar81 < sVar66) * uVar81 | (ushort)((short)uVar81 >= sVar66) * sVar66) +
           auVar271._4_2_;
      auVar97._6_2_ =
           (((short)uVar488 < sVar70) * uVar488 | (ushort)((short)uVar488 >= sVar70) * sVar70) +
           auVar271._6_2_;
      auVar97._8_2_ =
           (((short)uVar494 < sVar74) * uVar494 | (ushort)((short)uVar494 >= sVar74) * sVar74) +
           auVar271._8_2_;
      auVar97._10_2_ =
           (((short)uVar83 < sVar79) * uVar83 | (ushort)((short)uVar83 >= sVar79) * sVar79) +
           auVar271._10_2_;
      auVar97._12_2_ =
           (((short)uVar89 < sVar85) * uVar89 | (ushort)((short)uVar89 >= sVar85) * sVar85) +
           auVar271._12_2_;
      auVar97._14_2_ =
           (((short)uVar319 < sVar71) * uVar319 | (ushort)((short)uVar319 >= sVar71) * sVar71) +
           auVar271._14_2_;
      auVar97 = auVar97 ^ auVar271;
      auVar91 = psraw(auVar150,0xf);
      auVar54._0_2_ =
           (((short)uVar139 < sVar38) * uVar139 | (ushort)((short)uVar139 >= sVar38) * sVar38) +
           auVar91._0_2_;
      auVar54._2_2_ =
           (((short)uVar166 < sVar40) * uVar166 | (ushort)((short)uVar166 >= sVar40) * sVar40) +
           auVar91._2_2_;
      auVar54._4_2_ =
           (((short)uVar170 < sVar59) * uVar170 | (ushort)((short)uVar170 >= sVar59) * sVar59) +
           auVar91._4_2_;
      auVar54._6_2_ =
           (((short)uVar174 < sVar60) * uVar174 | (ushort)((short)uVar174 >= sVar60) * sVar60) +
           auVar91._6_2_;
      auVar54._8_2_ =
           (((short)uVar178 < sVar63) * uVar178 | (ushort)((short)uVar178 >= sVar63) * sVar63) +
           auVar91._8_2_;
      auVar54._10_2_ =
           (((short)uVar182 < sVar64) * uVar182 | (ushort)((short)uVar182 >= sVar64) * sVar64) +
           auVar91._10_2_;
      auVar54._12_2_ =
           (((short)uVar186 < sVar67) * uVar186 | (ushort)((short)uVar186 >= sVar67) * sVar67) +
           auVar91._12_2_;
      auVar54._14_2_ =
           (((short)uVar190 < sVar68) * uVar190 | (ushort)((short)uVar190 >= sVar68) * sVar68) +
           auVar91._14_2_;
      auVar54 = auVar54 ^ auVar91;
      uVar65 = (ushort)(sVar75 < (short)uVar293) * sVar75 | (sVar75 >= (short)uVar293) * uVar293;
      uVar73 = (ushort)(sVar140 < (short)uVar307) * sVar140 | (sVar140 >= (short)uVar307) * uVar307;
      uVar81 = (ushort)(sVar80 < (short)uVar309) * sVar80 | (sVar80 >= (short)uVar309) * uVar309;
      uVar488 = (ushort)(sVar167 < (short)uVar311) * sVar167 | (sVar167 >= (short)uVar311) * uVar311
      ;
      uVar494 = (ushort)(sVar86 < (short)uVar313) * sVar86 | (sVar86 >= (short)uVar313) * uVar313;
      uVar83 = (ushort)(sVar171 < (short)uVar315) * sVar171 | (sVar171 >= (short)uVar315) * uVar315;
      uVar89 = (ushort)(sVar122 < (short)uVar317) * sVar122 | (sVar122 >= (short)uVar317) * uVar317;
      uVar319 = (ushort)(sVar175 < (short)uVar320) * sVar175 | (sVar175 >= (short)uVar320) * uVar320
      ;
      auVar271 = lddqu(auVar271,*(undefined1 (*) [16])((long)in + lVar30 * -2));
      bVar269 = auVar271[0];
      bVar212 = auVar143[0];
      bVar411 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[1];
      bVar212 = auVar143[1];
      bVar417 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[2];
      bVar212 = auVar143[2];
      bVar418 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[3];
      bVar212 = auVar143[3];
      bVar419 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[4];
      bVar212 = auVar143[4];
      bVar420 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[5];
      bVar212 = auVar143[5];
      bVar421 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[6];
      bVar212 = auVar143[6];
      bVar422 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[7];
      bVar212 = auVar143[7];
      bVar423 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[8];
      bVar212 = auVar143[8];
      bVar424 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[9];
      bVar212 = auVar143[9];
      bVar425 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[10];
      bVar212 = auVar143[10];
      bVar426 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xb];
      bVar212 = auVar143[0xb];
      bVar427 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xc];
      bVar212 = auVar143[0xc];
      bVar428 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xd];
      bVar212 = auVar143[0xd];
      bVar429 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xe];
      bVar212 = auVar143[0xe];
      bVar241 = auVar143[0xf];
      bVar430 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar271[0xf];
      bVar431 = (bVar241 < bVar269) * bVar269 | (bVar241 >= bVar269) * bVar241;
      sVar38 = auVar271._0_2_;
      uVar139 = (ushort)(sVar38 < (short)uVar65) * sVar38 | (sVar38 >= (short)uVar65) * uVar65;
      sVar40 = auVar271._2_2_;
      uVar166 = (ushort)(sVar40 < (short)uVar73) * sVar40 | (sVar40 >= (short)uVar73) * uVar73;
      sVar59 = auVar271._4_2_;
      uVar170 = (ushort)(sVar59 < (short)uVar81) * sVar59 | (sVar59 >= (short)uVar81) * uVar81;
      sVar60 = auVar271._6_2_;
      uVar174 = (ushort)(sVar60 < (short)uVar488) * sVar60 | (sVar60 >= (short)uVar488) * uVar488;
      sVar63 = auVar271._8_2_;
      uVar178 = (ushort)(sVar63 < (short)uVar494) * sVar63 | (sVar63 >= (short)uVar494) * uVar494;
      sVar64 = auVar271._10_2_;
      uVar182 = (ushort)(sVar64 < (short)uVar83) * sVar64 | (sVar64 >= (short)uVar83) * uVar83;
      sVar67 = auVar271._12_2_;
      uVar186 = (ushort)(sVar67 < (short)uVar89) * sVar67 | (sVar67 >= (short)uVar89) * uVar89;
      sVar68 = auVar271._14_2_;
      uVar190 = (ushort)(sVar68 < (short)uVar319) * sVar68 | (sVar68 >= (short)uVar319) * uVar319;
      auVar151._0_2_ = sVar38 - sVar348;
      auVar151._2_2_ = sVar40 - sVar363;
      auVar151._4_2_ = sVar59 - sVar365;
      auVar151._6_2_ = sVar60 - sVar366;
      auVar151._8_2_ = sVar63 - sVar369;
      auVar151._10_2_ = sVar64 - sVar371;
      auVar151._12_2_ = sVar67 - sVar374;
      auVar151._14_2_ = sVar68 - sVar378;
      auVar271 = pabsw(auVar230,auVar151);
      uVar307 = auVar271._0_2_;
      auVar436._0_2_ = uVar307 >> local_168._0_8_;
      uVar311 = auVar271._2_2_;
      auVar436._2_2_ = uVar311 >> local_168._0_8_;
      uVar315 = auVar271._4_2_;
      auVar436._4_2_ = uVar315 >> local_168._0_8_;
      uVar320 = auVar271._6_2_;
      auVar436._6_2_ = uVar320 >> local_168._0_8_;
      uVar270 = auVar271._8_2_;
      auVar436._8_2_ = uVar270 >> local_168._0_8_;
      uVar286 = auVar271._10_2_;
      auVar436._10_2_ = uVar286 >> local_168._0_8_;
      uVar287 = auVar271._12_2_;
      uVar288 = auVar271._14_2_;
      auVar436._12_2_ = uVar287 >> local_168._0_8_;
      auVar436._14_2_ = uVar288 >> local_168._0_8_;
      auVar271 = psubusw(auVar21,auVar436);
      uVar65 = (ushort)(sVar127 < (short)uVar322) * sVar127 | (sVar127 >= (short)uVar322) * uVar322;
      uVar73 = (ushort)(sVar179 < (short)uVar333) * sVar179 | (sVar179 >= (short)uVar333) * uVar333;
      uVar81 = (ushort)(sVar132 < (short)uVar334) * sVar132 | (sVar132 >= (short)uVar334) * uVar334;
      uVar488 = (ushort)(sVar183 < (short)uVar335) * sVar183 | (sVar183 >= (short)uVar335) * uVar335
      ;
      uVar494 = (ushort)(sVar137 < (short)uVar336) * sVar137 | (sVar137 >= (short)uVar336) * uVar336
      ;
      uVar83 = (ushort)(sVar187 < (short)uVar337) * sVar187 | (sVar187 >= (short)uVar337) * uVar337;
      uVar89 = (ushort)(sVar141 < (short)uVar338) * sVar141 | (sVar141 >= (short)uVar338) * uVar338;
      uVar319 = (ushort)(sVar168 < (short)uVar339) * sVar168 | (sVar168 >= (short)uVar339) * uVar339
      ;
      auVar91 = lddqu(auVar436,*(undefined1 (*) [16])((long)in + lVar30 * -2 + 0x120));
      bVar269 = auVar91[0];
      bVar212 = auVar195[0];
      bVar212 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar91[1];
      bVar241 = auVar195[1];
      bVar241 = (bVar241 < bVar269) * bVar269 | (bVar241 >= bVar269) * bVar241;
      bVar269 = auVar91[2];
      bVar386 = auVar195[2];
      bVar386 = (bVar386 < bVar269) * bVar269 | (bVar386 >= bVar269) * bVar386;
      bVar269 = auVar91[3];
      bVar389 = auVar195[3];
      bVar389 = (bVar389 < bVar269) * bVar269 | (bVar389 >= bVar269) * bVar389;
      bVar269 = auVar91[4];
      bVar390 = auVar195[4];
      bVar390 = (bVar390 < bVar269) * bVar269 | (bVar390 >= bVar269) * bVar390;
      bVar269 = auVar91[5];
      bVar393 = auVar195[5];
      bVar393 = (bVar393 < bVar269) * bVar269 | (bVar393 >= bVar269) * bVar393;
      bVar269 = auVar91[6];
      bVar394 = auVar195[6];
      bVar394 = (bVar394 < bVar269) * bVar269 | (bVar394 >= bVar269) * bVar394;
      bVar269 = auVar91[7];
      bVar397 = auVar195[7];
      bVar397 = (bVar397 < bVar269) * bVar269 | (bVar397 >= bVar269) * bVar397;
      bVar269 = auVar91[8];
      bVar398 = auVar195[8];
      bVar398 = (bVar398 < bVar269) * bVar269 | (bVar398 >= bVar269) * bVar398;
      bVar269 = auVar91[9];
      bVar401 = auVar195[9];
      bVar401 = (bVar401 < bVar269) * bVar269 | (bVar401 >= bVar269) * bVar401;
      bVar269 = auVar91[10];
      bVar402 = auVar195[10];
      bVar402 = (bVar402 < bVar269) * bVar269 | (bVar402 >= bVar269) * bVar402;
      bVar269 = auVar91[0xb];
      bVar404 = auVar195[0xb];
      bVar404 = (bVar404 < bVar269) * bVar269 | (bVar404 >= bVar269) * bVar404;
      bVar269 = auVar91[0xc];
      bVar405 = auVar195[0xc];
      bVar405 = (bVar405 < bVar269) * bVar269 | (bVar405 >= bVar269) * bVar405;
      bVar269 = auVar91[0xd];
      bVar407 = auVar195[0xd];
      bVar407 = (bVar407 < bVar269) * bVar269 | (bVar407 >= bVar269) * bVar407;
      bVar269 = auVar91[0xe];
      bVar408 = auVar195[0xe];
      bVar410 = auVar195[0xf];
      bVar408 = (bVar408 < bVar269) * bVar269 | (bVar408 >= bVar269) * bVar408;
      bVar269 = auVar91[0xf];
      bVar410 = (bVar410 < bVar269) * bVar269 | (bVar410 >= bVar269) * bVar410;
      sVar38 = auVar91._0_2_;
      uVar293 = (ushort)(sVar38 < (short)uVar65) * sVar38 | (sVar38 >= (short)uVar65) * uVar65;
      sVar40 = auVar91._2_2_;
      uVar309 = (ushort)(sVar40 < (short)uVar73) * sVar40 | (sVar40 >= (short)uVar73) * uVar73;
      sVar59 = auVar91._4_2_;
      uVar313 = (ushort)(sVar59 < (short)uVar81) * sVar59 | (sVar59 >= (short)uVar81) * uVar81;
      sVar60 = auVar91._6_2_;
      uVar317 = (ushort)(sVar60 < (short)uVar488) * sVar60 | (sVar60 >= (short)uVar488) * uVar488;
      sVar63 = auVar91._8_2_;
      uVar322 = (ushort)(sVar63 < (short)uVar494) * sVar63 | (sVar63 >= (short)uVar494) * uVar494;
      sVar64 = auVar91._10_2_;
      uVar334 = (ushort)(sVar64 < (short)uVar83) * sVar64 | (sVar64 >= (short)uVar83) * uVar83;
      sVar67 = auVar91._12_2_;
      uVar336 = (ushort)(sVar67 < (short)uVar89) * sVar67 | (sVar67 >= (short)uVar89) * uVar89;
      sVar68 = auVar91._14_2_;
      uVar338 = (ushort)(sVar68 < (short)uVar319) * sVar68 | (sVar68 >= (short)uVar319) * uVar319;
      sVar140 = auVar26._0_2_;
      auVar480._0_2_ = sVar38 - sVar140;
      sVar167 = auVar26._2_2_;
      auVar480._2_2_ = sVar40 - sVar167;
      sVar171 = auVar26._4_2_;
      auVar480._4_2_ = sVar59 - sVar171;
      sVar175 = auVar26._6_2_;
      auVar480._6_2_ = sVar60 - sVar175;
      sVar179 = auVar26._8_2_;
      auVar480._8_2_ = sVar63 - sVar179;
      sVar183 = auVar26._10_2_;
      auVar480._10_2_ = sVar64 - sVar183;
      sVar187 = auVar26._12_2_;
      auVar480._12_2_ = sVar67 - sVar187;
      auVar480._14_2_ = sVar68 - sVar191;
      auVar195 = pabsw(auVar195,auVar480);
      uVar65 = auVar195._0_2_;
      auVar200._0_2_ = uVar65 >> local_168._0_8_;
      uVar73 = auVar195._2_2_;
      auVar200._2_2_ = uVar73 >> local_168._0_8_;
      uVar81 = auVar195._4_2_;
      auVar200._4_2_ = uVar81 >> local_168._0_8_;
      uVar488 = auVar195._6_2_;
      auVar200._6_2_ = uVar488 >> local_168._0_8_;
      uVar494 = auVar195._8_2_;
      auVar200._8_2_ = uVar494 >> local_168._0_8_;
      uVar83 = auVar195._10_2_;
      auVar200._10_2_ = uVar83 >> local_168._0_8_;
      uVar89 = auVar195._12_2_;
      uVar319 = auVar195._14_2_;
      auVar200._12_2_ = uVar89 >> local_168._0_8_;
      auVar200._14_2_ = uVar319 >> local_168._0_8_;
      auVar91 = psubusw(auVar21,auVar200);
      sVar38 = auVar271._0_2_;
      sVar40 = auVar271._2_2_;
      sVar59 = auVar271._4_2_;
      sVar60 = auVar271._6_2_;
      sVar63 = auVar271._8_2_;
      sVar64 = auVar271._10_2_;
      sVar67 = auVar271._12_2_;
      sVar68 = auVar271._14_2_;
      sVar42 = auVar91._0_2_;
      sVar62 = auVar91._2_2_;
      sVar66 = auVar91._4_2_;
      sVar70 = auVar91._6_2_;
      sVar74 = auVar91._8_2_;
      sVar79 = auVar91._10_2_;
      sVar85 = auVar91._12_2_;
      sVar71 = auVar91._14_2_;
      auVar271 = psraw(auVar151,0xf);
      auVar112._0_2_ =
           (((short)uVar307 < sVar38) * uVar307 | (ushort)((short)uVar307 >= sVar38) * sVar38) +
           auVar271._0_2_;
      auVar112._2_2_ =
           (((short)uVar311 < sVar40) * uVar311 | (ushort)((short)uVar311 >= sVar40) * sVar40) +
           auVar271._2_2_;
      auVar112._4_2_ =
           (((short)uVar315 < sVar59) * uVar315 | (ushort)((short)uVar315 >= sVar59) * sVar59) +
           auVar271._4_2_;
      auVar112._6_2_ =
           (((short)uVar320 < sVar60) * uVar320 | (ushort)((short)uVar320 >= sVar60) * sVar60) +
           auVar271._6_2_;
      auVar112._8_2_ =
           (((short)uVar270 < sVar63) * uVar270 | (ushort)((short)uVar270 >= sVar63) * sVar63) +
           auVar271._8_2_;
      auVar112._10_2_ =
           (((short)uVar286 < sVar64) * uVar286 | (ushort)((short)uVar286 >= sVar64) * sVar64) +
           auVar271._10_2_;
      auVar112._12_2_ =
           (((short)uVar287 < sVar67) * uVar287 | (ushort)((short)uVar287 >= sVar67) * sVar67) +
           auVar271._12_2_;
      auVar112._14_2_ =
           (((short)uVar288 < sVar68) * uVar288 | (ushort)((short)uVar288 >= sVar68) * sVar68) +
           auVar271._14_2_;
      auVar112 = auVar112 ^ auVar271;
      auVar91 = psraw(auVar480,0xf);
      auVar437._0_2_ =
           (((short)uVar65 < sVar42) * uVar65 | (ushort)((short)uVar65 >= sVar42) * sVar42) +
           auVar91._0_2_;
      auVar437._2_2_ =
           (((short)uVar73 < sVar62) * uVar73 | (ushort)((short)uVar73 >= sVar62) * sVar62) +
           auVar91._2_2_;
      auVar437._4_2_ =
           (((short)uVar81 < sVar66) * uVar81 | (ushort)((short)uVar81 >= sVar66) * sVar66) +
           auVar91._4_2_;
      auVar437._6_2_ =
           (((short)uVar488 < sVar70) * uVar488 | (ushort)((short)uVar488 >= sVar70) * sVar70) +
           auVar91._6_2_;
      auVar437._8_2_ =
           (((short)uVar494 < sVar74) * uVar494 | (ushort)((short)uVar494 >= sVar74) * sVar74) +
           auVar91._8_2_;
      auVar437._10_2_ =
           (((short)uVar83 < sVar79) * uVar83 | (ushort)((short)uVar83 >= sVar79) * sVar79) +
           auVar91._10_2_;
      auVar437._12_2_ =
           (((short)uVar89 < sVar85) * uVar89 | (ushort)((short)uVar89 >= sVar85) * sVar85) +
           auVar91._12_2_;
      auVar437._14_2_ =
           (((short)uVar319 < sVar71) * uVar319 | (ushort)((short)uVar319 >= sVar71) * sVar71) +
           auVar91._14_2_;
      auVar437 = auVar437 ^ auVar91;
      auVar143 = lddqu(auVar271,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar34 * 2));
      sVar75 = auVar143._0_2_;
      auVar152._0_2_ = sVar75 - sVar348;
      sVar80 = auVar143._2_2_;
      auVar152._2_2_ = sVar80 - sVar363;
      sVar86 = auVar143._4_2_;
      auVar152._4_2_ = sVar86 - sVar365;
      sVar122 = auVar143._6_2_;
      auVar152._6_2_ = sVar122 - sVar366;
      sVar127 = auVar143._8_2_;
      auVar152._8_2_ = sVar127 - sVar369;
      sVar132 = auVar143._10_2_;
      auVar152._10_2_ = sVar132 - sVar371;
      sVar137 = auVar143._12_2_;
      sVar141 = auVar143._14_2_;
      auVar152._12_2_ = sVar137 - sVar374;
      auVar152._14_2_ = sVar141 - sVar378;
      auVar271 = pabsw(auVar57,auVar152);
      uVar65 = auVar271._0_2_;
      auVar55._0_2_ = uVar65 >> local_168._0_8_;
      uVar73 = auVar271._2_2_;
      auVar55._2_2_ = uVar73 >> local_168._0_8_;
      uVar81 = auVar271._4_2_;
      auVar55._4_2_ = uVar81 >> local_168._0_8_;
      uVar488 = auVar271._6_2_;
      auVar55._6_2_ = uVar488 >> local_168._0_8_;
      uVar494 = auVar271._8_2_;
      auVar55._8_2_ = uVar494 >> local_168._0_8_;
      uVar83 = auVar271._10_2_;
      auVar55._10_2_ = uVar83 >> local_168._0_8_;
      uVar89 = auVar271._12_2_;
      uVar319 = auVar271._14_2_;
      auVar55._12_2_ = uVar89 >> local_168._0_8_;
      auVar55._14_2_ = uVar319 >> local_168._0_8_;
      auVar22._4_2_ = uStack_1d4;
      auVar22._0_4_ = uVar44;
      auVar22._6_2_ = uStack_1d2;
      auVar22._8_2_ = uStack_1d4;
      auVar22._10_2_ = uStack_1d2;
      auVar22._12_2_ = uStack_1d4;
      auVar22._14_2_ = uStack_1d2;
      auVar91 = psubusw(auVar22,auVar55);
      auVar195 = lddqu(auVar195,*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])((long)in + 0x120) + lVar34 * 2));
      sVar168 = auVar195._0_2_;
      auVar278._0_2_ = sVar168 - sVar140;
      sVar169 = auVar195._2_2_;
      auVar278._2_2_ = sVar169 - sVar167;
      sVar172 = auVar195._4_2_;
      auVar278._4_2_ = sVar172 - sVar171;
      sVar173 = auVar195._6_2_;
      auVar278._6_2_ = sVar173 - sVar175;
      sVar176 = auVar195._8_2_;
      auVar278._8_2_ = sVar176 - sVar179;
      sVar177 = auVar195._10_2_;
      auVar278._10_2_ = sVar177 - sVar183;
      sVar180 = auVar195._12_2_;
      sVar181 = auVar195._14_2_;
      auVar278._12_2_ = sVar180 - sVar187;
      auVar278._14_2_ = sVar181 - sVar191;
      auVar271 = pabsw(auVar203,auVar278);
      uVar307 = auVar271._0_2_;
      auVar201._0_2_ = uVar307 >> local_168._0_8_;
      uVar311 = auVar271._2_2_;
      auVar201._2_2_ = uVar311 >> local_168._0_8_;
      uVar315 = auVar271._4_2_;
      auVar201._4_2_ = uVar315 >> local_168._0_8_;
      uVar320 = auVar271._6_2_;
      auVar201._6_2_ = uVar320 >> local_168._0_8_;
      uVar333 = auVar271._8_2_;
      auVar201._8_2_ = uVar333 >> local_168._0_8_;
      uVar335 = auVar271._10_2_;
      auVar201._10_2_ = uVar335 >> local_168._0_8_;
      uVar337 = auVar271._12_2_;
      uVar339 = auVar271._14_2_;
      auVar201._12_2_ = uVar337 >> local_168._0_8_;
      auVar201._14_2_ = uVar339 >> local_168._0_8_;
      auVar271 = psubusw(auVar22,auVar201);
      sVar42 = auVar91._0_2_;
      sVar62 = auVar91._2_2_;
      sVar66 = auVar91._4_2_;
      sVar70 = auVar91._6_2_;
      sVar74 = auVar91._8_2_;
      sVar79 = auVar91._10_2_;
      sVar85 = auVar91._12_2_;
      sVar71 = auVar91._14_2_;
      sVar38 = auVar271._0_2_;
      sVar40 = auVar271._2_2_;
      sVar59 = auVar271._4_2_;
      sVar60 = auVar271._6_2_;
      sVar63 = auVar271._8_2_;
      sVar64 = auVar271._10_2_;
      sVar67 = auVar271._12_2_;
      sVar68 = auVar271._14_2_;
      auVar271 = psraw(auVar152,0xf);
      auVar98._0_2_ =
           (((short)uVar65 < sVar42) * uVar65 | (ushort)((short)uVar65 >= sVar42) * sVar42) +
           auVar271._0_2_;
      auVar98._2_2_ =
           (((short)uVar73 < sVar62) * uVar73 | (ushort)((short)uVar73 >= sVar62) * sVar62) +
           auVar271._2_2_;
      auVar98._4_2_ =
           (((short)uVar81 < sVar66) * uVar81 | (ushort)((short)uVar81 >= sVar66) * sVar66) +
           auVar271._4_2_;
      auVar98._6_2_ =
           (((short)uVar488 < sVar70) * uVar488 | (ushort)((short)uVar488 >= sVar70) * sVar70) +
           auVar271._6_2_;
      auVar98._8_2_ =
           (((short)uVar494 < sVar74) * uVar494 | (ushort)((short)uVar494 >= sVar74) * sVar74) +
           auVar271._8_2_;
      auVar98._10_2_ =
           (((short)uVar83 < sVar79) * uVar83 | (ushort)((short)uVar83 >= sVar79) * sVar79) +
           auVar271._10_2_;
      auVar98._12_2_ =
           (((short)uVar89 < sVar85) * uVar89 | (ushort)((short)uVar89 >= sVar85) * sVar85) +
           auVar271._12_2_;
      auVar98._14_2_ =
           (((short)uVar319 < sVar71) * uVar319 | (ushort)((short)uVar319 >= sVar71) * sVar71) +
           auVar271._14_2_;
      auVar98 = auVar98 ^ auVar271;
      auVar153[0] = (bVar194 < bVar242) * bVar242 | (bVar194 >= bVar242) * bVar194;
      auVar153[1] = (bVar213 < bVar245) * bVar245 | (bVar213 >= bVar245) * bVar213;
      auVar153[2] = (bVar214 < bVar246) * bVar246 | (bVar214 >= bVar246) * bVar214;
      auVar153[3] = (bVar215 < bVar249) * bVar249 | (bVar215 >= bVar249) * bVar215;
      auVar153[4] = (bVar216 < bVar250) * bVar250 | (bVar216 >= bVar250) * bVar216;
      auVar153[5] = (bVar217 < bVar253) * bVar253 | (bVar217 >= bVar253) * bVar217;
      auVar153[6] = (bVar218 < bVar254) * bVar254 | (bVar218 >= bVar254) * bVar218;
      auVar153[7] = (bVar219 < bVar257) * bVar257 | (bVar219 >= bVar257) * bVar219;
      auVar153[8] = (bVar220 < bVar258) * bVar258 | (bVar220 >= bVar258) * bVar220;
      auVar153[9] = (bVar221 < bVar261) * bVar261 | (bVar221 >= bVar261) * bVar221;
      auVar153[10] = (bVar222 < bVar262) * bVar262 | (bVar222 >= bVar262) * bVar222;
      auVar153[0xb] = (bVar223 < bVar265) * bVar265 | (bVar223 >= bVar265) * bVar223;
      auVar153[0xc] = (bVar224 < bVar266) * bVar266 | (bVar224 >= bVar266) * bVar224;
      auVar153[0xd] = (bVar225 < bVar375) * bVar375 | (bVar225 >= bVar375) * bVar225;
      auVar153[0xe] = (bVar226 < bVar376) * bVar376 | (bVar226 >= bVar376) * bVar226;
      auVar153[0xf] = (bVar227 < bVar380) * bVar380 | (bVar227 >= bVar380) * bVar227;
      bVar269 = auVar143[0];
      bVar194 = (bVar411 < bVar269) * bVar269 | (bVar411 >= bVar269) * bVar411;
      bVar269 = auVar143[1];
      bVar213 = (bVar417 < bVar269) * bVar269 | (bVar417 >= bVar269) * bVar417;
      bVar269 = auVar143[2];
      bVar214 = (bVar418 < bVar269) * bVar269 | (bVar418 >= bVar269) * bVar418;
      bVar269 = auVar143[3];
      bVar215 = (bVar419 < bVar269) * bVar269 | (bVar419 >= bVar269) * bVar419;
      bVar269 = auVar143[4];
      bVar216 = (bVar420 < bVar269) * bVar269 | (bVar420 >= bVar269) * bVar420;
      bVar269 = auVar143[5];
      bVar217 = (bVar421 < bVar269) * bVar269 | (bVar421 >= bVar269) * bVar421;
      bVar269 = auVar143[6];
      bVar218 = (bVar422 < bVar269) * bVar269 | (bVar422 >= bVar269) * bVar422;
      bVar269 = auVar143[7];
      bVar219 = (bVar423 < bVar269) * bVar269 | (bVar423 >= bVar269) * bVar423;
      bVar269 = auVar143[8];
      bVar220 = (bVar424 < bVar269) * bVar269 | (bVar424 >= bVar269) * bVar424;
      bVar269 = auVar143[9];
      bVar221 = (bVar425 < bVar269) * bVar269 | (bVar425 >= bVar269) * bVar425;
      bVar269 = auVar143[10];
      bVar222 = (bVar426 < bVar269) * bVar269 | (bVar426 >= bVar269) * bVar426;
      bVar269 = auVar143[0xb];
      bVar223 = (bVar427 < bVar269) * bVar269 | (bVar427 >= bVar269) * bVar427;
      bVar269 = auVar143[0xc];
      bVar224 = (bVar428 < bVar269) * bVar269 | (bVar428 >= bVar269) * bVar428;
      bVar269 = auVar143[0xd];
      bVar225 = (bVar429 < bVar269) * bVar269 | (bVar429 >= bVar269) * bVar429;
      bVar269 = auVar143[0xe];
      bVar226 = (bVar430 < bVar269) * bVar269 | (bVar430 >= bVar269) * bVar430;
      bVar269 = auVar143[0xf];
      bVar269 = (bVar431 < bVar269) * bVar269 | (bVar431 >= bVar269) * bVar431;
      bVar194 = (bVar194 < auVar153[0]) * auVar153[0] | (bVar194 >= auVar153[0]) * bVar194;
      bVar213 = (bVar213 < auVar153[1]) * auVar153[1] | (bVar213 >= auVar153[1]) * bVar213;
      bVar214 = (bVar214 < auVar153[2]) * auVar153[2] | (bVar214 >= auVar153[2]) * bVar214;
      bVar215 = (bVar215 < auVar153[3]) * auVar153[3] | (bVar215 >= auVar153[3]) * bVar215;
      bVar216 = (bVar216 < auVar153[4]) * auVar153[4] | (bVar216 >= auVar153[4]) * bVar216;
      bVar217 = (bVar217 < auVar153[5]) * auVar153[5] | (bVar217 >= auVar153[5]) * bVar217;
      bVar218 = (bVar218 < auVar153[6]) * auVar153[6] | (bVar218 >= auVar153[6]) * bVar218;
      bVar219 = (bVar219 < auVar153[7]) * auVar153[7] | (bVar219 >= auVar153[7]) * bVar219;
      bVar220 = (bVar220 < auVar153[8]) * auVar153[8] | (bVar220 >= auVar153[8]) * bVar220;
      bVar221 = (bVar221 < auVar153[9]) * auVar153[9] | (bVar221 >= auVar153[9]) * bVar221;
      bVar222 = (bVar222 < auVar153[10]) * auVar153[10] | (bVar222 >= auVar153[10]) * bVar222;
      bVar223 = (bVar223 < auVar153[0xb]) * auVar153[0xb] | (bVar223 >= auVar153[0xb]) * bVar223;
      bVar224 = (bVar224 < auVar153[0xc]) * auVar153[0xc] | (bVar224 >= auVar153[0xc]) * bVar224;
      bVar225 = (bVar225 < auVar153[0xd]) * auVar153[0xd] | (bVar225 >= auVar153[0xd]) * bVar225;
      bVar226 = (bVar226 < auVar153[0xe]) * auVar153[0xe] | (bVar226 >= auVar153[0xe]) * bVar226;
      bVar227 = (bVar269 < auVar153[0xf]) * auVar153[0xf] | (bVar269 >= auVar153[0xf]) * bVar269;
      auVar91 = psraw(auVar278,0xf);
      auVar56._0_2_ =
           (((short)uVar307 < sVar38) * uVar307 | (ushort)((short)uVar307 >= sVar38) * sVar38) +
           auVar91._0_2_;
      auVar56._2_2_ =
           (((short)uVar311 < sVar40) * uVar311 | (ushort)((short)uVar311 >= sVar40) * sVar40) +
           auVar91._2_2_;
      auVar56._4_2_ =
           (((short)uVar315 < sVar59) * uVar315 | (ushort)((short)uVar315 >= sVar59) * sVar59) +
           auVar91._4_2_;
      auVar56._6_2_ =
           (((short)uVar320 < sVar60) * uVar320 | (ushort)((short)uVar320 >= sVar60) * sVar60) +
           auVar91._6_2_;
      auVar56._8_2_ =
           (((short)uVar333 < sVar63) * uVar333 | (ushort)((short)uVar333 >= sVar63) * sVar63) +
           auVar91._8_2_;
      auVar56._10_2_ =
           (((short)uVar335 < sVar64) * uVar335 | (ushort)((short)uVar335 >= sVar64) * sVar64) +
           auVar91._10_2_;
      auVar56._12_2_ =
           (((short)uVar337 < sVar67) * uVar337 | (ushort)((short)uVar337 >= sVar67) * sVar67) +
           auVar91._12_2_;
      auVar56._14_2_ =
           (((short)uVar339 < sVar68) * uVar339 | (ushort)((short)uVar339 >= sVar68) * sVar68) +
           auVar91._14_2_;
      auVar271 = lddqu(auVar153,*(undefined1 (*) [16])((long)in + lVar34 * -2));
      bVar269 = auVar271[0];
      auVar414[0] = (bVar194 < bVar269) * bVar269 | (bVar194 >= bVar269) * bVar194;
      bVar269 = auVar271[1];
      auVar414[1] = (bVar213 < bVar269) * bVar269 | (bVar213 >= bVar269) * bVar213;
      bVar269 = auVar271[2];
      auVar414[2] = (bVar214 < bVar269) * bVar269 | (bVar214 >= bVar269) * bVar214;
      bVar269 = auVar271[3];
      auVar414[3] = (bVar215 < bVar269) * bVar269 | (bVar215 >= bVar269) * bVar215;
      bVar269 = auVar271[4];
      auVar414[4] = (bVar216 < bVar269) * bVar269 | (bVar216 >= bVar269) * bVar216;
      bVar269 = auVar271[5];
      auVar414[5] = (bVar217 < bVar269) * bVar269 | (bVar217 >= bVar269) * bVar217;
      bVar269 = auVar271[6];
      auVar414[6] = (bVar218 < bVar269) * bVar269 | (bVar218 >= bVar269) * bVar218;
      bVar269 = auVar271[7];
      auVar414[7] = (bVar219 < bVar269) * bVar269 | (bVar219 >= bVar269) * bVar219;
      bVar269 = auVar271[8];
      auVar414[8] = (bVar220 < bVar269) * bVar269 | (bVar220 >= bVar269) * bVar220;
      bVar269 = auVar271[9];
      auVar414[9] = (bVar221 < bVar269) * bVar269 | (bVar221 >= bVar269) * bVar221;
      bVar269 = auVar271[10];
      auVar414[10] = (bVar222 < bVar269) * bVar269 | (bVar222 >= bVar269) * bVar222;
      bVar269 = auVar271[0xb];
      auVar414[0xb] = (bVar223 < bVar269) * bVar269 | (bVar223 >= bVar269) * bVar223;
      bVar269 = auVar271[0xc];
      auVar414[0xc] = (bVar224 < bVar269) * bVar269 | (bVar224 >= bVar269) * bVar224;
      bVar269 = auVar271[0xd];
      auVar414[0xd] = (bVar225 < bVar269) * bVar269 | (bVar225 >= bVar269) * bVar225;
      bVar269 = auVar271[0xe];
      auVar414[0xe] = (bVar226 < bVar269) * bVar269 | (bVar226 >= bVar269) * bVar226;
      bVar269 = auVar271[0xf];
      auVar414[0xf] = (bVar227 < bVar269) * bVar269 | (bVar227 >= bVar269) * bVar227;
      sVar38 = auVar271._0_2_;
      uVar307 = (ushort)(sVar38 < sVar75) * sVar38 | (ushort)(sVar38 >= sVar75) * sVar75;
      sVar40 = auVar271._2_2_;
      uVar311 = (ushort)(sVar40 < sVar80) * sVar40 | (ushort)(sVar40 >= sVar80) * sVar80;
      sVar59 = auVar271._4_2_;
      uVar315 = (ushort)(sVar59 < sVar86) * sVar59 | (ushort)(sVar59 >= sVar86) * sVar86;
      sVar60 = auVar271._6_2_;
      uVar320 = (ushort)(sVar60 < sVar122) * sVar60 | (ushort)(sVar60 >= sVar122) * sVar122;
      sVar63 = auVar271._8_2_;
      uVar333 = (ushort)(sVar63 < sVar127) * sVar63 | (ushort)(sVar63 >= sVar127) * sVar127;
      sVar64 = auVar271._10_2_;
      uVar335 = (ushort)(sVar64 < sVar132) * sVar64 | (ushort)(sVar64 >= sVar132) * sVar132;
      sVar67 = auVar271._12_2_;
      uVar337 = (ushort)(sVar67 < sVar137) * sVar67 | (ushort)(sVar67 >= sVar137) * sVar137;
      sVar68 = auVar271._14_2_;
      uVar339 = (ushort)(sVar68 < sVar141) * sVar68 | (ushort)(sVar68 >= sVar141) * sVar141;
      auVar202._0_2_ = sVar38 - sVar348;
      auVar202._2_2_ = sVar40 - sVar363;
      auVar202._4_2_ = sVar59 - sVar365;
      auVar202._6_2_ = sVar60 - sVar366;
      auVar202._8_2_ = sVar63 - sVar369;
      auVar202._10_2_ = sVar64 - sVar371;
      auVar202._12_2_ = sVar67 - sVar374;
      auVar202._14_2_ = sVar68 - sVar378;
      auVar271 = pabsw(auVar22,auVar202);
      local_168._4_4_ = 0;
      uVar65 = auVar271._0_2_;
      auVar154._0_2_ = uVar65 >> local_168._0_8_;
      uVar73 = auVar271._2_2_;
      auVar154._2_2_ = uVar73 >> local_168._0_8_;
      uVar81 = auVar271._4_2_;
      auVar154._4_2_ = uVar81 >> local_168._0_8_;
      uVar488 = auVar271._6_2_;
      auVar154._6_2_ = uVar488 >> local_168._0_8_;
      uVar494 = auVar271._8_2_;
      auVar154._8_2_ = uVar494 >> local_168._0_8_;
      uVar83 = auVar271._10_2_;
      auVar154._10_2_ = uVar83 >> local_168._0_8_;
      uVar89 = auVar271._12_2_;
      uVar319 = auVar271._14_2_;
      auVar154._12_2_ = uVar89 >> local_168._0_8_;
      auVar154._14_2_ = uVar319 >> local_168._0_8_;
      auVar56 = auVar56 ^ auVar91;
      auVar91 = psubusw(auVar22,auVar154);
      auVar155[0] = (auVar149[0] < bVar106) * bVar106 | (auVar149[0] >= bVar106) * auVar149[0];
      auVar155[1] = (auVar149[1] < bVar120) * bVar120 | (auVar149[1] >= bVar120) * auVar149[1];
      auVar155[2] = (auVar149[2] < bVar121) * bVar121 | (auVar149[2] >= bVar121) * auVar149[2];
      auVar155[3] = (auVar149[3] < bVar123) * bVar123 | (auVar149[3] >= bVar123) * auVar149[3];
      auVar155[4] = (auVar149[4] < bVar124) * bVar124 | (auVar149[4] >= bVar124) * auVar149[4];
      auVar155[5] = (auVar149[5] < bVar125) * bVar125 | (auVar149[5] >= bVar125) * auVar149[5];
      auVar155[6] = (auVar149[6] < bVar126) * bVar126 | (auVar149[6] >= bVar126) * auVar149[6];
      auVar155[7] = (auVar149[7] < bVar128) * bVar128 | (auVar149[7] >= bVar128) * auVar149[7];
      auVar155[8] = (auVar149[8] < bVar129) * bVar129 | (auVar149[8] >= bVar129) * auVar149[8];
      auVar155[9] = (auVar149[9] < bVar130) * bVar130 | (auVar149[9] >= bVar130) * auVar149[9];
      auVar155[10] = (auVar149[10] < bVar131) * bVar131 | (auVar149[10] >= bVar131) * auVar149[10];
      auVar155[0xb] =
           (auVar149[0xb] < bVar133) * bVar133 | (auVar149[0xb] >= bVar133) * auVar149[0xb];
      auVar155[0xc] =
           (auVar149[0xc] < bVar134) * bVar134 | (auVar149[0xc] >= bVar134) * auVar149[0xc];
      auVar155[0xd] =
           (auVar149[0xd] < bVar135) * bVar135 | (auVar149[0xd] >= bVar135) * auVar149[0xd];
      auVar155[0xe] =
           (auVar149[0xe] < bVar136) * bVar136 | (auVar149[0xe] >= bVar136) * auVar149[0xe];
      auVar155[0xf] =
           (auVar149[0xf] < bVar138) * bVar138 | (auVar149[0xf] >= bVar138) * auVar149[0xf];
      bVar269 = auVar195[0];
      bVar106 = (bVar212 < bVar269) * bVar269 | (bVar212 >= bVar269) * bVar212;
      bVar269 = auVar195[1];
      bVar120 = (bVar241 < bVar269) * bVar269 | (bVar241 >= bVar269) * bVar241;
      bVar269 = auVar195[2];
      bVar121 = (bVar386 < bVar269) * bVar269 | (bVar386 >= bVar269) * bVar386;
      bVar269 = auVar195[3];
      bVar123 = (bVar389 < bVar269) * bVar269 | (bVar389 >= bVar269) * bVar389;
      bVar269 = auVar195[4];
      bVar124 = (bVar390 < bVar269) * bVar269 | (bVar390 >= bVar269) * bVar390;
      bVar269 = auVar195[5];
      bVar125 = (bVar393 < bVar269) * bVar269 | (bVar393 >= bVar269) * bVar393;
      bVar269 = auVar195[6];
      bVar126 = (bVar394 < bVar269) * bVar269 | (bVar394 >= bVar269) * bVar394;
      bVar269 = auVar195[7];
      bVar128 = (bVar397 < bVar269) * bVar269 | (bVar397 >= bVar269) * bVar397;
      bVar269 = auVar195[8];
      bVar129 = (bVar398 < bVar269) * bVar269 | (bVar398 >= bVar269) * bVar398;
      bVar269 = auVar195[9];
      bVar130 = (bVar401 < bVar269) * bVar269 | (bVar401 >= bVar269) * bVar401;
      bVar269 = auVar195[10];
      bVar131 = (bVar402 < bVar269) * bVar269 | (bVar402 >= bVar269) * bVar402;
      bVar269 = auVar195[0xb];
      bVar133 = (bVar404 < bVar269) * bVar269 | (bVar404 >= bVar269) * bVar404;
      bVar269 = auVar195[0xc];
      bVar134 = (bVar405 < bVar269) * bVar269 | (bVar405 >= bVar269) * bVar405;
      bVar269 = auVar195[0xd];
      bVar135 = (bVar407 < bVar269) * bVar269 | (bVar407 >= bVar269) * bVar407;
      bVar269 = auVar195[0xe];
      bVar136 = (bVar408 < bVar269) * bVar269 | (bVar408 >= bVar269) * bVar408;
      bVar269 = auVar195[0xf];
      bVar269 = (bVar410 < bVar269) * bVar269 | (bVar410 >= bVar269) * bVar410;
      bVar106 = (bVar106 < auVar155[0]) * auVar155[0] | (bVar106 >= auVar155[0]) * bVar106;
      bVar120 = (bVar120 < auVar155[1]) * auVar155[1] | (bVar120 >= auVar155[1]) * bVar120;
      bVar121 = (bVar121 < auVar155[2]) * auVar155[2] | (bVar121 >= auVar155[2]) * bVar121;
      bVar123 = (bVar123 < auVar155[3]) * auVar155[3] | (bVar123 >= auVar155[3]) * bVar123;
      bVar124 = (bVar124 < auVar155[4]) * auVar155[4] | (bVar124 >= auVar155[4]) * bVar124;
      bVar125 = (bVar125 < auVar155[5]) * auVar155[5] | (bVar125 >= auVar155[5]) * bVar125;
      bVar126 = (bVar126 < auVar155[6]) * auVar155[6] | (bVar126 >= auVar155[6]) * bVar126;
      bVar128 = (bVar128 < auVar155[7]) * auVar155[7] | (bVar128 >= auVar155[7]) * bVar128;
      bVar129 = (bVar129 < auVar155[8]) * auVar155[8] | (bVar129 >= auVar155[8]) * bVar129;
      bVar130 = (bVar130 < auVar155[9]) * auVar155[9] | (bVar130 >= auVar155[9]) * bVar130;
      bVar131 = (bVar131 < auVar155[10]) * auVar155[10] | (bVar131 >= auVar155[10]) * bVar131;
      bVar133 = (bVar133 < auVar155[0xb]) * auVar155[0xb] | (bVar133 >= auVar155[0xb]) * bVar133;
      bVar134 = (bVar134 < auVar155[0xc]) * auVar155[0xc] | (bVar134 >= auVar155[0xc]) * bVar134;
      bVar135 = (bVar135 < auVar155[0xd]) * auVar155[0xd] | (bVar135 >= auVar155[0xd]) * bVar135;
      bVar136 = (bVar136 < auVar155[0xe]) * auVar155[0xe] | (bVar136 >= auVar155[0xe]) * bVar136;
      bVar138 = (bVar269 < auVar155[0xf]) * auVar155[0xf] | (bVar269 >= auVar155[0xf]) * bVar269;
      auVar271 = lddqu(auVar155,*(undefined1 (*) [16])((long)in + lVar34 * -2 + 0x120));
      bVar269 = auVar271[0];
      auVar383[0] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = auVar271[1];
      auVar383[1] = (bVar120 < bVar269) * bVar269 | (bVar120 >= bVar269) * bVar120;
      bVar269 = auVar271[2];
      auVar383[2] = (bVar121 < bVar269) * bVar269 | (bVar121 >= bVar269) * bVar121;
      bVar269 = auVar271[3];
      auVar383[3] = (bVar123 < bVar269) * bVar269 | (bVar123 >= bVar269) * bVar123;
      bVar269 = auVar271[4];
      auVar383[4] = (bVar124 < bVar269) * bVar269 | (bVar124 >= bVar269) * bVar124;
      bVar269 = auVar271[5];
      auVar383[5] = (bVar125 < bVar269) * bVar269 | (bVar125 >= bVar269) * bVar125;
      bVar269 = auVar271[6];
      auVar383[6] = (bVar126 < bVar269) * bVar269 | (bVar126 >= bVar269) * bVar126;
      bVar269 = auVar271[7];
      auVar383[7] = (bVar128 < bVar269) * bVar269 | (bVar128 >= bVar269) * bVar128;
      bVar269 = auVar271[8];
      auVar383[8] = (bVar129 < bVar269) * bVar269 | (bVar129 >= bVar269) * bVar129;
      bVar269 = auVar271[9];
      auVar383[9] = (bVar130 < bVar269) * bVar269 | (bVar130 >= bVar269) * bVar130;
      bVar269 = auVar271[10];
      auVar383[10] = (bVar131 < bVar269) * bVar269 | (bVar131 >= bVar269) * bVar131;
      bVar269 = auVar271[0xb];
      auVar383[0xb] = (bVar133 < bVar269) * bVar269 | (bVar133 >= bVar269) * bVar133;
      bVar269 = auVar271[0xc];
      auVar383[0xc] = (bVar134 < bVar269) * bVar269 | (bVar134 >= bVar269) * bVar134;
      bVar269 = auVar271[0xd];
      auVar383[0xd] = (bVar135 < bVar269) * bVar269 | (bVar135 >= bVar269) * bVar135;
      bVar269 = auVar271[0xe];
      auVar383[0xe] = (bVar136 < bVar269) * bVar269 | (bVar136 >= bVar269) * bVar136;
      bVar269 = auVar271[0xf];
      auVar383[0xf] = (bVar138 < bVar269) * bVar269 | (bVar138 >= bVar269) * bVar138;
      sVar38 = auVar271._0_2_;
      uVar270 = (ushort)(sVar38 < sVar168) * sVar38 | (ushort)(sVar38 >= sVar168) * sVar168;
      sVar40 = auVar271._2_2_;
      uVar286 = (ushort)(sVar40 < sVar169) * sVar40 | (ushort)(sVar40 >= sVar169) * sVar169;
      sVar59 = auVar271._4_2_;
      uVar287 = (ushort)(sVar59 < sVar172) * sVar59 | (ushort)(sVar59 >= sVar172) * sVar172;
      sVar60 = auVar271._6_2_;
      uVar288 = (ushort)(sVar60 < sVar173) * sVar60 | (ushort)(sVar60 >= sVar173) * sVar173;
      sVar63 = auVar271._8_2_;
      uVar289 = (ushort)(sVar63 < sVar176) * sVar63 | (ushort)(sVar63 >= sVar176) * sVar176;
      sVar64 = auVar271._10_2_;
      uVar290 = (ushort)(sVar64 < sVar177) * sVar64 | (ushort)(sVar64 >= sVar177) * sVar177;
      sVar67 = auVar271._12_2_;
      uVar291 = (ushort)(sVar67 < sVar180) * sVar67 | (ushort)(sVar67 >= sVar180) * sVar180;
      sVar68 = auVar271._14_2_;
      uVar292 = (ushort)(sVar68 < sVar181) * sVar68 | (ushort)(sVar68 >= sVar181) * sVar181;
      auVar279._0_2_ = sVar38 - sVar140;
      auVar279._2_2_ = sVar40 - sVar167;
      auVar279._4_2_ = sVar59 - sVar171;
      auVar279._6_2_ = sVar60 - sVar175;
      auVar279._8_2_ = sVar63 - sVar179;
      auVar279._10_2_ = sVar64 - sVar183;
      auVar279._12_2_ = sVar67 - sVar187;
      auVar279._14_2_ = sVar68 - sVar191;
      auVar271 = pabsw(auVar57,auVar279);
      uVar381 = auVar271._0_2_;
      in_XMM7._0_2_ = uVar381 >> local_168._0_8_;
      uVar388 = auVar271._2_2_;
      in_XMM7._2_2_ = uVar388 >> local_168._0_8_;
      uVar392 = auVar271._4_2_;
      in_XMM7._4_2_ = uVar392 >> local_168._0_8_;
      uVar396 = auVar271._6_2_;
      in_XMM7._6_2_ = uVar396 >> local_168._0_8_;
      uVar400 = auVar271._8_2_;
      in_XMM7._8_2_ = uVar400 >> local_168._0_8_;
      uVar469 = auVar271._10_2_;
      in_XMM7._10_2_ = uVar469 >> local_168._0_8_;
      uVar472 = auVar271._12_2_;
      uVar475 = auVar271._14_2_;
      in_XMM7._12_2_ = uVar472 >> local_168._0_8_;
      in_XMM7._14_2_ = uVar475 >> local_168._0_8_;
      auVar23._4_2_ = uStack_1d4;
      auVar23._0_4_ = uVar44;
      auVar23._6_2_ = uStack_1d2;
      auVar23._8_2_ = uStack_1d4;
      auVar23._10_2_ = uStack_1d2;
      auVar23._12_2_ = uStack_1d4;
      auVar23._14_2_ = uStack_1d2;
      auVar271 = psubusw(auVar23,in_XMM7);
      sVar42 = auVar91._0_2_;
      sVar62 = auVar91._2_2_;
      sVar66 = auVar91._4_2_;
      sVar70 = auVar91._6_2_;
      sVar74 = auVar91._8_2_;
      sVar79 = auVar91._10_2_;
      sVar85 = auVar91._12_2_;
      sVar71 = auVar91._14_2_;
      sVar38 = auVar271._0_2_;
      sVar40 = auVar271._2_2_;
      sVar59 = auVar271._4_2_;
      sVar60 = auVar271._6_2_;
      sVar63 = auVar271._8_2_;
      sVar64 = auVar271._10_2_;
      sVar67 = auVar271._12_2_;
      sVar68 = auVar271._14_2_;
      auVar271 = psraw(auVar202,0xf);
      auVar354._0_2_ =
           (((short)uVar65 < sVar42) * uVar65 | (ushort)((short)uVar65 >= sVar42) * sVar42) +
           auVar271._0_2_;
      auVar354._2_2_ =
           (((short)uVar73 < sVar62) * uVar73 | (ushort)((short)uVar73 >= sVar62) * sVar62) +
           auVar271._2_2_;
      auVar354._4_2_ =
           (((short)uVar81 < sVar66) * uVar81 | (ushort)((short)uVar81 >= sVar66) * sVar66) +
           auVar271._4_2_;
      auVar354._6_2_ =
           (((short)uVar488 < sVar70) * uVar488 | (ushort)((short)uVar488 >= sVar70) * sVar70) +
           auVar271._6_2_;
      auVar354._8_2_ =
           (((short)uVar494 < sVar74) * uVar494 | (ushort)((short)uVar494 >= sVar74) * sVar74) +
           auVar271._8_2_;
      auVar354._10_2_ =
           (((short)uVar83 < sVar79) * uVar83 | (ushort)((short)uVar83 >= sVar79) * sVar79) +
           auVar271._10_2_;
      auVar354._12_2_ =
           (((short)uVar89 < sVar85) * uVar89 | (ushort)((short)uVar89 >= sVar85) * sVar85) +
           auVar271._12_2_;
      auVar354._14_2_ =
           (((short)uVar319 < sVar71) * uVar319 | (ushort)((short)uVar319 >= sVar71) * sVar71) +
           auVar271._14_2_;
      auVar354 = auVar354 ^ auVar271;
      auVar271 = psraw(auVar279,0xf);
      auVar156._0_2_ =
           (((short)uVar381 < sVar38) * uVar381 | (ushort)((short)uVar381 >= sVar38) * sVar38) +
           auVar271._0_2_;
      auVar156._2_2_ =
           (((short)uVar388 < sVar40) * uVar388 | (ushort)((short)uVar388 >= sVar40) * sVar40) +
           auVar271._2_2_;
      auVar156._4_2_ =
           (((short)uVar392 < sVar59) * uVar392 | (ushort)((short)uVar392 >= sVar59) * sVar59) +
           auVar271._4_2_;
      auVar156._6_2_ =
           (((short)uVar396 < sVar60) * uVar396 | (ushort)((short)uVar396 >= sVar60) * sVar60) +
           auVar271._6_2_;
      auVar156._8_2_ =
           (((short)uVar400 < sVar63) * uVar400 | (ushort)((short)uVar400 >= sVar63) * sVar63) +
           auVar271._8_2_;
      auVar156._10_2_ =
           (((short)uVar469 < sVar64) * uVar469 | (ushort)((short)uVar469 >= sVar64) * sVar64) +
           auVar271._10_2_;
      auVar156._12_2_ =
           (((short)uVar472 < sVar67) * uVar472 | (ushort)((short)uVar472 >= sVar67) * sVar67) +
           auVar271._12_2_;
      auVar156._14_2_ =
           (((short)uVar475 < sVar68) * uVar475 | (ushort)((short)uVar475 >= sVar68) * sVar68) +
           auVar271._14_2_;
      auVar156 = auVar156 ^ auVar271;
      local_b8 = auVar46._0_2_;
      sStack_b6 = auVar46._2_2_;
      auVar355._0_2_ =
           (auVar354._0_2_ + auVar98._0_2_ + auVar112._0_2_ + auVar97._0_2_) * local_b8 +
           in_XMM9._0_2_;
      auVar355._2_2_ =
           (auVar354._2_2_ + auVar98._2_2_ + auVar112._2_2_ + auVar97._2_2_) * sStack_b6 +
           in_XMM9._2_2_;
      auVar355._4_2_ =
           (auVar354._4_2_ + auVar98._4_2_ + auVar112._4_2_ + auVar97._4_2_) * local_b8 +
           in_XMM9._4_2_;
      auVar355._6_2_ =
           (auVar354._6_2_ + auVar98._6_2_ + auVar112._6_2_ + auVar97._6_2_) * sStack_b6 +
           in_XMM9._6_2_;
      auVar355._8_2_ =
           (auVar354._8_2_ + auVar98._8_2_ + auVar112._8_2_ + auVar97._8_2_) * local_b8 +
           in_XMM9._8_2_;
      auVar355._10_2_ =
           (auVar354._10_2_ + auVar98._10_2_ + auVar112._10_2_ + auVar97._10_2_) * sStack_b6 +
           in_XMM9._10_2_;
      auVar355._12_2_ =
           (auVar354._12_2_ + auVar98._12_2_ + auVar112._12_2_ + auVar97._12_2_) * local_b8 +
           in_XMM9._12_2_;
      auVar355._14_2_ =
           (auVar354._14_2_ + auVar98._14_2_ + auVar112._14_2_ + auVar97._14_2_) * sStack_b6 +
           in_XMM9._14_2_;
      auVar157._0_2_ =
           (auVar156._0_2_ + auVar56._0_2_ + auVar437._0_2_ + auVar54._0_2_) * local_b8 +
           (auVar235._0_2_ + auVar199._0_2_ + auVar413._0_2_) * local_a8 +
           (auVar382._0_2_ + auVar94._0_2_) * sVar72 + (auVar145._0_2_ + auVar48._0_2_) * sVar39;
      auVar157._2_2_ =
           (auVar156._2_2_ + auVar56._2_2_ + auVar437._2_2_ + auVar54._2_2_) * sStack_b6 +
           (auVar235._2_2_ + auVar199._2_2_ + auVar413._2_2_) * sStack_a6 +
           (auVar382._2_2_ + auVar94._2_2_) * sVar76 + (auVar145._2_2_ + auVar48._2_2_) * sVar58;
      auVar157._4_2_ =
           (auVar156._4_2_ + auVar56._4_2_ + auVar437._4_2_ + auVar54._4_2_) * local_b8 +
           (auVar235._4_2_ + auVar199._4_2_ + auVar413._4_2_) * local_a8 +
           (auVar382._4_2_ + auVar94._4_2_) * sVar72 + (auVar145._4_2_ + auVar48._4_2_) * sVar39;
      auVar157._6_2_ =
           (auVar156._6_2_ + auVar56._6_2_ + auVar437._6_2_ + auVar54._6_2_) * sStack_b6 +
           (auVar235._6_2_ + auVar199._6_2_ + auVar413._6_2_) * sStack_a6 +
           (auVar382._6_2_ + auVar94._6_2_) * sVar76 + (auVar145._6_2_ + auVar48._6_2_) * sVar58;
      auVar157._8_2_ =
           (auVar156._8_2_ + auVar56._8_2_ + auVar437._8_2_ + auVar54._8_2_) * local_b8 +
           (auVar235._8_2_ + auVar199._8_2_ + auVar413._8_2_) * local_a8 +
           (auVar382._8_2_ + auVar94._8_2_) * sVar72 + (auVar145._8_2_ + auVar48._8_2_) * sVar39;
      auVar157._10_2_ =
           (auVar156._10_2_ + auVar56._10_2_ + auVar437._10_2_ + auVar54._10_2_) * sStack_b6 +
           (auVar235._10_2_ + auVar199._10_2_ + auVar413._10_2_) * sStack_a6 +
           (auVar382._10_2_ + auVar94._10_2_) * sVar76 + (auVar145._10_2_ + auVar48._10_2_) * sVar58
      ;
      auVar157._12_2_ =
           (auVar156._12_2_ + auVar56._12_2_ + auVar437._12_2_ + auVar54._12_2_) * local_b8 +
           (auVar235._12_2_ + auVar199._12_2_ + auVar413._12_2_) * local_a8 +
           (auVar382._12_2_ + auVar94._12_2_) * sVar72 + (auVar145._12_2_ + auVar48._12_2_) * sVar39
      ;
      auVar157._14_2_ =
           (auVar156._14_2_ + auVar56._14_2_ + auVar437._14_2_ + auVar54._14_2_) * sStack_b6 +
           (auVar235._14_2_ + auVar199._14_2_ + auVar413._14_2_) * sStack_a6 +
           (auVar382._14_2_ + auVar94._14_2_) * sVar76 + (auVar145._14_2_ + auVar48._14_2_) * sVar58
      ;
      local_198 = local_198 & _DAT_004c1840;
      sVar38 = local_198._0_2_;
      uVar65 = (ushort)(sVar38 < sVar348) * sVar348 | (ushort)(sVar38 >= sVar348) * sVar38;
      sVar38 = local_198._2_2_;
      uVar73 = (ushort)(sVar38 < sVar363) * sVar363 | (ushort)(sVar38 >= sVar363) * sVar38;
      sVar38 = local_198._4_2_;
      uVar81 = (ushort)(sVar38 < sVar365) * sVar365 | (ushort)(sVar38 >= sVar365) * sVar38;
      sVar38 = local_198._6_2_;
      uVar488 = (ushort)(sVar38 < sVar366) * sVar366 | (ushort)(sVar38 >= sVar366) * sVar38;
      sVar38 = local_198._8_2_;
      uVar494 = (ushort)(sVar38 < sVar369) * sVar369 | (ushort)(sVar38 >= sVar369) * sVar38;
      sVar38 = local_198._10_2_;
      uVar83 = (ushort)(sVar38 < sVar371) * sVar371 | (ushort)(sVar38 >= sVar371) * sVar38;
      sVar38 = local_198._12_2_;
      sVar40 = local_198._14_2_;
      uVar89 = (ushort)(sVar38 < sVar374) * sVar374 | (ushort)(sVar38 >= sVar374) * sVar38;
      uVar319 = (ushort)(sVar40 < sVar378) * sVar378 | (ushort)(sVar40 >= sVar378) * sVar40;
      auVar414 = auVar414 & _DAT_004c1840;
      sVar38 = auVar414._0_2_;
      in_XMM12._0_2_ =
           (sVar38 < (short)uVar65) * uVar65 | (ushort)(sVar38 >= (short)uVar65) * sVar38;
      sVar38 = auVar414._2_2_;
      in_XMM12._2_2_ =
           (sVar38 < (short)uVar73) * uVar73 | (ushort)(sVar38 >= (short)uVar73) * sVar38;
      sVar38 = auVar414._4_2_;
      in_XMM12._4_2_ =
           (sVar38 < (short)uVar81) * uVar81 | (ushort)(sVar38 >= (short)uVar81) * sVar38;
      sVar38 = auVar414._6_2_;
      in_XMM12._6_2_ =
           (sVar38 < (short)uVar488) * uVar488 | (ushort)(sVar38 >= (short)uVar488) * sVar38;
      sVar38 = auVar414._8_2_;
      in_XMM12._8_2_ =
           (sVar38 < (short)uVar494) * uVar494 | (ushort)(sVar38 >= (short)uVar494) * sVar38;
      sVar38 = auVar414._10_2_;
      in_XMM12._10_2_ =
           (sVar38 < (short)uVar83) * uVar83 | (ushort)(sVar38 >= (short)uVar83) * sVar38;
      sVar38 = auVar414._12_2_;
      sVar40 = auVar414._14_2_;
      in_XMM12._12_2_ =
           (sVar38 < (short)uVar89) * uVar89 | (ushort)(sVar38 >= (short)uVar89) * sVar38;
      in_XMM12._14_2_ =
           (sVar40 < (short)uVar319) * uVar319 | (ushort)(sVar40 >= (short)uVar319) * sVar40;
      local_178 = local_178 & _DAT_004c1840;
      sVar38 = local_178._0_2_;
      uVar65 = (ushort)(sVar38 < sVar140) * sVar140 | (ushort)(sVar38 >= sVar140) * sVar38;
      sVar38 = local_178._2_2_;
      uVar73 = (ushort)(sVar38 < sVar167) * sVar167 | (ushort)(sVar38 >= sVar167) * sVar38;
      sVar38 = local_178._4_2_;
      uVar81 = (ushort)(sVar38 < sVar171) * sVar171 | (ushort)(sVar38 >= sVar171) * sVar38;
      sVar38 = local_178._6_2_;
      uVar488 = (ushort)(sVar38 < sVar175) * sVar175 | (ushort)(sVar38 >= sVar175) * sVar38;
      sVar38 = local_178._8_2_;
      uVar494 = (ushort)(sVar38 < sVar179) * sVar179 | (ushort)(sVar38 >= sVar179) * sVar38;
      sVar38 = local_178._10_2_;
      uVar83 = (ushort)(sVar38 < sVar183) * sVar183 | (ushort)(sVar38 >= sVar183) * sVar38;
      sVar38 = local_178._12_2_;
      sVar40 = local_178._14_2_;
      uVar89 = (ushort)(sVar38 < sVar187) * sVar187 | (ushort)(sVar38 >= sVar187) * sVar38;
      uVar319 = (ushort)(sVar40 < sVar191) * sVar191 | (ushort)(sVar40 >= sVar191) * sVar40;
      auVar383 = auVar383 & _DAT_004c1840;
      sVar38 = auVar383._0_2_;
      uVar381 = (sVar38 < (short)uVar65) * uVar65 | (ushort)(sVar38 >= (short)uVar65) * sVar38;
      sVar38 = auVar383._2_2_;
      uVar388 = (sVar38 < (short)uVar73) * uVar73 | (ushort)(sVar38 >= (short)uVar73) * sVar38;
      sVar38 = auVar383._4_2_;
      uVar392 = (sVar38 < (short)uVar81) * uVar81 | (ushort)(sVar38 >= (short)uVar81) * sVar38;
      sVar38 = auVar383._6_2_;
      uVar396 = (sVar38 < (short)uVar488) * uVar488 | (ushort)(sVar38 >= (short)uVar488) * sVar38;
      sVar38 = auVar383._8_2_;
      uVar400 = (sVar38 < (short)uVar494) * uVar494 | (ushort)(sVar38 >= (short)uVar494) * sVar38;
      sVar38 = auVar383._10_2_;
      uVar83 = (sVar38 < (short)uVar83) * uVar83 | (ushort)(sVar38 >= (short)uVar83) * sVar38;
      sVar38 = auVar383._12_2_;
      sVar40 = auVar383._14_2_;
      uVar89 = (sVar38 < (short)uVar89) * uVar89 | (ushort)(sVar38 >= (short)uVar89) * sVar38;
      uVar319 = (sVar40 < (short)uVar319) * uVar319 | (ushort)(sVar40 >= (short)uVar319) * sVar40;
      uVar61 = ((short)uVar478 < (short)uVar61) * uVar478 |
               ((short)uVar478 >= (short)uVar61) * uVar61;
      uVar65 = ((short)uVar485 < (short)uVar69) * uVar485 |
               ((short)uVar485 >= (short)uVar69) * uVar69;
      uVar69 = ((short)uVar487 < (short)uVar77) * uVar487 |
               ((short)uVar487 >= (short)uVar77) * uVar77;
      uVar73 = ((short)uVar489 < (short)uVar87) * uVar489 |
               ((short)uVar489 >= (short)uVar87) * uVar87;
      uVar77 = ((short)uVar491 < (short)uVar492) * uVar491 |
               ((short)uVar491 >= (short)uVar492) * uVar492;
      uVar81 = ((short)uVar493 < (short)uVar78) * uVar493 |
               ((short)uVar493 >= (short)uVar78) * uVar78;
      uVar87 = ((short)uVar495 < (short)uVar84) * uVar495 |
               ((short)uVar495 >= (short)uVar84) * uVar84;
      uVar488 = ((short)uVar497 < (short)uVar90) * uVar497 |
                ((short)uVar497 >= (short)uVar90) * uVar90;
      auVar99._0_2_ =
           ((short)uVar41 < (short)auVar298._0_2_) * uVar41 |
           ((short)uVar41 >= (short)auVar298._0_2_) * auVar298._0_2_;
      auVar99._2_2_ =
           ((short)uVar477 < (short)auVar298._2_2_) * uVar477 |
           ((short)uVar477 >= (short)auVar298._2_2_) * auVar298._2_2_;
      auVar99._4_2_ =
           ((short)uVar484 < (short)auVar298._4_2_) * uVar484 |
           ((short)uVar484 >= (short)auVar298._4_2_) * auVar298._4_2_;
      auVar99._6_2_ =
           ((short)uVar486 < (short)auVar298._6_2_) * uVar486 |
           ((short)uVar486 >= (short)auVar298._6_2_) * auVar298._6_2_;
      auVar99._8_2_ =
           ((short)uVar490 < (short)auVar298._8_2_) * uVar490 |
           ((short)uVar490 >= (short)auVar298._8_2_) * auVar298._8_2_;
      auVar99._10_2_ =
           ((short)uVar496 < (short)auVar298._10_2_) * uVar496 |
           ((short)uVar496 >= (short)auVar298._10_2_) * auVar298._10_2_;
      auVar99._12_2_ =
           ((short)uVar82 < (short)auVar298._12_2_) * uVar82 |
           ((short)uVar82 >= (short)auVar298._12_2_) * auVar298._12_2_;
      auVar99._14_2_ =
           ((short)uVar88 < (short)auVar298._14_2_) * uVar88 |
           ((short)uVar88 >= (short)auVar298._14_2_) * auVar298._14_2_;
      uVar486 = ((short)uVar61 < (short)uVar139) * uVar61 |
                ((short)uVar61 >= (short)uVar139) * uVar139;
      uVar490 = ((short)uVar65 < (short)uVar166) * uVar65 |
                ((short)uVar65 >= (short)uVar166) * uVar166;
      uVar492 = ((short)uVar69 < (short)uVar170) * uVar69 |
                ((short)uVar69 >= (short)uVar170) * uVar170;
      uVar494 = ((short)uVar73 < (short)uVar174) * uVar73 |
                ((short)uVar73 >= (short)uVar174) * uVar174;
      uVar496 = ((short)uVar77 < (short)uVar178) * uVar77 |
                ((short)uVar77 >= (short)uVar178) * uVar178;
      uVar81 = ((short)uVar81 < (short)uVar182) * uVar81 |
               ((short)uVar81 >= (short)uVar182) * uVar182;
      uVar87 = ((short)uVar87 < (short)uVar186) * uVar87 |
               ((short)uVar87 >= (short)uVar186) * uVar186;
      uVar488 = ((short)uVar488 < (short)uVar190) * uVar488 |
                ((short)uVar488 >= (short)uVar190) * uVar190;
      uVar41 = ((short)auVar99._0_2_ < (short)uVar293) * auVar99._0_2_ |
               ((short)auVar99._0_2_ >= (short)uVar293) * uVar293;
      uVar61 = ((short)auVar99._2_2_ < (short)uVar309) * auVar99._2_2_ |
               ((short)auVar99._2_2_ >= (short)uVar309) * uVar309;
      uVar65 = ((short)auVar99._4_2_ < (short)uVar313) * auVar99._4_2_ |
               ((short)auVar99._4_2_ >= (short)uVar313) * uVar313;
      uVar477 = ((short)auVar99._6_2_ < (short)uVar317) * auVar99._6_2_ |
                ((short)auVar99._6_2_ >= (short)uVar317) * uVar317;
      uVar69 = ((short)auVar99._8_2_ < (short)uVar322) * auVar99._8_2_ |
               ((short)auVar99._8_2_ >= (short)uVar322) * uVar322;
      uVar73 = ((short)auVar99._10_2_ < (short)uVar334) * auVar99._10_2_ |
               ((short)auVar99._10_2_ >= (short)uVar334) * uVar334;
      uVar484 = ((short)auVar99._12_2_ < (short)uVar336) * auVar99._12_2_ |
                ((short)auVar99._12_2_ >= (short)uVar336) * uVar336;
      uVar77 = ((short)auVar99._14_2_ < (short)uVar338) * auVar99._14_2_ |
               ((short)auVar99._14_2_ >= (short)uVar338) * uVar338;
      in_XMM5._0_2_ =
           ((short)uVar486 < (short)uVar307) * uVar486 |
           ((short)uVar486 >= (short)uVar307) * uVar307;
      in_XMM5._2_2_ =
           ((short)uVar490 < (short)uVar311) * uVar490 |
           ((short)uVar490 >= (short)uVar311) * uVar311;
      in_XMM5._4_2_ =
           ((short)uVar492 < (short)uVar315) * uVar492 |
           ((short)uVar492 >= (short)uVar315) * uVar315;
      in_XMM5._6_2_ =
           ((short)uVar494 < (short)uVar320) * uVar494 |
           ((short)uVar494 >= (short)uVar320) * uVar320;
      in_XMM5._8_2_ =
           ((short)uVar496 < (short)uVar333) * uVar496 |
           ((short)uVar496 >= (short)uVar333) * uVar333;
      in_XMM5._10_2_ =
           ((short)uVar81 < (short)uVar335) * uVar81 | ((short)uVar81 >= (short)uVar335) * uVar335;
      in_XMM5._12_2_ =
           ((short)uVar87 < (short)uVar337) * uVar87 | ((short)uVar87 >= (short)uVar337) * uVar337;
      in_XMM5._14_2_ =
           ((short)uVar488 < (short)uVar339) * uVar488 |
           ((short)uVar488 >= (short)uVar339) * uVar339;
      uVar41 = ((short)uVar41 < (short)uVar270) * uVar41 |
               ((short)uVar41 >= (short)uVar270) * uVar270;
      uVar61 = ((short)uVar61 < (short)uVar286) * uVar61 |
               ((short)uVar61 >= (short)uVar286) * uVar286;
      uVar65 = ((short)uVar65 < (short)uVar287) * uVar65 |
               ((short)uVar65 >= (short)uVar287) * uVar287;
      uVar477 = ((short)uVar477 < (short)uVar288) * uVar477 |
                ((short)uVar477 >= (short)uVar288) * uVar288;
      uVar69 = ((short)uVar69 < (short)uVar289) * uVar69 |
               ((short)uVar69 >= (short)uVar289) * uVar289;
      uVar73 = ((short)uVar73 < (short)uVar290) * uVar73 |
               ((short)uVar73 >= (short)uVar290) * uVar290;
      uVar484 = ((short)uVar484 < (short)uVar291) * uVar484 |
                ((short)uVar484 >= (short)uVar291) * uVar291;
      uVar77 = ((short)uVar77 < (short)uVar292) * uVar77 |
               ((short)uVar77 >= (short)uVar292) * uVar292;
      auVar271 = psraw(auVar355,0xf);
      auVar91 = pmovsxbw(auVar99,0x808080808080808);
      auVar356._0_2_ = auVar355._0_2_ + auVar91._0_2_ + auVar271._0_2_;
      auVar356._2_2_ = auVar355._2_2_ + auVar91._2_2_ + auVar271._2_2_;
      auVar356._4_2_ = auVar355._4_2_ + auVar91._4_2_ + auVar271._4_2_;
      auVar356._6_2_ = auVar355._6_2_ + auVar91._6_2_ + auVar271._6_2_;
      auVar356._8_2_ = auVar355._8_2_ + auVar91._8_2_ + auVar271._8_2_;
      auVar356._10_2_ = auVar355._10_2_ + auVar91._10_2_ + auVar271._10_2_;
      auVar356._12_2_ = auVar355._12_2_ + auVar91._12_2_ + auVar271._12_2_;
      auVar356._14_2_ = auVar355._14_2_ + auVar91._14_2_ + auVar271._14_2_;
      auVar271 = psraw(auVar157,0xf);
      auVar158._0_2_ = auVar157._0_2_ + auVar91._0_2_ + auVar271._0_2_;
      auVar158._2_2_ = auVar157._2_2_ + auVar91._2_2_ + auVar271._2_2_;
      auVar158._4_2_ = auVar157._4_2_ + auVar91._4_2_ + auVar271._4_2_;
      auVar158._6_2_ = auVar157._6_2_ + auVar91._6_2_ + auVar271._6_2_;
      auVar158._8_2_ = auVar157._8_2_ + auVar91._8_2_ + auVar271._8_2_;
      auVar158._10_2_ = auVar157._10_2_ + auVar91._10_2_ + auVar271._10_2_;
      auVar158._12_2_ = auVar157._12_2_ + auVar91._12_2_ + auVar271._12_2_;
      auVar158._14_2_ = auVar157._14_2_ + auVar91._14_2_ + auVar271._14_2_;
      auVar271 = psraw(auVar356,4);
      sVar348 = auVar271._0_2_ + sVar348;
      sVar363 = auVar271._2_2_ + sVar363;
      sVar365 = auVar271._4_2_ + sVar365;
      sVar366 = auVar271._6_2_ + sVar366;
      sVar369 = auVar271._8_2_ + sVar369;
      sVar371 = auVar271._10_2_ + sVar371;
      sVar374 = auVar271._12_2_ + sVar374;
      sVar378 = auVar271._14_2_ + sVar378;
      uVar81 = (sVar348 < (short)in_XMM5._0_2_) * in_XMM5._0_2_ |
               (ushort)(sVar348 >= (short)in_XMM5._0_2_) * sVar348;
      uVar486 = (sVar363 < (short)in_XMM5._2_2_) * in_XMM5._2_2_ |
                (ushort)(sVar363 >= (short)in_XMM5._2_2_) * sVar363;
      uVar87 = (sVar365 < (short)in_XMM5._4_2_) * in_XMM5._4_2_ |
               (ushort)(sVar365 >= (short)in_XMM5._4_2_) * sVar365;
      uVar488 = (sVar366 < (short)in_XMM5._6_2_) * in_XMM5._6_2_ |
                (ushort)(sVar366 >= (short)in_XMM5._6_2_) * sVar366;
      uVar490 = (sVar369 < (short)in_XMM5._8_2_) * in_XMM5._8_2_ |
                (ushort)(sVar369 >= (short)in_XMM5._8_2_) * sVar369;
      uVar492 = (sVar371 < (short)in_XMM5._10_2_) * in_XMM5._10_2_ |
                (ushort)(sVar371 >= (short)in_XMM5._10_2_) * sVar371;
      uVar494 = (sVar374 < (short)in_XMM5._12_2_) * in_XMM5._12_2_ |
                (ushort)(sVar374 >= (short)in_XMM5._12_2_) * sVar374;
      uVar496 = (sVar378 < (short)in_XMM5._14_2_) * in_XMM5._14_2_ |
                (ushort)(sVar378 >= (short)in_XMM5._14_2_) * sVar378;
      in_XMM10._0_2_ =
           ((short)in_XMM12._0_2_ < (short)uVar81) * in_XMM12._0_2_ |
           ((short)in_XMM12._0_2_ >= (short)uVar81) * uVar81;
      in_XMM10._2_2_ =
           ((short)in_XMM12._2_2_ < (short)uVar486) * in_XMM12._2_2_ |
           ((short)in_XMM12._2_2_ >= (short)uVar486) * uVar486;
      in_XMM10._4_2_ =
           ((short)in_XMM12._4_2_ < (short)uVar87) * in_XMM12._4_2_ |
           ((short)in_XMM12._4_2_ >= (short)uVar87) * uVar87;
      in_XMM10._6_2_ =
           ((short)in_XMM12._6_2_ < (short)uVar488) * in_XMM12._6_2_ |
           ((short)in_XMM12._6_2_ >= (short)uVar488) * uVar488;
      in_XMM10._8_2_ =
           ((short)in_XMM12._8_2_ < (short)uVar490) * in_XMM12._8_2_ |
           ((short)in_XMM12._8_2_ >= (short)uVar490) * uVar490;
      in_XMM10._10_2_ =
           ((short)in_XMM12._10_2_ < (short)uVar492) * in_XMM12._10_2_ |
           ((short)in_XMM12._10_2_ >= (short)uVar492) * uVar492;
      in_XMM10._12_2_ =
           ((short)in_XMM12._12_2_ < (short)uVar494) * in_XMM12._12_2_ |
           ((short)in_XMM12._12_2_ >= (short)uVar494) * uVar494;
      in_XMM10._14_2_ =
           ((short)in_XMM12._14_2_ < (short)uVar496) * in_XMM12._14_2_ |
           ((short)in_XMM12._14_2_ >= (short)uVar496) * uVar496;
      auVar271 = psraw(auVar158,4);
      sVar140 = auVar271._0_2_ + sVar140;
      sVar167 = auVar271._2_2_ + sVar167;
      sVar171 = auVar271._4_2_ + sVar171;
      sVar175 = auVar271._6_2_ + sVar175;
      sVar179 = auVar271._8_2_ + sVar179;
      sVar183 = auVar271._10_2_ + sVar183;
      sVar187 = auVar271._12_2_ + sVar187;
      sVar191 = auVar271._14_2_ + sVar191;
      uVar41 = (sVar140 < (short)uVar41) * uVar41 | (ushort)(sVar140 >= (short)uVar41) * sVar140;
      uVar61 = (sVar167 < (short)uVar61) * uVar61 | (ushort)(sVar167 >= (short)uVar61) * sVar167;
      uVar65 = (sVar171 < (short)uVar65) * uVar65 | (ushort)(sVar171 >= (short)uVar65) * sVar171;
      uVar477 = (sVar175 < (short)uVar477) * uVar477 | (ushort)(sVar175 >= (short)uVar477) * sVar175
      ;
      uVar69 = (sVar179 < (short)uVar69) * uVar69 | (ushort)(sVar179 >= (short)uVar69) * sVar179;
      uVar73 = (sVar183 < (short)uVar73) * uVar73 | (ushort)(sVar183 >= (short)uVar73) * sVar183;
      uVar484 = (sVar187 < (short)uVar484) * uVar484 | (ushort)(sVar187 >= (short)uVar484) * sVar187
      ;
      uVar77 = (sVar191 < (short)uVar77) * uVar77 | (ushort)(sVar191 >= (short)uVar77) * sVar191;
      uVar41 = ((short)uVar381 < (short)uVar41) * uVar381 |
               ((short)uVar381 >= (short)uVar41) * uVar41;
      uVar61 = ((short)uVar388 < (short)uVar61) * uVar388 |
               ((short)uVar388 >= (short)uVar61) * uVar61;
      uVar65 = ((short)uVar392 < (short)uVar65) * uVar392 |
               ((short)uVar392 >= (short)uVar65) * uVar65;
      uVar477 = ((short)uVar396 < (short)uVar477) * uVar396 |
                ((short)uVar396 >= (short)uVar477) * uVar477;
      uVar69 = ((short)uVar400 < (short)uVar69) * uVar400 |
               ((short)uVar400 >= (short)uVar69) * uVar69;
      uVar73 = ((short)uVar83 < (short)uVar73) * uVar83 | ((short)uVar83 >= (short)uVar73) * uVar73;
      uVar484 = ((short)uVar89 < (short)uVar484) * uVar89 |
                ((short)uVar89 >= (short)uVar484) * uVar484;
      uVar77 = ((short)uVar319 < (short)uVar77) * uVar319 |
               ((short)uVar319 >= (short)uVar77) * uVar77;
      *(char *)((long)dest + 8) =
           (0 < (short)in_XMM10._0_2_) * ((short)in_XMM10._0_2_ < 0x100) * (char)in_XMM10._0_2_ -
           (0xff < (short)in_XMM10._0_2_);
      *(char *)((long)dest + 9) =
           (0 < (short)in_XMM10._2_2_) * ((short)in_XMM10._2_2_ < 0x100) * (char)in_XMM10._2_2_ -
           (0xff < (short)in_XMM10._2_2_);
      *(char *)((long)dest + 10) =
           (0 < (short)in_XMM10._4_2_) * ((short)in_XMM10._4_2_ < 0x100) * (char)in_XMM10._4_2_ -
           (0xff < (short)in_XMM10._4_2_);
      *(char *)((long)dest + 0xb) =
           (0 < (short)in_XMM10._6_2_) * ((short)in_XMM10._6_2_ < 0x100) * (char)in_XMM10._6_2_ -
           (0xff < (short)in_XMM10._6_2_);
      *(char *)((long)dest + 0xc) =
           (0 < (short)in_XMM10._8_2_) * ((short)in_XMM10._8_2_ < 0x100) * (char)in_XMM10._8_2_ -
           (0xff < (short)in_XMM10._8_2_);
      *(char *)((long)dest + 0xd) =
           (0 < (short)in_XMM10._10_2_) * ((short)in_XMM10._10_2_ < 0x100) * (char)in_XMM10._10_2_ -
           (0xff < (short)in_XMM10._10_2_);
      *(char *)((long)dest + 0xe) =
           (0 < (short)in_XMM10._12_2_) * ((short)in_XMM10._12_2_ < 0x100) * (char)in_XMM10._12_2_ -
           (0xff < (short)in_XMM10._12_2_);
      *(char *)((long)dest + 0xf) =
           (0 < (short)in_XMM10._14_2_) * ((short)in_XMM10._14_2_ < 0x100) * (char)in_XMM10._14_2_ -
           (0xff < (short)in_XMM10._14_2_);
      pcVar2 = (char *)((long)dest + (long)dstride);
      *pcVar2 = (0 < (short)uVar41) * ((short)uVar41 < 0x100) * (char)uVar41 -
                (0xff < (short)uVar41);
      pcVar2[1] = (0 < (short)uVar61) * ((short)uVar61 < 0x100) * (char)uVar61 -
                  (0xff < (short)uVar61);
      pcVar2[2] = (0 < (short)uVar65) * ((short)uVar65 < 0x100) * (char)uVar65 -
                  (0xff < (short)uVar65);
      pcVar2[3] = (0 < (short)uVar477) * ((short)uVar477 < 0x100) * (char)uVar477 -
                  (0xff < (short)uVar477);
      pcVar2[4] = (0 < (short)uVar69) * ((short)uVar69 < 0x100) * (char)uVar69 -
                  (0xff < (short)uVar69);
      pcVar2[5] = (0 < (short)uVar73) * ((short)uVar73 < 0x100) * (char)uVar73 -
                  (0xff < (short)uVar73);
      pcVar2[6] = (0 < (short)uVar484) * ((short)uVar484 < 0x100) * (char)uVar484 -
                  (0xff < (short)uVar484);
      pcVar2[7] = (0 < (short)uVar77) * ((short)uVar77 < 0x100) * (char)uVar77 -
                  (0xff < (short)uVar77);
      dest = (void *)((long)dest + (long)dstride * 2);
      in = (uint16_t *)((long)in + 0x240);
      in_XMM4 = auVar203;
      in_XMM6 = auVar57;
    }
  }
  else {
    uVar33 = pri_damping;
    if (pri_strength != 0) {
      iVar20 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar20 == 0; iVar20 = iVar20 + -1) {
        }
      }
      uVar33 = pri_damping - iVar20;
      if (pri_damping < iVar20) {
        uVar33 = 0;
      }
    }
    local_198._0_4_ = sec_damping;
    if (sec_strength != 0) {
      iVar20 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar20 == 0; iVar20 = iVar20 + -1) {
        }
      }
      local_198._0_4_ = sec_damping - iVar20;
      if (sec_damping < iVar20) {
        local_198._0_4_ = 0;
      }
    }
    auVar45 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
    local_98._4_4_ = auVar45._0_4_;
    local_98._0_4_ = local_98._4_4_;
    local_98._8_4_ = local_98._4_4_;
    local_98._12_4_ = local_98._4_4_;
    auVar45 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
    local_168._4_4_ = auVar45._0_4_;
    local_168._0_4_ = local_168._4_4_;
    local_168._8_4_ = local_168._4_4_;
    local_168._12_4_ = local_168._4_4_;
    auVar45 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
    auVar46 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
    lVar35 = (long)dstride;
    for (lVar29 = 0; lVar29 < block_height; lVar29 = lVar29 + 4) {
      uVar3 = *(undefined8 *)in;
      uVar4 = *(undefined8 *)(in + 0x90);
      uVar5 = *(undefined8 *)(in + 0x120);
      uVar6 = *(undefined8 *)(in + 0x1b0);
      uVar7 = *(undefined8 *)(in + lVar31);
      uVar8 = *(undefined8 *)(in + lVar31 + 0x90);
      uVar9 = *(undefined8 *)(in + lVar31 + 0x120);
      uVar10 = *(undefined8 *)(in + lVar31 + 0x1b0);
      sVar38 = (short)uVar8;
      sVar294 = (short)uVar4;
      auVar271._0_2_ = sVar38 - sVar294;
      sVar59 = (short)((ulong)uVar8 >> 0x10);
      sVar308 = (short)((ulong)uVar4 >> 0x10);
      auVar271._2_2_ = sVar59 - sVar308;
      sVar63 = (short)((ulong)uVar8 >> 0x20);
      sVar310 = (short)((ulong)uVar4 >> 0x20);
      auVar271._4_2_ = sVar63 - sVar310;
      sVar67 = (short)((ulong)uVar8 >> 0x30);
      sVar312 = (short)((ulong)uVar4 >> 0x30);
      auVar271._6_2_ = sVar67 - sVar312;
      sVar42 = (short)uVar7;
      sVar314 = (short)uVar3;
      auVar271._8_2_ = sVar42 - sVar314;
      sVar66 = (short)((ulong)uVar7 >> 0x10);
      sVar316 = (short)((ulong)uVar3 >> 0x10);
      auVar271._10_2_ = sVar66 - sVar316;
      sVar74 = (short)((ulong)uVar7 >> 0x20);
      sVar85 = (short)((ulong)uVar7 >> 0x30);
      sVar318 = (short)((ulong)uVar3 >> 0x20);
      auVar271._12_2_ = sVar74 - sVar318;
      sVar321 = (short)((ulong)uVar3 >> 0x30);
      auVar271._14_2_ = sVar85 - sVar321;
      sVar187 = (short)uVar10;
      sVar349 = (short)uVar6;
      auVar159._0_2_ = sVar187 - sVar349;
      sVar168 = (short)((ulong)uVar10 >> 0x10);
      sVar364 = (short)((ulong)uVar6 >> 0x10);
      auVar159._2_2_ = sVar168 - sVar364;
      sVar172 = (short)((ulong)uVar10 >> 0x20);
      sVar348 = (short)((ulong)uVar6 >> 0x20);
      auVar159._4_2_ = sVar172 - sVar348;
      sVar176 = (short)((ulong)uVar10 >> 0x30);
      sVar367 = (short)((ulong)uVar6 >> 0x30);
      auVar159._6_2_ = sVar176 - sVar367;
      sVar180 = (short)uVar9;
      sVar363 = (short)uVar5;
      auVar159._8_2_ = sVar180 - sVar363;
      sVar184 = (short)((ulong)uVar9 >> 0x10);
      sVar372 = (short)((ulong)uVar5 >> 0x10);
      auVar159._10_2_ = sVar184 - sVar372;
      sVar188 = (short)((ulong)uVar9 >> 0x20);
      sVar192 = (short)((ulong)uVar9 >> 0x30);
      sVar365 = (short)((ulong)uVar5 >> 0x20);
      auVar159._12_2_ = sVar188 - sVar365;
      sVar379 = (short)((ulong)uVar5 >> 0x30);
      auVar159._14_2_ = sVar192 - sVar379;
      auVar203 = pabsw(in_XMM4,auVar271);
      auVar57 = psraw(auVar271,0xf);
      auVar271 = pabsw(in_XMM5,auVar159);
      auVar91 = psraw(auVar159,0xf);
      uVar107 = (ulong)uVar33;
      uVar41 = auVar203._0_2_;
      auVar340._0_2_ = uVar41 >> uVar107;
      uVar61 = auVar203._2_2_;
      auVar340._2_2_ = uVar61 >> uVar107;
      uVar65 = auVar203._4_2_;
      auVar340._4_2_ = uVar65 >> uVar107;
      uVar477 = auVar203._6_2_;
      auVar340._6_2_ = uVar477 >> uVar107;
      uVar69 = auVar203._8_2_;
      auVar340._8_2_ = uVar69 >> uVar107;
      uVar73 = auVar203._10_2_;
      auVar340._10_2_ = uVar73 >> uVar107;
      uVar484 = auVar203._12_2_;
      uVar77 = auVar203._14_2_;
      auVar340._12_2_ = uVar484 >> uVar107;
      auVar340._14_2_ = uVar77 >> uVar107;
      uVar81 = auVar271._0_2_;
      auVar280._0_2_ = uVar81 >> uVar107;
      uVar486 = auVar271._2_2_;
      auVar280._2_2_ = uVar486 >> uVar107;
      uVar87 = auVar271._4_2_;
      auVar280._4_2_ = uVar87 >> uVar107;
      uVar488 = auVar271._6_2_;
      auVar280._6_2_ = uVar488 >> uVar107;
      uVar490 = auVar271._8_2_;
      auVar280._8_2_ = uVar490 >> uVar107;
      uVar492 = auVar271._10_2_;
      auVar280._10_2_ = uVar492 >> uVar107;
      uVar494 = auVar271._12_2_;
      uVar496 = auVar271._14_2_;
      auVar280._12_2_ = uVar494 >> uVar107;
      auVar280._14_2_ = uVar496 >> uVar107;
      auVar271 = psubusw(local_98,auVar340);
      auVar203 = psubusw(local_98,auVar280);
      sVar39 = auVar271._0_2_;
      sVar58 = auVar271._2_2_;
      sVar71 = auVar271._4_2_;
      sVar72 = auVar271._6_2_;
      sVar75 = auVar271._8_2_;
      sVar76 = auVar271._10_2_;
      sVar140 = auVar271._12_2_;
      sVar80 = auVar271._14_2_;
      sVar40 = auVar203._0_2_;
      sVar60 = auVar203._2_2_;
      sVar64 = auVar203._4_2_;
      sVar68 = auVar203._6_2_;
      sVar62 = auVar203._8_2_;
      sVar70 = auVar203._10_2_;
      sVar79 = auVar203._12_2_;
      sVar191 = auVar203._14_2_;
      auVar113._0_2_ =
           (((short)uVar41 < sVar39) * uVar41 | (ushort)((short)uVar41 >= sVar39) * sVar39) +
           auVar57._0_2_;
      auVar113._2_2_ =
           (((short)uVar61 < sVar58) * uVar61 | (ushort)((short)uVar61 >= sVar58) * sVar58) +
           auVar57._2_2_;
      auVar113._4_2_ =
           (((short)uVar65 < sVar71) * uVar65 | (ushort)((short)uVar65 >= sVar71) * sVar71) +
           auVar57._4_2_;
      auVar113._6_2_ =
           (((short)uVar477 < sVar72) * uVar477 | (ushort)((short)uVar477 >= sVar72) * sVar72) +
           auVar57._6_2_;
      auVar113._8_2_ =
           (((short)uVar69 < sVar75) * uVar69 | (ushort)((short)uVar69 >= sVar75) * sVar75) +
           auVar57._8_2_;
      auVar113._10_2_ =
           (((short)uVar73 < sVar76) * uVar73 | (ushort)((short)uVar73 >= sVar76) * sVar76) +
           auVar57._10_2_;
      auVar113._12_2_ =
           (((short)uVar484 < sVar140) * uVar484 | (ushort)((short)uVar484 >= sVar140) * sVar140) +
           auVar57._12_2_;
      auVar113._14_2_ =
           (((short)uVar77 < sVar80) * uVar77 | (ushort)((short)uVar77 >= sVar80) * sVar80) +
           auVar57._14_2_;
      auVar342._0_2_ =
           (((short)uVar81 < sVar40) * uVar81 | (ushort)((short)uVar81 >= sVar40) * sVar40) +
           auVar91._0_2_;
      auVar342._2_2_ =
           (((short)uVar486 < sVar60) * uVar486 | (ushort)((short)uVar486 >= sVar60) * sVar60) +
           auVar91._2_2_;
      auVar342._4_2_ =
           (((short)uVar87 < sVar64) * uVar87 | (ushort)((short)uVar87 >= sVar64) * sVar64) +
           auVar91._4_2_;
      auVar342._6_2_ =
           (((short)uVar488 < sVar68) * uVar488 | (ushort)((short)uVar488 >= sVar68) * sVar68) +
           auVar91._6_2_;
      auVar342._8_2_ =
           (((short)uVar490 < sVar62) * uVar490 | (ushort)((short)uVar490 >= sVar62) * sVar62) +
           auVar91._8_2_;
      auVar342._10_2_ =
           (((short)uVar492 < sVar70) * uVar492 | (ushort)((short)uVar492 >= sVar70) * sVar70) +
           auVar91._10_2_;
      auVar342._12_2_ =
           (((short)uVar494 < sVar79) * uVar494 | (ushort)((short)uVar494 >= sVar79) * sVar79) +
           auVar91._12_2_;
      auVar342._14_2_ =
           (((short)uVar496 < sVar191) * uVar496 | (ushort)((short)uVar496 >= sVar191) * sVar191) +
           auVar91._14_2_;
      auVar113 = auVar113 ^ auVar57;
      auVar342 = auVar342 ^ auVar91;
      uVar3 = *(undefined8 *)(in + -lVar31);
      uVar4 = *(undefined8 *)(in + (0x90 - lVar31));
      uVar5 = *(undefined8 *)(in + (0x120 - lVar31));
      uVar6 = *(undefined8 *)(in + (0x1b0 - lVar31));
      sVar141 = (short)uVar4;
      auVar160._0_2_ = sVar141 - sVar294;
      sVar169 = (short)((ulong)uVar4 >> 0x10);
      auVar160._2_2_ = sVar169 - sVar308;
      sVar173 = (short)((ulong)uVar4 >> 0x20);
      auVar160._4_2_ = sVar173 - sVar310;
      sVar177 = (short)((ulong)uVar4 >> 0x30);
      auVar160._6_2_ = sVar177 - sVar312;
      sVar181 = (short)uVar3;
      auVar160._8_2_ = sVar181 - sVar314;
      sVar185 = (short)((ulong)uVar3 >> 0x10);
      auVar160._10_2_ = sVar185 - sVar316;
      sVar189 = (short)((ulong)uVar3 >> 0x20);
      sVar193 = (short)((ulong)uVar3 >> 0x30);
      auVar160._12_2_ = sVar189 - sVar318;
      auVar160._14_2_ = sVar193 - sVar321;
      sVar228 = (short)uVar6;
      auVar236._0_2_ = sVar228 - sVar349;
      sVar243 = (short)((ulong)uVar6 >> 0x10);
      auVar236._2_2_ = sVar243 - sVar364;
      sVar247 = (short)((ulong)uVar6 >> 0x20);
      auVar236._4_2_ = sVar247 - sVar348;
      sVar251 = (short)((ulong)uVar6 >> 0x30);
      auVar236._6_2_ = sVar251 - sVar367;
      sVar255 = (short)uVar5;
      auVar236._8_2_ = sVar255 - sVar363;
      sVar259 = (short)((ulong)uVar5 >> 0x10);
      auVar236._10_2_ = sVar259 - sVar372;
      sVar263 = (short)((ulong)uVar5 >> 0x20);
      sVar267 = (short)((ulong)uVar5 >> 0x30);
      auVar236._12_2_ = sVar263 - sVar365;
      auVar236._14_2_ = sVar267 - sVar379;
      auVar57 = pabsw(auVar280,auVar160);
      auVar203 = psraw(auVar160,0xf);
      uVar41 = auVar57._0_2_;
      auVar204._0_2_ = uVar41 >> uVar107;
      uVar61 = auVar57._2_2_;
      auVar204._2_2_ = uVar61 >> uVar107;
      uVar65 = auVar57._4_2_;
      auVar204._4_2_ = uVar65 >> uVar107;
      uVar477 = auVar57._6_2_;
      auVar204._6_2_ = uVar477 >> uVar107;
      uVar69 = auVar57._8_2_;
      auVar204._8_2_ = uVar69 >> uVar107;
      uVar73 = auVar57._10_2_;
      auVar204._10_2_ = uVar73 >> uVar107;
      uVar484 = auVar57._12_2_;
      uVar77 = auVar57._14_2_;
      auVar204._12_2_ = uVar484 >> uVar107;
      auVar204._14_2_ = uVar77 >> uVar107;
      auVar91 = pabsw(in_XMM7,auVar236);
      uVar81 = auVar91._0_2_;
      auVar327._0_2_ = uVar81 >> uVar107;
      uVar486 = auVar91._2_2_;
      auVar327._2_2_ = uVar486 >> uVar107;
      uVar87 = auVar91._4_2_;
      auVar327._4_2_ = uVar87 >> uVar107;
      uVar488 = auVar91._6_2_;
      auVar327._6_2_ = uVar488 >> uVar107;
      uVar490 = auVar91._8_2_;
      auVar327._8_2_ = uVar490 >> uVar107;
      uVar492 = auVar91._10_2_;
      auVar327._10_2_ = uVar492 >> uVar107;
      uVar494 = auVar91._12_2_;
      uVar496 = auVar91._14_2_;
      auVar327._12_2_ = uVar494 >> uVar107;
      auVar327._14_2_ = uVar496 >> uVar107;
      auVar271 = psraw(auVar236,0xf);
      auVar143 = psubusw(local_98,auVar204);
      auVar57 = psubusw(local_98,auVar327);
      sVar39 = auVar143._0_2_;
      sVar58 = auVar143._2_2_;
      sVar71 = auVar143._4_2_;
      sVar72 = auVar143._6_2_;
      sVar75 = auVar143._8_2_;
      sVar76 = auVar143._10_2_;
      sVar140 = auVar143._12_2_;
      sVar80 = auVar143._14_2_;
      sVar40 = auVar57._0_2_;
      sVar60 = auVar57._2_2_;
      sVar64 = auVar57._4_2_;
      sVar68 = auVar57._6_2_;
      sVar62 = auVar57._8_2_;
      sVar70 = auVar57._10_2_;
      sVar79 = auVar57._12_2_;
      sVar191 = auVar57._14_2_;
      auVar415._0_2_ =
           (((short)uVar41 < sVar39) * uVar41 | (ushort)((short)uVar41 >= sVar39) * sVar39) +
           auVar203._0_2_;
      auVar415._2_2_ =
           (((short)uVar61 < sVar58) * uVar61 | (ushort)((short)uVar61 >= sVar58) * sVar58) +
           auVar203._2_2_;
      auVar415._4_2_ =
           (((short)uVar65 < sVar71) * uVar65 | (ushort)((short)uVar65 >= sVar71) * sVar71) +
           auVar203._4_2_;
      auVar415._6_2_ =
           (((short)uVar477 < sVar72) * uVar477 | (ushort)((short)uVar477 >= sVar72) * sVar72) +
           auVar203._6_2_;
      auVar415._8_2_ =
           (((short)uVar69 < sVar75) * uVar69 | (ushort)((short)uVar69 >= sVar75) * sVar75) +
           auVar203._8_2_;
      auVar415._10_2_ =
           (((short)uVar73 < sVar76) * uVar73 | (ushort)((short)uVar73 >= sVar76) * sVar76) +
           auVar203._10_2_;
      auVar415._12_2_ =
           (((short)uVar484 < sVar140) * uVar484 | (ushort)((short)uVar484 >= sVar140) * sVar140) +
           auVar203._12_2_;
      auVar415._14_2_ =
           (((short)uVar77 < sVar80) * uVar77 | (ushort)((short)uVar77 >= sVar80) * sVar80) +
           auVar203._14_2_;
      auVar205._0_2_ =
           (((short)uVar81 < sVar40) * uVar81 | (ushort)((short)uVar81 >= sVar40) * sVar40) +
           auVar271._0_2_;
      auVar205._2_2_ =
           (((short)uVar486 < sVar60) * uVar486 | (ushort)((short)uVar486 >= sVar60) * sVar60) +
           auVar271._2_2_;
      auVar205._4_2_ =
           (((short)uVar87 < sVar64) * uVar87 | (ushort)((short)uVar87 >= sVar64) * sVar64) +
           auVar271._4_2_;
      auVar205._6_2_ =
           (((short)uVar488 < sVar68) * uVar488 | (ushort)((short)uVar488 >= sVar68) * sVar68) +
           auVar271._6_2_;
      auVar205._8_2_ =
           (((short)uVar490 < sVar62) * uVar490 | (ushort)((short)uVar490 >= sVar62) * sVar62) +
           auVar271._8_2_;
      auVar205._10_2_ =
           (((short)uVar492 < sVar70) * uVar492 | (ushort)((short)uVar492 >= sVar70) * sVar70) +
           auVar271._10_2_;
      auVar205._12_2_ =
           (((short)uVar494 < sVar79) * uVar494 | (ushort)((short)uVar494 >= sVar79) * sVar79) +
           auVar271._12_2_;
      auVar205._14_2_ =
           (((short)uVar496 < sVar191) * uVar496 | (ushort)((short)uVar496 >= sVar191) * sVar191) +
           auVar271._14_2_;
      auVar415 = auVar415 ^ auVar203;
      auVar205 = auVar205 ^ auVar271;
      auVar57 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar37][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar37][0]),0);
      sVar39 = auVar57._0_2_;
      sVar71 = auVar57._2_2_;
      uVar11 = *(undefined8 *)(in + lVar32);
      uVar12 = *(undefined8 *)(in + lVar32 + 0x90);
      uVar13 = *(undefined8 *)(in + lVar32 + 0x120);
      uVar14 = *(undefined8 *)(in + lVar32 + 0x1b0);
      sVar58 = (short)uVar12;
      auVar350._0_2_ = sVar58 - sVar294;
      sVar72 = (short)((ulong)uVar12 >> 0x10);
      auVar350._2_2_ = sVar72 - sVar308;
      sVar75 = (short)((ulong)uVar12 >> 0x20);
      auVar350._4_2_ = sVar75 - sVar310;
      sVar76 = (short)((ulong)uVar12 >> 0x30);
      auVar350._6_2_ = sVar76 - sVar312;
      sVar140 = (short)uVar11;
      auVar350._8_2_ = sVar140 - sVar314;
      sVar80 = (short)((ulong)uVar11 >> 0x10);
      auVar350._10_2_ = sVar80 - sVar316;
      sVar167 = (short)((ulong)uVar11 >> 0x20);
      sVar86 = (short)((ulong)uVar11 >> 0x30);
      auVar350._12_2_ = sVar167 - sVar318;
      auVar350._14_2_ = sVar86 - sVar321;
      sVar171 = (short)uVar14;
      auVar114._0_2_ = sVar171 - sVar349;
      sVar122 = (short)((ulong)uVar14 >> 0x10);
      auVar114._2_2_ = sVar122 - sVar364;
      sVar175 = (short)((ulong)uVar14 >> 0x20);
      auVar114._4_2_ = sVar175 - sVar348;
      sVar127 = (short)((ulong)uVar14 >> 0x30);
      auVar114._6_2_ = sVar127 - sVar367;
      sVar179 = (short)uVar13;
      auVar114._8_2_ = sVar179 - sVar363;
      sVar132 = (short)((ulong)uVar13 >> 0x10);
      auVar114._10_2_ = sVar132 - sVar372;
      sVar183 = (short)((ulong)uVar13 >> 0x20);
      sVar137 = (short)((ulong)uVar13 >> 0x30);
      auVar114._12_2_ = sVar183 - sVar365;
      auVar114._14_2_ = sVar137 - sVar379;
      auVar143 = pabsw(auVar203,auVar350);
      uVar41 = auVar143._0_2_;
      auVar281._0_2_ = uVar41 >> uVar107;
      uVar61 = auVar143._2_2_;
      auVar281._2_2_ = uVar61 >> uVar107;
      uVar65 = auVar143._4_2_;
      auVar281._4_2_ = uVar65 >> uVar107;
      uVar477 = auVar143._6_2_;
      auVar281._6_2_ = uVar477 >> uVar107;
      uVar69 = auVar143._8_2_;
      auVar281._8_2_ = uVar69 >> uVar107;
      uVar73 = auVar143._10_2_;
      auVar281._10_2_ = uVar73 >> uVar107;
      uVar484 = auVar143._12_2_;
      uVar77 = auVar143._14_2_;
      auVar281._12_2_ = uVar484 >> uVar107;
      auVar281._14_2_ = uVar77 >> uVar107;
      auVar57 = pabsw(auVar91,auVar114);
      auVar91 = psubusw(local_98,auVar281);
      uVar81 = auVar57._0_2_;
      auVar328._0_2_ = uVar81 >> uVar107;
      uVar486 = auVar57._2_2_;
      auVar328._2_2_ = uVar486 >> uVar107;
      uVar87 = auVar57._4_2_;
      auVar328._4_2_ = uVar87 >> uVar107;
      uVar488 = auVar57._6_2_;
      auVar328._6_2_ = uVar488 >> uVar107;
      uVar490 = auVar57._8_2_;
      auVar328._8_2_ = uVar490 >> uVar107;
      uVar492 = auVar57._10_2_;
      auVar328._10_2_ = uVar492 >> uVar107;
      uVar494 = auVar57._12_2_;
      uVar496 = auVar57._14_2_;
      auVar328._12_2_ = uVar494 >> uVar107;
      auVar328._14_2_ = uVar496 >> uVar107;
      auVar57 = psubusw(local_98,auVar328);
      auVar203 = psraw(auVar350,0xf);
      auVar271 = psraw(auVar114,0xf);
      sVar229 = auVar91._0_2_;
      sVar244 = auVar91._2_2_;
      sVar248 = auVar91._4_2_;
      sVar252 = auVar91._6_2_;
      sVar256 = auVar91._8_2_;
      sVar260 = auVar91._10_2_;
      sVar264 = auVar91._12_2_;
      sVar268 = auVar91._14_2_;
      sVar40 = auVar57._0_2_;
      sVar60 = auVar57._2_2_;
      sVar64 = auVar57._4_2_;
      sVar68 = auVar57._6_2_;
      sVar62 = auVar57._8_2_;
      sVar70 = auVar57._10_2_;
      sVar79 = auVar57._12_2_;
      sVar191 = auVar57._14_2_;
      auVar237._0_2_ =
           (((short)uVar41 < sVar229) * uVar41 | (ushort)((short)uVar41 >= sVar229) * sVar229) +
           auVar203._0_2_;
      auVar237._2_2_ =
           (((short)uVar61 < sVar244) * uVar61 | (ushort)((short)uVar61 >= sVar244) * sVar244) +
           auVar203._2_2_;
      auVar237._4_2_ =
           (((short)uVar65 < sVar248) * uVar65 | (ushort)((short)uVar65 >= sVar248) * sVar248) +
           auVar203._4_2_;
      auVar237._6_2_ =
           (((short)uVar477 < sVar252) * uVar477 | (ushort)((short)uVar477 >= sVar252) * sVar252) +
           auVar203._6_2_;
      auVar237._8_2_ =
           (((short)uVar69 < sVar256) * uVar69 | (ushort)((short)uVar69 >= sVar256) * sVar256) +
           auVar203._8_2_;
      auVar237._10_2_ =
           (((short)uVar73 < sVar260) * uVar73 | (ushort)((short)uVar73 >= sVar260) * sVar260) +
           auVar203._10_2_;
      auVar237._12_2_ =
           (((short)uVar484 < sVar264) * uVar484 | (ushort)((short)uVar484 >= sVar264) * sVar264) +
           auVar203._12_2_;
      auVar237._14_2_ =
           (((short)uVar77 < sVar268) * uVar77 | (ushort)((short)uVar77 >= sVar268) * sVar268) +
           auVar203._14_2_;
      auVar91._0_2_ =
           (((short)uVar81 < sVar40) * uVar81 | (ushort)((short)uVar81 >= sVar40) * sVar40) +
           auVar271._0_2_;
      auVar91._2_2_ =
           (((short)uVar486 < sVar60) * uVar486 | (ushort)((short)uVar486 >= sVar60) * sVar60) +
           auVar271._2_2_;
      auVar91._4_2_ =
           (((short)uVar87 < sVar64) * uVar87 | (ushort)((short)uVar87 >= sVar64) * sVar64) +
           auVar271._4_2_;
      auVar91._6_2_ =
           (((short)uVar488 < sVar68) * uVar488 | (ushort)((short)uVar488 >= sVar68) * sVar68) +
           auVar271._6_2_;
      auVar91._8_2_ =
           (((short)uVar490 < sVar62) * uVar490 | (ushort)((short)uVar490 >= sVar62) * sVar62) +
           auVar271._8_2_;
      auVar91._10_2_ =
           (((short)uVar492 < sVar70) * uVar492 | (ushort)((short)uVar492 >= sVar70) * sVar70) +
           auVar271._10_2_;
      auVar91._12_2_ =
           (((short)uVar494 < sVar79) * uVar494 | (ushort)((short)uVar494 >= sVar79) * sVar79) +
           auVar271._12_2_;
      auVar91._14_2_ =
           (((short)uVar496 < sVar191) * uVar496 | (ushort)((short)uVar496 >= sVar191) * sVar191) +
           auVar271._14_2_;
      auVar237 = auVar237 ^ auVar203;
      auVar91 = auVar91 ^ auVar271;
      uVar15 = *(undefined8 *)(in + -lVar32);
      uVar16 = *(undefined8 *)(in + (0x90 - lVar32));
      uVar17 = *(undefined8 *)(in + (0x120 - lVar32));
      uVar18 = *(undefined8 *)(in + (0x1b0 - lVar32));
      bStack_e0 = (byte)uVar17;
      bStack_df = (byte)((ulong)uVar17 >> 8);
      bStack_de = (byte)((ulong)uVar17 >> 0x10);
      bStack_dd = (byte)((ulong)uVar17 >> 0x18);
      bStack_dc = (byte)((ulong)uVar17 >> 0x20);
      bStack_db = (byte)((ulong)uVar17 >> 0x28);
      bStack_da = (byte)((ulong)uVar17 >> 0x30);
      bStack_d9 = (byte)((ulong)uVar17 >> 0x38);
      uVar17 = *(undefined8 *)(in + lVar28);
      uVar19 = *(undefined8 *)(in + lVar28 + 0x90);
      uVar41 = (ushort)(sVar38 < sVar294) * sVar38 | (ushort)(sVar38 >= sVar294) * sVar294;
      uVar61 = (ushort)(sVar59 < sVar308) * sVar59 | (ushort)(sVar59 >= sVar308) * sVar308;
      uVar65 = (ushort)(sVar63 < sVar310) * sVar63 | (ushort)(sVar63 >= sVar310) * sVar310;
      uVar477 = (ushort)(sVar67 < sVar312) * sVar67 | (ushort)(sVar67 >= sVar312) * sVar312;
      uVar69 = (ushort)(sVar42 < sVar314) * sVar42 | (ushort)(sVar42 >= sVar314) * sVar314;
      uVar73 = (ushort)(sVar66 < sVar316) * sVar66 | (ushort)(sVar66 >= sVar316) * sVar316;
      uVar484 = (ushort)(sVar74 < sVar318) * sVar74 | (ushort)(sVar74 >= sVar318) * sVar318;
      uVar77 = (ushort)(sVar85 < sVar321) * sVar85 | (ushort)(sVar85 >= sVar321) * sVar321;
      bVar269 = (byte)uVar4;
      bVar106 = (byte)uVar8;
      bVar213 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar4 >> 8);
      bVar106 = (byte)((ulong)uVar8 >> 8);
      bVar214 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar4 >> 0x10);
      bVar106 = (byte)((ulong)uVar8 >> 0x10);
      bVar215 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar4 >> 0x18);
      bVar106 = (byte)((ulong)uVar8 >> 0x18);
      bVar216 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar4 >> 0x20);
      bVar106 = (byte)((ulong)uVar8 >> 0x20);
      bVar217 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar4 >> 0x28);
      bVar106 = (byte)((ulong)uVar8 >> 0x28);
      bVar218 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar4 >> 0x30);
      bVar106 = (byte)((ulong)uVar8 >> 0x30);
      bVar219 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar4 >> 0x38);
      bVar106 = (byte)((ulong)uVar8 >> 0x38);
      bVar220 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)uVar3;
      bVar106 = (byte)uVar7;
      bVar221 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar3 >> 8);
      bVar106 = (byte)((ulong)uVar7 >> 8);
      bVar222 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar3 >> 0x10);
      bVar106 = (byte)((ulong)uVar7 >> 0x10);
      bVar223 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar3 >> 0x18);
      bVar106 = (byte)((ulong)uVar7 >> 0x18);
      bVar224 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar3 >> 0x20);
      bVar106 = (byte)((ulong)uVar7 >> 0x20);
      bVar225 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar3 >> 0x28);
      bVar106 = (byte)((ulong)uVar7 >> 0x28);
      bVar226 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar3 >> 0x30);
      bVar106 = (byte)((ulong)uVar7 >> 0x30);
      bVar120 = (byte)((ulong)uVar7 >> 0x38);
      bVar227 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar3 >> 0x38);
      bVar241 = (bVar120 < bVar269) * bVar269 | (bVar120 >= bVar269) * bVar120;
      uVar139 = (ushort)(sVar58 < sVar141) * sVar58 | (ushort)(sVar58 >= sVar141) * sVar141;
      uVar178 = (ushort)(sVar72 < sVar169) * sVar72 | (ushort)(sVar72 >= sVar169) * sVar169;
      uVar293 = (ushort)(sVar75 < sVar173) * sVar75 | (ushort)(sVar75 >= sVar173) * sVar173;
      uVar313 = (ushort)(sVar76 < sVar177) * sVar76 | (ushort)(sVar76 >= sVar177) * sVar177;
      uVar322 = (ushort)(sVar140 < sVar181) * sVar140 | (ushort)(sVar140 >= sVar181) * sVar181;
      uVar334 = (ushort)(sVar80 < sVar185) * sVar80 | (ushort)(sVar80 >= sVar185) * sVar185;
      uVar336 = (ushort)(sVar167 < sVar189) * sVar167 | (ushort)(sVar167 >= sVar189) * sVar189;
      uVar338 = (ushort)(sVar86 < sVar193) * sVar86 | (ushort)(sVar86 >= sVar193) * sVar193;
      bVar269 = (byte)uVar16;
      bVar106 = (byte)uVar12;
      bVar121 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar16 >> 8);
      bVar106 = (byte)((ulong)uVar12 >> 8);
      bVar123 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar16 >> 0x10);
      bVar106 = (byte)((ulong)uVar12 >> 0x10);
      bVar124 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar16 >> 0x18);
      bVar106 = (byte)((ulong)uVar12 >> 0x18);
      bVar125 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar16 >> 0x20);
      bVar106 = (byte)((ulong)uVar12 >> 0x20);
      bVar126 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar16 >> 0x28);
      bVar106 = (byte)((ulong)uVar12 >> 0x28);
      bVar128 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar16 >> 0x30);
      bVar106 = (byte)((ulong)uVar12 >> 0x30);
      bVar129 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar16 >> 0x38);
      bVar106 = (byte)((ulong)uVar12 >> 0x38);
      bVar130 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)uVar15;
      bVar106 = (byte)uVar11;
      bVar131 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar15 >> 8);
      bVar106 = (byte)((ulong)uVar11 >> 8);
      bVar133 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar15 >> 0x10);
      bVar106 = (byte)((ulong)uVar11 >> 0x10);
      bVar134 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar15 >> 0x18);
      bVar106 = (byte)((ulong)uVar11 >> 0x18);
      bVar135 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar15 >> 0x20);
      bVar106 = (byte)((ulong)uVar11 >> 0x20);
      bVar136 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar15 >> 0x28);
      bVar106 = (byte)((ulong)uVar11 >> 0x28);
      bVar138 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar15 >> 0x30);
      bVar106 = (byte)((ulong)uVar11 >> 0x30);
      bVar120 = (byte)((ulong)uVar11 >> 0x38);
      bVar194 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar15 >> 0x38);
      bVar212 = (bVar120 < bVar269) * bVar269 | (bVar120 >= bVar269) * bVar120;
      sVar38 = (short)uVar16;
      sVar42 = (short)uVar19;
      uVar166 = (ushort)(sVar38 < sVar42) * sVar38 | (ushort)(sVar38 >= sVar42) * sVar42;
      sVar40 = (short)((ulong)uVar16 >> 0x10);
      sVar62 = (short)((ulong)uVar19 >> 0x10);
      uVar174 = (ushort)(sVar40 < sVar62) * sVar40 | (ushort)(sVar40 >= sVar62) * sVar62;
      sVar59 = (short)((ulong)uVar16 >> 0x20);
      sVar66 = (short)((ulong)uVar19 >> 0x20);
      uVar182 = (ushort)(sVar59 < sVar66) * sVar59 | (ushort)(sVar59 >= sVar66) * sVar66;
      sVar60 = (short)((ulong)uVar16 >> 0x30);
      sVar70 = (short)((ulong)uVar19 >> 0x30);
      uVar190 = (ushort)(sVar60 < sVar70) * sVar60 | (ushort)(sVar60 >= sVar70) * sVar70;
      sVar63 = (short)uVar15;
      sVar74 = (short)uVar17;
      uVar307 = (ushort)(sVar63 < sVar74) * sVar63 | (ushort)(sVar63 >= sVar74) * sVar74;
      sVar64 = (short)((ulong)uVar15 >> 0x10);
      sVar79 = (short)((ulong)uVar17 >> 0x10);
      uVar311 = (ushort)(sVar64 < sVar79) * sVar64 | (ushort)(sVar64 >= sVar79) * sVar79;
      sVar67 = (short)((ulong)uVar15 >> 0x20);
      sVar85 = (short)((ulong)uVar17 >> 0x20);
      sVar191 = (short)((ulong)uVar17 >> 0x30);
      uVar315 = (ushort)(sVar67 < sVar85) * sVar67 | (ushort)(sVar67 >= sVar85) * sVar85;
      sVar68 = (short)((ulong)uVar15 >> 0x30);
      uVar320 = (ushort)(sVar68 < sVar191) * sVar68 | (ushort)(sVar68 >= sVar191) * sVar191;
      auVar299._0_2_ = sVar38 - sVar294;
      auVar299._2_2_ = sVar40 - sVar308;
      auVar299._4_2_ = sVar59 - sVar310;
      auVar299._6_2_ = sVar60 - sVar312;
      auVar299._8_2_ = sVar63 - sVar314;
      auVar299._10_2_ = sVar64 - sVar316;
      auVar299._12_2_ = sVar67 - sVar318;
      auVar299._14_2_ = sVar68 - sVar321;
      auVar57 = pabsw(auVar143,auVar299);
      uVar81 = auVar57._0_2_;
      auVar100._0_2_ = uVar81 >> uVar107;
      uVar486 = auVar57._2_2_;
      auVar100._2_2_ = uVar486 >> uVar107;
      uVar87 = auVar57._4_2_;
      auVar100._4_2_ = uVar87 >> uVar107;
      uVar488 = auVar57._6_2_;
      auVar100._6_2_ = uVar488 >> uVar107;
      uVar490 = auVar57._8_2_;
      auVar100._8_2_ = uVar490 >> uVar107;
      uVar492 = auVar57._10_2_;
      auVar100._10_2_ = uVar492 >> uVar107;
      uVar494 = auVar57._12_2_;
      uVar496 = auVar57._14_2_;
      auVar100._12_2_ = uVar494 >> uVar107;
      auVar100._14_2_ = uVar496 >> uVar107;
      auVar203 = psubusw(local_98,auVar100);
      uVar3 = *(undefined8 *)(in + lVar28 + 0x120);
      uVar4 = *(undefined8 *)(in + lVar28 + 0x1b0);
      auVar206._0_2_ =
           (ushort)(sVar187 < sVar349) * sVar187 | (ushort)(sVar187 >= sVar349) * sVar349;
      auVar206._2_2_ =
           (ushort)(sVar168 < sVar364) * sVar168 | (ushort)(sVar168 >= sVar364) * sVar364;
      auVar206._4_2_ =
           (ushort)(sVar172 < sVar348) * sVar172 | (ushort)(sVar172 >= sVar348) * sVar348;
      auVar206._6_2_ =
           (ushort)(sVar176 < sVar367) * sVar176 | (ushort)(sVar176 >= sVar367) * sVar367;
      auVar206._8_2_ =
           (ushort)(sVar180 < sVar363) * sVar180 | (ushort)(sVar180 >= sVar363) * sVar363;
      auVar206._10_2_ =
           (ushort)(sVar184 < sVar372) * sVar184 | (ushort)(sVar184 >= sVar372) * sVar372;
      auVar206._12_2_ =
           (ushort)(sVar188 < sVar365) * sVar188 | (ushort)(sVar188 >= sVar365) * sVar365;
      auVar206._14_2_ =
           (ushort)(sVar192 < sVar379) * sVar192 | (ushort)(sVar192 >= sVar379) * sVar379;
      bVar269 = (byte)uVar6;
      bVar106 = (byte)uVar10;
      auVar384[0] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar6 >> 8);
      bVar106 = (byte)((ulong)uVar10 >> 8);
      auVar384[1] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar6 >> 0x10);
      bVar106 = (byte)((ulong)uVar10 >> 0x10);
      auVar384[2] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar6 >> 0x18);
      bVar106 = (byte)((ulong)uVar10 >> 0x18);
      auVar384[3] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar6 >> 0x20);
      bVar106 = (byte)((ulong)uVar10 >> 0x20);
      auVar384[4] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar6 >> 0x28);
      bVar106 = (byte)((ulong)uVar10 >> 0x28);
      auVar384[5] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar6 >> 0x30);
      bVar106 = (byte)((ulong)uVar10 >> 0x30);
      auVar384[6] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar6 >> 0x38);
      bVar106 = (byte)((ulong)uVar10 >> 0x38);
      auVar384[7] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)uVar5;
      bVar106 = (byte)uVar9;
      auVar384[8] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar5 >> 8);
      bVar106 = (byte)((ulong)uVar9 >> 8);
      auVar384[9] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar5 >> 0x10);
      bVar106 = (byte)((ulong)uVar9 >> 0x10);
      auVar384[10] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar5 >> 0x18);
      bVar106 = (byte)((ulong)uVar9 >> 0x18);
      auVar384[0xb] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar5 >> 0x20);
      bVar106 = (byte)((ulong)uVar9 >> 0x20);
      auVar384[0xc] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar5 >> 0x28);
      bVar106 = (byte)((ulong)uVar9 >> 0x28);
      auVar384[0xd] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar5 >> 0x30);
      bVar106 = (byte)((ulong)uVar9 >> 0x30);
      bVar120 = (byte)((ulong)uVar9 >> 0x38);
      auVar384[0xe] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar5 >> 0x38);
      auVar384[0xf] = (bVar120 < bVar269) * bVar269 | (bVar120 >= bVar269) * bVar120;
      uVar78 = (ushort)(sVar171 < sVar228) * sVar171 | (ushort)(sVar171 >= sVar228) * sVar228;
      uVar83 = (ushort)(sVar122 < sVar243) * sVar122 | (ushort)(sVar122 >= sVar243) * sVar243;
      uVar82 = (ushort)(sVar175 < sVar247) * sVar175 | (ushort)(sVar175 >= sVar247) * sVar247;
      uVar84 = (ushort)(sVar127 < sVar251) * sVar127 | (ushort)(sVar127 >= sVar251) * sVar251;
      uVar89 = (ushort)(sVar179 < sVar255) * sVar179 | (ushort)(sVar179 >= sVar255) * sVar255;
      uVar88 = (ushort)(sVar132 < sVar259) * sVar132 | (ushort)(sVar132 >= sVar259) * sVar259;
      uVar90 = (ushort)(sVar183 < sVar263) * sVar183 | (ushort)(sVar183 >= sVar263) * sVar263;
      uVar319 = (ushort)(sVar137 < sVar267) * sVar137 | (ushort)(sVar137 >= sVar267) * sVar267;
      Var24 = CONCAT19(bStack_df,CONCAT18(bStack_e0,uVar18));
      auVar25[10] = bStack_de;
      auVar25._0_10_ = Var24;
      auVar25[0xb] = bStack_dd;
      auVar26[0xc] = bStack_dc;
      auVar26._0_12_ = auVar25;
      auVar26[0xd] = bStack_db;
      auVar57[0xe] = bStack_da;
      auVar57._0_14_ = auVar26;
      auVar57[0xf] = bStack_d9;
      bVar269 = (byte)uVar18;
      bVar106 = (byte)uVar14;
      bVar411 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar18 >> 8);
      bVar106 = (byte)((ulong)uVar14 >> 8);
      bVar417 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar18 >> 0x10);
      bVar106 = (byte)((ulong)uVar14 >> 0x10);
      bVar418 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar18 >> 0x18);
      bVar106 = (byte)((ulong)uVar14 >> 0x18);
      bVar419 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar18 >> 0x20);
      bVar106 = (byte)((ulong)uVar14 >> 0x20);
      bVar420 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar18 >> 0x28);
      bVar106 = (byte)((ulong)uVar14 >> 0x28);
      bVar421 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar18 >> 0x30);
      bVar106 = (byte)((ulong)uVar14 >> 0x30);
      bVar422 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar18 >> 0x38);
      bVar106 = (byte)((ulong)uVar14 >> 0x38);
      bVar423 = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)uVar13;
      bVar424 = (bVar269 < bStack_e0) * bStack_e0 | (bVar269 >= bStack_e0) * bVar269;
      bVar269 = (byte)((ulong)uVar13 >> 8);
      bVar425 = (bVar269 < bStack_df) * bStack_df | (bVar269 >= bStack_df) * bVar269;
      bVar269 = (byte)((ulong)uVar13 >> 0x10);
      bVar426 = (bVar269 < bStack_de) * bStack_de | (bVar269 >= bStack_de) * bVar269;
      bVar269 = (byte)((ulong)uVar13 >> 0x18);
      bVar427 = (bVar269 < bStack_dd) * bStack_dd | (bVar269 >= bStack_dd) * bVar269;
      bVar269 = (byte)((ulong)uVar13 >> 0x20);
      bVar428 = (bVar269 < bStack_dc) * bStack_dc | (bVar269 >= bStack_dc) * bVar269;
      bVar269 = (byte)((ulong)uVar13 >> 0x28);
      bVar429 = (bVar269 < bStack_db) * bStack_db | (bVar269 >= bStack_db) * bVar269;
      bVar269 = (byte)((ulong)uVar13 >> 0x30);
      bVar106 = (byte)((ulong)uVar13 >> 0x38);
      bVar430 = (bVar269 < bStack_da) * bStack_da | (bVar269 >= bStack_da) * bVar269;
      bVar431 = (bVar106 < bStack_d9) * bStack_d9 | (bVar106 >= bStack_d9) * bVar106;
      sVar38 = (short)uVar18;
      sVar58 = (short)uVar4;
      uVar270 = (ushort)(sVar38 < sVar58) * sVar38 | (ushort)(sVar38 >= sVar58) * sVar58;
      sVar40 = (short)((ulong)uVar18 >> 0x10);
      sVar72 = (short)((ulong)uVar4 >> 0x10);
      uVar286 = (ushort)(sVar40 < sVar72) * sVar40 | (ushort)(sVar40 >= sVar72) * sVar72;
      sVar59 = (short)((ulong)uVar18 >> 0x20);
      sVar75 = (short)((ulong)uVar4 >> 0x20);
      uVar287 = (ushort)(sVar59 < sVar75) * sVar59 | (ushort)(sVar59 >= sVar75) * sVar75;
      sVar60 = (short)((ulong)uVar18 >> 0x30);
      sVar76 = (short)((ulong)uVar4 >> 0x30);
      uVar288 = (ushort)(sVar60 < sVar76) * sVar60 | (ushort)(sVar60 >= sVar76) * sVar76;
      sVar63 = (short)((unkuint10)Var24 >> 0x40);
      sVar140 = (short)uVar3;
      uVar289 = (ushort)(sVar63 < sVar140) * sVar63 | (ushort)(sVar63 >= sVar140) * sVar140;
      sVar64 = auVar25._10_2_;
      sVar80 = (short)((ulong)uVar3 >> 0x10);
      uVar290 = (ushort)(sVar64 < sVar80) * sVar64 | (ushort)(sVar64 >= sVar80) * sVar80;
      sVar67 = auVar26._12_2_;
      sVar167 = (short)((ulong)uVar3 >> 0x20);
      sVar86 = (short)((ulong)uVar3 >> 0x30);
      uVar291 = (ushort)(sVar67 < sVar167) * sVar67 | (ushort)(sVar67 >= sVar167) * sVar167;
      sVar68 = auVar57._14_2_;
      uVar292 = (ushort)(sVar68 < sVar86) * sVar68 | (ushort)(sVar68 >= sVar86) * sVar86;
      auVar329._0_2_ = sVar38 - sVar349;
      auVar329._2_2_ = sVar40 - sVar364;
      auVar329._4_2_ = sVar59 - sVar348;
      auVar329._6_2_ = sVar60 - sVar367;
      auVar329._8_2_ = sVar63 - sVar363;
      auVar329._10_2_ = sVar64 - sVar372;
      auVar329._12_2_ = sVar67 - sVar365;
      auVar329._14_2_ = sVar68 - sVar379;
      auVar57 = pabsw(ZEXT416(uVar33),auVar329);
      uVar170 = auVar57._0_2_;
      auVar357._0_2_ = uVar170 >> uVar107;
      uVar186 = auVar57._2_2_;
      auVar357._2_2_ = uVar186 >> uVar107;
      uVar309 = auVar57._4_2_;
      auVar357._4_2_ = uVar309 >> uVar107;
      uVar317 = auVar57._6_2_;
      auVar357._6_2_ = uVar317 >> uVar107;
      uVar333 = auVar57._8_2_;
      auVar357._8_2_ = uVar333 >> uVar107;
      uVar335 = auVar57._10_2_;
      auVar357._10_2_ = uVar335 >> uVar107;
      uVar337 = auVar57._12_2_;
      uVar339 = auVar57._14_2_;
      auVar357._12_2_ = uVar337 >> uVar107;
      auVar357._14_2_ = uVar339 >> uVar107;
      auVar57 = psubusw(local_98,auVar357);
      sVar171 = auVar203._0_2_;
      sVar122 = auVar203._2_2_;
      sVar175 = auVar203._4_2_;
      sVar127 = auVar203._6_2_;
      sVar179 = auVar203._8_2_;
      sVar132 = auVar203._10_2_;
      sVar183 = auVar203._12_2_;
      sVar137 = auVar203._14_2_;
      sVar38 = auVar57._0_2_;
      sVar40 = auVar57._2_2_;
      sVar59 = auVar57._4_2_;
      sVar60 = auVar57._6_2_;
      sVar63 = auVar57._8_2_;
      sVar64 = auVar57._10_2_;
      sVar67 = auVar57._12_2_;
      sVar68 = auVar57._14_2_;
      auVar57 = psraw(auVar299,0xf);
      auVar481._0_2_ =
           (((short)uVar81 < sVar171) * uVar81 | (ushort)((short)uVar81 >= sVar171) * sVar171) +
           auVar57._0_2_;
      auVar481._2_2_ =
           (((short)uVar486 < sVar122) * uVar486 | (ushort)((short)uVar486 >= sVar122) * sVar122) +
           auVar57._2_2_;
      auVar481._4_2_ =
           (((short)uVar87 < sVar175) * uVar87 | (ushort)((short)uVar87 >= sVar175) * sVar175) +
           auVar57._4_2_;
      auVar481._6_2_ =
           (((short)uVar488 < sVar127) * uVar488 | (ushort)((short)uVar488 >= sVar127) * sVar127) +
           auVar57._6_2_;
      auVar481._8_2_ =
           (((short)uVar490 < sVar179) * uVar490 | (ushort)((short)uVar490 >= sVar179) * sVar179) +
           auVar57._8_2_;
      auVar481._10_2_ =
           (((short)uVar492 < sVar132) * uVar492 | (ushort)((short)uVar492 >= sVar132) * sVar132) +
           auVar57._10_2_;
      auVar481._12_2_ =
           (((short)uVar494 < sVar183) * uVar494 | (ushort)((short)uVar494 >= sVar183) * sVar183) +
           auVar57._12_2_;
      auVar481._14_2_ =
           (((short)uVar496 < sVar137) * uVar496 | (ushort)((short)uVar496 >= sVar137) * sVar137) +
           auVar57._14_2_;
      auVar481 = auVar481 ^ auVar57;
      local_68 = auVar237._0_2_;
      sStack_66 = auVar237._2_2_;
      sStack_64 = auVar237._4_2_;
      sStack_62 = auVar237._6_2_;
      sStack_60 = auVar237._8_2_;
      sStack_5e = auVar237._10_2_;
      sStack_5c = auVar237._12_2_;
      sStack_5a = auVar237._14_2_;
      auVar57 = psraw(auVar329,0xf);
      auVar438._0_2_ =
           (((short)uVar170 < sVar38) * uVar170 | (ushort)((short)uVar170 >= sVar38) * sVar38) +
           auVar57._0_2_;
      auVar438._2_2_ =
           (((short)uVar186 < sVar40) * uVar186 | (ushort)((short)uVar186 >= sVar40) * sVar40) +
           auVar57._2_2_;
      auVar438._4_2_ =
           (((short)uVar309 < sVar59) * uVar309 | (ushort)((short)uVar309 >= sVar59) * sVar59) +
           auVar57._4_2_;
      auVar438._6_2_ =
           (((short)uVar317 < sVar60) * uVar317 | (ushort)((short)uVar317 >= sVar60) * sVar60) +
           auVar57._6_2_;
      auVar438._8_2_ =
           (((short)uVar333 < sVar63) * uVar333 | (ushort)((short)uVar333 >= sVar63) * sVar63) +
           auVar57._8_2_;
      auVar438._10_2_ =
           (((short)uVar335 < sVar64) * uVar335 | (ushort)((short)uVar335 >= sVar64) * sVar64) +
           auVar57._10_2_;
      auVar438._12_2_ =
           (((short)uVar337 < sVar67) * uVar337 | (ushort)((short)uVar337 >= sVar67) * sVar67) +
           auVar57._12_2_;
      auVar438._14_2_ =
           (((short)uVar339 < sVar68) * uVar339 | (ushort)((short)uVar339 >= sVar68) * sVar68) +
           auVar57._14_2_;
      auVar438 = auVar438 ^ auVar57;
      local_118 = auVar91._0_2_;
      sStack_116 = auVar91._2_2_;
      sStack_114 = auVar91._4_2_;
      sStack_112 = auVar91._6_2_;
      sStack_110 = auVar91._8_2_;
      sStack_10e = auVar91._10_2_;
      sStack_10c = auVar91._12_2_;
      sStack_10a = auVar91._14_2_;
      auVar57 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar37][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar37][1]),0);
      sVar171 = auVar57._0_2_;
      sVar122 = auVar57._2_2_;
      local_158[1] = (bVar123 < bVar214) * bVar214 | (bVar123 >= bVar214) * bVar123;
      local_158[0] = (bVar121 < bVar213) * bVar213 | (bVar121 >= bVar213) * bVar121;
      local_158[2] = (bVar124 < bVar215) * bVar215 | (bVar124 >= bVar215) * bVar124;
      local_158[3] = (bVar125 < bVar216) * bVar216 | (bVar125 >= bVar216) * bVar125;
      local_158[4] = (bVar126 < bVar217) * bVar217 | (bVar126 >= bVar217) * bVar126;
      local_158[5] = (bVar128 < bVar218) * bVar218 | (bVar128 >= bVar218) * bVar128;
      local_158[6] = (bVar129 < bVar219) * bVar219 | (bVar129 >= bVar219) * bVar129;
      local_158[7] = (bVar130 < bVar220) * bVar220 | (bVar130 >= bVar220) * bVar130;
      local_158[8] = (bVar131 < bVar221) * bVar221 | (bVar131 >= bVar221) * bVar131;
      local_158[9] = (bVar133 < bVar222) * bVar222 | (bVar133 >= bVar222) * bVar133;
      local_158[10] = (bVar134 < bVar223) * bVar223 | (bVar134 >= bVar223) * bVar134;
      local_158[0xb] = (bVar135 < bVar224) * bVar224 | (bVar135 >= bVar224) * bVar135;
      local_158[0xc] = (bVar136 < bVar225) * bVar225 | (bVar136 >= bVar225) * bVar136;
      local_158[0xd] = (bVar138 < bVar226) * bVar226 | (bVar138 >= bVar226) * bVar138;
      local_158[0xe] = (bVar194 < bVar227) * bVar227 | (bVar194 >= bVar227) * bVar194;
      local_158[0xf] = (bVar212 < bVar241) * bVar241 | (bVar212 >= bVar241) * bVar212;
      auVar143._0_2_ =
           ((short)uVar41 < (short)uVar139) * uVar41 | ((short)uVar41 >= (short)uVar139) * uVar139;
      auVar143._2_2_ =
           ((short)uVar61 < (short)uVar178) * uVar61 | ((short)uVar61 >= (short)uVar178) * uVar178;
      auVar143._4_2_ =
           ((short)uVar65 < (short)uVar293) * uVar65 | ((short)uVar65 >= (short)uVar293) * uVar293;
      auVar143._6_2_ =
           ((short)uVar477 < (short)uVar313) * uVar477 |
           ((short)uVar477 >= (short)uVar313) * uVar313;
      auVar143._8_2_ =
           ((short)uVar69 < (short)uVar322) * uVar69 | ((short)uVar69 >= (short)uVar322) * uVar322;
      auVar143._10_2_ =
           ((short)uVar73 < (short)uVar334) * uVar73 | ((short)uVar73 >= (short)uVar334) * uVar334;
      auVar143._12_2_ =
           ((short)uVar484 < (short)uVar336) * uVar484 |
           ((short)uVar484 >= (short)uVar336) * uVar336;
      auVar143._14_2_ =
           ((short)uVar77 < (short)uVar338) * uVar77 | ((short)uVar77 >= (short)uVar338) * uVar338;
      uVar139 = ((short)auVar206._0_2_ < (short)uVar78) * auVar206._0_2_ |
                ((short)auVar206._0_2_ >= (short)uVar78) * uVar78;
      uVar170 = ((short)auVar206._2_2_ < (short)uVar83) * auVar206._2_2_ |
                ((short)auVar206._2_2_ >= (short)uVar83) * uVar83;
      uVar178 = ((short)auVar206._4_2_ < (short)uVar82) * auVar206._4_2_ |
                ((short)auVar206._4_2_ >= (short)uVar82) * uVar82;
      uVar186 = ((short)auVar206._6_2_ < (short)uVar84) * auVar206._6_2_ |
                ((short)auVar206._6_2_ >= (short)uVar84) * uVar84;
      uVar293 = ((short)auVar206._8_2_ < (short)uVar89) * auVar206._8_2_ |
                ((short)auVar206._8_2_ >= (short)uVar89) * uVar89;
      uVar309 = ((short)auVar206._10_2_ < (short)uVar88) * auVar206._10_2_ |
                ((short)auVar206._10_2_ >= (short)uVar88) * uVar88;
      uVar313 = ((short)auVar206._12_2_ < (short)uVar90) * auVar206._12_2_ |
                ((short)auVar206._12_2_ >= (short)uVar90) * uVar90;
      uVar317 = ((short)auVar206._14_2_ < (short)uVar319) * auVar206._14_2_ |
                ((short)auVar206._14_2_ >= (short)uVar319) * uVar319;
      auVar300._0_2_ = sVar42 - sVar294;
      auVar300._2_2_ = sVar62 - sVar308;
      auVar300._4_2_ = sVar66 - sVar310;
      auVar300._6_2_ = sVar70 - sVar312;
      auVar300._8_2_ = sVar74 - sVar314;
      auVar300._10_2_ = sVar79 - sVar316;
      auVar300._12_2_ = sVar85 - sVar318;
      auVar300._14_2_ = sVar191 - sVar321;
      auVar101._0_2_ = sVar58 - sVar349;
      auVar101._2_2_ = sVar72 - sVar364;
      auVar101._4_2_ = sVar75 - sVar348;
      auVar101._6_2_ = sVar76 - sVar367;
      auVar101._8_2_ = sVar140 - sVar363;
      auVar101._10_2_ = sVar80 - sVar372;
      auVar101._12_2_ = sVar167 - sVar365;
      auVar101._14_2_ = sVar86 - sVar379;
      auVar57 = pabsw(auVar143,auVar300);
      local_198._4_4_ = 0;
      uVar41 = auVar57._0_2_;
      auVar115._0_2_ = uVar41 >> local_198._0_8_;
      uVar61 = auVar57._2_2_;
      auVar115._2_2_ = uVar61 >> local_198._0_8_;
      uVar65 = auVar57._4_2_;
      auVar115._4_2_ = uVar65 >> local_198._0_8_;
      uVar477 = auVar57._6_2_;
      auVar115._6_2_ = uVar477 >> local_198._0_8_;
      uVar69 = auVar57._8_2_;
      auVar115._8_2_ = uVar69 >> local_198._0_8_;
      uVar73 = auVar57._10_2_;
      auVar115._10_2_ = uVar73 >> local_198._0_8_;
      uVar484 = auVar57._12_2_;
      uVar77 = auVar57._14_2_;
      auVar115._12_2_ = uVar484 >> local_198._0_8_;
      auVar115._14_2_ = uVar77 >> local_198._0_8_;
      auVar57 = pabsw(auVar206,auVar101);
      uVar81 = auVar57._0_2_;
      auVar238._0_2_ = uVar81 >> local_198._0_8_;
      uVar486 = auVar57._2_2_;
      auVar238._2_2_ = uVar486 >> local_198._0_8_;
      uVar87 = auVar57._4_2_;
      auVar238._4_2_ = uVar87 >> local_198._0_8_;
      uVar488 = auVar57._6_2_;
      auVar238._6_2_ = uVar488 >> local_198._0_8_;
      uVar490 = auVar57._8_2_;
      auVar238._8_2_ = uVar490 >> local_198._0_8_;
      uVar492 = auVar57._10_2_;
      auVar238._10_2_ = uVar492 >> local_198._0_8_;
      uVar494 = auVar57._12_2_;
      uVar496 = auVar57._14_2_;
      auVar238._12_2_ = uVar494 >> local_198._0_8_;
      auVar238._14_2_ = uVar496 >> local_198._0_8_;
      auVar203 = psubusw(local_168,auVar115);
      auVar57 = psubusw(local_168,auVar238);
      sVar42 = auVar203._0_2_;
      sVar62 = auVar203._2_2_;
      sVar66 = auVar203._4_2_;
      sVar70 = auVar203._6_2_;
      sVar74 = auVar203._8_2_;
      sVar79 = auVar203._10_2_;
      sVar85 = auVar203._12_2_;
      sVar191 = auVar203._14_2_;
      sVar38 = auVar57._0_2_;
      sVar40 = auVar57._2_2_;
      sVar59 = auVar57._4_2_;
      sVar60 = auVar57._6_2_;
      sVar63 = auVar57._8_2_;
      sVar64 = auVar57._10_2_;
      sVar67 = auVar57._12_2_;
      sVar68 = auVar57._14_2_;
      auVar203 = psraw(auVar300,0xf);
      auVar57 = psraw(auVar101,0xf);
      auVar161._0_2_ =
           (((short)uVar41 < sVar42) * uVar41 | (ushort)((short)uVar41 >= sVar42) * sVar42) +
           auVar203._0_2_;
      auVar161._2_2_ =
           (((short)uVar61 < sVar62) * uVar61 | (ushort)((short)uVar61 >= sVar62) * sVar62) +
           auVar203._2_2_;
      auVar161._4_2_ =
           (((short)uVar65 < sVar66) * uVar65 | (ushort)((short)uVar65 >= sVar66) * sVar66) +
           auVar203._4_2_;
      auVar161._6_2_ =
           (((short)uVar477 < sVar70) * uVar477 | (ushort)((short)uVar477 >= sVar70) * sVar70) +
           auVar203._6_2_;
      auVar161._8_2_ =
           (((short)uVar69 < sVar74) * uVar69 | (ushort)((short)uVar69 >= sVar74) * sVar74) +
           auVar203._8_2_;
      auVar161._10_2_ =
           (((short)uVar73 < sVar79) * uVar73 | (ushort)((short)uVar73 >= sVar79) * sVar79) +
           auVar203._10_2_;
      auVar161._12_2_ =
           (((short)uVar484 < sVar85) * uVar484 | (ushort)((short)uVar484 >= sVar85) * sVar85) +
           auVar203._12_2_;
      auVar161._14_2_ =
           (((short)uVar77 < sVar191) * uVar77 | (ushort)((short)uVar77 >= sVar191) * sVar191) +
           auVar203._14_2_;
      auVar116._0_2_ =
           (((short)uVar81 < sVar38) * uVar81 | (ushort)((short)uVar81 >= sVar38) * sVar38) +
           auVar57._0_2_;
      auVar116._2_2_ =
           (((short)uVar486 < sVar40) * uVar486 | (ushort)((short)uVar486 >= sVar40) * sVar40) +
           auVar57._2_2_;
      auVar116._4_2_ =
           (((short)uVar87 < sVar59) * uVar87 | (ushort)((short)uVar87 >= sVar59) * sVar59) +
           auVar57._4_2_;
      auVar116._6_2_ =
           (((short)uVar488 < sVar60) * uVar488 | (ushort)((short)uVar488 >= sVar60) * sVar60) +
           auVar57._6_2_;
      auVar116._8_2_ =
           (((short)uVar490 < sVar63) * uVar490 | (ushort)((short)uVar490 >= sVar63) * sVar63) +
           auVar57._8_2_;
      auVar116._10_2_ =
           (((short)uVar492 < sVar64) * uVar492 | (ushort)((short)uVar492 >= sVar64) * sVar64) +
           auVar57._10_2_;
      auVar116._12_2_ =
           (((short)uVar494 < sVar67) * uVar494 | (ushort)((short)uVar494 >= sVar67) * sVar67) +
           auVar57._12_2_;
      auVar116._14_2_ =
           (((short)uVar496 < sVar68) * uVar496 | (ushort)((short)uVar496 >= sVar68) * sVar68) +
           auVar57._14_2_;
      auVar161 = auVar161 ^ auVar203;
      auVar116 = auVar116 ^ auVar57;
      uVar5 = *(undefined8 *)(in + -lVar28);
      uVar6 = *(undefined8 *)(in + (0x90 - lVar28));
      local_1b8 = (byte)uVar19;
      bStack_1b7 = (byte)((ulong)uVar19 >> 8);
      bStack_1b6 = (byte)((ulong)uVar19 >> 0x10);
      bStack_1b5 = (byte)((ulong)uVar19 >> 0x18);
      bStack_1b4 = (byte)((ulong)uVar19 >> 0x20);
      bStack_1b3 = (byte)((ulong)uVar19 >> 0x28);
      bStack_1b2 = (byte)((ulong)uVar19 >> 0x30);
      bStack_1b1 = (byte)((ulong)uVar19 >> 0x38);
      bStack_1b0 = (byte)uVar17;
      bStack_1af = (byte)((ulong)uVar17 >> 8);
      bStack_1ae = (byte)((ulong)uVar17 >> 0x10);
      bStack_1ad = (byte)((ulong)uVar17 >> 0x18);
      bStack_1ac = (byte)((ulong)uVar17 >> 0x20);
      bStack_1ab = (byte)((ulong)uVar17 >> 0x28);
      bStack_1aa = (byte)((ulong)uVar17 >> 0x30);
      bStack_1a9 = (byte)((ulong)uVar17 >> 0x38);
      bVar269 = (byte)uVar6;
      bVar106 = (local_1b8 < bVar269) * bVar269 | (local_1b8 >= bVar269) * local_1b8;
      bVar269 = (byte)((ulong)uVar6 >> 8);
      bVar121 = (bStack_1b7 < bVar269) * bVar269 | (bStack_1b7 >= bVar269) * bStack_1b7;
      bVar269 = (byte)((ulong)uVar6 >> 0x10);
      bVar124 = (bStack_1b6 < bVar269) * bVar269 | (bStack_1b6 >= bVar269) * bStack_1b6;
      bVar269 = (byte)((ulong)uVar6 >> 0x18);
      bVar126 = (bStack_1b5 < bVar269) * bVar269 | (bStack_1b5 >= bVar269) * bStack_1b5;
      bVar269 = (byte)((ulong)uVar6 >> 0x20);
      bVar129 = (bStack_1b4 < bVar269) * bVar269 | (bStack_1b4 >= bVar269) * bStack_1b4;
      bVar269 = (byte)((ulong)uVar6 >> 0x28);
      bVar131 = (bStack_1b3 < bVar269) * bVar269 | (bStack_1b3 >= bVar269) * bStack_1b3;
      bVar269 = (byte)((ulong)uVar6 >> 0x30);
      bVar134 = (bStack_1b2 < bVar269) * bVar269 | (bStack_1b2 >= bVar269) * bStack_1b2;
      bVar269 = (byte)((ulong)uVar6 >> 0x38);
      bVar136 = (bStack_1b1 < bVar269) * bVar269 | (bStack_1b1 >= bVar269) * bStack_1b1;
      bVar269 = (byte)uVar5;
      bVar194 = (bStack_1b0 < bVar269) * bVar269 | (bStack_1b0 >= bVar269) * bStack_1b0;
      bVar269 = (byte)((ulong)uVar5 >> 8);
      bVar213 = (bStack_1af < bVar269) * bVar269 | (bStack_1af >= bVar269) * bStack_1af;
      bVar269 = (byte)((ulong)uVar5 >> 0x10);
      bVar215 = (bStack_1ae < bVar269) * bVar269 | (bStack_1ae >= bVar269) * bStack_1ae;
      bVar269 = (byte)((ulong)uVar5 >> 0x18);
      bVar217 = (bStack_1ad < bVar269) * bVar269 | (bStack_1ad >= bVar269) * bStack_1ad;
      bVar269 = (byte)((ulong)uVar5 >> 0x20);
      bVar219 = (bStack_1ac < bVar269) * bVar269 | (bStack_1ac >= bVar269) * bStack_1ac;
      bVar269 = (byte)((ulong)uVar5 >> 0x28);
      bVar221 = (bStack_1ab < bVar269) * bVar269 | (bStack_1ab >= bVar269) * bStack_1ab;
      bVar269 = (byte)((ulong)uVar5 >> 0x30);
      bVar223 = (bStack_1aa < bVar269) * bVar269 | (bStack_1aa >= bVar269) * bStack_1aa;
      bVar269 = (byte)((ulong)uVar5 >> 0x38);
      bVar225 = (bStack_1a9 < bVar269) * bVar269 | (bStack_1a9 >= bVar269) * bStack_1a9;
      sVar38 = (short)uVar6;
      uVar322 = (ushort)(sVar38 < (short)uVar166) * sVar38 | (sVar38 >= (short)uVar166) * uVar166;
      sVar40 = (short)((ulong)uVar6 >> 0x10);
      uVar333 = (ushort)(sVar40 < (short)uVar174) * sVar40 | (sVar40 >= (short)uVar174) * uVar174;
      sVar59 = (short)((ulong)uVar6 >> 0x20);
      uVar334 = (ushort)(sVar59 < (short)uVar182) * sVar59 | (sVar59 >= (short)uVar182) * uVar182;
      sVar60 = (short)((ulong)uVar6 >> 0x30);
      uVar335 = (ushort)(sVar60 < (short)uVar190) * sVar60 | (sVar60 >= (short)uVar190) * uVar190;
      sVar63 = (short)uVar5;
      uVar336 = (ushort)(sVar63 < (short)uVar307) * sVar63 | (sVar63 >= (short)uVar307) * uVar307;
      sVar64 = (short)((ulong)uVar5 >> 0x10);
      uVar337 = (ushort)(sVar64 < (short)uVar311) * sVar64 | (sVar64 >= (short)uVar311) * uVar311;
      sVar67 = (short)((ulong)uVar5 >> 0x20);
      uVar338 = (ushort)(sVar67 < (short)uVar315) * sVar67 | (sVar67 >= (short)uVar315) * uVar315;
      sVar68 = (short)((ulong)uVar5 >> 0x30);
      uVar339 = (ushort)(sVar68 < (short)uVar320) * sVar68 | (sVar68 >= (short)uVar320) * uVar320;
      auVar207._0_2_ = sVar38 - sVar294;
      auVar207._2_2_ = sVar40 - sVar308;
      auVar207._4_2_ = sVar59 - sVar310;
      auVar207._6_2_ = sVar60 - sVar312;
      auVar207._8_2_ = sVar63 - sVar314;
      auVar207._10_2_ = sVar64 - sVar316;
      auVar207._12_2_ = sVar67 - sVar318;
      auVar207._14_2_ = sVar68 - sVar321;
      auVar57 = pabsw(auVar384,auVar207);
      uVar41 = auVar57._0_2_;
      auVar102._0_2_ = uVar41 >> local_198._0_8_;
      uVar61 = auVar57._2_2_;
      auVar102._2_2_ = uVar61 >> local_198._0_8_;
      uVar65 = auVar57._4_2_;
      auVar102._4_2_ = uVar65 >> local_198._0_8_;
      uVar477 = auVar57._6_2_;
      auVar102._6_2_ = uVar477 >> local_198._0_8_;
      uVar69 = auVar57._8_2_;
      auVar102._8_2_ = uVar69 >> local_198._0_8_;
      uVar73 = auVar57._10_2_;
      auVar102._10_2_ = uVar73 >> local_198._0_8_;
      uVar484 = auVar57._12_2_;
      uVar77 = auVar57._14_2_;
      auVar102._12_2_ = uVar484 >> local_198._0_8_;
      auVar102._14_2_ = uVar77 >> local_198._0_8_;
      uVar5 = *(undefined8 *)(in + (0x120 - lVar28));
      uVar6 = *(undefined8 *)(in + (0x1b0 - lVar28));
      auVar203 = psubusw(local_168,auVar102);
      local_1f8 = (byte)uVar4;
      bStack_1f7 = (byte)((ulong)uVar4 >> 8);
      bStack_1f6 = (byte)((ulong)uVar4 >> 0x10);
      bStack_1f5 = (byte)((ulong)uVar4 >> 0x18);
      bStack_1f4 = (byte)((ulong)uVar4 >> 0x20);
      bStack_1f3 = (byte)((ulong)uVar4 >> 0x28);
      bStack_1f2 = (byte)((ulong)uVar4 >> 0x30);
      bStack_1f1 = (byte)((ulong)uVar4 >> 0x38);
      bStack_1f0 = (byte)uVar3;
      bStack_1ef = (byte)((ulong)uVar3 >> 8);
      bStack_1ee = (byte)((ulong)uVar3 >> 0x10);
      bStack_1ed = (byte)((ulong)uVar3 >> 0x18);
      bStack_1ec = (byte)((ulong)uVar3 >> 0x20);
      bStack_1eb = (byte)((ulong)uVar3 >> 0x28);
      bStack_1ea = (byte)((ulong)uVar3 >> 0x30);
      bStack_1e9 = (byte)((ulong)uVar3 >> 0x38);
      bVar269 = (byte)uVar6;
      bVar120 = (local_1f8 < bVar269) * bVar269 | (local_1f8 >= bVar269) * local_1f8;
      bVar269 = (byte)((ulong)uVar6 >> 8);
      bVar123 = (bStack_1f7 < bVar269) * bVar269 | (bStack_1f7 >= bVar269) * bStack_1f7;
      bVar269 = (byte)((ulong)uVar6 >> 0x10);
      bVar125 = (bStack_1f6 < bVar269) * bVar269 | (bStack_1f6 >= bVar269) * bStack_1f6;
      bVar269 = (byte)((ulong)uVar6 >> 0x18);
      bVar128 = (bStack_1f5 < bVar269) * bVar269 | (bStack_1f5 >= bVar269) * bStack_1f5;
      bVar269 = (byte)((ulong)uVar6 >> 0x20);
      bVar130 = (bStack_1f4 < bVar269) * bVar269 | (bStack_1f4 >= bVar269) * bStack_1f4;
      bVar269 = (byte)((ulong)uVar6 >> 0x28);
      bVar133 = (bStack_1f3 < bVar269) * bVar269 | (bStack_1f3 >= bVar269) * bStack_1f3;
      bVar269 = (byte)((ulong)uVar6 >> 0x30);
      bVar135 = (bStack_1f2 < bVar269) * bVar269 | (bStack_1f2 >= bVar269) * bStack_1f2;
      bVar269 = (byte)((ulong)uVar6 >> 0x38);
      bVar138 = (bStack_1f1 < bVar269) * bVar269 | (bStack_1f1 >= bVar269) * bStack_1f1;
      bVar269 = (byte)uVar5;
      bVar212 = (bStack_1f0 < bVar269) * bVar269 | (bStack_1f0 >= bVar269) * bStack_1f0;
      bVar269 = (byte)((ulong)uVar5 >> 8);
      bVar214 = (bStack_1ef < bVar269) * bVar269 | (bStack_1ef >= bVar269) * bStack_1ef;
      bVar269 = (byte)((ulong)uVar5 >> 0x10);
      bVar216 = (bStack_1ee < bVar269) * bVar269 | (bStack_1ee >= bVar269) * bStack_1ee;
      bVar269 = (byte)((ulong)uVar5 >> 0x18);
      bVar218 = (bStack_1ed < bVar269) * bVar269 | (bStack_1ed >= bVar269) * bStack_1ed;
      bVar269 = (byte)((ulong)uVar5 >> 0x20);
      bVar220 = (bStack_1ec < bVar269) * bVar269 | (bStack_1ec >= bVar269) * bStack_1ec;
      bVar269 = (byte)((ulong)uVar5 >> 0x28);
      bVar222 = (bStack_1eb < bVar269) * bVar269 | (bStack_1eb >= bVar269) * bStack_1eb;
      bVar269 = (byte)((ulong)uVar5 >> 0x30);
      bVar224 = (bStack_1ea < bVar269) * bVar269 | (bStack_1ea >= bVar269) * bStack_1ea;
      bVar269 = (byte)((ulong)uVar5 >> 0x38);
      bVar226 = (bStack_1e9 < bVar269) * bVar269 | (bStack_1e9 >= bVar269) * bStack_1e9;
      sVar38 = (short)uVar6;
      auVar195._0_2_ =
           (ushort)(sVar38 < (short)uVar270) * sVar38 | (sVar38 >= (short)uVar270) * uVar270;
      sVar40 = (short)((ulong)uVar6 >> 0x10);
      auVar195._2_2_ =
           (ushort)(sVar40 < (short)uVar286) * sVar40 | (sVar40 >= (short)uVar286) * uVar286;
      sVar59 = (short)((ulong)uVar6 >> 0x20);
      auVar195._4_2_ =
           (ushort)(sVar59 < (short)uVar287) * sVar59 | (sVar59 >= (short)uVar287) * uVar287;
      sVar60 = (short)((ulong)uVar6 >> 0x30);
      auVar195._6_2_ =
           (ushort)(sVar60 < (short)uVar288) * sVar60 | (sVar60 >= (short)uVar288) * uVar288;
      sVar63 = (short)uVar5;
      auVar195._8_2_ =
           (ushort)(sVar63 < (short)uVar289) * sVar63 | (sVar63 >= (short)uVar289) * uVar289;
      sVar64 = (short)((ulong)uVar5 >> 0x10);
      auVar195._10_2_ =
           (ushort)(sVar64 < (short)uVar290) * sVar64 | (sVar64 >= (short)uVar290) * uVar290;
      sVar67 = (short)((ulong)uVar5 >> 0x20);
      auVar195._12_2_ =
           (ushort)(sVar67 < (short)uVar291) * sVar67 | (sVar67 >= (short)uVar291) * uVar291;
      sVar68 = (short)((ulong)uVar5 >> 0x30);
      auVar195._14_2_ =
           (ushort)(sVar68 < (short)uVar292) * sVar68 | (sVar68 >= (short)uVar292) * uVar292;
      auVar282._0_2_ = sVar38 - sVar349;
      auVar282._2_2_ = sVar40 - sVar364;
      auVar282._4_2_ = sVar59 - sVar348;
      auVar282._6_2_ = sVar60 - sVar367;
      auVar282._8_2_ = sVar63 - sVar363;
      auVar282._10_2_ = sVar64 - sVar372;
      auVar282._12_2_ = sVar67 - sVar365;
      auVar282._14_2_ = sVar68 - sVar379;
      auVar57 = pabsw(auVar195,auVar282);
      uVar81 = auVar57._0_2_;
      auVar330._0_2_ = uVar81 >> local_198._0_8_;
      uVar486 = auVar57._2_2_;
      auVar330._2_2_ = uVar486 >> local_198._0_8_;
      uVar87 = auVar57._4_2_;
      auVar330._4_2_ = uVar87 >> local_198._0_8_;
      uVar488 = auVar57._6_2_;
      auVar330._6_2_ = uVar488 >> local_198._0_8_;
      uVar490 = auVar57._8_2_;
      auVar330._8_2_ = uVar490 >> local_198._0_8_;
      uVar492 = auVar57._10_2_;
      auVar330._10_2_ = uVar492 >> local_198._0_8_;
      uVar494 = auVar57._12_2_;
      uVar496 = auVar57._14_2_;
      auVar330._12_2_ = uVar494 >> local_198._0_8_;
      auVar330._14_2_ = uVar496 >> local_198._0_8_;
      auVar57 = psubusw(local_168,auVar330);
      sVar42 = auVar203._0_2_;
      sVar62 = auVar203._2_2_;
      sVar66 = auVar203._4_2_;
      sVar70 = auVar203._6_2_;
      sVar74 = auVar203._8_2_;
      sVar79 = auVar203._10_2_;
      sVar85 = auVar203._12_2_;
      sVar191 = auVar203._14_2_;
      sVar38 = auVar57._0_2_;
      sVar40 = auVar57._2_2_;
      sVar59 = auVar57._4_2_;
      sVar60 = auVar57._6_2_;
      sVar63 = auVar57._8_2_;
      sVar64 = auVar57._10_2_;
      sVar67 = auVar57._12_2_;
      sVar68 = auVar57._14_2_;
      auVar57 = psraw(auVar207,0xf);
      auVar358._0_2_ =
           (((short)uVar41 < sVar42) * uVar41 | (ushort)((short)uVar41 >= sVar42) * sVar42) +
           auVar57._0_2_;
      auVar358._2_2_ =
           (((short)uVar61 < sVar62) * uVar61 | (ushort)((short)uVar61 >= sVar62) * sVar62) +
           auVar57._2_2_;
      auVar358._4_2_ =
           (((short)uVar65 < sVar66) * uVar65 | (ushort)((short)uVar65 >= sVar66) * sVar66) +
           auVar57._4_2_;
      auVar358._6_2_ =
           (((short)uVar477 < sVar70) * uVar477 | (ushort)((short)uVar477 >= sVar70) * sVar70) +
           auVar57._6_2_;
      auVar358._8_2_ =
           (((short)uVar69 < sVar74) * uVar69 | (ushort)((short)uVar69 >= sVar74) * sVar74) +
           auVar57._8_2_;
      auVar358._10_2_ =
           (((short)uVar73 < sVar79) * uVar73 | (ushort)((short)uVar73 >= sVar79) * sVar79) +
           auVar57._10_2_;
      auVar358._12_2_ =
           (((short)uVar484 < sVar85) * uVar484 | (ushort)((short)uVar484 >= sVar85) * sVar85) +
           auVar57._12_2_;
      auVar358._14_2_ =
           (((short)uVar77 < sVar191) * uVar77 | (ushort)((short)uVar77 >= sVar191) * sVar191) +
           auVar57._14_2_;
      auVar358 = auVar358 ^ auVar57;
      auVar57 = psraw(auVar282,0xf);
      auVar301._0_2_ =
           (((short)uVar81 < sVar38) * uVar81 | (ushort)((short)uVar81 >= sVar38) * sVar38) +
           auVar57._0_2_;
      auVar301._2_2_ =
           (((short)uVar486 < sVar40) * uVar486 | (ushort)((short)uVar486 >= sVar40) * sVar40) +
           auVar57._2_2_;
      auVar301._4_2_ =
           (((short)uVar87 < sVar59) * uVar87 | (ushort)((short)uVar87 >= sVar59) * sVar59) +
           auVar57._4_2_;
      auVar301._6_2_ =
           (((short)uVar488 < sVar60) * uVar488 | (ushort)((short)uVar488 >= sVar60) * sVar60) +
           auVar57._6_2_;
      auVar301._8_2_ =
           (((short)uVar490 < sVar63) * uVar490 | (ushort)((short)uVar490 >= sVar63) * sVar63) +
           auVar57._8_2_;
      auVar301._10_2_ =
           (((short)uVar492 < sVar64) * uVar492 | (ushort)((short)uVar492 >= sVar64) * sVar64) +
           auVar57._10_2_;
      auVar301._12_2_ =
           (((short)uVar494 < sVar67) * uVar494 | (ushort)((short)uVar494 >= sVar67) * sVar67) +
           auVar57._12_2_;
      auVar301._14_2_ =
           (((short)uVar496 < sVar68) * uVar496 | (ushort)((short)uVar496 >= sVar68) * sVar68) +
           auVar57._14_2_;
      auVar301 = auVar301 ^ auVar57;
      uVar3 = *(undefined8 *)(in + lVar36);
      uVar4 = *(undefined8 *)(in + lVar36 + 0x90);
      uVar5 = *(undefined8 *)(in + lVar36 + 0x120);
      uVar6 = *(undefined8 *)(in + lVar36 + 0x1b0);
      uVar7 = *(undefined8 *)(in + -lVar36);
      uVar8 = *(undefined8 *)(in + (0x90 - lVar36));
      uVar9 = *(undefined8 *)(in + (0x120 - lVar36));
      uVar10 = *(undefined8 *)(in + (0x1b0 - lVar36));
      bVar269 = (byte)uVar8;
      bVar227 = (byte)uVar4;
      bVar227 = (bVar227 < bVar269) * bVar269 | (bVar227 >= bVar269) * bVar227;
      bVar269 = (byte)((ulong)uVar8 >> 8);
      bVar241 = (byte)((ulong)uVar4 >> 8);
      bVar241 = (bVar241 < bVar269) * bVar269 | (bVar241 >= bVar269) * bVar241;
      bVar269 = (byte)((ulong)uVar8 >> 0x10);
      bVar242 = (byte)((ulong)uVar4 >> 0x10);
      bVar242 = (bVar242 < bVar269) * bVar269 | (bVar242 >= bVar269) * bVar242;
      bVar269 = (byte)((ulong)uVar8 >> 0x18);
      bVar245 = (byte)((ulong)uVar4 >> 0x18);
      bVar245 = (bVar245 < bVar269) * bVar269 | (bVar245 >= bVar269) * bVar245;
      bVar269 = (byte)((ulong)uVar8 >> 0x20);
      bVar246 = (byte)((ulong)uVar4 >> 0x20);
      bVar246 = (bVar246 < bVar269) * bVar269 | (bVar246 >= bVar269) * bVar246;
      bVar269 = (byte)((ulong)uVar8 >> 0x28);
      bVar249 = (byte)((ulong)uVar4 >> 0x28);
      bVar249 = (bVar249 < bVar269) * bVar269 | (bVar249 >= bVar269) * bVar249;
      bVar269 = (byte)((ulong)uVar8 >> 0x30);
      bVar250 = (byte)((ulong)uVar4 >> 0x30);
      bVar250 = (bVar250 < bVar269) * bVar269 | (bVar250 >= bVar269) * bVar250;
      bVar269 = (byte)((ulong)uVar8 >> 0x38);
      bVar253 = (byte)((ulong)uVar4 >> 0x38);
      bVar253 = (bVar253 < bVar269) * bVar269 | (bVar253 >= bVar269) * bVar253;
      bVar269 = (byte)uVar7;
      bVar254 = (byte)uVar3;
      bVar254 = (bVar254 < bVar269) * bVar269 | (bVar254 >= bVar269) * bVar254;
      bVar269 = (byte)((ulong)uVar7 >> 8);
      bVar257 = (byte)((ulong)uVar3 >> 8);
      bVar257 = (bVar257 < bVar269) * bVar269 | (bVar257 >= bVar269) * bVar257;
      bVar269 = (byte)((ulong)uVar7 >> 0x10);
      bVar258 = (byte)((ulong)uVar3 >> 0x10);
      bVar258 = (bVar258 < bVar269) * bVar269 | (bVar258 >= bVar269) * bVar258;
      bVar269 = (byte)((ulong)uVar7 >> 0x18);
      bVar261 = (byte)((ulong)uVar3 >> 0x18);
      bVar261 = (bVar261 < bVar269) * bVar269 | (bVar261 >= bVar269) * bVar261;
      bVar269 = (byte)((ulong)uVar7 >> 0x20);
      bVar262 = (byte)((ulong)uVar3 >> 0x20);
      bVar262 = (bVar262 < bVar269) * bVar269 | (bVar262 >= bVar269) * bVar262;
      bVar269 = (byte)((ulong)uVar7 >> 0x28);
      bVar265 = (byte)((ulong)uVar3 >> 0x28);
      bVar265 = (bVar265 < bVar269) * bVar269 | (bVar265 >= bVar269) * bVar265;
      bVar269 = (byte)((ulong)uVar7 >> 0x30);
      bVar266 = (byte)((ulong)uVar3 >> 0x30);
      bVar375 = (byte)((ulong)uVar3 >> 0x38);
      bVar266 = (bVar266 < bVar269) * bVar269 | (bVar266 >= bVar269) * bVar266;
      bVar269 = (byte)((ulong)uVar7 >> 0x38);
      bVar375 = (bVar375 < bVar269) * bVar269 | (bVar375 >= bVar269) * bVar375;
      sVar38 = (short)uVar4;
      sVar42 = (short)uVar8;
      uVar41 = (ushort)(sVar38 < sVar42) * sVar38 | (ushort)(sVar38 >= sVar42) * sVar42;
      sVar40 = (short)((ulong)uVar4 >> 0x10);
      sVar62 = (short)((ulong)uVar8 >> 0x10);
      uVar61 = (ushort)(sVar40 < sVar62) * sVar40 | (ushort)(sVar40 >= sVar62) * sVar62;
      sVar59 = (short)((ulong)uVar4 >> 0x20);
      sVar66 = (short)((ulong)uVar8 >> 0x20);
      uVar65 = (ushort)(sVar59 < sVar66) * sVar59 | (ushort)(sVar59 >= sVar66) * sVar66;
      sVar60 = (short)((ulong)uVar4 >> 0x30);
      sVar70 = (short)((ulong)uVar8 >> 0x30);
      uVar477 = (ushort)(sVar60 < sVar70) * sVar60 | (ushort)(sVar60 >= sVar70) * sVar70;
      sVar63 = (short)uVar3;
      sVar74 = (short)uVar7;
      uVar73 = (ushort)(sVar63 < sVar74) * sVar63 | (ushort)(sVar63 >= sVar74) * sVar74;
      sVar64 = (short)((ulong)uVar3 >> 0x10);
      sVar79 = (short)((ulong)uVar7 >> 0x10);
      uVar484 = (ushort)(sVar64 < sVar79) * sVar64 | (ushort)(sVar64 >= sVar79) * sVar79;
      sVar67 = (short)((ulong)uVar3 >> 0x20);
      sVar85 = (short)((ulong)uVar7 >> 0x20);
      sVar191 = (short)((ulong)uVar7 >> 0x30);
      uVar81 = (ushort)(sVar67 < sVar85) * sVar67 | (ushort)(sVar67 >= sVar85) * sVar85;
      sVar68 = (short)((ulong)uVar3 >> 0x30);
      uVar486 = (ushort)(sVar68 < sVar191) * sVar68 | (ushort)(sVar68 >= sVar191) * sVar191;
      auVar239._0_2_ = sVar38 - sVar294;
      auVar239._2_2_ = sVar40 - sVar308;
      auVar239._4_2_ = sVar59 - sVar310;
      auVar239._6_2_ = sVar60 - sVar312;
      auVar239._8_2_ = sVar63 - sVar314;
      auVar239._10_2_ = sVar64 - sVar316;
      auVar239._12_2_ = sVar67 - sVar318;
      auVar239._14_2_ = sVar68 - sVar321;
      bVar269 = (byte)uVar10;
      bVar376 = (byte)uVar6;
      bVar376 = (bVar376 < bVar269) * bVar269 | (bVar376 >= bVar269) * bVar376;
      bVar269 = (byte)((ulong)uVar10 >> 8);
      bVar380 = (byte)((ulong)uVar6 >> 8);
      bVar380 = (bVar380 < bVar269) * bVar269 | (bVar380 >= bVar269) * bVar380;
      bVar269 = (byte)((ulong)uVar10 >> 0x10);
      bVar386 = (byte)((ulong)uVar6 >> 0x10);
      bVar386 = (bVar386 < bVar269) * bVar269 | (bVar386 >= bVar269) * bVar386;
      bVar269 = (byte)((ulong)uVar10 >> 0x18);
      bVar389 = (byte)((ulong)uVar6 >> 0x18);
      bVar389 = (bVar389 < bVar269) * bVar269 | (bVar389 >= bVar269) * bVar389;
      bVar269 = (byte)((ulong)uVar10 >> 0x20);
      bVar390 = (byte)((ulong)uVar6 >> 0x20);
      bVar390 = (bVar390 < bVar269) * bVar269 | (bVar390 >= bVar269) * bVar390;
      bVar269 = (byte)((ulong)uVar10 >> 0x28);
      bVar393 = (byte)((ulong)uVar6 >> 0x28);
      bVar393 = (bVar393 < bVar269) * bVar269 | (bVar393 >= bVar269) * bVar393;
      bVar269 = (byte)((ulong)uVar10 >> 0x30);
      bVar394 = (byte)((ulong)uVar6 >> 0x30);
      bVar394 = (bVar394 < bVar269) * bVar269 | (bVar394 >= bVar269) * bVar394;
      bVar269 = (byte)((ulong)uVar10 >> 0x38);
      bVar397 = (byte)((ulong)uVar6 >> 0x38);
      bVar397 = (bVar397 < bVar269) * bVar269 | (bVar397 >= bVar269) * bVar397;
      bVar269 = (byte)uVar9;
      bVar398 = (byte)uVar5;
      bVar398 = (bVar398 < bVar269) * bVar269 | (bVar398 >= bVar269) * bVar398;
      bVar269 = (byte)((ulong)uVar9 >> 8);
      bVar401 = (byte)((ulong)uVar5 >> 8);
      bVar401 = (bVar401 < bVar269) * bVar269 | (bVar401 >= bVar269) * bVar401;
      bVar269 = (byte)((ulong)uVar9 >> 0x10);
      bVar402 = (byte)((ulong)uVar5 >> 0x10);
      bVar402 = (bVar402 < bVar269) * bVar269 | (bVar402 >= bVar269) * bVar402;
      bVar269 = (byte)((ulong)uVar9 >> 0x18);
      bVar404 = (byte)((ulong)uVar5 >> 0x18);
      bVar404 = (bVar404 < bVar269) * bVar269 | (bVar404 >= bVar269) * bVar404;
      bVar269 = (byte)((ulong)uVar9 >> 0x20);
      bVar405 = (byte)((ulong)uVar5 >> 0x20);
      bVar405 = (bVar405 < bVar269) * bVar269 | (bVar405 >= bVar269) * bVar405;
      bVar269 = (byte)((ulong)uVar9 >> 0x28);
      bVar407 = (byte)((ulong)uVar5 >> 0x28);
      bVar407 = (bVar407 < bVar269) * bVar269 | (bVar407 >= bVar269) * bVar407;
      bVar269 = (byte)((ulong)uVar9 >> 0x30);
      bVar408 = (byte)((ulong)uVar5 >> 0x30);
      bVar410 = (byte)((ulong)uVar5 >> 0x38);
      bVar408 = (bVar408 < bVar269) * bVar269 | (bVar408 >= bVar269) * bVar408;
      bVar269 = (byte)((ulong)uVar9 >> 0x38);
      bVar410 = (bVar410 < bVar269) * bVar269 | (bVar410 >= bVar269) * bVar410;
      sVar38 = (short)uVar6;
      sVar58 = (short)uVar10;
      uVar83 = (ushort)(sVar38 < sVar58) * sVar38 | (ushort)(sVar38 >= sVar58) * sVar58;
      sVar40 = (short)((ulong)uVar6 >> 0x10);
      sVar72 = (short)((ulong)uVar10 >> 0x10);
      uVar89 = (ushort)(sVar40 < sVar72) * sVar40 | (ushort)(sVar40 >= sVar72) * sVar72;
      sVar59 = (short)((ulong)uVar6 >> 0x20);
      sVar75 = (short)((ulong)uVar10 >> 0x20);
      uVar319 = (ushort)(sVar59 < sVar75) * sVar59 | (ushort)(sVar59 >= sVar75) * sVar75;
      sVar60 = (short)((ulong)uVar6 >> 0x30);
      sVar76 = (short)((ulong)uVar10 >> 0x30);
      uVar166 = (ushort)(sVar60 < sVar76) * sVar60 | (ushort)(sVar60 >= sVar76) * sVar76;
      sVar63 = (short)uVar5;
      sVar140 = (short)uVar9;
      uVar174 = (ushort)(sVar63 < sVar140) * sVar63 | (ushort)(sVar63 >= sVar140) * sVar140;
      sVar64 = (short)((ulong)uVar5 >> 0x10);
      sVar80 = (short)((ulong)uVar9 >> 0x10);
      uVar182 = (ushort)(sVar64 < sVar80) * sVar64 | (ushort)(sVar64 >= sVar80) * sVar80;
      sVar67 = (short)((ulong)uVar5 >> 0x20);
      sVar167 = (short)((ulong)uVar9 >> 0x20);
      sVar86 = (short)((ulong)uVar9 >> 0x30);
      uVar190 = (ushort)(sVar67 < sVar167) * sVar67 | (ushort)(sVar67 >= sVar167) * sVar167;
      sVar68 = (short)((ulong)uVar5 >> 0x30);
      uVar307 = (ushort)(sVar68 < sVar86) * sVar68 | (ushort)(sVar68 >= sVar86) * sVar86;
      auVar208._0_2_ = sVar38 - sVar349;
      auVar208._2_2_ = sVar40 - sVar364;
      auVar208._4_2_ = sVar59 - sVar348;
      auVar208._6_2_ = sVar60 - sVar367;
      auVar208._8_2_ = sVar63 - sVar363;
      auVar208._10_2_ = sVar64 - sVar372;
      auVar208._12_2_ = sVar67 - sVar365;
      auVar208._14_2_ = sVar68 - sVar379;
      auVar57 = pabsw(local_168,auVar239);
      uVar78 = auVar57._0_2_;
      auVar456._0_2_ = uVar78 >> local_198._0_8_;
      uVar82 = auVar57._2_2_;
      auVar456._2_2_ = uVar82 >> local_198._0_8_;
      uVar84 = auVar57._4_2_;
      auVar456._4_2_ = uVar84 >> local_198._0_8_;
      uVar88 = auVar57._6_2_;
      auVar456._6_2_ = uVar88 >> local_198._0_8_;
      uVar90 = auVar57._8_2_;
      auVar456._8_2_ = uVar90 >> local_198._0_8_;
      uVar311 = auVar57._10_2_;
      auVar456._10_2_ = uVar311 >> local_198._0_8_;
      uVar315 = auVar57._12_2_;
      uVar320 = auVar57._14_2_;
      auVar456._12_2_ = uVar315 >> local_198._0_8_;
      auVar456._14_2_ = uVar320 >> local_198._0_8_;
      auVar203 = pabsw(auVar330,auVar208);
      uVar69 = auVar203._0_2_;
      auVar283._0_2_ = uVar69 >> local_198._0_8_;
      uVar77 = auVar203._2_2_;
      auVar283._2_2_ = uVar77 >> local_198._0_8_;
      uVar87 = auVar203._4_2_;
      auVar283._4_2_ = uVar87 >> local_198._0_8_;
      uVar488 = auVar203._6_2_;
      auVar283._6_2_ = uVar488 >> local_198._0_8_;
      uVar490 = auVar203._8_2_;
      auVar283._8_2_ = uVar490 >> local_198._0_8_;
      uVar492 = auVar203._10_2_;
      auVar283._10_2_ = uVar492 >> local_198._0_8_;
      uVar494 = auVar203._12_2_;
      uVar496 = auVar203._14_2_;
      auVar283._12_2_ = uVar494 >> local_198._0_8_;
      auVar283._14_2_ = uVar496 >> local_198._0_8_;
      auVar57 = psubusw(local_168,auVar456);
      auVar271 = psubusw(local_168,auVar283);
      sVar38 = auVar57._0_2_;
      sVar40 = auVar57._2_2_;
      sVar59 = auVar57._4_2_;
      sVar60 = auVar57._6_2_;
      sVar63 = auVar57._8_2_;
      sVar64 = auVar57._10_2_;
      sVar67 = auVar57._12_2_;
      sVar68 = auVar57._14_2_;
      sVar175 = auVar271._0_2_;
      sVar127 = auVar271._2_2_;
      sVar179 = auVar271._4_2_;
      sVar132 = auVar271._6_2_;
      sVar183 = auVar271._8_2_;
      sVar137 = auVar271._10_2_;
      sVar187 = auVar271._12_2_;
      sVar141 = auVar271._14_2_;
      auVar57 = psraw(auVar239,0xf);
      auVar230._0_2_ =
           (((short)uVar78 < sVar38) * uVar78 | (ushort)((short)uVar78 >= sVar38) * sVar38) +
           auVar57._0_2_;
      auVar230._2_2_ =
           (((short)uVar82 < sVar40) * uVar82 | (ushort)((short)uVar82 >= sVar40) * sVar40) +
           auVar57._2_2_;
      auVar230._4_2_ =
           (((short)uVar84 < sVar59) * uVar84 | (ushort)((short)uVar84 >= sVar59) * sVar59) +
           auVar57._4_2_;
      auVar230._6_2_ =
           (((short)uVar88 < sVar60) * uVar88 | (ushort)((short)uVar88 >= sVar60) * sVar60) +
           auVar57._6_2_;
      auVar230._8_2_ =
           (((short)uVar90 < sVar63) * uVar90 | (ushort)((short)uVar90 >= sVar63) * sVar63) +
           auVar57._8_2_;
      auVar230._10_2_ =
           (((short)uVar311 < sVar64) * uVar311 | (ushort)((short)uVar311 >= sVar64) * sVar64) +
           auVar57._10_2_;
      auVar230._12_2_ =
           (((short)uVar315 < sVar67) * uVar315 | (ushort)((short)uVar315 >= sVar67) * sVar67) +
           auVar57._12_2_;
      auVar230._14_2_ =
           (((short)uVar320 < sVar68) * uVar320 | (ushort)((short)uVar320 >= sVar68) * sVar68) +
           auVar57._14_2_;
      auVar230 = auVar230 ^ auVar57;
      auVar57 = psraw(auVar208,0xf);
      auVar457._0_2_ =
           (((short)uVar69 < sVar175) * uVar69 | (ushort)((short)uVar69 >= sVar175) * sVar175) +
           auVar57._0_2_;
      auVar457._2_2_ =
           (((short)uVar77 < sVar127) * uVar77 | (ushort)((short)uVar77 >= sVar127) * sVar127) +
           auVar57._2_2_;
      auVar457._4_2_ =
           (((short)uVar87 < sVar179) * uVar87 | (ushort)((short)uVar87 >= sVar179) * sVar179) +
           auVar57._4_2_;
      auVar457._6_2_ =
           (((short)uVar488 < sVar132) * uVar488 | (ushort)((short)uVar488 >= sVar132) * sVar132) +
           auVar57._6_2_;
      auVar457._8_2_ =
           (((short)uVar490 < sVar183) * uVar490 | (ushort)((short)uVar490 >= sVar183) * sVar183) +
           auVar57._8_2_;
      auVar457._10_2_ =
           (((short)uVar492 < sVar137) * uVar492 | (ushort)((short)uVar492 >= sVar137) * sVar137) +
           auVar57._10_2_;
      auVar457._12_2_ =
           (((short)uVar494 < sVar187) * uVar494 | (ushort)((short)uVar494 >= sVar187) * sVar187) +
           auVar57._12_2_;
      auVar457._14_2_ =
           (((short)uVar496 < sVar141) * uVar496 | (ushort)((short)uVar496 >= sVar141) * sVar141) +
           auVar57._14_2_;
      auVar457 = auVar457 ^ auVar57;
      auVar117._0_2_ = sVar42 - sVar294;
      auVar117._2_2_ = sVar62 - sVar308;
      auVar117._4_2_ = sVar66 - sVar310;
      auVar117._6_2_ = sVar70 - sVar312;
      auVar117._8_2_ = sVar74 - sVar314;
      auVar117._10_2_ = sVar79 - sVar316;
      auVar117._12_2_ = sVar85 - sVar318;
      auVar117._14_2_ = sVar191 - sVar321;
      auVar271 = pabsw(auVar57,auVar117);
      uVar69 = auVar271._0_2_;
      auVar284._0_2_ = uVar69 >> local_198._0_8_;
      uVar77 = auVar271._2_2_;
      auVar284._2_2_ = uVar77 >> local_198._0_8_;
      uVar87 = auVar271._4_2_;
      auVar284._4_2_ = uVar87 >> local_198._0_8_;
      uVar488 = auVar271._6_2_;
      auVar284._6_2_ = uVar488 >> local_198._0_8_;
      uVar490 = auVar271._8_2_;
      auVar284._8_2_ = uVar490 >> local_198._0_8_;
      uVar492 = auVar271._10_2_;
      auVar284._10_2_ = uVar492 >> local_198._0_8_;
      uVar494 = auVar271._12_2_;
      uVar496 = auVar271._14_2_;
      auVar284._12_2_ = uVar494 >> local_198._0_8_;
      auVar284._14_2_ = uVar496 >> local_198._0_8_;
      auVar232 = psubusw(local_168,auVar284);
      auVar162._0_2_ = sVar58 - sVar349;
      auVar162._2_2_ = sVar72 - sVar364;
      auVar162._4_2_ = sVar75 - sVar348;
      auVar162._6_2_ = sVar76 - sVar367;
      auVar162._8_2_ = sVar140 - sVar363;
      auVar162._10_2_ = sVar80 - sVar372;
      auVar162._12_2_ = sVar167 - sVar365;
      auVar162._14_2_ = sVar86 - sVar379;
      auVar91 = pabsw(auVar203,auVar162);
      uVar78 = auVar91._0_2_;
      auVar346._0_2_ = uVar78 >> local_198._0_8_;
      uVar82 = auVar91._2_2_;
      auVar346._2_2_ = uVar82 >> local_198._0_8_;
      uVar84 = auVar91._4_2_;
      auVar346._4_2_ = uVar84 >> local_198._0_8_;
      uVar88 = auVar91._6_2_;
      auVar346._6_2_ = uVar88 >> local_198._0_8_;
      uVar90 = auVar91._8_2_;
      auVar346._8_2_ = uVar90 >> local_198._0_8_;
      uVar311 = auVar91._10_2_;
      auVar346._10_2_ = uVar311 >> local_198._0_8_;
      uVar315 = auVar91._12_2_;
      uVar320 = auVar91._14_2_;
      auVar346._12_2_ = uVar315 >> local_198._0_8_;
      auVar346._14_2_ = uVar320 >> local_198._0_8_;
      auVar57 = psubusw(local_168,auVar346);
      sVar42 = auVar232._0_2_;
      sVar62 = auVar232._2_2_;
      sVar66 = auVar232._4_2_;
      sVar70 = auVar232._6_2_;
      sVar74 = auVar232._8_2_;
      sVar79 = auVar232._10_2_;
      sVar85 = auVar232._12_2_;
      sVar191 = auVar232._14_2_;
      sVar38 = auVar57._0_2_;
      sVar40 = auVar57._2_2_;
      sVar59 = auVar57._4_2_;
      sVar60 = auVar57._6_2_;
      sVar63 = auVar57._8_2_;
      sVar64 = auVar57._10_2_;
      sVar67 = auVar57._12_2_;
      sVar68 = auVar57._14_2_;
      auVar57 = psraw(auVar117,0xf);
      auVar416._0_2_ =
           (((short)uVar69 < sVar42) * uVar69 | (ushort)((short)uVar69 >= sVar42) * sVar42) +
           auVar57._0_2_;
      auVar416._2_2_ =
           (((short)uVar77 < sVar62) * uVar77 | (ushort)((short)uVar77 >= sVar62) * sVar62) +
           auVar57._2_2_;
      auVar416._4_2_ =
           (((short)uVar87 < sVar66) * uVar87 | (ushort)((short)uVar87 >= sVar66) * sVar66) +
           auVar57._4_2_;
      auVar416._6_2_ =
           (((short)uVar488 < sVar70) * uVar488 | (ushort)((short)uVar488 >= sVar70) * sVar70) +
           auVar57._6_2_;
      auVar416._8_2_ =
           (((short)uVar490 < sVar74) * uVar490 | (ushort)((short)uVar490 >= sVar74) * sVar74) +
           auVar57._8_2_;
      auVar416._10_2_ =
           (((short)uVar492 < sVar79) * uVar492 | (ushort)((short)uVar492 >= sVar79) * sVar79) +
           auVar57._10_2_;
      auVar416._12_2_ =
           (((short)uVar494 < sVar85) * uVar494 | (ushort)((short)uVar494 >= sVar85) * sVar85) +
           auVar57._12_2_;
      auVar416._14_2_ =
           (((short)uVar496 < sVar191) * uVar496 | (ushort)((short)uVar496 >= sVar191) * sVar191) +
           auVar57._14_2_;
      auVar416 = auVar416 ^ auVar57;
      auVar203 = psraw(auVar162,0xf);
      auVar385._0_2_ =
           (((short)uVar78 < sVar38) * uVar78 | (ushort)((short)uVar78 >= sVar38) * sVar38) +
           auVar203._0_2_;
      auVar385._2_2_ =
           (((short)uVar82 < sVar40) * uVar82 | (ushort)((short)uVar82 >= sVar40) * sVar40) +
           auVar203._2_2_;
      auVar385._4_2_ =
           (((short)uVar84 < sVar59) * uVar84 | (ushort)((short)uVar84 >= sVar59) * sVar59) +
           auVar203._4_2_;
      auVar385._6_2_ =
           (((short)uVar88 < sVar60) * uVar88 | (ushort)((short)uVar88 >= sVar60) * sVar60) +
           auVar203._6_2_;
      auVar385._8_2_ =
           (((short)uVar90 < sVar63) * uVar90 | (ushort)((short)uVar90 >= sVar63) * sVar63) +
           auVar203._8_2_;
      auVar385._10_2_ =
           (((short)uVar311 < sVar64) * uVar311 | (ushort)((short)uVar311 >= sVar64) * sVar64) +
           auVar203._10_2_;
      auVar385._12_2_ =
           (((short)uVar315 < sVar67) * uVar315 | (ushort)((short)uVar315 >= sVar67) * sVar67) +
           auVar203._12_2_;
      auVar385._14_2_ =
           (((short)uVar320 < sVar68) * uVar320 | (ushort)((short)uVar320 >= sVar68) * sVar68) +
           auVar203._14_2_;
      auVar385 = auVar385 ^ auVar203;
      local_b8 = auVar45._0_2_;
      sStack_b6 = auVar45._2_2_;
      uVar3 = *(undefined8 *)(in + lVar30);
      uVar4 = *(undefined8 *)(in + lVar30 + 0x90);
      uVar5 = *(undefined8 *)(in + lVar30 + 0x120);
      uVar6 = *(undefined8 *)(in + lVar30 + 0x1b0);
      sVar38 = (short)uVar4;
      auVar232._0_2_ = sVar38 - sVar294;
      sVar40 = (short)((ulong)uVar4 >> 0x10);
      auVar232._2_2_ = sVar40 - sVar308;
      sVar59 = (short)((ulong)uVar4 >> 0x20);
      auVar232._4_2_ = sVar59 - sVar310;
      sVar60 = (short)((ulong)uVar4 >> 0x30);
      auVar232._6_2_ = sVar60 - sVar312;
      sVar63 = (short)uVar3;
      auVar232._8_2_ = sVar63 - sVar314;
      sVar64 = (short)((ulong)uVar3 >> 0x10);
      auVar232._10_2_ = sVar64 - sVar316;
      sVar67 = (short)((ulong)uVar3 >> 0x20);
      sVar68 = (short)((ulong)uVar3 >> 0x30);
      auVar232._12_2_ = sVar67 - sVar318;
      auVar232._14_2_ = sVar68 - sVar321;
      sVar42 = (short)uVar6;
      auVar103._0_2_ = sVar42 - sVar349;
      sVar62 = (short)((ulong)uVar6 >> 0x10);
      auVar103._2_2_ = sVar62 - sVar364;
      sVar66 = (short)((ulong)uVar6 >> 0x20);
      auVar103._4_2_ = sVar66 - sVar348;
      sVar70 = (short)((ulong)uVar6 >> 0x30);
      auVar103._6_2_ = sVar70 - sVar367;
      sVar74 = (short)uVar5;
      auVar103._8_2_ = sVar74 - sVar363;
      sVar79 = (short)((ulong)uVar5 >> 0x10);
      auVar103._10_2_ = sVar79 - sVar372;
      sVar85 = (short)((ulong)uVar5 >> 0x20);
      sVar191 = (short)((ulong)uVar5 >> 0x30);
      auVar103._12_2_ = sVar85 - sVar365;
      auVar103._14_2_ = sVar191 - sVar379;
      auVar57 = pabsw(auVar57,auVar232);
      local_198._4_4_ = 0;
      uVar69 = auVar57._0_2_;
      auVar163._0_2_ = uVar69 >> local_198._0_8_;
      uVar77 = auVar57._2_2_;
      auVar163._2_2_ = uVar77 >> local_198._0_8_;
      uVar87 = auVar57._4_2_;
      auVar163._4_2_ = uVar87 >> local_198._0_8_;
      uVar488 = auVar57._6_2_;
      auVar163._6_2_ = uVar488 >> local_198._0_8_;
      uVar490 = auVar57._8_2_;
      auVar163._8_2_ = uVar490 >> local_198._0_8_;
      uVar492 = auVar57._10_2_;
      auVar163._10_2_ = uVar492 >> local_198._0_8_;
      uVar494 = auVar57._12_2_;
      uVar496 = auVar57._14_2_;
      auVar163._12_2_ = uVar494 >> local_198._0_8_;
      auVar163._14_2_ = uVar496 >> local_198._0_8_;
      auVar57 = pabsw(auVar271,auVar103);
      uVar78 = auVar57._0_2_;
      auVar302._0_2_ = uVar78 >> local_198._0_8_;
      uVar82 = auVar57._2_2_;
      auVar302._2_2_ = uVar82 >> local_198._0_8_;
      uVar84 = auVar57._4_2_;
      auVar302._4_2_ = uVar84 >> local_198._0_8_;
      uVar88 = auVar57._6_2_;
      auVar302._6_2_ = uVar88 >> local_198._0_8_;
      uVar90 = auVar57._8_2_;
      auVar302._8_2_ = uVar90 >> local_198._0_8_;
      uVar311 = auVar57._10_2_;
      auVar302._10_2_ = uVar311 >> local_198._0_8_;
      uVar315 = auVar57._12_2_;
      uVar320 = auVar57._14_2_;
      auVar302._12_2_ = uVar315 >> local_198._0_8_;
      auVar302._14_2_ = uVar320 >> local_198._0_8_;
      auVar203 = psubusw(local_168,auVar163);
      auVar57 = psubusw(local_168,auVar302);
      sVar175 = auVar203._0_2_;
      sVar127 = auVar203._2_2_;
      sVar179 = auVar203._4_2_;
      sVar132 = auVar203._6_2_;
      sVar183 = auVar203._8_2_;
      sVar137 = auVar203._10_2_;
      sVar187 = auVar203._12_2_;
      sVar141 = auVar203._14_2_;
      sVar58 = auVar57._0_2_;
      sVar72 = auVar57._2_2_;
      sVar75 = auVar57._4_2_;
      sVar76 = auVar57._6_2_;
      sVar140 = auVar57._8_2_;
      sVar80 = auVar57._10_2_;
      sVar167 = auVar57._12_2_;
      sVar86 = auVar57._14_2_;
      auVar57 = psraw(auVar232,0xf);
      auVar482._0_2_ =
           (((short)uVar69 < sVar175) * uVar69 | (ushort)((short)uVar69 >= sVar175) * sVar175) +
           auVar57._0_2_;
      auVar482._2_2_ =
           (((short)uVar77 < sVar127) * uVar77 | (ushort)((short)uVar77 >= sVar127) * sVar127) +
           auVar57._2_2_;
      auVar482._4_2_ =
           (((short)uVar87 < sVar179) * uVar87 | (ushort)((short)uVar87 >= sVar179) * sVar179) +
           auVar57._4_2_;
      auVar482._6_2_ =
           (((short)uVar488 < sVar132) * uVar488 | (ushort)((short)uVar488 >= sVar132) * sVar132) +
           auVar57._6_2_;
      auVar482._8_2_ =
           (((short)uVar490 < sVar183) * uVar490 | (ushort)((short)uVar490 >= sVar183) * sVar183) +
           auVar57._8_2_;
      auVar482._10_2_ =
           (((short)uVar492 < sVar137) * uVar492 | (ushort)((short)uVar492 >= sVar137) * sVar137) +
           auVar57._10_2_;
      auVar482._12_2_ =
           (((short)uVar494 < sVar187) * uVar494 | (ushort)((short)uVar494 >= sVar187) * sVar187) +
           auVar57._12_2_;
      auVar482._14_2_ =
           (((short)uVar496 < sVar141) * uVar496 | (ushort)((short)uVar496 >= sVar141) * sVar141) +
           auVar57._14_2_;
      auVar482 = auVar482 ^ auVar57;
      auVar57 = psraw(auVar103,0xf);
      auVar164._0_2_ =
           (((short)uVar78 < sVar58) * uVar78 | (ushort)((short)uVar78 >= sVar58) * sVar58) +
           auVar57._0_2_;
      auVar164._2_2_ =
           (((short)uVar82 < sVar72) * uVar82 | (ushort)((short)uVar82 >= sVar72) * sVar72) +
           auVar57._2_2_;
      auVar164._4_2_ =
           (((short)uVar84 < sVar75) * uVar84 | (ushort)((short)uVar84 >= sVar75) * sVar75) +
           auVar57._4_2_;
      auVar164._6_2_ =
           (((short)uVar88 < sVar76) * uVar88 | (ushort)((short)uVar88 >= sVar76) * sVar76) +
           auVar57._6_2_;
      auVar164._8_2_ =
           (((short)uVar90 < sVar140) * uVar90 | (ushort)((short)uVar90 >= sVar140) * sVar140) +
           auVar57._8_2_;
      auVar164._10_2_ =
           (((short)uVar311 < sVar80) * uVar311 | (ushort)((short)uVar311 >= sVar80) * sVar80) +
           auVar57._10_2_;
      auVar164._12_2_ =
           (((short)uVar315 < sVar167) * uVar315 | (ushort)((short)uVar315 >= sVar167) * sVar167) +
           auVar57._12_2_;
      auVar164._14_2_ =
           (((short)uVar320 < sVar86) * uVar320 | (ushort)((short)uVar320 >= sVar86) * sVar86) +
           auVar57._14_2_;
      auVar164 = auVar164 ^ auVar57;
      uVar7 = *(undefined8 *)(in + -lVar30);
      uVar8 = *(undefined8 *)(in + (0x90 - lVar30));
      uVar9 = *(undefined8 *)(in + (0x120 - lVar30));
      uVar10 = *(undefined8 *)(in + (0x1b0 - lVar30));
      uVar41 = (ushort)(sVar38 < (short)uVar41) * sVar38 | (sVar38 >= (short)uVar41) * uVar41;
      uVar61 = (ushort)(sVar40 < (short)uVar61) * sVar40 | (sVar40 >= (short)uVar61) * uVar61;
      uVar65 = (ushort)(sVar59 < (short)uVar65) * sVar59 | (sVar59 >= (short)uVar65) * uVar65;
      uVar69 = (ushort)(sVar60 < (short)uVar477) * sVar60 | (sVar60 >= (short)uVar477) * uVar477;
      uVar73 = (ushort)(sVar63 < (short)uVar73) * sVar63 | (sVar63 >= (short)uVar73) * uVar73;
      uVar77 = (ushort)(sVar64 < (short)uVar484) * sVar64 | (sVar64 >= (short)uVar484) * uVar484;
      uVar81 = (ushort)(sVar67 < (short)uVar81) * sVar67 | (sVar67 >= (short)uVar81) * uVar81;
      uVar87 = (ushort)(sVar68 < (short)uVar486) * sVar68 | (sVar68 >= (short)uVar486) * uVar486;
      bVar269 = (byte)uVar8;
      bVar432 = (byte)uVar4;
      bVar455 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar8 >> 8);
      bVar432 = (byte)((ulong)uVar4 >> 8);
      bVar459 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar8 >> 0x10);
      bVar432 = (byte)((ulong)uVar4 >> 0x10);
      bVar460 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar8 >> 0x18);
      bVar432 = (byte)((ulong)uVar4 >> 0x18);
      bVar461 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar8 >> 0x20);
      bVar432 = (byte)((ulong)uVar4 >> 0x20);
      bVar462 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar8 >> 0x28);
      bVar432 = (byte)((ulong)uVar4 >> 0x28);
      bVar463 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar8 >> 0x30);
      bVar432 = (byte)((ulong)uVar4 >> 0x30);
      bVar464 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar8 >> 0x38);
      bVar432 = (byte)((ulong)uVar4 >> 0x38);
      bVar465 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)uVar7;
      bVar432 = (byte)uVar3;
      bVar466 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar7 >> 8);
      bVar432 = (byte)((ulong)uVar3 >> 8);
      bVar467 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar7 >> 0x10);
      bVar432 = (byte)((ulong)uVar3 >> 0x10);
      bVar468 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar7 >> 0x18);
      bVar432 = (byte)((ulong)uVar3 >> 0x18);
      bVar470 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar7 >> 0x20);
      bVar432 = (byte)((ulong)uVar3 >> 0x20);
      bVar471 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar7 >> 0x28);
      bVar432 = (byte)((ulong)uVar3 >> 0x28);
      bVar473 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar7 >> 0x30);
      bVar432 = (byte)((ulong)uVar3 >> 0x30);
      bVar440 = (byte)((ulong)uVar3 >> 0x38);
      bVar474 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar7 >> 0x38);
      bVar476 = (bVar440 < bVar269) * bVar269 | (bVar440 >= bVar269) * bVar440;
      sVar38 = (short)uVar8;
      uVar41 = (ushort)(sVar38 < (short)uVar41) * sVar38 | (sVar38 >= (short)uVar41) * uVar41;
      sVar40 = (short)((ulong)uVar8 >> 0x10);
      uVar477 = (ushort)(sVar40 < (short)uVar61) * sVar40 | (sVar40 >= (short)uVar61) * uVar61;
      sVar59 = (short)((ulong)uVar8 >> 0x20);
      uVar484 = (ushort)(sVar59 < (short)uVar65) * sVar59 | (sVar59 >= (short)uVar65) * uVar65;
      sVar60 = (short)((ulong)uVar8 >> 0x30);
      uVar486 = (ushort)(sVar60 < (short)uVar69) * sVar60 | (sVar60 >= (short)uVar69) * uVar69;
      sVar63 = (short)uVar7;
      uVar490 = (ushort)(sVar63 < (short)uVar73) * sVar63 | (sVar63 >= (short)uVar73) * uVar73;
      sVar64 = (short)((ulong)uVar7 >> 0x10);
      uVar496 = (ushort)(sVar64 < (short)uVar77) * sVar64 | (sVar64 >= (short)uVar77) * uVar77;
      sVar67 = (short)((ulong)uVar7 >> 0x20);
      uVar82 = (ushort)(sVar67 < (short)uVar81) * sVar67 | (sVar67 >= (short)uVar81) * uVar81;
      sVar68 = (short)((ulong)uVar7 >> 0x30);
      uVar88 = (ushort)(sVar68 < (short)uVar87) * sVar68 | (sVar68 >= (short)uVar87) * uVar87;
      auVar209._0_2_ = sVar38 - sVar294;
      auVar209._2_2_ = sVar40 - sVar308;
      auVar209._4_2_ = sVar59 - sVar310;
      auVar209._6_2_ = sVar60 - sVar312;
      auVar209._8_2_ = sVar63 - sVar314;
      auVar209._10_2_ = sVar64 - sVar316;
      auVar209._12_2_ = sVar67 - sVar318;
      auVar209._14_2_ = sVar68 - sVar321;
      auVar57 = pabsw(auVar302,auVar209);
      uVar61 = auVar57._0_2_;
      auVar324._0_2_ = uVar61 >> local_198._0_8_;
      uVar69 = auVar57._2_2_;
      auVar324._2_2_ = uVar69 >> local_198._0_8_;
      uVar77 = auVar57._4_2_;
      auVar324._4_2_ = uVar77 >> local_198._0_8_;
      uVar87 = auVar57._6_2_;
      auVar324._6_2_ = uVar87 >> local_198._0_8_;
      uVar492 = auVar57._8_2_;
      auVar324._8_2_ = uVar492 >> local_198._0_8_;
      uVar78 = auVar57._10_2_;
      auVar324._10_2_ = uVar78 >> local_198._0_8_;
      uVar84 = auVar57._12_2_;
      uVar90 = auVar57._14_2_;
      auVar324._12_2_ = uVar84 >> local_198._0_8_;
      auVar324._14_2_ = uVar90 >> local_198._0_8_;
      auVar203 = psubusw(local_168,auVar324);
      uVar65 = (ushort)(sVar42 < (short)uVar83) * sVar42 | (sVar42 >= (short)uVar83) * uVar83;
      uVar73 = (ushort)(sVar62 < (short)uVar89) * sVar62 | (sVar62 >= (short)uVar89) * uVar89;
      uVar81 = (ushort)(sVar66 < (short)uVar319) * sVar66 | (sVar66 >= (short)uVar319) * uVar319;
      uVar488 = (ushort)(sVar70 < (short)uVar166) * sVar70 | (sVar70 >= (short)uVar166) * uVar166;
      uVar494 = (ushort)(sVar74 < (short)uVar174) * sVar74 | (sVar74 >= (short)uVar174) * uVar174;
      uVar83 = (ushort)(sVar79 < (short)uVar182) * sVar79 | (sVar79 >= (short)uVar182) * uVar182;
      uVar89 = (ushort)(sVar85 < (short)uVar190) * sVar85 | (sVar85 >= (short)uVar190) * uVar190;
      uVar319 = (ushort)(sVar191 < (short)uVar307) * sVar191 | (sVar191 >= (short)uVar307) * uVar307
      ;
      bVar269 = (byte)uVar10;
      bVar432 = (byte)uVar6;
      bVar432 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar10 >> 8);
      bVar440 = (byte)((ulong)uVar6 >> 8);
      bVar440 = (bVar440 < bVar269) * bVar269 | (bVar440 >= bVar269) * bVar440;
      bVar269 = (byte)((ulong)uVar10 >> 0x10);
      bVar441 = (byte)((ulong)uVar6 >> 0x10);
      bVar441 = (bVar441 < bVar269) * bVar269 | (bVar441 >= bVar269) * bVar441;
      bVar269 = (byte)((ulong)uVar10 >> 0x18);
      bVar442 = (byte)((ulong)uVar6 >> 0x18);
      bVar442 = (bVar442 < bVar269) * bVar269 | (bVar442 >= bVar269) * bVar442;
      bVar269 = (byte)((ulong)uVar10 >> 0x20);
      bVar443 = (byte)((ulong)uVar6 >> 0x20);
      bVar443 = (bVar443 < bVar269) * bVar269 | (bVar443 >= bVar269) * bVar443;
      bVar269 = (byte)((ulong)uVar10 >> 0x28);
      bVar444 = (byte)((ulong)uVar6 >> 0x28);
      bVar444 = (bVar444 < bVar269) * bVar269 | (bVar444 >= bVar269) * bVar444;
      bVar269 = (byte)((ulong)uVar10 >> 0x30);
      bVar445 = (byte)((ulong)uVar6 >> 0x30);
      bVar445 = (bVar445 < bVar269) * bVar269 | (bVar445 >= bVar269) * bVar445;
      bVar269 = (byte)((ulong)uVar10 >> 0x38);
      bVar446 = (byte)((ulong)uVar6 >> 0x38);
      bVar446 = (bVar446 < bVar269) * bVar269 | (bVar446 >= bVar269) * bVar446;
      bVar269 = (byte)uVar9;
      bVar447 = (byte)uVar5;
      bVar447 = (bVar447 < bVar269) * bVar269 | (bVar447 >= bVar269) * bVar447;
      bVar269 = (byte)((ulong)uVar9 >> 8);
      bVar448 = (byte)((ulong)uVar5 >> 8);
      bVar448 = (bVar448 < bVar269) * bVar269 | (bVar448 >= bVar269) * bVar448;
      bVar269 = (byte)((ulong)uVar9 >> 0x10);
      bVar449 = (byte)((ulong)uVar5 >> 0x10);
      bVar449 = (bVar449 < bVar269) * bVar269 | (bVar449 >= bVar269) * bVar449;
      bVar269 = (byte)((ulong)uVar9 >> 0x18);
      bVar450 = (byte)((ulong)uVar5 >> 0x18);
      bVar450 = (bVar450 < bVar269) * bVar269 | (bVar450 >= bVar269) * bVar450;
      bVar269 = (byte)((ulong)uVar9 >> 0x20);
      bVar451 = (byte)((ulong)uVar5 >> 0x20);
      bVar451 = (bVar451 < bVar269) * bVar269 | (bVar451 >= bVar269) * bVar451;
      bVar269 = (byte)((ulong)uVar9 >> 0x28);
      bVar452 = (byte)((ulong)uVar5 >> 0x28);
      bVar452 = (bVar452 < bVar269) * bVar269 | (bVar452 >= bVar269) * bVar452;
      bVar269 = (byte)((ulong)uVar9 >> 0x30);
      bVar453 = (byte)((ulong)uVar5 >> 0x30);
      bVar454 = (byte)((ulong)uVar5 >> 0x38);
      bVar453 = (bVar453 < bVar269) * bVar269 | (bVar453 >= bVar269) * bVar453;
      bVar269 = (byte)((ulong)uVar9 >> 0x38);
      bVar454 = (bVar454 < bVar269) * bVar269 | (bVar454 >= bVar269) * bVar454;
      sVar38 = (short)uVar10;
      uVar65 = (ushort)(sVar38 < (short)uVar65) * sVar38 | (sVar38 >= (short)uVar65) * uVar65;
      sVar40 = (short)((ulong)uVar10 >> 0x10);
      uVar73 = (ushort)(sVar40 < (short)uVar73) * sVar40 | (sVar40 >= (short)uVar73) * uVar73;
      sVar59 = (short)((ulong)uVar10 >> 0x20);
      uVar81 = (ushort)(sVar59 < (short)uVar81) * sVar59 | (sVar59 >= (short)uVar81) * uVar81;
      sVar60 = (short)((ulong)uVar10 >> 0x30);
      uVar488 = (ushort)(sVar60 < (short)uVar488) * sVar60 | (sVar60 >= (short)uVar488) * uVar488;
      sVar63 = (short)uVar9;
      uVar494 = (ushort)(sVar63 < (short)uVar494) * sVar63 | (sVar63 >= (short)uVar494) * uVar494;
      sVar64 = (short)((ulong)uVar9 >> 0x10);
      uVar83 = (ushort)(sVar64 < (short)uVar83) * sVar64 | (sVar64 >= (short)uVar83) * uVar83;
      sVar67 = (short)((ulong)uVar9 >> 0x20);
      uVar89 = (ushort)(sVar67 < (short)uVar89) * sVar67 | (sVar67 >= (short)uVar89) * uVar89;
      sVar68 = (short)((ulong)uVar9 >> 0x30);
      uVar319 = (ushort)(sVar68 < (short)uVar319) * sVar68 | (sVar68 >= (short)uVar319) * uVar319;
      auVar118._0_2_ = sVar38 - sVar349;
      auVar118._2_2_ = sVar40 - sVar364;
      auVar118._4_2_ = sVar59 - sVar348;
      auVar118._6_2_ = sVar60 - sVar367;
      auVar118._8_2_ = sVar63 - sVar363;
      auVar118._10_2_ = sVar64 - sVar372;
      auVar118._12_2_ = sVar67 - sVar365;
      auVar118._14_2_ = sVar68 - sVar379;
      auVar57 = pabsw(auVar91,auVar118);
      uVar166 = auVar57._0_2_;
      auVar347._0_2_ = uVar166 >> local_198._0_8_;
      uVar174 = auVar57._2_2_;
      auVar347._2_2_ = uVar174 >> local_198._0_8_;
      uVar182 = auVar57._4_2_;
      auVar347._4_2_ = uVar182 >> local_198._0_8_;
      uVar190 = auVar57._6_2_;
      auVar347._6_2_ = uVar190 >> local_198._0_8_;
      uVar307 = auVar57._8_2_;
      auVar347._8_2_ = uVar307 >> local_198._0_8_;
      uVar311 = auVar57._10_2_;
      auVar347._10_2_ = uVar311 >> local_198._0_8_;
      uVar315 = auVar57._12_2_;
      uVar320 = auVar57._14_2_;
      auVar347._12_2_ = uVar315 >> local_198._0_8_;
      auVar347._14_2_ = uVar320 >> local_198._0_8_;
      auVar57 = psubusw(local_168,auVar347);
      sVar42 = auVar203._0_2_;
      sVar62 = auVar203._2_2_;
      sVar66 = auVar203._4_2_;
      sVar70 = auVar203._6_2_;
      sVar74 = auVar203._8_2_;
      sVar79 = auVar203._10_2_;
      sVar85 = auVar203._12_2_;
      sVar191 = auVar203._14_2_;
      sVar38 = auVar57._0_2_;
      sVar40 = auVar57._2_2_;
      sVar59 = auVar57._4_2_;
      sVar60 = auVar57._6_2_;
      sVar63 = auVar57._8_2_;
      sVar64 = auVar57._10_2_;
      sVar67 = auVar57._12_2_;
      sVar68 = auVar57._14_2_;
      auVar57 = psraw(auVar209,0xf);
      auVar285._0_2_ =
           (((short)uVar61 < sVar42) * uVar61 | (ushort)((short)uVar61 >= sVar42) * sVar42) +
           auVar57._0_2_;
      auVar285._2_2_ =
           (((short)uVar69 < sVar62) * uVar69 | (ushort)((short)uVar69 >= sVar62) * sVar62) +
           auVar57._2_2_;
      auVar285._4_2_ =
           (((short)uVar77 < sVar66) * uVar77 | (ushort)((short)uVar77 >= sVar66) * sVar66) +
           auVar57._4_2_;
      auVar285._6_2_ =
           (((short)uVar87 < sVar70) * uVar87 | (ushort)((short)uVar87 >= sVar70) * sVar70) +
           auVar57._6_2_;
      auVar285._8_2_ =
           (((short)uVar492 < sVar74) * uVar492 | (ushort)((short)uVar492 >= sVar74) * sVar74) +
           auVar57._8_2_;
      auVar285._10_2_ =
           (((short)uVar78 < sVar79) * uVar78 | (ushort)((short)uVar78 >= sVar79) * sVar79) +
           auVar57._10_2_;
      auVar285._12_2_ =
           (((short)uVar84 < sVar85) * uVar84 | (ushort)((short)uVar84 >= sVar85) * sVar85) +
           auVar57._12_2_;
      auVar285._14_2_ =
           (((short)uVar90 < sVar191) * uVar90 | (ushort)((short)uVar90 >= sVar191) * sVar191) +
           auVar57._14_2_;
      auVar285 = auVar285 ^ auVar57;
      auVar57 = psraw(auVar118,0xf);
      auVar240._0_2_ =
           (((short)uVar166 < sVar38) * uVar166 | (ushort)((short)uVar166 >= sVar38) * sVar38) +
           auVar57._0_2_;
      auVar240._2_2_ =
           (((short)uVar174 < sVar40) * uVar174 | (ushort)((short)uVar174 >= sVar40) * sVar40) +
           auVar57._2_2_;
      auVar240._4_2_ =
           (((short)uVar182 < sVar59) * uVar182 | (ushort)((short)uVar182 >= sVar59) * sVar59) +
           auVar57._4_2_;
      auVar240._6_2_ =
           (((short)uVar190 < sVar60) * uVar190 | (ushort)((short)uVar190 >= sVar60) * sVar60) +
           auVar57._6_2_;
      auVar240._8_2_ =
           (((short)uVar307 < sVar63) * uVar307 | (ushort)((short)uVar307 >= sVar63) * sVar63) +
           auVar57._8_2_;
      auVar240._10_2_ =
           (((short)uVar311 < sVar64) * uVar311 | (ushort)((short)uVar311 >= sVar64) * sVar64) +
           auVar57._10_2_;
      auVar240._12_2_ =
           (((short)uVar315 < sVar67) * uVar315 | (ushort)((short)uVar315 >= sVar67) * sVar67) +
           auVar57._12_2_;
      auVar240._14_2_ =
           (((short)uVar320 < sVar68) * uVar320 | (ushort)((short)uVar320 >= sVar68) * sVar68) +
           auVar57._14_2_;
      auVar240 = auVar240 ^ auVar57;
      uVar3 = *(undefined8 *)(in + lVar34);
      uVar4 = *(undefined8 *)(in + lVar34 + 0x90);
      uVar5 = *(undefined8 *)(in + lVar34 + 0x120);
      uVar6 = *(undefined8 *)(in + lVar34 + 0x1b0);
      uVar7 = *(undefined8 *)(in + -lVar34);
      uVar8 = *(undefined8 *)(in + (0x90 - lVar34));
      uVar9 = *(undefined8 *)(in + (0x120 - lVar34));
      uVar10 = *(undefined8 *)(in + (0x1b0 - lVar34));
      bVar106 = (bVar227 < bVar106) * bVar106 | (bVar227 >= bVar106) * bVar227;
      bVar121 = (bVar241 < bVar121) * bVar121 | (bVar241 >= bVar121) * bVar241;
      bVar124 = (bVar242 < bVar124) * bVar124 | (bVar242 >= bVar124) * bVar242;
      bVar126 = (bVar245 < bVar126) * bVar126 | (bVar245 >= bVar126) * bVar245;
      bVar129 = (bVar246 < bVar129) * bVar129 | (bVar246 >= bVar129) * bVar246;
      bVar131 = (bVar249 < bVar131) * bVar131 | (bVar249 >= bVar131) * bVar249;
      bVar134 = (bVar250 < bVar134) * bVar134 | (bVar250 >= bVar134) * bVar250;
      bVar136 = (bVar253 < bVar136) * bVar136 | (bVar253 >= bVar136) * bVar253;
      bVar194 = (bVar254 < bVar194) * bVar194 | (bVar254 >= bVar194) * bVar254;
      bVar213 = (bVar257 < bVar213) * bVar213 | (bVar257 >= bVar213) * bVar257;
      bVar215 = (bVar258 < bVar215) * bVar215 | (bVar258 >= bVar215) * bVar258;
      bVar217 = (bVar261 < bVar217) * bVar217 | (bVar261 >= bVar217) * bVar261;
      bVar219 = (bVar262 < bVar219) * bVar219 | (bVar262 >= bVar219) * bVar262;
      bVar221 = (bVar265 < bVar221) * bVar221 | (bVar265 >= bVar221) * bVar265;
      bVar223 = (bVar266 < bVar223) * bVar223 | (bVar266 >= bVar223) * bVar266;
      bVar225 = (bVar375 < bVar225) * bVar225 | (bVar375 >= bVar225) * bVar375;
      bVar120 = (bVar376 < bVar120) * bVar120 | (bVar376 >= bVar120) * bVar376;
      bVar123 = (bVar380 < bVar123) * bVar123 | (bVar380 >= bVar123) * bVar380;
      bVar125 = (bVar386 < bVar125) * bVar125 | (bVar386 >= bVar125) * bVar386;
      bVar128 = (bVar389 < bVar128) * bVar128 | (bVar389 >= bVar128) * bVar389;
      bVar130 = (bVar390 < bVar130) * bVar130 | (bVar390 >= bVar130) * bVar390;
      bVar133 = (bVar393 < bVar133) * bVar133 | (bVar393 >= bVar133) * bVar393;
      bVar135 = (bVar394 < bVar135) * bVar135 | (bVar394 >= bVar135) * bVar394;
      bVar138 = (bVar397 < bVar138) * bVar138 | (bVar397 >= bVar138) * bVar397;
      bVar212 = (bVar398 < bVar212) * bVar212 | (bVar398 >= bVar212) * bVar398;
      bVar214 = (bVar401 < bVar214) * bVar214 | (bVar401 >= bVar214) * bVar401;
      bVar216 = (bVar402 < bVar216) * bVar216 | (bVar402 >= bVar216) * bVar402;
      bVar218 = (bVar404 < bVar218) * bVar218 | (bVar404 >= bVar218) * bVar404;
      bVar220 = (bVar405 < bVar220) * bVar220 | (bVar405 >= bVar220) * bVar405;
      bVar222 = (bVar407 < bVar222) * bVar222 | (bVar407 >= bVar222) * bVar407;
      bVar224 = (bVar408 < bVar224) * bVar224 | (bVar408 >= bVar224) * bVar408;
      bVar226 = (bVar410 < bVar226) * bVar226 | (bVar410 >= bVar226) * bVar410;
      bVar269 = (byte)uVar4;
      bVar227 = (bVar455 < bVar269) * bVar269 | (bVar455 >= bVar269) * bVar455;
      bVar269 = (byte)((ulong)uVar4 >> 8);
      bVar241 = (bVar459 < bVar269) * bVar269 | (bVar459 >= bVar269) * bVar459;
      bVar269 = (byte)((ulong)uVar4 >> 0x10);
      bVar242 = (bVar460 < bVar269) * bVar269 | (bVar460 >= bVar269) * bVar460;
      bVar269 = (byte)((ulong)uVar4 >> 0x18);
      bVar245 = (bVar461 < bVar269) * bVar269 | (bVar461 >= bVar269) * bVar461;
      bVar269 = (byte)((ulong)uVar4 >> 0x20);
      bVar246 = (bVar462 < bVar269) * bVar269 | (bVar462 >= bVar269) * bVar462;
      bVar269 = (byte)((ulong)uVar4 >> 0x28);
      bVar249 = (bVar463 < bVar269) * bVar269 | (bVar463 >= bVar269) * bVar463;
      bVar269 = (byte)((ulong)uVar4 >> 0x30);
      bVar250 = (bVar464 < bVar269) * bVar269 | (bVar464 >= bVar269) * bVar464;
      bVar269 = (byte)((ulong)uVar4 >> 0x38);
      bVar253 = (bVar465 < bVar269) * bVar269 | (bVar465 >= bVar269) * bVar465;
      bVar269 = (byte)uVar3;
      bVar254 = (bVar466 < bVar269) * bVar269 | (bVar466 >= bVar269) * bVar466;
      bVar269 = (byte)((ulong)uVar3 >> 8);
      bVar257 = (bVar467 < bVar269) * bVar269 | (bVar467 >= bVar269) * bVar467;
      bVar269 = (byte)((ulong)uVar3 >> 0x10);
      bVar258 = (bVar468 < bVar269) * bVar269 | (bVar468 >= bVar269) * bVar468;
      bVar269 = (byte)((ulong)uVar3 >> 0x18);
      bVar261 = (bVar470 < bVar269) * bVar269 | (bVar470 >= bVar269) * bVar470;
      bVar269 = (byte)((ulong)uVar3 >> 0x20);
      bVar262 = (bVar471 < bVar269) * bVar269 | (bVar471 >= bVar269) * bVar471;
      bVar269 = (byte)((ulong)uVar3 >> 0x28);
      bVar265 = (bVar473 < bVar269) * bVar269 | (bVar473 >= bVar269) * bVar473;
      bVar269 = (byte)((ulong)uVar3 >> 0x30);
      bVar266 = (bVar474 < bVar269) * bVar269 | (bVar474 >= bVar269) * bVar474;
      bVar269 = (byte)((ulong)uVar3 >> 0x38);
      bVar269 = (bVar476 < bVar269) * bVar269 | (bVar476 >= bVar269) * bVar476;
      bVar227 = (bVar227 < bVar106) * bVar106 | (bVar227 >= bVar106) * bVar227;
      bVar241 = (bVar241 < bVar121) * bVar121 | (bVar241 >= bVar121) * bVar241;
      bVar242 = (bVar242 < bVar124) * bVar124 | (bVar242 >= bVar124) * bVar242;
      bVar245 = (bVar245 < bVar126) * bVar126 | (bVar245 >= bVar126) * bVar245;
      bVar246 = (bVar246 < bVar129) * bVar129 | (bVar246 >= bVar129) * bVar246;
      bVar249 = (bVar249 < bVar131) * bVar131 | (bVar249 >= bVar131) * bVar249;
      bVar250 = (bVar250 < bVar134) * bVar134 | (bVar250 >= bVar134) * bVar250;
      bVar253 = (bVar253 < bVar136) * bVar136 | (bVar253 >= bVar136) * bVar253;
      bVar254 = (bVar254 < bVar194) * bVar194 | (bVar254 >= bVar194) * bVar254;
      bVar257 = (bVar257 < bVar213) * bVar213 | (bVar257 >= bVar213) * bVar257;
      bVar258 = (bVar258 < bVar215) * bVar215 | (bVar258 >= bVar215) * bVar258;
      bVar261 = (bVar261 < bVar217) * bVar217 | (bVar261 >= bVar217) * bVar261;
      bVar262 = (bVar262 < bVar219) * bVar219 | (bVar262 >= bVar219) * bVar262;
      bVar265 = (bVar265 < bVar221) * bVar221 | (bVar265 >= bVar221) * bVar265;
      bVar266 = (bVar266 < bVar223) * bVar223 | (bVar266 >= bVar223) * bVar266;
      bVar225 = (bVar269 < bVar225) * bVar225 | (bVar269 >= bVar225) * bVar269;
      bVar269 = (byte)uVar6;
      bVar106 = (bVar432 < bVar269) * bVar269 | (bVar432 >= bVar269) * bVar432;
      bVar269 = (byte)((ulong)uVar6 >> 8);
      bVar121 = (bVar440 < bVar269) * bVar269 | (bVar440 >= bVar269) * bVar440;
      bVar269 = (byte)((ulong)uVar6 >> 0x10);
      bVar124 = (bVar441 < bVar269) * bVar269 | (bVar441 >= bVar269) * bVar441;
      bVar269 = (byte)((ulong)uVar6 >> 0x18);
      bVar126 = (bVar442 < bVar269) * bVar269 | (bVar442 >= bVar269) * bVar442;
      bVar269 = (byte)((ulong)uVar6 >> 0x20);
      bVar129 = (bVar443 < bVar269) * bVar269 | (bVar443 >= bVar269) * bVar443;
      bVar269 = (byte)((ulong)uVar6 >> 0x28);
      bVar131 = (bVar444 < bVar269) * bVar269 | (bVar444 >= bVar269) * bVar444;
      bVar269 = (byte)((ulong)uVar6 >> 0x30);
      bVar134 = (bVar445 < bVar269) * bVar269 | (bVar445 >= bVar269) * bVar445;
      bVar269 = (byte)((ulong)uVar6 >> 0x38);
      bVar136 = (bVar446 < bVar269) * bVar269 | (bVar446 >= bVar269) * bVar446;
      bVar269 = (byte)uVar5;
      bVar194 = (bVar447 < bVar269) * bVar269 | (bVar447 >= bVar269) * bVar447;
      bVar269 = (byte)((ulong)uVar5 >> 8);
      bVar213 = (bVar448 < bVar269) * bVar269 | (bVar448 >= bVar269) * bVar448;
      bVar269 = (byte)((ulong)uVar5 >> 0x10);
      bVar215 = (bVar449 < bVar269) * bVar269 | (bVar449 >= bVar269) * bVar449;
      bVar269 = (byte)((ulong)uVar5 >> 0x18);
      bVar217 = (bVar450 < bVar269) * bVar269 | (bVar450 >= bVar269) * bVar450;
      bVar269 = (byte)((ulong)uVar5 >> 0x20);
      bVar219 = (bVar451 < bVar269) * bVar269 | (bVar451 >= bVar269) * bVar451;
      bVar269 = (byte)((ulong)uVar5 >> 0x28);
      bVar221 = (bVar452 < bVar269) * bVar269 | (bVar452 >= bVar269) * bVar452;
      bVar269 = (byte)((ulong)uVar5 >> 0x30);
      bVar223 = (bVar453 < bVar269) * bVar269 | (bVar453 >= bVar269) * bVar453;
      bVar269 = (byte)((ulong)uVar5 >> 0x38);
      bVar269 = (bVar454 < bVar269) * bVar269 | (bVar454 >= bVar269) * bVar454;
      bVar106 = (bVar106 < bVar120) * bVar120 | (bVar106 >= bVar120) * bVar106;
      bVar120 = (bVar121 < bVar123) * bVar123 | (bVar121 >= bVar123) * bVar121;
      bVar121 = (bVar124 < bVar125) * bVar125 | (bVar124 >= bVar125) * bVar124;
      bVar123 = (bVar126 < bVar128) * bVar128 | (bVar126 >= bVar128) * bVar126;
      bVar124 = (bVar129 < bVar130) * bVar130 | (bVar129 >= bVar130) * bVar129;
      bVar125 = (bVar131 < bVar133) * bVar133 | (bVar131 >= bVar133) * bVar131;
      bVar126 = (bVar134 < bVar135) * bVar135 | (bVar134 >= bVar135) * bVar134;
      bVar128 = (bVar136 < bVar138) * bVar138 | (bVar136 >= bVar138) * bVar136;
      bVar129 = (bVar194 < bVar212) * bVar212 | (bVar194 >= bVar212) * bVar194;
      bVar130 = (bVar213 < bVar214) * bVar214 | (bVar213 >= bVar214) * bVar213;
      bVar131 = (bVar215 < bVar216) * bVar216 | (bVar215 >= bVar216) * bVar215;
      bVar133 = (bVar217 < bVar218) * bVar218 | (bVar217 >= bVar218) * bVar217;
      bVar134 = (bVar219 < bVar220) * bVar220 | (bVar219 >= bVar220) * bVar219;
      bVar135 = (bVar221 < bVar222) * bVar222 | (bVar221 >= bVar222) * bVar221;
      bVar136 = (bVar223 < bVar224) * bVar224 | (bVar223 >= bVar224) * bVar223;
      bVar138 = (bVar269 < bVar226) * bVar226 | (bVar269 >= bVar226) * bVar269;
      bVar269 = (byte)uVar8;
      auVar458[0] = (bVar227 < bVar269) * bVar269 | (bVar227 >= bVar269) * bVar227;
      bVar269 = (byte)((ulong)uVar8 >> 8);
      auVar458[1] = (bVar241 < bVar269) * bVar269 | (bVar241 >= bVar269) * bVar241;
      bVar269 = (byte)((ulong)uVar8 >> 0x10);
      auVar458[2] = (bVar242 < bVar269) * bVar269 | (bVar242 >= bVar269) * bVar242;
      bVar269 = (byte)((ulong)uVar8 >> 0x18);
      auVar458[3] = (bVar245 < bVar269) * bVar269 | (bVar245 >= bVar269) * bVar245;
      bVar269 = (byte)((ulong)uVar8 >> 0x20);
      auVar458[4] = (bVar246 < bVar269) * bVar269 | (bVar246 >= bVar269) * bVar246;
      bVar269 = (byte)((ulong)uVar8 >> 0x28);
      auVar458[5] = (bVar249 < bVar269) * bVar269 | (bVar249 >= bVar269) * bVar249;
      bVar269 = (byte)((ulong)uVar8 >> 0x30);
      auVar458[6] = (bVar250 < bVar269) * bVar269 | (bVar250 >= bVar269) * bVar250;
      bVar269 = (byte)((ulong)uVar8 >> 0x38);
      auVar458[7] = (bVar253 < bVar269) * bVar269 | (bVar253 >= bVar269) * bVar253;
      bVar269 = (byte)uVar7;
      auVar458[8] = (bVar254 < bVar269) * bVar269 | (bVar254 >= bVar269) * bVar254;
      bVar269 = (byte)((ulong)uVar7 >> 8);
      auVar458[9] = (bVar257 < bVar269) * bVar269 | (bVar257 >= bVar269) * bVar257;
      bVar269 = (byte)((ulong)uVar7 >> 0x10);
      auVar458[10] = (bVar258 < bVar269) * bVar269 | (bVar258 >= bVar269) * bVar258;
      bVar269 = (byte)((ulong)uVar7 >> 0x18);
      auVar458[0xb] = (bVar261 < bVar269) * bVar269 | (bVar261 >= bVar269) * bVar261;
      bVar269 = (byte)((ulong)uVar7 >> 0x20);
      auVar458[0xc] = (bVar262 < bVar269) * bVar269 | (bVar262 >= bVar269) * bVar262;
      bVar269 = (byte)((ulong)uVar7 >> 0x28);
      auVar458[0xd] = (bVar265 < bVar269) * bVar269 | (bVar265 >= bVar269) * bVar265;
      bVar269 = (byte)((ulong)uVar7 >> 0x30);
      auVar458[0xe] = (bVar266 < bVar269) * bVar269 | (bVar266 >= bVar269) * bVar266;
      bVar269 = (byte)((ulong)uVar7 >> 0x38);
      auVar458[0xf] = (bVar225 < bVar269) * bVar269 | (bVar225 >= bVar269) * bVar225;
      sVar38 = (short)uVar4;
      sVar175 = (short)uVar8;
      auVar210._0_2_ = (ushort)(sVar38 < sVar175) * sVar38 | (ushort)(sVar38 >= sVar175) * sVar175;
      sVar40 = (short)((ulong)uVar4 >> 0x10);
      sVar127 = (short)((ulong)uVar8 >> 0x10);
      auVar210._2_2_ = (ushort)(sVar40 < sVar127) * sVar40 | (ushort)(sVar40 >= sVar127) * sVar127;
      sVar59 = (short)((ulong)uVar4 >> 0x20);
      sVar179 = (short)((ulong)uVar8 >> 0x20);
      auVar210._4_2_ = (ushort)(sVar59 < sVar179) * sVar59 | (ushort)(sVar59 >= sVar179) * sVar179;
      sVar60 = (short)((ulong)uVar4 >> 0x30);
      sVar132 = (short)((ulong)uVar8 >> 0x30);
      auVar210._6_2_ = (ushort)(sVar60 < sVar132) * sVar60 | (ushort)(sVar60 >= sVar132) * sVar132;
      sVar63 = (short)uVar3;
      sVar183 = (short)uVar7;
      auVar210._8_2_ = (ushort)(sVar63 < sVar183) * sVar63 | (ushort)(sVar63 >= sVar183) * sVar183;
      sVar64 = (short)((ulong)uVar3 >> 0x10);
      sVar137 = (short)((ulong)uVar7 >> 0x10);
      auVar210._10_2_ = (ushort)(sVar64 < sVar137) * sVar64 | (ushort)(sVar64 >= sVar137) * sVar137;
      sVar67 = (short)((ulong)uVar3 >> 0x20);
      sVar187 = (short)((ulong)uVar7 >> 0x20);
      sVar141 = (short)((ulong)uVar7 >> 0x30);
      auVar210._12_2_ = (ushort)(sVar67 < sVar187) * sVar67 | (ushort)(sVar67 >= sVar187) * sVar187;
      sVar68 = (short)((ulong)uVar3 >> 0x30);
      auVar210._14_2_ = (ushort)(sVar68 < sVar141) * sVar68 | (ushort)(sVar68 >= sVar141) * sVar141;
      auVar303._0_2_ = sVar38 - sVar294;
      auVar303._2_2_ = sVar40 - sVar308;
      auVar303._4_2_ = sVar59 - sVar310;
      auVar303._6_2_ = sVar60 - sVar312;
      auVar303._8_2_ = sVar63 - sVar314;
      auVar303._10_2_ = sVar64 - sVar316;
      auVar303._12_2_ = sVar67 - sVar318;
      auVar303._14_2_ = sVar68 - sVar321;
      bVar269 = (byte)uVar10;
      auVar439[0] = (bVar106 < bVar269) * bVar269 | (bVar106 >= bVar269) * bVar106;
      bVar269 = (byte)((ulong)uVar10 >> 8);
      auVar439[1] = (bVar120 < bVar269) * bVar269 | (bVar120 >= bVar269) * bVar120;
      bVar269 = (byte)((ulong)uVar10 >> 0x10);
      auVar439[2] = (bVar121 < bVar269) * bVar269 | (bVar121 >= bVar269) * bVar121;
      bVar269 = (byte)((ulong)uVar10 >> 0x18);
      auVar439[3] = (bVar123 < bVar269) * bVar269 | (bVar123 >= bVar269) * bVar123;
      bVar269 = (byte)((ulong)uVar10 >> 0x20);
      auVar439[4] = (bVar124 < bVar269) * bVar269 | (bVar124 >= bVar269) * bVar124;
      bVar269 = (byte)((ulong)uVar10 >> 0x28);
      auVar439[5] = (bVar125 < bVar269) * bVar269 | (bVar125 >= bVar269) * bVar125;
      bVar269 = (byte)((ulong)uVar10 >> 0x30);
      auVar439[6] = (bVar126 < bVar269) * bVar269 | (bVar126 >= bVar269) * bVar126;
      bVar269 = (byte)((ulong)uVar10 >> 0x38);
      auVar439[7] = (bVar128 < bVar269) * bVar269 | (bVar128 >= bVar269) * bVar128;
      bVar269 = (byte)uVar9;
      auVar439[8] = (bVar129 < bVar269) * bVar269 | (bVar129 >= bVar269) * bVar129;
      bVar269 = (byte)((ulong)uVar9 >> 8);
      auVar439[9] = (bVar130 < bVar269) * bVar269 | (bVar130 >= bVar269) * bVar130;
      bVar269 = (byte)((ulong)uVar9 >> 0x10);
      auVar439[10] = (bVar131 < bVar269) * bVar269 | (bVar131 >= bVar269) * bVar131;
      bVar269 = (byte)((ulong)uVar9 >> 0x18);
      auVar439[0xb] = (bVar133 < bVar269) * bVar269 | (bVar133 >= bVar269) * bVar133;
      bVar269 = (byte)((ulong)uVar9 >> 0x20);
      auVar439[0xc] = (bVar134 < bVar269) * bVar269 | (bVar134 >= bVar269) * bVar134;
      bVar269 = (byte)((ulong)uVar9 >> 0x28);
      auVar439[0xd] = (bVar135 < bVar269) * bVar269 | (bVar135 >= bVar269) * bVar135;
      bVar269 = (byte)((ulong)uVar9 >> 0x30);
      auVar439[0xe] = (bVar136 < bVar269) * bVar269 | (bVar136 >= bVar269) * bVar136;
      bVar269 = (byte)((ulong)uVar9 >> 0x38);
      auVar439[0xf] = (bVar138 < bVar269) * bVar269 | (bVar138 >= bVar269) * bVar138;
      sVar38 = (short)uVar6;
      sVar58 = (short)uVar10;
      uVar166 = (ushort)(sVar38 < sVar58) * sVar38 | (ushort)(sVar38 >= sVar58) * sVar58;
      sVar40 = (short)((ulong)uVar6 >> 0x10);
      sVar72 = (short)((ulong)uVar10 >> 0x10);
      uVar174 = (ushort)(sVar40 < sVar72) * sVar40 | (ushort)(sVar40 >= sVar72) * sVar72;
      sVar59 = (short)((ulong)uVar6 >> 0x20);
      sVar75 = (short)((ulong)uVar10 >> 0x20);
      uVar182 = (ushort)(sVar59 < sVar75) * sVar59 | (ushort)(sVar59 >= sVar75) * sVar75;
      sVar60 = (short)((ulong)uVar6 >> 0x30);
      sVar76 = (short)((ulong)uVar10 >> 0x30);
      uVar190 = (ushort)(sVar60 < sVar76) * sVar60 | (ushort)(sVar60 >= sVar76) * sVar76;
      sVar63 = (short)uVar5;
      sVar140 = (short)uVar9;
      uVar307 = (ushort)(sVar63 < sVar140) * sVar63 | (ushort)(sVar63 >= sVar140) * sVar140;
      sVar64 = (short)((ulong)uVar5 >> 0x10);
      sVar80 = (short)((ulong)uVar9 >> 0x10);
      uVar311 = (ushort)(sVar64 < sVar80) * sVar64 | (ushort)(sVar64 >= sVar80) * sVar80;
      sVar67 = (short)((ulong)uVar5 >> 0x20);
      sVar167 = (short)((ulong)uVar9 >> 0x20);
      sVar86 = (short)((ulong)uVar9 >> 0x30);
      uVar315 = (ushort)(sVar67 < sVar167) * sVar67 | (ushort)(sVar67 >= sVar167) * sVar167;
      sVar68 = (short)((ulong)uVar5 >> 0x30);
      uVar320 = (ushort)(sVar68 < sVar86) * sVar68 | (ushort)(sVar68 >= sVar86) * sVar86;
      auVar331._0_2_ = sVar38 - sVar349;
      auVar331._2_2_ = sVar40 - sVar364;
      auVar331._4_2_ = sVar59 - sVar348;
      auVar331._6_2_ = sVar60 - sVar367;
      auVar331._8_2_ = sVar63 - sVar363;
      auVar331._10_2_ = sVar64 - sVar372;
      auVar331._12_2_ = sVar67 - sVar365;
      auVar331._14_2_ = sVar68 - sVar379;
      auVar271 = pabsw(auVar347,auVar303);
      uVar270 = auVar271._0_2_;
      auVar359._0_2_ = uVar270 >> local_198._0_8_;
      uVar286 = auVar271._2_2_;
      auVar359._2_2_ = uVar286 >> local_198._0_8_;
      uVar287 = auVar271._4_2_;
      auVar359._4_2_ = uVar287 >> local_198._0_8_;
      uVar288 = auVar271._6_2_;
      auVar359._6_2_ = uVar288 >> local_198._0_8_;
      uVar289 = auVar271._8_2_;
      auVar359._8_2_ = uVar289 >> local_198._0_8_;
      uVar290 = auVar271._10_2_;
      auVar359._10_2_ = uVar290 >> local_198._0_8_;
      uVar291 = auVar271._12_2_;
      uVar292 = auVar271._14_2_;
      auVar359._12_2_ = uVar291 >> local_198._0_8_;
      auVar359._14_2_ = uVar292 >> local_198._0_8_;
      auVar57 = pabsw(auVar210,auVar331);
      uVar61 = auVar57._0_2_;
      auVar119._0_2_ = uVar61 >> local_198._0_8_;
      uVar69 = auVar57._2_2_;
      auVar119._2_2_ = uVar69 >> local_198._0_8_;
      uVar77 = auVar57._4_2_;
      auVar119._4_2_ = uVar77 >> local_198._0_8_;
      uVar87 = auVar57._6_2_;
      auVar119._6_2_ = uVar87 >> local_198._0_8_;
      uVar492 = auVar57._8_2_;
      auVar119._8_2_ = uVar492 >> local_198._0_8_;
      uVar78 = auVar57._10_2_;
      auVar119._10_2_ = uVar78 >> local_198._0_8_;
      uVar84 = auVar57._12_2_;
      uVar90 = auVar57._14_2_;
      auVar119._12_2_ = uVar84 >> local_198._0_8_;
      auVar119._14_2_ = uVar90 >> local_198._0_8_;
      auVar57 = psubusw(local_168,auVar359);
      auVar203 = psubusw(local_168,auVar119);
      sVar38 = auVar57._0_2_;
      sVar40 = auVar57._2_2_;
      sVar59 = auVar57._4_2_;
      sVar60 = auVar57._6_2_;
      sVar63 = auVar57._8_2_;
      sVar64 = auVar57._10_2_;
      sVar67 = auVar57._12_2_;
      sVar68 = auVar57._14_2_;
      sVar42 = auVar203._0_2_;
      sVar62 = auVar203._2_2_;
      sVar66 = auVar203._4_2_;
      sVar70 = auVar203._6_2_;
      sVar74 = auVar203._8_2_;
      sVar79 = auVar203._10_2_;
      sVar85 = auVar203._12_2_;
      sVar191 = auVar203._14_2_;
      auVar57 = psraw(auVar303,0xf);
      auVar341._0_2_ =
           (((short)uVar270 < sVar38) * uVar270 | (ushort)((short)uVar270 >= sVar38) * sVar38) +
           auVar57._0_2_;
      auVar341._2_2_ =
           (((short)uVar286 < sVar40) * uVar286 | (ushort)((short)uVar286 >= sVar40) * sVar40) +
           auVar57._2_2_;
      auVar341._4_2_ =
           (((short)uVar287 < sVar59) * uVar287 | (ushort)((short)uVar287 >= sVar59) * sVar59) +
           auVar57._4_2_;
      auVar341._6_2_ =
           (((short)uVar288 < sVar60) * uVar288 | (ushort)((short)uVar288 >= sVar60) * sVar60) +
           auVar57._6_2_;
      auVar341._8_2_ =
           (((short)uVar289 < sVar63) * uVar289 | (ushort)((short)uVar289 >= sVar63) * sVar63) +
           auVar57._8_2_;
      auVar341._10_2_ =
           (((short)uVar290 < sVar64) * uVar290 | (ushort)((short)uVar290 >= sVar64) * sVar64) +
           auVar57._10_2_;
      auVar341._12_2_ =
           (((short)uVar291 < sVar67) * uVar291 | (ushort)((short)uVar291 >= sVar67) * sVar67) +
           auVar57._12_2_;
      auVar341._14_2_ =
           (((short)uVar292 < sVar68) * uVar292 | (ushort)((short)uVar292 >= sVar68) * sVar68) +
           auVar57._14_2_;
      auVar341 = auVar341 ^ auVar57;
      auVar57 = psraw(auVar331,0xf);
      auVar104._0_2_ =
           (((short)uVar61 < sVar42) * uVar61 | (ushort)((short)uVar61 >= sVar42) * sVar42) +
           auVar57._0_2_;
      auVar104._2_2_ =
           (((short)uVar69 < sVar62) * uVar69 | (ushort)((short)uVar69 >= sVar62) * sVar62) +
           auVar57._2_2_;
      auVar104._4_2_ =
           (((short)uVar77 < sVar66) * uVar77 | (ushort)((short)uVar77 >= sVar66) * sVar66) +
           auVar57._4_2_;
      auVar104._6_2_ =
           (((short)uVar87 < sVar70) * uVar87 | (ushort)((short)uVar87 >= sVar70) * sVar70) +
           auVar57._6_2_;
      auVar104._8_2_ =
           (((short)uVar492 < sVar74) * uVar492 | (ushort)((short)uVar492 >= sVar74) * sVar74) +
           auVar57._8_2_;
      auVar104._10_2_ =
           (((short)uVar78 < sVar79) * uVar78 | (ushort)((short)uVar78 >= sVar79) * sVar79) +
           auVar57._10_2_;
      auVar104._12_2_ =
           (((short)uVar84 < sVar85) * uVar84 | (ushort)((short)uVar84 >= sVar85) * sVar85) +
           auVar57._12_2_;
      auVar104._14_2_ =
           (((short)uVar90 < sVar191) * uVar90 | (ushort)((short)uVar90 >= sVar191) * sVar191) +
           auVar57._14_2_;
      auVar104 = auVar104 ^ auVar57;
      auVar165._0_2_ = sVar175 - sVar294;
      auVar165._2_2_ = sVar127 - sVar308;
      auVar165._4_2_ = sVar179 - sVar310;
      auVar165._6_2_ = sVar132 - sVar312;
      auVar165._8_2_ = sVar183 - sVar314;
      auVar165._10_2_ = sVar137 - sVar316;
      auVar165._12_2_ = sVar187 - sVar318;
      auVar165._14_2_ = sVar141 - sVar321;
      auVar57 = pabsw(auVar271,auVar165);
      uVar61 = auVar57._0_2_;
      auVar211._0_2_ = uVar61 >> local_198._0_8_;
      uVar69 = auVar57._2_2_;
      auVar211._2_2_ = uVar69 >> local_198._0_8_;
      uVar77 = auVar57._4_2_;
      auVar211._4_2_ = uVar77 >> local_198._0_8_;
      uVar87 = auVar57._6_2_;
      auVar211._6_2_ = uVar87 >> local_198._0_8_;
      uVar492 = auVar57._8_2_;
      auVar211._8_2_ = uVar492 >> local_198._0_8_;
      uVar78 = auVar57._10_2_;
      auVar211._10_2_ = uVar78 >> local_198._0_8_;
      uVar84 = auVar57._12_2_;
      uVar90 = auVar57._14_2_;
      auVar211._12_2_ = uVar84 >> local_198._0_8_;
      auVar211._14_2_ = uVar90 >> local_198._0_8_;
      auVar203 = psubusw(local_168,auVar211);
      auVar483._0_2_ = sVar58 - sVar349;
      auVar483._2_2_ = sVar72 - sVar364;
      auVar483._4_2_ = sVar75 - sVar348;
      auVar483._6_2_ = sVar76 - sVar367;
      auVar483._8_2_ = sVar140 - sVar363;
      auVar483._10_2_ = sVar80 - sVar372;
      auVar483._12_2_ = sVar167 - sVar365;
      auVar483._14_2_ = sVar86 - sVar379;
      auVar57 = pabsw(auVar211,auVar483);
      uVar270 = auVar57._0_2_;
      auVar332._0_2_ = uVar270 >> local_198._0_8_;
      uVar286 = auVar57._2_2_;
      auVar332._2_2_ = uVar286 >> local_198._0_8_;
      uVar287 = auVar57._4_2_;
      auVar332._4_2_ = uVar287 >> local_198._0_8_;
      uVar288 = auVar57._6_2_;
      auVar332._6_2_ = uVar288 >> local_198._0_8_;
      uVar289 = auVar57._8_2_;
      auVar332._8_2_ = uVar289 >> local_198._0_8_;
      uVar290 = auVar57._10_2_;
      auVar332._10_2_ = uVar290 >> local_198._0_8_;
      uVar291 = auVar57._12_2_;
      uVar292 = auVar57._14_2_;
      auVar332._12_2_ = uVar291 >> local_198._0_8_;
      auVar332._14_2_ = uVar292 >> local_198._0_8_;
      auVar57 = psubusw(local_168,auVar332);
      sVar38 = auVar203._0_2_;
      sVar40 = auVar203._2_2_;
      sVar59 = auVar203._4_2_;
      sVar60 = auVar203._6_2_;
      sVar63 = auVar203._8_2_;
      sVar64 = auVar203._10_2_;
      sVar67 = auVar203._12_2_;
      sVar68 = auVar203._14_2_;
      sVar42 = auVar57._0_2_;
      sVar62 = auVar57._2_2_;
      sVar66 = auVar57._4_2_;
      sVar70 = auVar57._6_2_;
      sVar74 = auVar57._8_2_;
      sVar79 = auVar57._10_2_;
      sVar85 = auVar57._12_2_;
      sVar191 = auVar57._14_2_;
      auVar57 = psraw(auVar165,0xf);
      auVar304._0_2_ =
           (((short)uVar61 < sVar38) * uVar61 | (ushort)((short)uVar61 >= sVar38) * sVar38) +
           auVar57._0_2_;
      auVar304._2_2_ =
           (((short)uVar69 < sVar40) * uVar69 | (ushort)((short)uVar69 >= sVar40) * sVar40) +
           auVar57._2_2_;
      auVar304._4_2_ =
           (((short)uVar77 < sVar59) * uVar77 | (ushort)((short)uVar77 >= sVar59) * sVar59) +
           auVar57._4_2_;
      auVar304._6_2_ =
           (((short)uVar87 < sVar60) * uVar87 | (ushort)((short)uVar87 >= sVar60) * sVar60) +
           auVar57._6_2_;
      auVar304._8_2_ =
           (((short)uVar492 < sVar63) * uVar492 | (ushort)((short)uVar492 >= sVar63) * sVar63) +
           auVar57._8_2_;
      auVar304._10_2_ =
           (((short)uVar78 < sVar64) * uVar78 | (ushort)((short)uVar78 >= sVar64) * sVar64) +
           auVar57._10_2_;
      auVar304._12_2_ =
           (((short)uVar84 < sVar67) * uVar84 | (ushort)((short)uVar84 >= sVar67) * sVar67) +
           auVar57._12_2_;
      auVar304._14_2_ =
           (((short)uVar90 < sVar68) * uVar90 | (ushort)((short)uVar90 >= sVar68) * sVar68) +
           auVar57._14_2_;
      auVar304 = auVar304 ^ auVar57;
      auVar57 = psraw(auVar483,0xf);
      auVar360._0_2_ =
           (((short)uVar270 < sVar42) * uVar270 | (ushort)((short)uVar270 >= sVar42) * sVar42) +
           auVar57._0_2_;
      auVar360._2_2_ =
           (((short)uVar286 < sVar62) * uVar286 | (ushort)((short)uVar286 >= sVar62) * sVar62) +
           auVar57._2_2_;
      auVar360._4_2_ =
           (((short)uVar287 < sVar66) * uVar287 | (ushort)((short)uVar287 >= sVar66) * sVar66) +
           auVar57._4_2_;
      auVar360._6_2_ =
           (((short)uVar288 < sVar70) * uVar288 | (ushort)((short)uVar288 >= sVar70) * sVar70) +
           auVar57._6_2_;
      auVar360._8_2_ =
           (((short)uVar289 < sVar74) * uVar289 | (ushort)((short)uVar289 >= sVar74) * sVar74) +
           auVar57._8_2_;
      auVar360._10_2_ =
           (((short)uVar290 < sVar79) * uVar290 | (ushort)((short)uVar290 >= sVar79) * sVar79) +
           auVar57._10_2_;
      auVar360._12_2_ =
           (((short)uVar291 < sVar85) * uVar291 | (ushort)((short)uVar291 >= sVar85) * sVar85) +
           auVar57._12_2_;
      auVar360._14_2_ =
           (((short)uVar292 < sVar191) * uVar292 | (ushort)((short)uVar292 >= sVar191) * sVar191) +
           auVar57._14_2_;
      auVar360 = auVar360 ^ auVar57;
      local_c8 = auVar46._0_2_;
      sStack_c6 = auVar46._2_2_;
      auVar305._0_2_ =
           (auVar304._0_2_ + auVar341._0_2_ + auVar285._0_2_ + auVar482._0_2_) * local_c8 +
           (auVar416._0_2_ + auVar230._0_2_ + auVar358._0_2_ + auVar161._0_2_) * local_b8 +
           (auVar481._0_2_ + local_68) * sVar171 + (auVar415._0_2_ + auVar113._0_2_) * sVar39;
      auVar305._2_2_ =
           (auVar304._2_2_ + auVar341._2_2_ + auVar285._2_2_ + auVar482._2_2_) * sStack_c6 +
           (auVar416._2_2_ + auVar230._2_2_ + auVar358._2_2_ + auVar161._2_2_) * sStack_b6 +
           (auVar481._2_2_ + sStack_66) * sVar122 + (auVar415._2_2_ + auVar113._2_2_) * sVar71;
      auVar305._4_2_ =
           (auVar304._4_2_ + auVar341._4_2_ + auVar285._4_2_ + auVar482._4_2_) * local_c8 +
           (auVar416._4_2_ + auVar230._4_2_ + auVar358._4_2_ + auVar161._4_2_) * local_b8 +
           (auVar481._4_2_ + sStack_64) * sVar171 + (auVar415._4_2_ + auVar113._4_2_) * sVar39;
      auVar305._6_2_ =
           (auVar304._6_2_ + auVar341._6_2_ + auVar285._6_2_ + auVar482._6_2_) * sStack_c6 +
           (auVar416._6_2_ + auVar230._6_2_ + auVar358._6_2_ + auVar161._6_2_) * sStack_b6 +
           (auVar481._6_2_ + sStack_62) * sVar122 + (auVar415._6_2_ + auVar113._6_2_) * sVar71;
      auVar305._8_2_ =
           (auVar304._8_2_ + auVar341._8_2_ + auVar285._8_2_ + auVar482._8_2_) * local_c8 +
           (auVar416._8_2_ + auVar230._8_2_ + auVar358._8_2_ + auVar161._8_2_) * local_b8 +
           (auVar481._8_2_ + sStack_60) * sVar171 + (auVar415._8_2_ + auVar113._8_2_) * sVar39;
      auVar305._10_2_ =
           (auVar304._10_2_ + auVar341._10_2_ + auVar285._10_2_ + auVar482._10_2_) * sStack_c6 +
           (auVar416._10_2_ + auVar230._10_2_ + auVar358._10_2_ + auVar161._10_2_) * sStack_b6 +
           (auVar481._10_2_ + sStack_5e) * sVar122 + (auVar415._10_2_ + auVar113._10_2_) * sVar71;
      auVar305._12_2_ =
           (auVar304._12_2_ + auVar341._12_2_ + auVar285._12_2_ + auVar482._12_2_) * local_c8 +
           (auVar416._12_2_ + auVar230._12_2_ + auVar358._12_2_ + auVar161._12_2_) * local_b8 +
           (auVar481._12_2_ + sStack_5c) * sVar171 + (auVar415._12_2_ + auVar113._12_2_) * sVar39;
      auVar305._14_2_ =
           (auVar304._14_2_ + auVar341._14_2_ + auVar285._14_2_ + auVar482._14_2_) * sStack_c6 +
           (auVar416._14_2_ + auVar230._14_2_ + auVar358._14_2_ + auVar161._14_2_) * sStack_b6 +
           (auVar481._14_2_ + sStack_5a) * sVar122 + (auVar415._14_2_ + auVar113._14_2_) * sVar71;
      auVar361._0_2_ =
           (auVar360._0_2_ + auVar104._0_2_ + auVar240._0_2_ + auVar164._0_2_) * local_c8 +
           (auVar385._0_2_ + auVar457._0_2_ + auVar301._0_2_ + auVar116._0_2_) * local_b8 +
           (auVar438._0_2_ + local_118) * sVar171 + (auVar205._0_2_ + auVar342._0_2_) * sVar39;
      auVar361._2_2_ =
           (auVar360._2_2_ + auVar104._2_2_ + auVar240._2_2_ + auVar164._2_2_) * sStack_c6 +
           (auVar385._2_2_ + auVar457._2_2_ + auVar301._2_2_ + auVar116._2_2_) * sStack_b6 +
           (auVar438._2_2_ + sStack_116) * sVar122 + (auVar205._2_2_ + auVar342._2_2_) * sVar71;
      auVar361._4_2_ =
           (auVar360._4_2_ + auVar104._4_2_ + auVar240._4_2_ + auVar164._4_2_) * local_c8 +
           (auVar385._4_2_ + auVar457._4_2_ + auVar301._4_2_ + auVar116._4_2_) * local_b8 +
           (auVar438._4_2_ + sStack_114) * sVar171 + (auVar205._4_2_ + auVar342._4_2_) * sVar39;
      auVar361._6_2_ =
           (auVar360._6_2_ + auVar104._6_2_ + auVar240._6_2_ + auVar164._6_2_) * sStack_c6 +
           (auVar385._6_2_ + auVar457._6_2_ + auVar301._6_2_ + auVar116._6_2_) * sStack_b6 +
           (auVar438._6_2_ + sStack_112) * sVar122 + (auVar205._6_2_ + auVar342._6_2_) * sVar71;
      auVar361._8_2_ =
           (auVar360._8_2_ + auVar104._8_2_ + auVar240._8_2_ + auVar164._8_2_) * local_c8 +
           (auVar385._8_2_ + auVar457._8_2_ + auVar301._8_2_ + auVar116._8_2_) * local_b8 +
           (auVar438._8_2_ + sStack_110) * sVar171 + (auVar205._8_2_ + auVar342._8_2_) * sVar39;
      auVar361._10_2_ =
           (auVar360._10_2_ + auVar104._10_2_ + auVar240._10_2_ + auVar164._10_2_) * sStack_c6 +
           (auVar385._10_2_ + auVar457._10_2_ + auVar301._10_2_ + auVar116._10_2_) * sStack_b6 +
           (auVar438._10_2_ + sStack_10e) * sVar122 + (auVar205._10_2_ + auVar342._10_2_) * sVar71;
      auVar361._12_2_ =
           (auVar360._12_2_ + auVar104._12_2_ + auVar240._12_2_ + auVar164._12_2_) * local_c8 +
           (auVar385._12_2_ + auVar457._12_2_ + auVar301._12_2_ + auVar116._12_2_) * local_b8 +
           (auVar438._12_2_ + sStack_10c) * sVar171 + (auVar205._12_2_ + auVar342._12_2_) * sVar39;
      auVar361._14_2_ =
           (auVar360._14_2_ + auVar104._14_2_ + auVar240._14_2_ + auVar164._14_2_) * sStack_c6 +
           (auVar385._14_2_ + auVar457._14_2_ + auVar301._14_2_ + auVar116._14_2_) * sStack_b6 +
           (auVar438._14_2_ + sStack_10a) * sVar122 + (auVar205._14_2_ + auVar342._14_2_) * sVar71;
      local_158 = local_158 & _DAT_004c1840;
      sVar38 = local_158._0_2_;
      uVar61 = (ushort)(sVar38 < sVar294) * sVar294 | (ushort)(sVar38 >= sVar294) * sVar38;
      sVar38 = local_158._2_2_;
      uVar69 = (ushort)(sVar38 < sVar308) * sVar308 | (ushort)(sVar38 >= sVar308) * sVar38;
      sVar38 = local_158._4_2_;
      uVar77 = (ushort)(sVar38 < sVar310) * sVar310 | (ushort)(sVar38 >= sVar310) * sVar38;
      sVar38 = local_158._6_2_;
      uVar87 = (ushort)(sVar38 < sVar312) * sVar312 | (ushort)(sVar38 >= sVar312) * sVar38;
      sVar38 = local_158._8_2_;
      uVar492 = (ushort)(sVar38 < sVar314) * sVar314 | (ushort)(sVar38 >= sVar314) * sVar38;
      sVar38 = local_158._10_2_;
      uVar78 = (ushort)(sVar38 < sVar316) * sVar316 | (ushort)(sVar38 >= sVar316) * sVar38;
      sVar38 = local_158._12_2_;
      sVar40 = local_158._14_2_;
      uVar84 = (ushort)(sVar38 < sVar318) * sVar318 | (ushort)(sVar38 >= sVar318) * sVar38;
      uVar90 = (ushort)(sVar40 < sVar321) * sVar321 | (ushort)(sVar40 >= sVar321) * sVar40;
      auVar458 = auVar458 & _DAT_004c1840;
      sVar38 = auVar458._0_2_;
      uVar381 = (sVar38 < (short)uVar61) * uVar61 | (ushort)(sVar38 >= (short)uVar61) * sVar38;
      sVar38 = auVar458._2_2_;
      uVar388 = (sVar38 < (short)uVar69) * uVar69 | (ushort)(sVar38 >= (short)uVar69) * sVar38;
      sVar38 = auVar458._4_2_;
      uVar392 = (sVar38 < (short)uVar77) * uVar77 | (ushort)(sVar38 >= (short)uVar77) * sVar38;
      sVar38 = auVar458._6_2_;
      uVar396 = (sVar38 < (short)uVar87) * uVar87 | (ushort)(sVar38 >= (short)uVar87) * sVar38;
      sVar38 = auVar458._8_2_;
      uVar400 = (sVar38 < (short)uVar492) * uVar492 | (ushort)(sVar38 >= (short)uVar492) * sVar38;
      sVar38 = auVar458._10_2_;
      uVar469 = (sVar38 < (short)uVar78) * uVar78 | (ushort)(sVar38 >= (short)uVar78) * sVar38;
      sVar38 = auVar458._12_2_;
      sVar40 = auVar458._14_2_;
      uVar472 = (sVar38 < (short)uVar84) * uVar84 | (ushort)(sVar38 >= (short)uVar84) * sVar38;
      uVar475 = (sVar40 < (short)uVar90) * uVar90 | (ushort)(sVar40 >= (short)uVar90) * sVar40;
      auVar203[1] = (bVar417 < auVar384[1]) * auVar384[1] | (bVar417 >= auVar384[1]) * bVar417;
      auVar203[0] = (bVar411 < auVar384[0]) * auVar384[0] | (bVar411 >= auVar384[0]) * bVar411;
      auVar203[2] = (bVar418 < auVar384[2]) * auVar384[2] | (bVar418 >= auVar384[2]) * bVar418;
      auVar203[3] = (bVar419 < auVar384[3]) * auVar384[3] | (bVar419 >= auVar384[3]) * bVar419;
      auVar203[4] = (bVar420 < auVar384[4]) * auVar384[4] | (bVar420 >= auVar384[4]) * bVar420;
      auVar203[5] = (bVar421 < auVar384[5]) * auVar384[5] | (bVar421 >= auVar384[5]) * bVar421;
      auVar203[6] = (bVar422 < auVar384[6]) * auVar384[6] | (bVar422 >= auVar384[6]) * bVar422;
      auVar203[7] = (bVar423 < auVar384[7]) * auVar384[7] | (bVar423 >= auVar384[7]) * bVar423;
      auVar203[8] = (bVar424 < auVar384[8]) * auVar384[8] | (bVar424 >= auVar384[8]) * bVar424;
      auVar203[9] = (bVar425 < auVar384[9]) * auVar384[9] | (bVar425 >= auVar384[9]) * bVar425;
      auVar203[10] = (bVar426 < auVar384[10]) * auVar384[10] | (bVar426 >= auVar384[10]) * bVar426;
      auVar203[0xb] =
           (bVar427 < auVar384[0xb]) * auVar384[0xb] | (bVar427 >= auVar384[0xb]) * bVar427;
      auVar203[0xc] =
           (bVar428 < auVar384[0xc]) * auVar384[0xc] | (bVar428 >= auVar384[0xc]) * bVar428;
      auVar203[0xd] =
           (bVar429 < auVar384[0xd]) * auVar384[0xd] | (bVar429 >= auVar384[0xd]) * bVar429;
      auVar203[0xe] =
           (bVar430 < auVar384[0xe]) * auVar384[0xe] | (bVar430 >= auVar384[0xe]) * bVar430;
      auVar203[0xf] =
           (bVar431 < auVar384[0xf]) * auVar384[0xf] | (bVar431 >= auVar384[0xf]) * bVar431;
      auVar203 = auVar203 & _DAT_004c1840;
      sVar38 = auVar203._0_2_;
      uVar61 = (ushort)(sVar38 < sVar349) * sVar349 | (ushort)(sVar38 >= sVar349) * sVar38;
      sVar38 = auVar203._2_2_;
      uVar69 = (ushort)(sVar38 < sVar364) * sVar364 | (ushort)(sVar38 >= sVar364) * sVar38;
      sVar38 = auVar203._4_2_;
      uVar77 = (ushort)(sVar38 < sVar348) * sVar348 | (ushort)(sVar38 >= sVar348) * sVar38;
      sVar38 = auVar203._6_2_;
      uVar87 = (ushort)(sVar38 < sVar367) * sVar367 | (ushort)(sVar38 >= sVar367) * sVar38;
      sVar38 = auVar203._8_2_;
      uVar492 = (ushort)(sVar38 < sVar363) * sVar363 | (ushort)(sVar38 >= sVar363) * sVar38;
      sVar38 = auVar203._10_2_;
      uVar78 = (ushort)(sVar38 < sVar372) * sVar372 | (ushort)(sVar38 >= sVar372) * sVar38;
      sVar38 = auVar203._12_2_;
      sVar40 = auVar203._14_2_;
      uVar84 = (ushort)(sVar38 < sVar365) * sVar365 | (ushort)(sVar38 >= sVar365) * sVar38;
      uVar90 = (ushort)(sVar40 < sVar379) * sVar379 | (ushort)(sVar40 >= sVar379) * sVar40;
      auVar439 = auVar439 & _DAT_004c1840;
      sVar38 = auVar439._0_2_;
      uVar270 = (sVar38 < (short)uVar61) * uVar61 | (ushort)(sVar38 >= (short)uVar61) * sVar38;
      sVar38 = auVar439._2_2_;
      uVar286 = (sVar38 < (short)uVar69) * uVar69 | (ushort)(sVar38 >= (short)uVar69) * sVar38;
      sVar38 = auVar439._4_2_;
      uVar287 = (sVar38 < (short)uVar77) * uVar77 | (ushort)(sVar38 >= (short)uVar77) * sVar38;
      sVar38 = auVar439._6_2_;
      uVar288 = (sVar38 < (short)uVar87) * uVar87 | (ushort)(sVar38 >= (short)uVar87) * sVar38;
      sVar38 = auVar439._8_2_;
      uVar289 = (sVar38 < (short)uVar492) * uVar492 | (ushort)(sVar38 >= (short)uVar492) * sVar38;
      sVar38 = auVar439._10_2_;
      uVar290 = (sVar38 < (short)uVar78) * uVar78 | (ushort)(sVar38 >= (short)uVar78) * sVar38;
      sVar38 = auVar439._12_2_;
      sVar40 = auVar439._14_2_;
      uVar291 = (sVar38 < (short)uVar84) * uVar84 | (ushort)(sVar38 >= (short)uVar84) * sVar38;
      uVar292 = (sVar40 < (short)uVar90) * uVar90 | (ushort)(sVar40 >= (short)uVar90) * sVar40;
      uVar61 = ((short)auVar143._0_2_ < (short)uVar322) * auVar143._0_2_ |
               ((short)auVar143._0_2_ >= (short)uVar322) * uVar322;
      uVar69 = ((short)auVar143._2_2_ < (short)uVar333) * auVar143._2_2_ |
               ((short)auVar143._2_2_ >= (short)uVar333) * uVar333;
      uVar77 = ((short)auVar143._4_2_ < (short)uVar334) * auVar143._4_2_ |
               ((short)auVar143._4_2_ >= (short)uVar334) * uVar334;
      uVar87 = ((short)auVar143._6_2_ < (short)uVar335) * auVar143._6_2_ |
               ((short)auVar143._6_2_ >= (short)uVar335) * uVar335;
      uVar492 = ((short)auVar143._8_2_ < (short)uVar336) * auVar143._8_2_ |
                ((short)auVar143._8_2_ >= (short)uVar336) * uVar336;
      uVar78 = ((short)auVar143._10_2_ < (short)uVar337) * auVar143._10_2_ |
               ((short)auVar143._10_2_ >= (short)uVar337) * uVar337;
      uVar84 = ((short)auVar143._12_2_ < (short)uVar338) * auVar143._12_2_ |
               ((short)auVar143._12_2_ >= (short)uVar338) * uVar338;
      uVar90 = ((short)auVar143._14_2_ < (short)uVar339) * auVar143._14_2_ |
               ((short)auVar143._14_2_ >= (short)uVar339) * uVar339;
      auVar105._0_2_ =
           ((short)uVar139 < (short)auVar195._0_2_) * uVar139 |
           ((short)uVar139 >= (short)auVar195._0_2_) * auVar195._0_2_;
      auVar105._2_2_ =
           ((short)uVar170 < (short)auVar195._2_2_) * uVar170 |
           ((short)uVar170 >= (short)auVar195._2_2_) * auVar195._2_2_;
      auVar105._4_2_ =
           ((short)uVar178 < (short)auVar195._4_2_) * uVar178 |
           ((short)uVar178 >= (short)auVar195._4_2_) * auVar195._4_2_;
      auVar105._6_2_ =
           ((short)uVar186 < (short)auVar195._6_2_) * uVar186 |
           ((short)uVar186 >= (short)auVar195._6_2_) * auVar195._6_2_;
      auVar105._8_2_ =
           ((short)uVar293 < (short)auVar195._8_2_) * uVar293 |
           ((short)uVar293 >= (short)auVar195._8_2_) * auVar195._8_2_;
      auVar105._10_2_ =
           ((short)uVar309 < (short)auVar195._10_2_) * uVar309 |
           ((short)uVar309 >= (short)auVar195._10_2_) * auVar195._10_2_;
      auVar105._12_2_ =
           ((short)uVar313 < (short)auVar195._12_2_) * uVar313 |
           ((short)uVar313 >= (short)auVar195._12_2_) * auVar195._12_2_;
      auVar105._14_2_ =
           ((short)uVar317 < (short)auVar195._14_2_) * uVar317 |
           ((short)uVar317 >= (short)auVar195._14_2_) * auVar195._14_2_;
      uVar139 = ((short)uVar61 < (short)uVar41) * uVar61 | ((short)uVar61 >= (short)uVar41) * uVar41
      ;
      uVar170 = ((short)uVar69 < (short)uVar477) * uVar69 |
                ((short)uVar69 >= (short)uVar477) * uVar477;
      uVar178 = ((short)uVar77 < (short)uVar484) * uVar77 |
                ((short)uVar77 >= (short)uVar484) * uVar484;
      uVar486 = ((short)uVar87 < (short)uVar486) * uVar87 |
                ((short)uVar87 >= (short)uVar486) * uVar486;
      uVar87 = ((short)uVar492 < (short)uVar490) * uVar492 |
               ((short)uVar492 >= (short)uVar490) * uVar490;
      uVar490 = ((short)uVar78 < (short)uVar496) * uVar78 |
                ((short)uVar78 >= (short)uVar496) * uVar496;
      uVar492 = ((short)uVar84 < (short)uVar82) * uVar84 | ((short)uVar84 >= (short)uVar82) * uVar82
      ;
      uVar496 = ((short)uVar90 < (short)uVar88) * uVar90 | ((short)uVar90 >= (short)uVar88) * uVar88
      ;
      uVar41 = ((short)auVar105._0_2_ < (short)uVar65) * auVar105._0_2_ |
               ((short)auVar105._0_2_ >= (short)uVar65) * uVar65;
      uVar61 = ((short)auVar105._2_2_ < (short)uVar73) * auVar105._2_2_ |
               ((short)auVar105._2_2_ >= (short)uVar73) * uVar73;
      uVar65 = ((short)auVar105._4_2_ < (short)uVar81) * auVar105._4_2_ |
               ((short)auVar105._4_2_ >= (short)uVar81) * uVar81;
      uVar477 = ((short)auVar105._6_2_ < (short)uVar488) * auVar105._6_2_ |
                ((short)auVar105._6_2_ >= (short)uVar488) * uVar488;
      uVar69 = ((short)auVar105._8_2_ < (short)uVar494) * auVar105._8_2_ |
               ((short)auVar105._8_2_ >= (short)uVar494) * uVar494;
      uVar73 = ((short)auVar105._10_2_ < (short)uVar83) * auVar105._10_2_ |
               ((short)auVar105._10_2_ >= (short)uVar83) * uVar83;
      uVar484 = ((short)auVar105._12_2_ < (short)uVar89) * auVar105._12_2_ |
                ((short)auVar105._12_2_ >= (short)uVar89) * uVar89;
      uVar77 = ((short)auVar105._14_2_ < (short)uVar319) * auVar105._14_2_ |
               ((short)auVar105._14_2_ >= (short)uVar319) * uVar319;
      in_XMM5._0_2_ =
           ((short)uVar139 < (short)auVar210._0_2_) * uVar139 |
           ((short)uVar139 >= (short)auVar210._0_2_) * auVar210._0_2_;
      in_XMM5._2_2_ =
           ((short)uVar170 < (short)auVar210._2_2_) * uVar170 |
           ((short)uVar170 >= (short)auVar210._2_2_) * auVar210._2_2_;
      in_XMM5._4_2_ =
           ((short)uVar178 < (short)auVar210._4_2_) * uVar178 |
           ((short)uVar178 >= (short)auVar210._4_2_) * auVar210._4_2_;
      in_XMM5._6_2_ =
           ((short)uVar486 < (short)auVar210._6_2_) * uVar486 |
           ((short)uVar486 >= (short)auVar210._6_2_) * auVar210._6_2_;
      in_XMM5._8_2_ =
           ((short)uVar87 < (short)auVar210._8_2_) * uVar87 |
           ((short)uVar87 >= (short)auVar210._8_2_) * auVar210._8_2_;
      in_XMM5._10_2_ =
           ((short)uVar490 < (short)auVar210._10_2_) * uVar490 |
           ((short)uVar490 >= (short)auVar210._10_2_) * auVar210._10_2_;
      in_XMM5._12_2_ =
           ((short)uVar492 < (short)auVar210._12_2_) * uVar492 |
           ((short)uVar492 >= (short)auVar210._12_2_) * auVar210._12_2_;
      in_XMM5._14_2_ =
           ((short)uVar496 < (short)auVar210._14_2_) * uVar496 |
           ((short)uVar496 >= (short)auVar210._14_2_) * auVar210._14_2_;
      in_XMM4._0_2_ =
           ((short)uVar41 < (short)uVar166) * uVar41 | ((short)uVar41 >= (short)uVar166) * uVar166;
      in_XMM4._2_2_ =
           ((short)uVar61 < (short)uVar174) * uVar61 | ((short)uVar61 >= (short)uVar174) * uVar174;
      in_XMM4._4_2_ =
           ((short)uVar65 < (short)uVar182) * uVar65 | ((short)uVar65 >= (short)uVar182) * uVar182;
      in_XMM4._6_2_ =
           ((short)uVar477 < (short)uVar190) * uVar477 |
           ((short)uVar477 >= (short)uVar190) * uVar190;
      in_XMM4._8_2_ =
           ((short)uVar69 < (short)uVar307) * uVar69 | ((short)uVar69 >= (short)uVar307) * uVar307;
      in_XMM4._10_2_ =
           ((short)uVar73 < (short)uVar311) * uVar73 | ((short)uVar73 >= (short)uVar311) * uVar311;
      in_XMM4._12_2_ =
           ((short)uVar484 < (short)uVar315) * uVar484 |
           ((short)uVar484 >= (short)uVar315) * uVar315;
      in_XMM4._14_2_ =
           ((short)uVar77 < (short)uVar320) * uVar77 | ((short)uVar77 >= (short)uVar320) * uVar320;
      auVar57 = psraw(auVar305,0xf);
      auVar203 = pmovsxbw(auVar105,0x808080808080808);
      auVar306._0_2_ = auVar305._0_2_ + auVar203._0_2_ + auVar57._0_2_;
      auVar306._2_2_ = auVar305._2_2_ + auVar203._2_2_ + auVar57._2_2_;
      auVar306._4_2_ = auVar305._4_2_ + auVar203._4_2_ + auVar57._4_2_;
      auVar306._6_2_ = auVar305._6_2_ + auVar203._6_2_ + auVar57._6_2_;
      auVar306._8_2_ = auVar305._8_2_ + auVar203._8_2_ + auVar57._8_2_;
      auVar306._10_2_ = auVar305._10_2_ + auVar203._10_2_ + auVar57._10_2_;
      auVar306._12_2_ = auVar305._12_2_ + auVar203._12_2_ + auVar57._12_2_;
      auVar306._14_2_ = auVar305._14_2_ + auVar203._14_2_ + auVar57._14_2_;
      auVar57 = psraw(auVar361,0xf);
      auVar362._0_2_ = auVar361._0_2_ + auVar203._0_2_ + auVar57._0_2_;
      auVar362._2_2_ = auVar361._2_2_ + auVar203._2_2_ + auVar57._2_2_;
      auVar362._4_2_ = auVar361._4_2_ + auVar203._4_2_ + auVar57._4_2_;
      auVar362._6_2_ = auVar361._6_2_ + auVar203._6_2_ + auVar57._6_2_;
      auVar362._8_2_ = auVar361._8_2_ + auVar203._8_2_ + auVar57._8_2_;
      auVar362._10_2_ = auVar361._10_2_ + auVar203._10_2_ + auVar57._10_2_;
      auVar362._12_2_ = auVar361._12_2_ + auVar203._12_2_ + auVar57._12_2_;
      auVar362._14_2_ = auVar361._14_2_ + auVar203._14_2_ + auVar57._14_2_;
      auVar57 = psraw(auVar306,4);
      sVar294 = auVar57._0_2_ + sVar294;
      sVar308 = auVar57._2_2_ + sVar308;
      sVar310 = auVar57._4_2_ + sVar310;
      sVar312 = auVar57._6_2_ + sVar312;
      sVar314 = auVar57._8_2_ + sVar314;
      sVar316 = auVar57._10_2_ + sVar316;
      sVar318 = auVar57._12_2_ + sVar318;
      sVar321 = auVar57._14_2_ + sVar321;
      uVar41 = (sVar294 < (short)in_XMM5._0_2_) * in_XMM5._0_2_ |
               (ushort)(sVar294 >= (short)in_XMM5._0_2_) * sVar294;
      uVar61 = (sVar308 < (short)in_XMM5._2_2_) * in_XMM5._2_2_ |
               (ushort)(sVar308 >= (short)in_XMM5._2_2_) * sVar308;
      uVar65 = (sVar310 < (short)in_XMM5._4_2_) * in_XMM5._4_2_ |
               (ushort)(sVar310 >= (short)in_XMM5._4_2_) * sVar310;
      uVar477 = (sVar312 < (short)in_XMM5._6_2_) * in_XMM5._6_2_ |
                (ushort)(sVar312 >= (short)in_XMM5._6_2_) * sVar312;
      uVar69 = (sVar314 < (short)in_XMM5._8_2_) * in_XMM5._8_2_ |
               (ushort)(sVar314 >= (short)in_XMM5._8_2_) * sVar314;
      uVar73 = (sVar316 < (short)in_XMM5._10_2_) * in_XMM5._10_2_ |
               (ushort)(sVar316 >= (short)in_XMM5._10_2_) * sVar316;
      uVar484 = (sVar318 < (short)in_XMM5._12_2_) * in_XMM5._12_2_ |
                (ushort)(sVar318 >= (short)in_XMM5._12_2_) * sVar318;
      uVar77 = (sVar321 < (short)in_XMM5._14_2_) * in_XMM5._14_2_ |
               (ushort)(sVar321 >= (short)in_XMM5._14_2_) * sVar321;
      in_XMM7._0_2_ =
           ((short)uVar381 < (short)uVar41) * uVar381 | ((short)uVar381 >= (short)uVar41) * uVar41;
      in_XMM7._2_2_ =
           ((short)uVar388 < (short)uVar61) * uVar388 | ((short)uVar388 >= (short)uVar61) * uVar61;
      in_XMM7._4_2_ =
           ((short)uVar392 < (short)uVar65) * uVar392 | ((short)uVar392 >= (short)uVar65) * uVar65;
      in_XMM7._6_2_ =
           ((short)uVar396 < (short)uVar477) * uVar396 |
           ((short)uVar396 >= (short)uVar477) * uVar477;
      in_XMM7._8_2_ =
           ((short)uVar400 < (short)uVar69) * uVar400 | ((short)uVar400 >= (short)uVar69) * uVar69;
      in_XMM7._10_2_ =
           ((short)uVar469 < (short)uVar73) * uVar469 | ((short)uVar469 >= (short)uVar73) * uVar73;
      in_XMM7._12_2_ =
           ((short)uVar472 < (short)uVar484) * uVar472 |
           ((short)uVar472 >= (short)uVar484) * uVar484;
      in_XMM7._14_2_ =
           ((short)uVar475 < (short)uVar77) * uVar475 | ((short)uVar475 >= (short)uVar77) * uVar77;
      auVar57 = psraw(auVar362,4);
      sVar349 = auVar57._0_2_ + sVar349;
      sVar364 = auVar57._2_2_ + sVar364;
      sVar348 = auVar57._4_2_ + sVar348;
      sVar367 = auVar57._6_2_ + sVar367;
      sVar363 = auVar57._8_2_ + sVar363;
      sVar372 = auVar57._10_2_ + sVar372;
      sVar365 = auVar57._12_2_ + sVar365;
      sVar379 = auVar57._14_2_ + sVar379;
      uVar41 = (sVar349 < (short)in_XMM4._0_2_) * in_XMM4._0_2_ |
               (ushort)(sVar349 >= (short)in_XMM4._0_2_) * sVar349;
      uVar61 = (sVar364 < (short)in_XMM4._2_2_) * in_XMM4._2_2_ |
               (ushort)(sVar364 >= (short)in_XMM4._2_2_) * sVar364;
      uVar65 = (sVar348 < (short)in_XMM4._4_2_) * in_XMM4._4_2_ |
               (ushort)(sVar348 >= (short)in_XMM4._4_2_) * sVar348;
      uVar477 = (sVar367 < (short)in_XMM4._6_2_) * in_XMM4._6_2_ |
                (ushort)(sVar367 >= (short)in_XMM4._6_2_) * sVar367;
      uVar69 = (sVar363 < (short)in_XMM4._8_2_) * in_XMM4._8_2_ |
               (ushort)(sVar363 >= (short)in_XMM4._8_2_) * sVar363;
      uVar73 = (sVar372 < (short)in_XMM4._10_2_) * in_XMM4._10_2_ |
               (ushort)(sVar372 >= (short)in_XMM4._10_2_) * sVar372;
      uVar484 = (sVar365 < (short)in_XMM4._12_2_) * in_XMM4._12_2_ |
                (ushort)(sVar365 >= (short)in_XMM4._12_2_) * sVar365;
      uVar77 = (sVar379 < (short)in_XMM4._14_2_) * in_XMM4._14_2_ |
               (ushort)(sVar379 >= (short)in_XMM4._14_2_) * sVar379;
      uVar41 = ((short)uVar270 < (short)uVar41) * uVar270 |
               ((short)uVar270 >= (short)uVar41) * uVar41;
      uVar61 = ((short)uVar286 < (short)uVar61) * uVar286 |
               ((short)uVar286 >= (short)uVar61) * uVar61;
      uVar65 = ((short)uVar287 < (short)uVar65) * uVar287 |
               ((short)uVar287 >= (short)uVar65) * uVar65;
      uVar477 = ((short)uVar288 < (short)uVar477) * uVar288 |
                ((short)uVar288 >= (short)uVar477) * uVar477;
      uVar69 = ((short)uVar289 < (short)uVar69) * uVar289 |
               ((short)uVar289 >= (short)uVar69) * uVar69;
      uVar73 = ((short)uVar290 < (short)uVar73) * uVar290 |
               ((short)uVar290 >= (short)uVar73) * uVar73;
      uVar484 = ((short)uVar291 < (short)uVar484) * uVar291 |
                ((short)uVar291 >= (short)uVar484) * uVar484;
      uVar77 = ((short)uVar292 < (short)uVar77) * uVar292 |
               ((short)uVar292 >= (short)uVar77) * uVar77;
      *(char *)((long)dest + 0xc) =
           (0 < (short)in_XMM7._8_2_) * ((short)in_XMM7._8_2_ < 0x100) * (char)in_XMM7._8_2_ -
           (0xff < (short)in_XMM7._8_2_);
      *(char *)((long)dest + 0xd) =
           (0 < (short)in_XMM7._10_2_) * ((short)in_XMM7._10_2_ < 0x100) * (char)in_XMM7._10_2_ -
           (0xff < (short)in_XMM7._10_2_);
      *(char *)((long)dest + 0xe) =
           (0 < (short)in_XMM7._12_2_) * ((short)in_XMM7._12_2_ < 0x100) * (char)in_XMM7._12_2_ -
           (0xff < (short)in_XMM7._12_2_);
      *(char *)((long)dest + 0xf) =
           (0 < (short)in_XMM7._14_2_) * ((short)in_XMM7._14_2_ < 0x100) * (char)in_XMM7._14_2_ -
           (0xff < (short)in_XMM7._14_2_);
      *(char *)((long)dest + lVar35 + 8) =
           (0 < (short)in_XMM7._0_2_) * ((short)in_XMM7._0_2_ < 0x100) * (char)in_XMM7._0_2_ -
           (0xff < (short)in_XMM7._0_2_);
      *(char *)((long)dest + lVar35 + 9) =
           (0 < (short)in_XMM7._2_2_) * ((short)in_XMM7._2_2_ < 0x100) * (char)in_XMM7._2_2_ -
           (0xff < (short)in_XMM7._2_2_);
      *(char *)((long)dest + lVar35 + 10) =
           (0 < (short)in_XMM7._4_2_) * ((short)in_XMM7._4_2_ < 0x100) * (char)in_XMM7._4_2_ -
           (0xff < (short)in_XMM7._4_2_);
      *(char *)((long)dest + lVar35 + 0xb) =
           (0 < (short)in_XMM7._6_2_) * ((short)in_XMM7._6_2_ < 0x100) * (char)in_XMM7._6_2_ -
           (0xff < (short)in_XMM7._6_2_);
      *(char *)((long)dest + lVar35 * 2 + 4) =
           (0 < (short)uVar69) * ((short)uVar69 < 0x100) * (char)uVar69 - (0xff < (short)uVar69);
      *(char *)((long)dest + lVar35 * 2 + 5) =
           (0 < (short)uVar73) * ((short)uVar73 < 0x100) * (char)uVar73 - (0xff < (short)uVar73);
      *(char *)((long)dest + lVar35 * 2 + 6) =
           (0 < (short)uVar484) * ((short)uVar484 < 0x100) * (char)uVar484 - (0xff < (short)uVar484)
      ;
      *(char *)((long)dest + lVar35 * 2 + 7) =
           (0 < (short)uVar77) * ((short)uVar77 < 0x100) * (char)uVar77 - (0xff < (short)uVar77);
      pcVar2 = (char *)((long)dest + lVar35 * 3);
      *pcVar2 = (0 < (short)uVar41) * ((short)uVar41 < 0x100) * (char)uVar41 -
                (0xff < (short)uVar41);
      pcVar2[1] = (0 < (short)uVar61) * ((short)uVar61 < 0x100) * (char)uVar61 -
                  (0xff < (short)uVar61);
      pcVar2[2] = (0 < (short)uVar65) * ((short)uVar65 < 0x100) * (char)uVar65 -
                  (0xff < (short)uVar65);
      pcVar2[3] = (0 < (short)uVar477) * ((short)uVar477 < 0x100) * (char)uVar477 -
                  (0xff < (short)uVar477);
      dest = (void *)((long)dest + lVar35 * 4);
      in = in + 0x240;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_0)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  }
}